

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Mish_x86_avx2::forward_inplace(Mish_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [24];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [24];
  undefined1 (*pauVar165) [32];
  undefined1 (*pauVar166) [16];
  long in_RSI;
  double dVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  __m128 _p_3;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _p_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m256 _p;
  int i;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  __m256 two;
  __m256 one_2;
  __m256 two_2;
  __m256 one_12;
  __m256 y_1;
  __m256 z_1;
  __m256 tmp_1;
  __m256 mask_1;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 y_7;
  __m256 z_7;
  __m256 tmp_7;
  __m256 mask_7;
  __m256 e_2;
  __m256 invalid_mask_2;
  __m256 one_11;
  __m256i imm0_4;
  __m256 pow2n;
  __m256 y;
  __m256 z;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  __m256 pow2n_4;
  __m256 y_6;
  __m256 z_6;
  __m256 mask_6;
  __m256 one_10;
  __m256i imm0_3;
  __m256 fx_4;
  __m256 tmp_6;
  __m256 one_13;
  __m256 pow2n_5;
  __m256 y_8;
  __m256 z_8;
  __m256 mask_8;
  __m256 one_14;
  __m256i imm0_5;
  __m256 fx_5;
  __m256 tmp_8;
  __m256 one_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 z_2;
  __m256 mask_2;
  __m256 one_4;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_2;
  __m128 two_1;
  __m128 one_7;
  __m128 two_3;
  __m128 one_17;
  v4sf y_4;
  v4sf z_4;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_6;
  v4si emm0_1;
  v4sf y_10;
  v4sf z_10;
  v4sf tmp_10;
  v4sf mask_10;
  v4sf e_3;
  v4sf invalid_mask_3;
  v4sf one_16;
  v4si emm0_4;
  v4sf pow2n_2;
  v4sf y_3;
  v4sf z_3;
  v4sf mask_3;
  v4sf one_5;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_3;
  v4sf pow2n_6;
  v4sf y_9;
  v4sf z_9;
  v4sf mask_9;
  v4sf one_15;
  v4si emm0_3;
  v4sf fx_6;
  v4sf tmp_9;
  __m128 one_18;
  v4sf pow2n_7;
  v4sf y_11;
  v4sf z_11;
  v4sf mask_11;
  v4sf one_19;
  v4si emm0_5;
  v4sf fx_7;
  v4sf tmp_11;
  __m128 one_8;
  v4sf pow2n_3;
  v4sf y_5;
  v4sf z_5;
  v4sf mask_5;
  v4sf one_9;
  v4si emm0_2;
  v4sf fx_3;
  v4sf tmp_5;
  undefined8 in_stack_ffffffffffff98e8;
  undefined1 in_stack_ffffffffffff98f0 [16];
  undefined8 local_66e0;
  undefined8 uStack_66d8;
  undefined8 local_6620;
  undefined8 uStack_6618;
  undefined8 local_65b0;
  undefined8 uStack_65a8;
  undefined8 local_65a0;
  undefined8 uStack_6598;
  undefined8 uStack_6590;
  undefined8 uStack_6588;
  int local_656c;
  Mat local_6568;
  undefined1 (*local_6520) [32];
  int local_6514;
  undefined8 local_6510;
  undefined8 uStack_6508;
  int local_64fc;
  Mat local_64f8;
  undefined1 (*local_64b0) [16];
  int local_64a4;
  undefined8 local_64a0;
  undefined8 uStack_6498;
  undefined8 uStack_6490;
  undefined8 uStack_6488;
  int local_6468;
  Mat local_6458;
  undefined1 (*local_6410) [32];
  int local_6408;
  int local_6404;
  int local_6400;
  int local_63fc;
  int local_63f8;
  int local_63f4;
  undefined1 (*local_63d0) [32];
  undefined1 (*local_63c8) [32];
  undefined8 local_63c0;
  undefined8 uStack_63b8;
  undefined8 uStack_63b0;
  undefined8 uStack_63a8;
  undefined8 local_63a0;
  undefined8 uStack_6398;
  undefined8 uStack_6390;
  undefined8 uStack_6388;
  undefined8 local_6380;
  undefined8 uStack_6378;
  undefined8 uStack_6370;
  undefined8 uStack_6368;
  undefined1 (*local_6348) [32];
  undefined8 local_6340;
  undefined8 uStack_6338;
  undefined8 uStack_6330;
  undefined8 uStack_6328;
  undefined1 (*local_6318) [32];
  undefined1 (*local_6310) [32];
  undefined1 (*local_6308) [16];
  undefined8 local_6300;
  undefined8 uStack_62f8;
  undefined8 local_62f0;
  undefined8 uStack_62e8;
  undefined8 local_62e0;
  undefined8 uStack_62d8;
  undefined1 (*local_62c8) [32];
  undefined8 local_62c0;
  undefined8 uStack_62b8;
  undefined1 (*local_62a8) [16];
  undefined1 local_62a0 [8];
  float fStack_6298;
  float fStack_6294;
  undefined8 local_6280;
  undefined8 uStack_6278;
  undefined8 uStack_6270;
  undefined8 uStack_6268;
  undefined1 local_6260 [8];
  float fStack_6258;
  float fStack_6254;
  undefined8 local_6240;
  undefined8 uStack_6238;
  undefined8 uStack_6230;
  undefined8 uStack_6228;
  undefined8 local_6220;
  undefined8 uStack_6218;
  undefined8 uStack_6210;
  undefined8 uStack_6208;
  undefined8 local_6200;
  undefined8 uStack_61f8;
  undefined8 uStack_61f0;
  undefined8 uStack_61e8;
  undefined8 local_61e0;
  undefined8 uStack_61d8;
  undefined8 uStack_61d0;
  undefined8 uStack_61c8;
  undefined8 local_61c0;
  undefined8 uStack_61b8;
  undefined8 uStack_61b0;
  undefined8 uStack_61a8;
  undefined8 local_61a0;
  undefined8 uStack_6198;
  undefined8 uStack_6190;
  undefined8 uStack_6188;
  undefined8 local_6180;
  undefined8 uStack_6178;
  undefined8 uStack_6170;
  undefined8 uStack_6168;
  undefined8 local_6160;
  undefined8 uStack_6158;
  undefined8 uStack_6150;
  undefined8 uStack_6148;
  undefined8 local_6140;
  undefined8 uStack_6138;
  undefined8 uStack_6130;
  undefined8 uStack_6128;
  undefined8 local_6120;
  undefined8 uStack_6118;
  undefined8 uStack_6110;
  undefined8 uStack_6108;
  undefined8 local_6100;
  undefined8 uStack_60f8;
  undefined8 uStack_60f0;
  undefined8 uStack_60e8;
  undefined1 local_60e0 [8];
  undefined8 uStack_60d8;
  undefined8 uStack_60d0;
  undefined8 uStack_60c8;
  float local_60c0;
  float fStack_60bc;
  float fStack_60b8;
  float fStack_60b4;
  float fStack_60b0;
  float fStack_60ac;
  float fStack_60a8;
  float fStack_60a4;
  undefined1 local_60a0 [8];
  undefined8 uStack_6098;
  undefined8 uStack_6090;
  undefined8 uStack_6088;
  undefined1 local_6080 [32];
  undefined1 local_6060 [8];
  undefined8 uStack_6058;
  undefined8 uStack_6050;
  undefined8 uStack_6048;
  undefined1 local_6040 [32];
  undefined4 local_6020;
  undefined4 uStack_601c;
  undefined4 uStack_6018;
  undefined4 uStack_6014;
  undefined4 uStack_6010;
  undefined4 uStack_600c;
  undefined4 uStack_6008;
  undefined4 uStack_6004;
  undefined1 local_6000 [32];
  undefined1 local_5fe0 [8];
  undefined8 uStack_5fd8;
  undefined8 uStack_5fd0;
  undefined8 uStack_5fc8;
  undefined4 local_5fc0;
  undefined4 uStack_5fbc;
  undefined4 uStack_5fb8;
  undefined4 uStack_5fb4;
  undefined4 uStack_5fb0;
  undefined4 uStack_5fac;
  undefined4 uStack_5fa8;
  undefined4 uStack_5fa4;
  undefined8 local_5fa0;
  undefined8 uStack_5f98;
  undefined8 uStack_5f90;
  undefined8 uStack_5f88;
  undefined4 local_5f80;
  undefined4 uStack_5f7c;
  undefined4 uStack_5f78;
  undefined4 uStack_5f74;
  undefined4 uStack_5f70;
  undefined4 uStack_5f6c;
  undefined4 uStack_5f68;
  undefined4 uStack_5f64;
  undefined8 local_5f60;
  undefined8 uStack_5f58;
  undefined8 uStack_5f50;
  undefined8 uStack_5f48;
  undefined4 local_5f40;
  undefined4 uStack_5f3c;
  undefined4 uStack_5f38;
  undefined4 uStack_5f34;
  undefined4 uStack_5f30;
  undefined4 uStack_5f2c;
  undefined4 uStack_5f28;
  undefined4 uStack_5f24;
  undefined8 local_5f20;
  undefined8 uStack_5f18;
  undefined8 uStack_5f10;
  undefined8 uStack_5f08;
  undefined8 local_5f00;
  undefined8 uStack_5ef8;
  undefined8 uStack_5ef0;
  undefined8 uStack_5ee8;
  undefined8 local_5ee0;
  undefined8 uStack_5ed8;
  undefined8 uStack_5ed0;
  undefined8 uStack_5ec8;
  undefined8 local_5ec0;
  undefined8 uStack_5eb8;
  undefined8 uStack_5eb0;
  undefined8 uStack_5ea8;
  undefined8 local_5ea0;
  undefined8 uStack_5e98;
  undefined8 uStack_5e90;
  undefined8 uStack_5e88;
  undefined8 local_5e80;
  undefined8 uStack_5e78;
  undefined8 uStack_5e70;
  undefined8 uStack_5e68;
  undefined8 local_5e60;
  undefined8 uStack_5e58;
  undefined8 uStack_5e50;
  undefined8 uStack_5e48;
  undefined8 local_5e40;
  undefined8 uStack_5e38;
  undefined8 uStack_5e30;
  undefined8 uStack_5e28;
  undefined8 local_5e20;
  undefined8 uStack_5e18;
  undefined8 uStack_5e10;
  undefined8 uStack_5e08;
  undefined8 local_5e00;
  undefined8 uStack_5df8;
  undefined8 uStack_5df0;
  undefined8 uStack_5de8;
  undefined8 local_5de0;
  undefined8 uStack_5dd8;
  undefined8 uStack_5dd0;
  undefined8 uStack_5dc8;
  undefined8 local_5dc0;
  undefined8 uStack_5db8;
  undefined8 uStack_5db0;
  undefined8 uStack_5da8;
  undefined8 local_5da0;
  undefined8 uStack_5d98;
  undefined8 uStack_5d90;
  undefined8 uStack_5d88;
  undefined8 local_5d80;
  undefined8 uStack_5d78;
  undefined8 uStack_5d70;
  undefined8 uStack_5d68;
  undefined8 local_5d60;
  undefined8 uStack_5d58;
  undefined8 uStack_5d50;
  undefined8 uStack_5d48;
  undefined8 local_5d40;
  undefined8 uStack_5d38;
  undefined8 uStack_5d30;
  undefined8 uStack_5d28;
  undefined8 local_5d20;
  undefined8 uStack_5d18;
  undefined8 uStack_5d10;
  undefined8 uStack_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined8 local_5ce0;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined8 local_5cc0;
  undefined8 uStack_5cb8;
  undefined8 uStack_5cb0;
  undefined8 uStack_5ca8;
  undefined8 local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined8 local_5c80;
  undefined8 uStack_5c78;
  undefined8 uStack_5c70;
  undefined8 uStack_5c68;
  undefined8 local_5c60;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined1 local_5c40 [8];
  undefined8 uStack_5c38;
  undefined8 uStack_5c30;
  undefined8 uStack_5c28;
  float local_5c20;
  float fStack_5c1c;
  float fStack_5c18;
  float fStack_5c14;
  float fStack_5c10;
  float fStack_5c0c;
  float fStack_5c08;
  float fStack_5c04;
  undefined1 local_5c00 [8];
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined1 local_5be0 [32];
  undefined1 local_5bc0 [8];
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined1 local_5ba0 [32];
  undefined4 local_5b80;
  undefined4 uStack_5b7c;
  undefined4 uStack_5b78;
  undefined4 uStack_5b74;
  undefined4 uStack_5b70;
  undefined4 uStack_5b6c;
  undefined4 uStack_5b68;
  undefined4 uStack_5b64;
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [8];
  undefined8 uStack_5b38;
  undefined8 uStack_5b30;
  undefined8 uStack_5b28;
  undefined4 local_5b20;
  undefined4 uStack_5b1c;
  undefined4 uStack_5b18;
  undefined4 uStack_5b14;
  undefined4 uStack_5b10;
  undefined4 uStack_5b0c;
  undefined4 uStack_5b08;
  undefined4 uStack_5b04;
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined4 local_5ae0;
  undefined4 uStack_5adc;
  undefined4 uStack_5ad8;
  undefined4 uStack_5ad4;
  undefined4 uStack_5ad0;
  undefined4 uStack_5acc;
  undefined4 uStack_5ac8;
  undefined4 uStack_5ac4;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined4 local_5aa0;
  undefined4 uStack_5a9c;
  undefined4 uStack_5a98;
  undefined4 uStack_5a94;
  undefined4 uStack_5a90;
  undefined4 uStack_5a8c;
  undefined4 uStack_5a88;
  undefined4 uStack_5a84;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  undefined8 local_5a40;
  undefined8 uStack_5a38;
  undefined8 uStack_5a30;
  undefined8 uStack_5a28;
  undefined8 local_5a20;
  undefined8 uStack_5a18;
  undefined8 uStack_5a10;
  undefined8 uStack_5a08;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 uStack_59f0;
  undefined8 uStack_59e8;
  undefined8 local_59e0;
  undefined8 uStack_59d8;
  undefined8 uStack_59d0;
  undefined8 uStack_59c8;
  undefined8 local_59c0;
  undefined8 uStack_59b8;
  undefined8 uStack_59b0;
  undefined8 uStack_59a8;
  undefined8 local_59a0;
  undefined8 uStack_5998;
  undefined8 uStack_5990;
  undefined8 uStack_5988;
  undefined8 local_5980;
  undefined8 uStack_5978;
  undefined8 uStack_5970;
  undefined8 uStack_5968;
  undefined8 local_5960;
  undefined8 uStack_5958;
  undefined8 uStack_5950;
  undefined8 uStack_5948;
  undefined8 local_5940;
  undefined8 uStack_5938;
  undefined8 uStack_5930;
  undefined8 uStack_5928;
  undefined8 local_5920;
  undefined8 uStack_5918;
  undefined8 uStack_5910;
  undefined8 uStack_5908;
  undefined8 local_5900;
  undefined8 uStack_58f8;
  undefined8 uStack_58f0;
  undefined8 uStack_58e8;
  undefined8 local_58e0;
  undefined8 uStack_58d8;
  undefined8 uStack_58d0;
  undefined8 uStack_58c8;
  undefined8 local_58c0;
  undefined8 uStack_58b8;
  undefined8 uStack_58b0;
  undefined8 uStack_58a8;
  undefined8 local_58a0;
  undefined8 uStack_5898;
  undefined8 uStack_5890;
  undefined8 uStack_5888;
  undefined8 local_5880;
  undefined8 uStack_5878;
  undefined8 uStack_5870;
  undefined8 uStack_5868;
  undefined8 local_5860;
  undefined8 uStack_5858;
  undefined8 uStack_5850;
  undefined8 uStack_5848;
  undefined8 local_5840;
  undefined8 uStack_5838;
  undefined8 uStack_5830;
  undefined8 uStack_5828;
  undefined8 local_5820;
  undefined8 uStack_5818;
  undefined8 uStack_5810;
  undefined8 uStack_5808;
  undefined8 local_5800;
  undefined8 uStack_57f8;
  undefined8 uStack_57f0;
  undefined8 uStack_57e8;
  undefined8 local_57e0;
  undefined8 uStack_57d8;
  undefined8 uStack_57d0;
  undefined8 uStack_57c8;
  undefined8 local_57c0;
  undefined8 uStack_57b8;
  undefined8 uStack_57b0;
  undefined8 uStack_57a8;
  undefined8 local_57a0;
  undefined8 uStack_5798;
  undefined8 uStack_5790;
  undefined8 uStack_5788;
  undefined8 local_5780;
  undefined8 uStack_5778;
  undefined8 uStack_5770;
  undefined8 uStack_5768;
  undefined8 local_5760;
  undefined8 uStack_5758;
  undefined8 uStack_5750;
  undefined8 uStack_5748;
  undefined8 local_5740;
  undefined8 uStack_5738;
  undefined8 uStack_5730;
  undefined8 uStack_5728;
  undefined8 local_5720;
  undefined8 uStack_5718;
  undefined8 uStack_5710;
  undefined8 uStack_5708;
  undefined8 local_5700;
  undefined8 uStack_56f8;
  undefined8 uStack_56f0;
  undefined8 uStack_56e8;
  undefined4 local_56e0;
  undefined4 uStack_56dc;
  undefined4 uStack_56d8;
  undefined4 uStack_56d4;
  undefined4 uStack_56d0;
  undefined4 uStack_56cc;
  undefined4 uStack_56c8;
  undefined4 uStack_56c4;
  undefined8 local_56c0;
  undefined8 uStack_56b8;
  undefined8 uStack_56b0;
  undefined8 uStack_56a8;
  undefined4 local_56a0;
  undefined4 uStack_569c;
  undefined4 uStack_5698;
  undefined4 uStack_5694;
  undefined4 uStack_5690;
  undefined4 uStack_568c;
  undefined4 uStack_5688;
  undefined4 uStack_5684;
  undefined8 local_5680;
  undefined8 uStack_5678;
  undefined8 uStack_5670;
  undefined8 uStack_5668;
  undefined4 local_5660;
  undefined4 uStack_565c;
  undefined4 uStack_5658;
  undefined4 uStack_5654;
  undefined4 uStack_5650;
  undefined4 uStack_564c;
  undefined4 uStack_5648;
  undefined4 uStack_5644;
  undefined8 local_5640;
  undefined8 uStack_5638;
  undefined8 uStack_5630;
  undefined8 uStack_5628;
  undefined4 local_5620;
  undefined4 uStack_561c;
  undefined4 uStack_5618;
  undefined4 uStack_5614;
  undefined4 uStack_5610;
  undefined4 uStack_560c;
  undefined4 uStack_5608;
  undefined4 uStack_5604;
  undefined8 local_5600;
  undefined8 uStack_55f8;
  undefined8 uStack_55f0;
  undefined8 uStack_55e8;
  undefined4 local_55e0;
  undefined4 uStack_55dc;
  undefined4 uStack_55d8;
  undefined4 uStack_55d4;
  undefined4 uStack_55d0;
  undefined4 uStack_55cc;
  undefined4 uStack_55c8;
  undefined4 uStack_55c4;
  undefined8 local_55c0;
  undefined8 uStack_55b8;
  undefined8 uStack_55b0;
  undefined8 uStack_55a8;
  undefined4 local_55a0;
  undefined4 uStack_559c;
  undefined4 uStack_5598;
  undefined4 uStack_5594;
  undefined4 uStack_5590;
  undefined4 uStack_558c;
  undefined4 uStack_5588;
  undefined4 uStack_5584;
  undefined8 local_5580;
  undefined8 uStack_5578;
  undefined8 uStack_5570;
  undefined8 uStack_5568;
  undefined4 local_5560;
  undefined4 uStack_555c;
  undefined4 uStack_5558;
  undefined4 uStack_5554;
  undefined4 uStack_5550;
  undefined4 uStack_554c;
  undefined4 uStack_5548;
  undefined4 uStack_5544;
  undefined8 local_5540;
  undefined8 uStack_5538;
  undefined8 uStack_5530;
  undefined8 uStack_5528;
  undefined4 local_5520;
  undefined4 uStack_551c;
  undefined4 uStack_5518;
  undefined4 uStack_5514;
  undefined4 uStack_5510;
  undefined4 uStack_550c;
  undefined4 uStack_5508;
  undefined4 uStack_5504;
  undefined8 local_5500;
  undefined8 uStack_54f8;
  undefined8 uStack_54f0;
  undefined8 uStack_54e8;
  undefined8 local_54e0;
  undefined8 uStack_54d8;
  undefined8 uStack_54d0;
  undefined8 uStack_54c8;
  undefined8 local_54c0;
  undefined8 uStack_54b8;
  undefined8 uStack_54b0;
  undefined8 uStack_54a8;
  undefined8 local_54a0;
  undefined8 uStack_5498;
  undefined8 uStack_5490;
  undefined8 uStack_5488;
  undefined8 local_5480;
  undefined8 uStack_5478;
  undefined8 uStack_5470;
  undefined8 uStack_5468;
  undefined8 local_5460;
  undefined8 uStack_5458;
  undefined8 uStack_5450;
  undefined8 uStack_5448;
  undefined8 local_5440;
  undefined8 uStack_5438;
  undefined8 uStack_5430;
  undefined8 uStack_5428;
  undefined8 local_5420;
  undefined8 uStack_5418;
  undefined8 uStack_5410;
  undefined8 uStack_5408;
  undefined8 local_5400;
  undefined8 uStack_53f8;
  undefined8 uStack_53f0;
  undefined8 uStack_53e8;
  undefined8 local_53e0;
  undefined8 uStack_53d8;
  undefined8 uStack_53d0;
  undefined8 uStack_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  undefined8 uStack_53a8;
  undefined4 local_53a0;
  undefined4 uStack_539c;
  undefined4 uStack_5398;
  undefined4 uStack_5394;
  undefined4 uStack_5390;
  undefined4 uStack_538c;
  undefined4 uStack_5388;
  undefined4 uStack_5384;
  undefined8 local_5380;
  undefined8 uStack_5378;
  undefined8 uStack_5370;
  undefined8 uStack_5368;
  undefined4 local_5360;
  undefined4 uStack_535c;
  undefined4 uStack_5358;
  undefined4 uStack_5354;
  undefined4 uStack_5350;
  undefined4 uStack_534c;
  undefined4 uStack_5348;
  undefined4 uStack_5344;
  undefined8 local_5340;
  undefined8 uStack_5338;
  undefined8 uStack_5330;
  undefined8 uStack_5328;
  undefined4 local_5320;
  undefined4 uStack_531c;
  undefined4 uStack_5318;
  undefined4 uStack_5314;
  undefined4 uStack_5310;
  undefined4 uStack_530c;
  undefined4 uStack_5308;
  undefined4 uStack_5304;
  undefined8 local_5300;
  undefined8 uStack_52f8;
  undefined8 uStack_52f0;
  undefined8 uStack_52e8;
  undefined4 local_52e0;
  undefined4 uStack_52dc;
  undefined4 uStack_52d8;
  undefined4 uStack_52d4;
  undefined4 uStack_52d0;
  undefined4 uStack_52cc;
  undefined4 uStack_52c8;
  undefined4 uStack_52c4;
  undefined8 local_52c0;
  undefined8 uStack_52b8;
  undefined8 uStack_52b0;
  undefined8 uStack_52a8;
  undefined4 local_52a0;
  undefined4 uStack_529c;
  undefined4 uStack_5298;
  undefined4 uStack_5294;
  undefined4 uStack_5290;
  undefined4 uStack_528c;
  undefined4 uStack_5288;
  undefined4 uStack_5284;
  undefined8 local_5280;
  undefined8 uStack_5278;
  undefined8 uStack_5270;
  undefined8 uStack_5268;
  undefined4 local_5260;
  undefined4 uStack_525c;
  undefined4 uStack_5258;
  undefined4 uStack_5254;
  undefined4 uStack_5250;
  undefined4 uStack_524c;
  undefined4 uStack_5248;
  undefined4 uStack_5244;
  undefined8 local_5240;
  undefined8 uStack_5238;
  undefined8 uStack_5230;
  undefined8 uStack_5228;
  undefined4 local_5220;
  undefined4 uStack_521c;
  undefined4 uStack_5218;
  undefined4 uStack_5214;
  undefined4 uStack_5210;
  undefined4 uStack_520c;
  undefined4 uStack_5208;
  undefined4 uStack_5204;
  undefined8 local_5200;
  undefined8 uStack_51f8;
  undefined8 uStack_51f0;
  undefined8 uStack_51e8;
  undefined4 local_51e0;
  undefined4 uStack_51dc;
  undefined4 uStack_51d8;
  undefined4 uStack_51d4;
  undefined4 uStack_51d0;
  undefined4 uStack_51cc;
  undefined4 uStack_51c8;
  undefined4 uStack_51c4;
  undefined8 local_51c0;
  undefined8 uStack_51b8;
  undefined8 uStack_51b0;
  undefined8 uStack_51a8;
  undefined8 local_51a0;
  undefined8 uStack_5198;
  undefined8 uStack_5190;
  undefined8 uStack_5188;
  undefined8 local_5180;
  undefined8 uStack_5178;
  undefined8 uStack_5170;
  undefined8 uStack_5168;
  undefined8 local_5160;
  undefined8 uStack_5158;
  undefined8 uStack_5150;
  undefined8 uStack_5148;
  undefined8 local_5140;
  undefined8 uStack_5138;
  undefined8 uStack_5130;
  undefined8 uStack_5128;
  undefined8 local_5120;
  undefined8 uStack_5118;
  undefined8 uStack_5110;
  undefined8 uStack_5108;
  undefined8 local_5100;
  undefined8 uStack_50f8;
  undefined8 uStack_50f0;
  undefined8 uStack_50e8;
  undefined8 local_50e0;
  undefined8 uStack_50d8;
  undefined8 uStack_50d0;
  undefined8 uStack_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  undefined8 uStack_50a8;
  undefined8 local_50a0;
  undefined8 uStack_5098;
  undefined8 uStack_5090;
  undefined8 uStack_5088;
  float local_5080;
  float fStack_507c;
  float fStack_5078;
  float fStack_5074;
  float fStack_5070;
  float fStack_506c;
  float fStack_5068;
  float fStack_5064;
  float local_5060;
  float fStack_505c;
  float fStack_5058;
  float fStack_5054;
  float fStack_5050;
  float fStack_504c;
  float fStack_5048;
  float fStack_5044;
  undefined1 local_5040 [32];
  undefined4 local_5020;
  undefined4 uStack_501c;
  undefined4 uStack_5018;
  undefined4 uStack_5014;
  undefined4 uStack_5010;
  undefined4 uStack_500c;
  undefined4 uStack_5008;
  undefined4 uStack_5004;
  undefined1 local_5000 [32];
  undefined1 local_4fe0 [8];
  undefined8 uStack_4fd8;
  undefined8 uStack_4fd0;
  undefined8 uStack_4fc8;
  undefined1 local_4fc0 [8];
  undefined8 uStack_4fb8;
  undefined8 uStack_4fb0;
  undefined8 uStack_4fa8;
  undefined1 local_4fa0 [32];
  undefined8 local_4f80;
  undefined8 uStack_4f78;
  undefined8 uStack_4f70;
  undefined8 uStack_4f68;
  undefined8 local_4f60;
  undefined8 uStack_4f58;
  undefined8 uStack_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f40;
  undefined8 uStack_4f38;
  undefined8 uStack_4f30;
  undefined8 uStack_4f28;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 uStack_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4f00;
  undefined8 uStack_4ef8;
  undefined8 uStack_4ef0;
  undefined8 uStack_4ee8;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  undefined8 local_4ec0;
  undefined8 uStack_4eb8;
  undefined8 uStack_4eb0;
  undefined8 uStack_4ea8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined4 local_4d80;
  undefined4 uStack_4d7c;
  undefined4 uStack_4d78;
  undefined4 uStack_4d74;
  undefined4 uStack_4d70;
  undefined4 uStack_4d6c;
  undefined4 uStack_4d68;
  undefined4 uStack_4d64;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined4 local_4d40;
  undefined4 uStack_4d3c;
  undefined4 uStack_4d38;
  undefined4 uStack_4d34;
  undefined4 uStack_4d30;
  undefined4 uStack_4d2c;
  undefined4 uStack_4d28;
  undefined4 uStack_4d24;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined4 local_4d00;
  undefined4 uStack_4cfc;
  undefined4 uStack_4cf8;
  undefined4 uStack_4cf4;
  undefined4 uStack_4cf0;
  undefined4 uStack_4cec;
  undefined4 uStack_4ce8;
  undefined4 uStack_4ce4;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined4 local_4c40;
  undefined4 uStack_4c3c;
  undefined4 uStack_4c38;
  undefined4 uStack_4c34;
  undefined4 uStack_4c30;
  undefined4 uStack_4c2c;
  undefined4 uStack_4c28;
  undefined4 uStack_4c24;
  undefined8 local_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined4 local_4c00;
  undefined4 uStack_4bfc;
  undefined4 uStack_4bf8;
  undefined4 uStack_4bf4;
  undefined4 uStack_4bf0;
  undefined4 uStack_4bec;
  undefined4 uStack_4be8;
  undefined4 uStack_4be4;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined4 local_4bc0;
  undefined4 uStack_4bbc;
  undefined4 uStack_4bb8;
  undefined4 uStack_4bb4;
  undefined4 uStack_4bb0;
  undefined4 uStack_4bac;
  undefined4 uStack_4ba8;
  undefined4 uStack_4ba4;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined4 local_4b80;
  undefined4 uStack_4b7c;
  undefined4 uStack_4b78;
  undefined4 uStack_4b74;
  undefined4 uStack_4b70;
  undefined4 uStack_4b6c;
  undefined4 uStack_4b68;
  undefined4 uStack_4b64;
  undefined8 local_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  undefined4 local_4b40;
  undefined4 uStack_4b3c;
  undefined4 uStack_4b38;
  undefined4 uStack_4b34;
  undefined4 uStack_4b30;
  undefined4 uStack_4b2c;
  undefined4 uStack_4b28;
  undefined4 uStack_4b24;
  undefined8 local_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined4 local_4b00;
  undefined4 uStack_4afc;
  undefined4 uStack_4af8;
  undefined4 uStack_4af4;
  undefined4 uStack_4af0;
  undefined4 uStack_4aec;
  undefined4 uStack_4ae8;
  undefined4 uStack_4ae4;
  undefined8 local_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  float local_4aa0;
  float fStack_4a9c;
  float fStack_4a98;
  float fStack_4a94;
  float fStack_4a90;
  float fStack_4a8c;
  float fStack_4a88;
  float fStack_4a84;
  float local_4a80;
  float fStack_4a7c;
  float fStack_4a78;
  float fStack_4a74;
  float fStack_4a70;
  float fStack_4a6c;
  float fStack_4a68;
  float fStack_4a64;
  undefined1 local_4a60 [32];
  undefined4 local_4a40;
  undefined4 uStack_4a3c;
  undefined4 uStack_4a38;
  undefined4 uStack_4a34;
  undefined4 uStack_4a30;
  undefined4 uStack_4a2c;
  undefined4 uStack_4a28;
  undefined4 uStack_4a24;
  undefined1 local_4a20 [32];
  undefined1 local_4a00 [8];
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  undefined1 local_49e0 [8];
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined1 local_49c0 [32];
  undefined8 local_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  undefined8 local_4960;
  undefined8 uStack_4958;
  undefined8 uStack_4950;
  undefined8 uStack_4948;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  undefined8 local_4920;
  undefined8 uStack_4918;
  undefined8 uStack_4910;
  undefined8 uStack_4908;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 local_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  undefined8 local_48a0;
  undefined8 uStack_4898;
  undefined8 uStack_4890;
  undefined8 uStack_4888;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  undefined8 local_4860;
  undefined8 uStack_4858;
  undefined8 uStack_4850;
  undefined8 uStack_4848;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  undefined8 local_4820;
  undefined8 uStack_4818;
  undefined8 uStack_4810;
  undefined8 uStack_4808;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 local_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  undefined4 local_47a0;
  undefined4 uStack_479c;
  undefined4 uStack_4798;
  undefined4 uStack_4794;
  undefined4 uStack_4790;
  undefined4 uStack_478c;
  undefined4 uStack_4788;
  undefined4 uStack_4784;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  undefined4 local_4760;
  undefined4 uStack_475c;
  undefined4 uStack_4758;
  undefined4 uStack_4754;
  undefined4 uStack_4750;
  undefined4 uStack_474c;
  undefined4 uStack_4748;
  undefined4 uStack_4744;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  undefined4 local_4720;
  undefined4 uStack_471c;
  undefined4 uStack_4718;
  undefined4 uStack_4714;
  undefined4 uStack_4710;
  undefined4 uStack_470c;
  undefined4 uStack_4708;
  undefined4 uStack_4704;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  undefined8 local_46e0;
  undefined8 uStack_46d8;
  undefined8 uStack_46d0;
  undefined8 uStack_46c8;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 local_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined4 local_4660;
  undefined4 uStack_465c;
  undefined4 uStack_4658;
  undefined4 uStack_4654;
  undefined4 uStack_4650;
  undefined4 uStack_464c;
  undefined4 uStack_4648;
  undefined4 uStack_4644;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined4 local_4620;
  undefined4 uStack_461c;
  undefined4 uStack_4618;
  undefined4 uStack_4614;
  undefined4 uStack_4610;
  undefined4 uStack_460c;
  undefined4 uStack_4608;
  undefined4 uStack_4604;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined4 local_45e0;
  undefined4 uStack_45dc;
  undefined4 uStack_45d8;
  undefined4 uStack_45d4;
  undefined4 uStack_45d0;
  undefined4 uStack_45cc;
  undefined4 uStack_45c8;
  undefined4 uStack_45c4;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined4 local_45a0;
  undefined4 uStack_459c;
  undefined4 uStack_4598;
  undefined4 uStack_4594;
  undefined4 uStack_4590;
  undefined4 uStack_458c;
  undefined4 uStack_4588;
  undefined4 uStack_4584;
  undefined8 local_4580;
  undefined8 uStack_4578;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  undefined4 local_4560;
  undefined4 uStack_455c;
  undefined4 uStack_4558;
  undefined4 uStack_4554;
  undefined4 uStack_4550;
  undefined4 uStack_454c;
  undefined4 uStack_4548;
  undefined4 uStack_4544;
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined4 local_4520;
  undefined4 uStack_451c;
  undefined4 uStack_4518;
  undefined4 uStack_4514;
  undefined4 uStack_4510;
  undefined4 uStack_450c;
  undefined4 uStack_4508;
  undefined4 uStack_4504;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined4 local_44d8;
  undefined4 local_44d4;
  undefined4 local_44d0;
  undefined4 local_44cc;
  undefined4 local_44c8;
  undefined4 local_44c4;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined1 local_4480 [32];
  undefined8 local_4460;
  undefined8 uStack_4458;
  undefined8 uStack_4450;
  undefined8 uStack_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined1 local_4420 [32];
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  float local_43e0;
  float fStack_43dc;
  float fStack_43d8;
  float fStack_43d4;
  float fStack_43d0;
  float fStack_43cc;
  float fStack_43c8;
  undefined4 uStack_43c4;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  float local_43a0;
  float fStack_439c;
  float fStack_4398;
  float fStack_4394;
  float fStack_4390;
  float fStack_438c;
  float fStack_4388;
  float fStack_4384;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  float local_4360;
  float fStack_435c;
  float fStack_4358;
  float fStack_4354;
  float fStack_4350;
  float fStack_434c;
  float fStack_4348;
  float fStack_4344;
  float local_4340;
  float fStack_433c;
  float fStack_4338;
  float fStack_4334;
  float fStack_4330;
  float fStack_432c;
  float fStack_4328;
  float fStack_4324;
  undefined1 local_4320 [32];
  undefined4 local_4300;
  undefined4 uStack_42fc;
  undefined4 uStack_42f8;
  undefined4 uStack_42f4;
  undefined4 uStack_42f0;
  undefined4 uStack_42ec;
  undefined4 uStack_42e8;
  undefined4 uStack_42e4;
  undefined1 local_42e0 [32];
  undefined1 local_42c0 [8];
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined1 local_42a0 [8];
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined1 local_4280 [32];
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined8 local_4240;
  undefined8 uStack_4238;
  undefined8 uStack_4230;
  undefined8 uStack_4228;
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 local_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  undefined8 uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 local_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined4 local_4060;
  undefined4 uStack_405c;
  undefined4 uStack_4058;
  undefined4 uStack_4054;
  undefined4 uStack_4050;
  undefined4 uStack_404c;
  undefined4 uStack_4048;
  undefined4 uStack_4044;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined4 local_4020;
  undefined4 uStack_401c;
  undefined4 uStack_4018;
  undefined4 uStack_4014;
  undefined4 uStack_4010;
  undefined4 uStack_400c;
  undefined4 uStack_4008;
  undefined4 uStack_4004;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined4 local_3fe0;
  undefined4 uStack_3fdc;
  undefined4 uStack_3fd8;
  undefined4 uStack_3fd4;
  undefined4 uStack_3fd0;
  undefined4 uStack_3fcc;
  undefined4 uStack_3fc8;
  undefined4 uStack_3fc4;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined4 local_3f20;
  undefined4 uStack_3f1c;
  undefined4 uStack_3f18;
  undefined4 uStack_3f14;
  undefined4 uStack_3f10;
  undefined4 uStack_3f0c;
  undefined4 uStack_3f08;
  undefined4 uStack_3f04;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined4 local_3ee0;
  undefined4 uStack_3edc;
  undefined4 uStack_3ed8;
  undefined4 uStack_3ed4;
  undefined4 uStack_3ed0;
  undefined4 uStack_3ecc;
  undefined4 uStack_3ec8;
  undefined4 uStack_3ec4;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined4 local_3ea0;
  undefined4 uStack_3e9c;
  undefined4 uStack_3e98;
  undefined4 uStack_3e94;
  undefined4 uStack_3e90;
  undefined4 uStack_3e8c;
  undefined4 uStack_3e88;
  undefined4 uStack_3e84;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined4 local_3e60;
  undefined4 uStack_3e5c;
  undefined4 uStack_3e58;
  undefined4 uStack_3e54;
  undefined4 uStack_3e50;
  undefined4 uStack_3e4c;
  undefined4 uStack_3e48;
  undefined4 uStack_3e44;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined4 local_3e20;
  undefined4 uStack_3e1c;
  undefined4 uStack_3e18;
  undefined4 uStack_3e14;
  undefined4 uStack_3e10;
  undefined4 uStack_3e0c;
  undefined4 uStack_3e08;
  undefined4 uStack_3e04;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined4 local_3de0;
  undefined4 uStack_3ddc;
  undefined4 uStack_3dd8;
  undefined4 uStack_3dd4;
  undefined4 uStack_3dd0;
  undefined4 uStack_3dcc;
  undefined4 uStack_3dc8;
  undefined4 uStack_3dc4;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined4 local_3d84;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  float local_3d60;
  float fStack_3d5c;
  float fStack_3d58;
  float fStack_3d54;
  float fStack_3d50;
  float fStack_3d4c;
  float fStack_3d48;
  undefined4 uStack_3d44;
  undefined8 local_3d40;
  undefined8 uStack_3d38;
  undefined8 uStack_3d30;
  undefined8 uStack_3d28;
  float local_3d20;
  float fStack_3d1c;
  float fStack_3d18;
  float fStack_3d14;
  float fStack_3d10;
  float fStack_3d0c;
  float fStack_3d08;
  float fStack_3d04;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  float local_3ce0;
  float fStack_3cdc;
  float fStack_3cd8;
  float fStack_3cd4;
  float fStack_3cd0;
  float fStack_3ccc;
  float fStack_3cc8;
  float fStack_3cc4;
  float local_3cc0;
  float fStack_3cbc;
  float fStack_3cb8;
  float fStack_3cb4;
  float fStack_3cb0;
  float fStack_3cac;
  float fStack_3ca8;
  float fStack_3ca4;
  undefined1 local_3ca0 [32];
  undefined4 local_3c80;
  undefined4 uStack_3c7c;
  undefined4 uStack_3c78;
  undefined4 uStack_3c74;
  undefined4 uStack_3c70;
  undefined4 uStack_3c6c;
  undefined4 uStack_3c68;
  undefined4 uStack_3c64;
  undefined1 local_3c60 [32];
  undefined1 local_3c40 [8];
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined1 local_3c20 [8];
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined1 local_3c00 [32];
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined4 local_39e0;
  undefined4 uStack_39dc;
  undefined4 uStack_39d8;
  undefined4 uStack_39d4;
  undefined4 uStack_39d0;
  undefined4 uStack_39cc;
  undefined4 uStack_39c8;
  undefined4 uStack_39c4;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined4 local_39a0;
  undefined4 uStack_399c;
  undefined4 uStack_3998;
  undefined4 uStack_3994;
  undefined4 uStack_3990;
  undefined4 uStack_398c;
  undefined4 uStack_3988;
  undefined4 uStack_3984;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined4 local_3960;
  undefined4 uStack_395c;
  undefined4 uStack_3958;
  undefined4 uStack_3954;
  undefined4 uStack_3950;
  undefined4 uStack_394c;
  undefined4 uStack_3948;
  undefined4 uStack_3944;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined4 local_38a0;
  undefined4 uStack_389c;
  undefined4 uStack_3898;
  undefined4 uStack_3894;
  undefined4 uStack_3890;
  undefined4 uStack_388c;
  undefined4 uStack_3888;
  undefined4 uStack_3884;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined4 local_3860;
  undefined4 uStack_385c;
  undefined4 uStack_3858;
  undefined4 uStack_3854;
  undefined4 uStack_3850;
  undefined4 uStack_384c;
  undefined4 uStack_3848;
  undefined4 uStack_3844;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined4 local_3820;
  undefined4 uStack_381c;
  undefined4 uStack_3818;
  undefined4 uStack_3814;
  undefined4 uStack_3810;
  undefined4 uStack_380c;
  undefined4 uStack_3808;
  undefined4 uStack_3804;
  undefined8 local_3800;
  undefined8 uStack_37f8;
  undefined8 uStack_37f0;
  undefined8 uStack_37e8;
  undefined4 local_37e0;
  undefined4 uStack_37dc;
  undefined4 uStack_37d8;
  undefined4 uStack_37d4;
  undefined4 uStack_37d0;
  undefined4 uStack_37cc;
  undefined4 uStack_37c8;
  undefined4 uStack_37c4;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined4 local_37a0;
  undefined4 uStack_379c;
  undefined4 uStack_3798;
  undefined4 uStack_3794;
  undefined4 uStack_3790;
  undefined4 uStack_378c;
  undefined4 uStack_3788;
  undefined4 uStack_3784;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined4 local_3760;
  undefined4 uStack_375c;
  undefined4 uStack_3758;
  undefined4 uStack_3754;
  undefined4 uStack_3750;
  undefined4 uStack_374c;
  undefined4 uStack_3748;
  undefined4 uStack_3744;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined4 local_3704;
  float local_3700;
  float fStack_36fc;
  float fStack_36f8;
  float fStack_36f4;
  float fStack_36f0;
  float fStack_36ec;
  float fStack_36e8;
  float fStack_36e4;
  float local_36e0;
  float fStack_36dc;
  float fStack_36d8;
  float fStack_36d4;
  float fStack_36d0;
  float fStack_36cc;
  float fStack_36c8;
  float fStack_36c4;
  float local_36c0;
  float fStack_36bc;
  float fStack_36b8;
  float fStack_36b4;
  float fStack_36b0;
  float fStack_36ac;
  float fStack_36a8;
  float fStack_36a4;
  float local_36a0;
  float fStack_369c;
  float fStack_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  float fStack_3688;
  float fStack_3684;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 local_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined8 local_33a0;
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined1 local_32c0 [32];
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined1 local_3200 [32];
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined1 local_3180 [32];
  undefined1 local_3160 [32];
  undefined1 local_3140 [32];
  undefined1 local_3120 [32];
  undefined1 local_3100 [32];
  undefined1 local_30e0 [32];
  undefined1 local_30c0 [32];
  undefined1 local_30a0 [32];
  undefined4 local_3080;
  undefined4 uStack_307c;
  undefined4 uStack_3078;
  undefined4 uStack_3074;
  undefined4 uStack_3070;
  undefined4 uStack_306c;
  undefined4 uStack_3068;
  undefined4 uStack_3064;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined4 local_3040;
  undefined4 uStack_303c;
  undefined4 uStack_3038;
  undefined4 uStack_3034;
  undefined4 uStack_3030;
  undefined4 uStack_302c;
  undefined4 uStack_3028;
  undefined4 uStack_3024;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  undefined4 local_3000;
  undefined4 uStack_2ffc;
  undefined4 uStack_2ff8;
  undefined4 uStack_2ff4;
  undefined4 uStack_2ff0;
  undefined4 uStack_2fec;
  undefined4 uStack_2fe8;
  undefined4 uStack_2fe4;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  undefined4 local_2fc0;
  undefined4 uStack_2fbc;
  undefined4 uStack_2fb8;
  undefined4 uStack_2fb4;
  undefined4 uStack_2fb0;
  undefined4 uStack_2fac;
  undefined4 uStack_2fa8;
  undefined4 uStack_2fa4;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined4 local_2f80;
  undefined4 uStack_2f7c;
  undefined4 uStack_2f78;
  undefined4 uStack_2f74;
  undefined4 uStack_2f70;
  undefined4 uStack_2f6c;
  undefined4 uStack_2f68;
  undefined4 uStack_2f64;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined4 local_2f40;
  undefined4 uStack_2f3c;
  undefined4 uStack_2f38;
  undefined4 uStack_2f34;
  undefined4 uStack_2f30;
  undefined4 uStack_2f2c;
  undefined4 uStack_2f28;
  undefined4 uStack_2f24;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  undefined4 local_2ee4;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined4 local_2ea4;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined4 local_2cc0;
  undefined4 uStack_2cbc;
  undefined4 uStack_2cb8;
  undefined4 uStack_2cb4;
  undefined4 uStack_2cb0;
  undefined4 uStack_2cac;
  undefined4 uStack_2ca8;
  undefined4 uStack_2ca4;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined4 local_2c00;
  undefined4 uStack_2bfc;
  undefined4 uStack_2bf8;
  undefined4 uStack_2bf4;
  undefined4 uStack_2bf0;
  undefined4 uStack_2bec;
  undefined4 uStack_2be8;
  undefined4 uStack_2be4;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined4 local_2b80;
  undefined4 uStack_2b7c;
  undefined4 uStack_2b78;
  undefined4 uStack_2b74;
  undefined4 uStack_2b70;
  undefined4 uStack_2b6c;
  undefined4 uStack_2b68;
  undefined4 uStack_2b64;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined4 local_2b00;
  undefined4 uStack_2afc;
  undefined4 uStack_2af8;
  undefined4 uStack_2af4;
  undefined4 uStack_2af0;
  undefined4 uStack_2aec;
  undefined4 uStack_2ae8;
  undefined4 uStack_2ae4;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined4 local_29e4;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined4 local_29a4;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined4 local_2900;
  undefined4 uStack_28fc;
  undefined4 uStack_28f8;
  undefined4 uStack_28f4;
  undefined4 uStack_28f0;
  undefined4 uStack_28ec;
  undefined4 uStack_28e8;
  undefined4 uStack_28e4;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined4 local_28c0;
  undefined4 uStack_28bc;
  undefined4 uStack_28b8;
  undefined4 uStack_28b4;
  undefined4 uStack_28b0;
  undefined4 uStack_28ac;
  undefined4 uStack_28a8;
  undefined4 uStack_28a4;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined4 local_2880;
  undefined4 uStack_287c;
  undefined4 uStack_2878;
  undefined4 uStack_2874;
  undefined4 uStack_2870;
  undefined4 uStack_286c;
  undefined4 uStack_2868;
  undefined4 uStack_2864;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined4 local_2840;
  undefined4 uStack_283c;
  undefined4 uStack_2838;
  undefined4 uStack_2834;
  undefined4 uStack_2830;
  undefined4 uStack_282c;
  undefined4 uStack_2828;
  undefined4 uStack_2824;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined4 local_2664;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined4 local_2624;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined4 local_25e4;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined4 local_25a4;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 local_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined4 local_23e4;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined4 local_23a4;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined4 local_2364;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined4 local_2324;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined1 local_2300 [16];
  undefined1 auStack_22f0 [16];
  undefined4 local_22e0;
  undefined4 local_22dc;
  undefined4 local_22d8;
  undefined4 local_22d4;
  undefined4 local_22d0;
  undefined4 local_22cc;
  undefined4 local_22c8;
  undefined4 local_22c4;
  undefined1 local_22c0 [16];
  undefined1 auStack_22b0 [16];
  undefined4 local_22a0;
  undefined4 local_229c;
  undefined4 local_2298;
  undefined4 local_2294;
  undefined4 local_2290;
  undefined4 local_228c;
  undefined4 local_2288;
  undefined4 local_2284;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined1 auStack_2270 [16];
  undefined4 local_2260;
  undefined4 local_225c;
  undefined4 local_2258;
  undefined4 local_2254;
  undefined4 local_2250;
  undefined4 local_224c;
  undefined4 local_2248;
  undefined4 local_2244;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined1 auStack_2230 [16];
  undefined4 local_2220;
  undefined4 local_221c;
  undefined4 local_2218;
  undefined4 local_2214;
  undefined4 local_2210;
  undefined4 local_220c;
  undefined4 local_2208;
  undefined4 local_2204;
  undefined1 local_2200 [16];
  undefined1 auStack_21f0 [16];
  undefined4 local_21e0;
  undefined4 local_21dc;
  undefined4 local_21d8;
  undefined4 local_21d4;
  undefined4 local_21d0;
  undefined4 local_21cc;
  undefined4 local_21c8;
  undefined4 local_21c4;
  undefined1 local_21c0 [16];
  undefined1 auStack_21b0 [16];
  undefined4 local_21a0;
  undefined4 local_219c;
  undefined4 local_2198;
  undefined4 local_2194;
  undefined4 local_2190;
  undefined4 local_218c;
  undefined4 local_2188;
  undefined4 local_2184;
  undefined1 local_2180 [16];
  undefined1 auStack_2170 [16];
  undefined4 local_2160;
  undefined4 local_215c;
  undefined4 local_2158;
  undefined4 local_2154;
  undefined4 local_2150;
  undefined4 local_214c;
  undefined4 local_2148;
  undefined4 local_2144;
  undefined1 local_2140 [16];
  undefined1 auStack_2130 [16];
  undefined4 local_2110;
  undefined4 local_210c;
  undefined4 local_2108;
  undefined4 local_2104;
  undefined4 local_2100;
  undefined4 local_20fc;
  undefined4 local_20f8;
  undefined4 local_20f4;
  undefined1 local_20f0 [8];
  float fStack_20e8;
  float fStack_20e4;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined1 local_20d0 [8];
  float fStack_20c8;
  float fStack_20c4;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 local_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 local_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined1 local_2070 [8];
  float fStack_2068;
  float fStack_2064;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 local_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 local_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 local_2010;
  undefined8 uStack_2008;
  undefined1 local_2000 [8];
  float fStack_1ff8;
  float fStack_1ff4;
  undefined8 local_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined1 local_1fd0 [8];
  undefined8 uStack_1fc8;
  float local_1fc0;
  float fStack_1fbc;
  float fStack_1fb8;
  float fStack_1fb4;
  undefined8 local_1fb0;
  undefined8 uStack_1fa8;
  undefined1 local_1fa0 [16];
  undefined1 local_1f90 [8];
  undefined8 uStack_1f88;
  undefined1 local_1f80 [16];
  undefined4 local_1f70;
  undefined4 uStack_1f6c;
  undefined4 uStack_1f68;
  undefined4 uStack_1f64;
  undefined1 local_1f60 [16];
  undefined1 local_1f50 [8];
  undefined8 uStack_1f48;
  undefined4 local_1f40;
  undefined4 uStack_1f3c;
  undefined4 uStack_1f38;
  undefined4 uStack_1f34;
  undefined8 local_1f30;
  undefined8 uStack_1f28;
  undefined4 local_1f20;
  undefined4 uStack_1f1c;
  undefined4 uStack_1f18;
  undefined4 uStack_1f14;
  undefined8 local_1f10;
  undefined8 uStack_1f08;
  undefined4 local_1f00;
  undefined4 uStack_1efc;
  undefined4 uStack_1ef8;
  undefined4 uStack_1ef4;
  undefined8 local_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 local_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 local_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 local_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 local_1e70;
  undefined8 uStack_1e68;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 local_1e50;
  undefined8 uStack_1e48;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 local_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 local_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 local_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 local_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 local_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 local_1d90;
  undefined8 uStack_1d88;
  undefined1 local_1d80 [8];
  undefined8 uStack_1d78;
  float local_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float fStack_1d64;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined1 local_1d50 [16];
  undefined1 local_1d40 [8];
  undefined8 uStack_1d38;
  undefined1 local_1d30 [16];
  undefined4 local_1d20;
  undefined4 uStack_1d1c;
  undefined4 uStack_1d18;
  undefined4 uStack_1d14;
  undefined1 local_1d10 [16];
  undefined1 local_1d00 [8];
  undefined8 uStack_1cf8;
  undefined4 local_1cf0;
  undefined4 uStack_1cec;
  undefined4 uStack_1ce8;
  undefined4 uStack_1ce4;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined4 local_1cd0;
  undefined4 uStack_1ccc;
  undefined4 uStack_1cc8;
  undefined4 uStack_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined4 local_1cb0;
  undefined4 uStack_1cac;
  undefined4 uStack_1ca8;
  undefined4 uStack_1ca4;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 local_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 local_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 local_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 local_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 local_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 local_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 local_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 local_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 local_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 local_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 local_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 local_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 local_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 local_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined4 local_1ad0;
  undefined4 uStack_1acc;
  undefined4 uStack_1ac8;
  undefined4 uStack_1ac4;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined4 local_1ab0;
  undefined4 uStack_1aac;
  undefined4 uStack_1aa8;
  undefined4 uStack_1aa4;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined4 local_1a90;
  undefined4 uStack_1a8c;
  undefined4 uStack_1a88;
  undefined4 uStack_1a84;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined4 local_1a70;
  undefined4 uStack_1a6c;
  undefined4 uStack_1a68;
  undefined4 uStack_1a64;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined4 local_1a50;
  undefined4 uStack_1a4c;
  undefined4 uStack_1a48;
  undefined4 uStack_1a44;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined4 local_1a30;
  undefined4 uStack_1a2c;
  undefined4 uStack_1a28;
  undefined4 uStack_1a24;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined4 local_1a10;
  undefined4 uStack_1a0c;
  undefined4 uStack_1a08;
  undefined4 uStack_1a04;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined4 local_19f0;
  undefined4 uStack_19ec;
  undefined4 uStack_19e8;
  undefined4 uStack_19e4;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 local_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 local_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 local_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 local_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 local_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined4 local_1930;
  undefined4 uStack_192c;
  undefined4 uStack_1928;
  undefined4 uStack_1924;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined4 local_1910;
  undefined4 uStack_190c;
  undefined4 uStack_1908;
  undefined4 uStack_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined4 local_18f0;
  undefined4 uStack_18ec;
  undefined4 uStack_18e8;
  undefined4 uStack_18e4;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined4 local_18d0;
  undefined4 uStack_18cc;
  undefined4 uStack_18c8;
  undefined4 uStack_18c4;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined4 local_18b0;
  undefined4 uStack_18ac;
  undefined4 uStack_18a8;
  undefined4 uStack_18a4;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined4 local_1890;
  undefined4 uStack_188c;
  undefined4 uStack_1888;
  undefined4 uStack_1884;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined4 local_1870;
  undefined4 uStack_186c;
  undefined4 uStack_1868;
  undefined4 uStack_1864;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined4 local_1850;
  undefined4 uStack_184c;
  undefined4 uStack_1848;
  undefined4 uStack_1844;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 local_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 local_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 local_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 local_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 local_17b0;
  undefined8 uStack_17a8;
  float local_17a0;
  float fStack_179c;
  float fStack_1798;
  float fStack_1794;
  float local_1790;
  float fStack_178c;
  float fStack_1788;
  float fStack_1784;
  undefined1 local_1780 [16];
  undefined4 local_1770;
  undefined4 uStack_176c;
  undefined4 uStack_1768;
  undefined4 uStack_1764;
  undefined1 local_1760 [16];
  undefined1 local_1750 [8];
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined1 local_1730 [16];
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 local_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 local_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 local_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 local_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 local_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 local_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 local_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 local_1630;
  undefined8 uStack_1628;
  undefined4 local_1620;
  undefined4 uStack_161c;
  undefined4 uStack_1618;
  undefined4 uStack_1614;
  undefined8 local_1610;
  undefined8 uStack_1608;
  undefined4 local_1600;
  undefined4 uStack_15fc;
  undefined4 uStack_15f8;
  undefined4 uStack_15f4;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  undefined4 local_15e0;
  undefined4 uStack_15dc;
  undefined4 uStack_15d8;
  undefined4 uStack_15d4;
  undefined8 local_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined4 local_1580;
  undefined4 uStack_157c;
  undefined4 uStack_1578;
  undefined4 uStack_1574;
  undefined8 local_1570;
  undefined8 uStack_1568;
  undefined4 local_1560;
  undefined4 uStack_155c;
  undefined4 uStack_1558;
  undefined4 uStack_1554;
  undefined8 local_1550;
  undefined8 uStack_1548;
  undefined4 local_1540;
  undefined4 uStack_153c;
  undefined4 uStack_1538;
  undefined4 uStack_1534;
  undefined8 local_1530;
  undefined8 uStack_1528;
  undefined4 local_1520;
  undefined4 uStack_151c;
  undefined4 uStack_1518;
  undefined4 uStack_1514;
  undefined8 local_1510;
  undefined8 uStack_1508;
  undefined4 local_1500;
  undefined4 uStack_14fc;
  undefined4 uStack_14f8;
  undefined4 uStack_14f4;
  undefined8 local_14f0;
  undefined8 uStack_14e8;
  undefined4 local_14e0;
  undefined4 uStack_14dc;
  undefined4 uStack_14d8;
  undefined4 uStack_14d4;
  undefined8 local_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  float local_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  float local_14a0;
  float fStack_149c;
  float fStack_1498;
  float fStack_1494;
  undefined1 local_1490 [16];
  undefined4 local_1480;
  undefined4 uStack_147c;
  undefined4 uStack_1478;
  undefined4 uStack_1474;
  undefined1 local_1470 [16];
  undefined1 local_1460 [8];
  undefined8 uStack_1458;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined1 local_1440 [16];
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 local_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 local_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 local_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 local_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 local_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 local_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined4 local_1330;
  undefined4 uStack_132c;
  undefined4 uStack_1328;
  undefined4 uStack_1324;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined4 local_1310;
  undefined4 uStack_130c;
  undefined4 uStack_1308;
  undefined4 uStack_1304;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined4 local_12f0;
  undefined4 uStack_12ec;
  undefined4 uStack_12e8;
  undefined4 uStack_12e4;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 local_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 local_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined4 local_1290;
  undefined4 uStack_128c;
  undefined4 uStack_1288;
  undefined4 uStack_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined4 local_1270;
  undefined4 uStack_126c;
  undefined4 uStack_1268;
  undefined4 uStack_1264;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined4 local_1250;
  undefined4 uStack_124c;
  undefined4 uStack_1248;
  undefined4 uStack_1244;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined4 local_1230;
  undefined4 uStack_122c;
  undefined4 uStack_1228;
  undefined4 uStack_1224;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined4 local_1210;
  undefined4 uStack_120c;
  undefined4 uStack_1208;
  undefined4 uStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined4 local_11f0;
  undefined4 uStack_11ec;
  undefined4 uStack_11e8;
  undefined4 uStack_11e4;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined4 local_11d0;
  undefined4 uStack_11cc;
  undefined4 uStack_11c8;
  undefined4 uStack_11c4;
  undefined4 local_11b4;
  undefined4 local_11b0;
  undefined4 uStack_11ac;
  undefined4 uStack_11a8;
  undefined4 uStack_11a4;
  undefined4 local_1194;
  undefined4 local_1190;
  undefined4 uStack_118c;
  undefined4 uStack_1188;
  undefined4 uStack_1184;
  undefined4 local_1174;
  undefined4 local_1170;
  undefined4 uStack_116c;
  undefined4 uStack_1168;
  undefined4 uStack_1164;
  undefined4 local_1154;
  undefined4 local_1150;
  undefined4 uStack_114c;
  undefined4 uStack_1148;
  undefined4 uStack_1144;
  undefined4 local_1134;
  undefined4 local_1130;
  undefined4 uStack_112c;
  undefined4 uStack_1128;
  undefined4 uStack_1124;
  undefined4 local_1114;
  undefined8 local_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 local_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 local_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 local_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 local_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 local_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined1 local_1030 [16];
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 local_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 local_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined1 local_fd0 [16];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 local_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 local_f90;
  undefined8 uStack_f88;
  undefined1 local_f80 [16];
  undefined8 local_f70;
  undefined8 uStack_f68;
  undefined1 local_f60 [16];
  undefined8 local_f50;
  undefined8 uStack_f48;
  float local_f40;
  float fStack_f3c;
  float fStack_f38;
  float fStack_f34;
  undefined8 local_f30;
  undefined8 uStack_f28;
  undefined1 local_f20 [16];
  undefined8 local_f10;
  undefined8 uStack_f08;
  float local_f00;
  float fStack_efc;
  float fStack_ef8;
  float fStack_ef4;
  float local_ef0;
  float fStack_eec;
  float fStack_ee8;
  float fStack_ee4;
  undefined1 local_ee0 [16];
  undefined4 local_ed0;
  undefined4 uStack_ecc;
  undefined4 uStack_ec8;
  undefined4 uStack_ec4;
  undefined1 local_ec0 [16];
  undefined1 local_eb0 [8];
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined1 local_e90 [16];
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined1 local_e70 [16];
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined4 local_d80;
  undefined4 uStack_d7c;
  undefined4 uStack_d78;
  undefined4 uStack_d74;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined4 local_d60;
  undefined4 uStack_d5c;
  undefined4 uStack_d58;
  undefined4 uStack_d54;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined4 local_d40;
  undefined4 uStack_d3c;
  undefined4 uStack_d38;
  undefined4 uStack_d34;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined4 local_ce0;
  undefined4 uStack_cdc;
  undefined4 uStack_cd8;
  undefined4 uStack_cd4;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined4 local_cc0;
  undefined4 uStack_cbc;
  undefined4 uStack_cb8;
  undefined4 uStack_cb4;
  undefined8 local_cb0;
  undefined8 uStack_ca8;
  undefined4 local_ca0;
  undefined4 uStack_c9c;
  undefined4 uStack_c98;
  undefined4 uStack_c94;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined4 local_c80;
  undefined4 uStack_c7c;
  undefined4 uStack_c78;
  undefined4 uStack_c74;
  undefined8 local_c70;
  undefined8 uStack_c68;
  undefined4 local_c60;
  undefined4 uStack_c5c;
  undefined4 uStack_c58;
  undefined4 uStack_c54;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined4 local_c40;
  undefined4 uStack_c3c;
  undefined4 uStack_c38;
  undefined4 uStack_c34;
  undefined8 local_c30;
  undefined8 uStack_c28;
  undefined4 local_c20;
  undefined4 uStack_c1c;
  undefined4 uStack_c18;
  undefined4 uStack_c14;
  undefined4 local_c04;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  ulong uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined1 local_b50 [16];
  undefined8 local_b40;
  undefined8 uStack_b38;
  float local_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  undefined1 local_b10 [16];
  undefined4 local_b00;
  undefined4 uStack_afc;
  undefined4 uStack_af8;
  undefined4 uStack_af4;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [8];
  undefined8 uStack_ad8;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [16];
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined1 local_aa0 [16];
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined4 local_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined4 local_990;
  undefined4 uStack_98c;
  undefined4 uStack_988;
  undefined4 uStack_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined4 local_970;
  undefined4 uStack_96c;
  undefined4 uStack_968;
  undefined4 uStack_964;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined4 local_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined4 local_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e8;
  undefined4 uStack_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined4 local_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined4 local_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined4 local_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined4 local_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined4 local_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined4 local_834;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  ulong uStack_7b8;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [16];
  float local_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [16];
  undefined8 local_770;
  ulong uStack_768;
  undefined1 local_760 [16];
  undefined8 local_750;
  ulong uStack_748;
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined8 local_6f0;
  ulong uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  ulong uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined4 local_6b0;
  undefined4 uStack_6ac;
  undefined4 uStack_6a8;
  undefined4 uStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined4 local_690;
  undefined4 uStack_68c;
  undefined4 uStack_688;
  undefined4 uStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined4 local_670;
  undefined4 uStack_66c;
  undefined4 uStack_668;
  undefined4 uStack_664;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined4 local_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined4 local_630;
  undefined4 uStack_62c;
  undefined4 uStack_628;
  undefined4 uStack_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined4 local_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined4 local_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined4 local_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined4 local_4d0;
  undefined4 uStack_4cc;
  undefined4 uStack_4c8;
  undefined4 uStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined4 local_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined4 local_330;
  undefined4 uStack_32c;
  undefined4 uStack_328;
  undefined4 uStack_324;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined4 local_310;
  undefined4 uStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined4 local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined4 local_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined4 local_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined4 local_a4;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_63f4 = *(int *)(in_RSI + 0x2c);
  local_63f8 = *(int *)(in_RSI + 0x30);
  local_63fc = *(int *)(in_RSI + 0x38);
  local_6400 = local_63f4 * local_63f8;
  local_6404 = *(int *)(in_RSI + 0x18);
  if (local_6404 == 8) {
    local_6404 = 8;
    for (local_6408 = 0; local_6408 < local_63fc; local_6408 = local_6408 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffff98f0._0_8_,
                         (int)((ulong)in_stack_ffffffffffff98e8 >> 0x20));
      pauVar165 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_6458);
      ncnn::Mat::~Mat((Mat *)0x8f3add);
      local_6410 = pauVar165;
      for (local_6468 = 0; local_6468 < local_6400; local_6468 = local_6468 + 1) {
        local_63c8 = local_6410;
        local_63a0 = *(undefined8 *)*local_6410;
        uStack_6398 = *(undefined8 *)(*local_6410 + 8);
        uStack_6390 = *(undefined8 *)(*local_6410 + 0x10);
        auVar159 = *(undefined1 (*) [24])*local_6410;
        uStack_6388 = *(undefined8 *)(*local_6410 + 0x18);
        local_30e0 = ZEXT1632(ZEXT816(0) << 0x40);
        local_5020 = 0x3f800000;
        uStack_501c = 0x3f800000;
        uStack_5018 = 0x3f800000;
        uStack_5014 = 0x3f800000;
        uStack_5010 = 0x3f800000;
        uStack_500c = 0x3f800000;
        uStack_5008 = 0x3f800000;
        uStack_5004 = 0x3f800000;
        local_4fa0._0_8_ = auVar159._0_8_;
        local_2820 = local_4fa0._0_8_;
        local_4fa0._8_8_ = auVar159._8_8_;
        uStack_2818 = local_4fa0._8_8_;
        local_4fa0._16_8_ = auVar159._16_8_;
        uStack_2810 = local_4fa0._16_8_;
        local_2840 = 0x42b0c0a5;
        uStack_283c = 0x42b0c0a5;
        uStack_2838 = 0x42b0c0a5;
        uStack_2834 = 0x42b0c0a5;
        uStack_2830 = 0x42b0c0a5;
        uStack_282c = 0x42b0c0a5;
        uStack_2828 = 0x42b0c0a5;
        uStack_2824 = 0x42b0c0a5;
        auVar84._8_4_ = 0x42b0c0a5;
        auVar84._0_8_ = 0x42b0c0a542b0c0a5;
        auVar84._12_4_ = 0x42b0c0a5;
        auVar84._16_4_ = 0x42b0c0a5;
        auVar84._20_4_ = 0x42b0c0a5;
        auVar84._24_4_ = 0x42b0c0a5;
        auVar84._28_4_ = 0x42b0c0a5;
        auVar5 = vminps_avx(*local_6410,auVar84);
        local_4fa0._0_8_ = auVar5._0_8_;
        local_2fa0 = local_4fa0._0_8_;
        local_4fa0._8_8_ = auVar5._8_8_;
        uStack_2f98 = local_4fa0._8_8_;
        local_4fa0._16_8_ = auVar5._16_8_;
        uStack_2f90 = local_4fa0._16_8_;
        local_4fa0._24_8_ = auVar5._24_8_;
        uStack_2f88 = local_4fa0._24_8_;
        local_2fc0 = 0xc2b0c0a5;
        uStack_2fbc = 0xc2b0c0a5;
        uStack_2fb8 = 0xc2b0c0a5;
        uStack_2fb4 = 0xc2b0c0a5;
        uStack_2fb0 = 0xc2b0c0a5;
        uStack_2fac = 0xc2b0c0a5;
        uStack_2fa8 = 0xc2b0c0a5;
        uStack_2fa4 = 0xc2b0c0a5;
        auVar62._8_4_ = 0xc2b0c0a5;
        auVar62._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar62._12_4_ = 0xc2b0c0a5;
        auVar62._16_4_ = 0xc2b0c0a5;
        auVar62._20_4_ = 0xc2b0c0a5;
        auVar62._24_4_ = 0xc2b0c0a5;
        auVar62._28_4_ = 0xc2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar62);
        local_4fa0._0_8_ = auVar4._0_8_;
        uVar8 = local_4fa0._0_8_;
        local_4fa0._8_8_ = auVar4._8_8_;
        uVar9 = local_4fa0._8_8_;
        local_4fa0._16_8_ = auVar4._16_8_;
        uVar10 = local_4fa0._16_8_;
        local_4fa0._24_8_ = auVar4._24_8_;
        uVar11 = local_4fa0._24_8_;
        local_4d00 = 0x3fb8aa3b;
        uStack_4cfc = 0x3fb8aa3b;
        uStack_4cf8 = 0x3fb8aa3b;
        uStack_4cf4 = 0x3fb8aa3b;
        uStack_4cf0 = 0x3fb8aa3b;
        uStack_4cec = 0x3fb8aa3b;
        uStack_4ce8 = 0x3fb8aa3b;
        uStack_4ce4 = 0x3fb8aa3b;
        local_4ce0._0_4_ = auVar4._0_4_;
        local_4ce0._4_4_ = auVar4._4_4_;
        uStack_4cd8._0_4_ = auVar4._8_4_;
        uStack_4cd8._4_4_ = auVar4._12_4_;
        uStack_4cd0._0_4_ = auVar4._16_4_;
        uStack_4cd0._4_4_ = auVar4._20_4_;
        uStack_4cc8._0_4_ = auVar4._24_4_;
        uStack_4cc8._4_4_ = auVar4._28_4_;
        local_4fe0._4_4_ = local_4ce0._4_4_ * 1.442695;
        local_4fe0._0_4_ = (float)local_4ce0 * 1.442695;
        uStack_4fd8._0_4_ = (float)uStack_4cd8 * 1.442695;
        uStack_4fd8._4_4_ = uStack_4cd8._4_4_ * 1.442695;
        uStack_4fd0._0_4_ = (float)uStack_4cd0 * 1.442695;
        uStack_4fd0._4_4_ = uStack_4cd0._4_4_ * 1.442695;
        auVar159 = _local_4fe0;
        uStack_4fc8._0_4_ = (float)uStack_4cc8 * 1.442695;
        uStack_4fc8._4_4_ = uStack_4cc8._4_4_;
        auVar5 = _local_4fe0;
        local_4ae0 = local_4fe0;
        uStack_4ad8 = uStack_4fd8;
        uStack_4fd0 = auVar159._16_8_;
        uStack_4ad0 = uStack_4fd0;
        uStack_4fc8 = auVar5._24_8_;
        uStack_4ac8 = uStack_4fc8;
        local_4b00 = 0x3f000000;
        uStack_4afc = 0x3f000000;
        uStack_4af8 = 0x3f000000;
        uStack_4af4 = 0x3f000000;
        uStack_4af0 = 0x3f000000;
        uStack_4aec = 0x3f000000;
        uStack_4ae8 = 0x3f000000;
        uStack_4ae4 = 0x3f000000;
        local_4fe0._4_4_ = local_4ce0._4_4_ * 1.442695 + 0.5;
        local_4fe0._0_4_ = (float)local_4ce0 * 1.442695 + 0.5;
        uStack_4fd8._0_4_ = (float)uStack_4cd8 * 1.442695 + 0.5;
        uStack_4fd8._4_4_ = uStack_4cd8._4_4_ * 1.442695 + 0.5;
        uStack_4fd0._0_4_ = (float)uStack_4cd0 * 1.442695 + 0.5;
        uStack_4fd0._4_4_ = uStack_4cd0._4_4_ * 1.442695 + 0.5;
        uStack_4fc8._0_4_ = (float)uStack_4cc8 * 1.442695 + 0.5;
        uStack_4fc8._4_4_ = uStack_4cc8._4_4_ + 0.5;
        auVar6 = vroundps_avx(_local_4fe0,1);
        auVar5 = vcmpps_avx(_local_4fe0,auVar6,1);
        local_5040._0_8_ = auVar5._0_8_;
        local_2d60 = local_5040._0_8_;
        local_5040._8_8_ = auVar5._8_8_;
        uStack_2d58 = local_5040._8_8_;
        local_5040._16_8_ = auVar5._16_8_;
        uStack_2d50 = local_5040._16_8_;
        local_5040._24_8_ = auVar5._24_8_;
        uStack_2d48 = local_5040._24_8_;
        local_2d80 = 0x3f8000003f800000;
        uStack_2d78 = 0x3f8000003f800000;
        uStack_2d70 = 0x3f8000003f800000;
        uStack_2d68 = 0x3f8000003f800000;
        auVar70._8_8_ = 0x3f8000003f800000;
        auVar70._0_8_ = 0x3f8000003f800000;
        auVar70._16_8_ = 0x3f8000003f800000;
        auVar70._24_8_ = 0x3f8000003f800000;
        local_5040 = vpand_avx2(auVar5,auVar70);
        local_4fc0 = auVar6._0_8_;
        local_3320 = local_4fc0;
        uStack_4fb8 = auVar6._8_8_;
        uStack_3318 = uStack_4fb8;
        uStack_4fb0 = auVar6._16_8_;
        uStack_3310 = uStack_4fb0;
        uStack_4fa8 = auVar6._24_8_;
        uStack_3308 = uStack_4fa8;
        local_3340 = local_5040._0_8_;
        uStack_3338 = local_5040._8_8_;
        uStack_3330 = local_5040._16_8_;
        uStack_3328 = local_5040._24_8_;
        _local_4fe0 = vsubps_avx(auVar6,local_5040);
        local_4d40 = 0x3f318000;
        uStack_4d3c = 0x3f318000;
        uStack_4d38 = 0x3f318000;
        uStack_4d34 = 0x3f318000;
        uStack_4d30 = 0x3f318000;
        uStack_4d2c = 0x3f318000;
        uStack_4d28 = 0x3f318000;
        uStack_4d24 = 0x3f318000;
        local_4d20._0_4_ = local_4fe0._0_4_;
        local_4d20._4_4_ = local_4fe0._4_4_;
        uStack_4d18._0_4_ = local_4fe0._8_4_;
        uStack_4d18._4_4_ = local_4fe0._12_4_;
        uStack_4d10._0_4_ = local_4fe0._16_4_;
        uStack_4d10._4_4_ = local_4fe0._20_4_;
        uStack_4d08._0_4_ = local_4fe0._24_4_;
        uStack_4d08._4_4_ = local_4fe0._28_4_;
        local_4fc0._4_4_ = local_4d20._4_4_ * 0.6933594;
        local_4fc0._0_4_ = (float)local_4d20 * 0.6933594;
        uStack_4fb8._0_4_ = (float)uStack_4d18 * 0.6933594;
        uStack_4fb8._4_4_ = uStack_4d18._4_4_ * 0.6933594;
        uStack_4fb0._0_4_ = (float)uStack_4d10 * 0.6933594;
        uStack_4fb0._4_4_ = uStack_4d10._4_4_ * 0.6933594;
        auVar159 = _local_4fc0;
        uStack_4fa8._0_4_ = (float)uStack_4d08 * 0.6933594;
        uStack_4fa8._4_4_ = uStack_4d08._4_4_;
        auVar40 = _local_4fc0;
        local_4d60 = local_4fe0;
        uStack_4d58 = uStack_4fd8;
        uStack_4d50 = uStack_4fd0;
        uStack_4d48 = uStack_4fc8;
        local_4d80 = 0xb95e8083;
        uStack_4d7c = 0xb95e8083;
        uStack_4d78 = 0xb95e8083;
        uStack_4d74 = 0xb95e8083;
        uStack_4d70 = 0xb95e8083;
        uStack_4d6c = 0xb95e8083;
        uStack_4d68 = 0xb95e8083;
        uStack_4d64 = 0xb95e8083;
        local_3360 = local_4fa0._0_8_;
        uStack_3358 = local_4fa0._8_8_;
        uStack_3350 = local_4fa0._16_8_;
        uStack_3348 = local_4fa0._24_8_;
        local_3380 = local_4fc0;
        uStack_3378 = uStack_4fb8;
        uStack_4fb0 = auVar159._16_8_;
        uStack_3370 = uStack_4fb0;
        uStack_4fa8 = auVar40._24_8_;
        uStack_3368 = uStack_4fa8;
        auVar50._16_8_ = uStack_4fb0;
        auVar50._0_16_ = _local_4fc0;
        auVar50._24_8_ = uStack_4fa8;
        auVar5 = vsubps_avx(auVar4,auVar50);
        local_4fa0._0_8_ = auVar5._0_8_;
        local_33a0 = local_4fa0._0_8_;
        local_4fa0._8_8_ = auVar5._8_8_;
        uStack_3398 = local_4fa0._8_8_;
        local_4fa0._16_8_ = auVar5._16_8_;
        uStack_3390 = local_4fa0._16_8_;
        local_4fa0._24_8_ = auVar5._24_8_;
        uStack_3388 = local_4fa0._24_8_;
        local_33c0 = CONCAT44(local_4d20._4_4_ * -0.00021219444,(float)local_4d20 * -0.00021219444);
        uStack_33b8 = CONCAT44(uStack_4d18._4_4_ * -0.00021219444,
                               (float)uStack_4d18 * -0.00021219444);
        uStack_33b0 = CONCAT44(uStack_4d10._4_4_ * -0.00021219444,
                               (float)uStack_4d10 * -0.00021219444);
        uStack_33a8 = CONCAT44(uStack_4d08._4_4_,(float)uStack_4d08 * -0.00021219444);
        auVar49._8_8_ = uStack_33b8;
        auVar49._0_8_ = local_33c0;
        auVar49._16_8_ = uStack_33b0;
        auVar49._24_8_ = uStack_33a8;
        local_4fa0 = vsubps_avx(auVar5,auVar49);
        local_4dc0 = local_4fa0._0_8_;
        uStack_4db8 = local_4fa0._8_8_;
        uStack_4db0 = local_4fa0._16_8_;
        uStack_4da8 = local_4fa0._24_8_;
        local_4da0._0_4_ = local_4fa0._0_4_;
        local_4da0._4_4_ = local_4fa0._4_4_;
        uStack_4d98._0_4_ = local_4fa0._8_4_;
        uStack_4d98._4_4_ = local_4fa0._12_4_;
        uStack_4d90._0_4_ = local_4fa0._16_4_;
        uStack_4d90._4_4_ = local_4fa0._20_4_;
        uStack_4d88._0_4_ = local_4fa0._24_4_;
        uStack_4d88._4_4_ = local_4fa0._28_4_;
        fStack_5044 = uStack_4d88._4_4_;
        local_5060 = (float)local_4da0 * (float)local_4da0;
        fStack_505c = local_4da0._4_4_ * local_4da0._4_4_;
        fStack_5058 = (float)uStack_4d98 * (float)uStack_4d98;
        fStack_5054 = uStack_4d98._4_4_ * uStack_4d98._4_4_;
        fStack_5050 = (float)uStack_4d90 * (float)uStack_4d90;
        fStack_504c = uStack_4d90._4_4_ * uStack_4d90._4_4_;
        fStack_5048 = (float)uStack_4d88 * (float)uStack_4d88;
        local_4de0 = 0x3950696739506967;
        uStack_4dd8 = 0x3950696739506967;
        uStack_4dd0 = 0x3950696739506967;
        uStack_4dc8 = 0x3950696739506967;
        local_4e00 = local_4fa0._0_8_;
        uStack_4df8 = local_4fa0._8_8_;
        uStack_4df0 = local_4fa0._16_8_;
        uStack_4de8 = local_4fa0._24_8_;
        local_4b20 = CONCAT44(local_4da0._4_4_ * 0.00019875691,(float)local_4da0 * 0.00019875691);
        uStack_4b18 = CONCAT44(uStack_4d98._4_4_ * 0.00019875691,(float)uStack_4d98 * 0.00019875691)
        ;
        uStack_4b10 = CONCAT44(uStack_4d90._4_4_ * 0.00019875691,(float)uStack_4d90 * 0.00019875691)
        ;
        uStack_4b08 = CONCAT44(0x39506967,(float)uStack_4d88 * 0.00019875691);
        local_4b40 = 0x3ab743ce;
        uStack_4b3c = 0x3ab743ce;
        uStack_4b38 = 0x3ab743ce;
        uStack_4b34 = 0x3ab743ce;
        uStack_4b30 = 0x3ab743ce;
        uStack_4b2c = 0x3ab743ce;
        uStack_4b28 = 0x3ab743ce;
        uStack_4b24 = 0x3ab743ce;
        local_5080 = (float)local_4da0 * 0.00019875691 + 0.0013981999;
        fStack_507c = local_4da0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_5078 = (float)uStack_4d98 * 0.00019875691 + 0.0013981999;
        fStack_5074 = uStack_4d98._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_5070 = (float)uStack_4d90 * 0.00019875691 + 0.0013981999;
        fStack_506c = uStack_4d90._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_5068 = (float)uStack_4d88 * 0.00019875691 + 0.0013981999;
        local_4e20 = CONCAT44(fStack_507c,local_5080);
        uStack_4e18 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4e10 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4e08 = CONCAT44(0x3ad150fb,fStack_5068);
        local_4e40 = local_4fa0._0_8_;
        uStack_4e38 = local_4fa0._8_8_;
        uStack_4e30 = local_4fa0._16_8_;
        uStack_4e28 = local_4fa0._24_8_;
        local_5080 = local_5080 * (float)local_4da0;
        fStack_507c = fStack_507c * local_4da0._4_4_;
        fStack_5078 = fStack_5078 * (float)uStack_4d98;
        fStack_5074 = fStack_5074 * uStack_4d98._4_4_;
        fStack_5070 = fStack_5070 * (float)uStack_4d90;
        fStack_506c = fStack_506c * uStack_4d90._4_4_;
        fStack_5068 = fStack_5068 * (float)uStack_4d88;
        local_4b60 = CONCAT44(fStack_507c,local_5080);
        uStack_4b58 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4b50 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4b48 = CONCAT44(0x3ad150fb,fStack_5068);
        local_4b80 = 0x3c088908;
        uStack_4b7c = 0x3c088908;
        uStack_4b78 = 0x3c088908;
        uStack_4b74 = 0x3c088908;
        uStack_4b70 = 0x3c088908;
        uStack_4b6c = 0x3c088908;
        uStack_4b68 = 0x3c088908;
        uStack_4b64 = 0x3c088908;
        local_5080 = local_5080 + 0.008333452;
        fStack_507c = fStack_507c + 0.008333452;
        fStack_5078 = fStack_5078 + 0.008333452;
        fStack_5074 = fStack_5074 + 0.008333452;
        fStack_5070 = fStack_5070 + 0.008333452;
        fStack_506c = fStack_506c + 0.008333452;
        fStack_5068 = fStack_5068 + 0.008333452;
        local_4e60 = CONCAT44(fStack_507c,local_5080);
        uStack_4e58 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4e50 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4e48 = CONCAT44(0x3c22b327,fStack_5068);
        local_4e80 = local_4fa0._0_8_;
        uStack_4e78 = local_4fa0._8_8_;
        uStack_4e70 = local_4fa0._16_8_;
        uStack_4e68 = local_4fa0._24_8_;
        local_5080 = local_5080 * (float)local_4da0;
        fStack_507c = fStack_507c * local_4da0._4_4_;
        fStack_5078 = fStack_5078 * (float)uStack_4d98;
        fStack_5074 = fStack_5074 * uStack_4d98._4_4_;
        fStack_5070 = fStack_5070 * (float)uStack_4d90;
        fStack_506c = fStack_506c * uStack_4d90._4_4_;
        fStack_5068 = fStack_5068 * (float)uStack_4d88;
        local_4ba0 = CONCAT44(fStack_507c,local_5080);
        uStack_4b98 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4b90 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4b88 = CONCAT44(0x3c22b327,fStack_5068);
        local_4bc0 = 0x3d2aa9c1;
        uStack_4bbc = 0x3d2aa9c1;
        uStack_4bb8 = 0x3d2aa9c1;
        uStack_4bb4 = 0x3d2aa9c1;
        uStack_4bb0 = 0x3d2aa9c1;
        uStack_4bac = 0x3d2aa9c1;
        uStack_4ba8 = 0x3d2aa9c1;
        uStack_4ba4 = 0x3d2aa9c1;
        local_5080 = local_5080 + 0.041665796;
        fStack_507c = fStack_507c + 0.041665796;
        fStack_5078 = fStack_5078 + 0.041665796;
        fStack_5074 = fStack_5074 + 0.041665796;
        fStack_5070 = fStack_5070 + 0.041665796;
        fStack_506c = fStack_506c + 0.041665796;
        fStack_5068 = fStack_5068 + 0.041665796;
        local_4ea0 = CONCAT44(fStack_507c,local_5080);
        uStack_4e98 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4e90 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4e88 = CONCAT44(0x3d53568b,fStack_5068);
        local_4ec0 = local_4fa0._0_8_;
        uStack_4eb8 = local_4fa0._8_8_;
        uStack_4eb0 = local_4fa0._16_8_;
        uStack_4ea8 = local_4fa0._24_8_;
        local_5080 = local_5080 * (float)local_4da0;
        fStack_507c = fStack_507c * local_4da0._4_4_;
        fStack_5078 = fStack_5078 * (float)uStack_4d98;
        fStack_5074 = fStack_5074 * uStack_4d98._4_4_;
        fStack_5070 = fStack_5070 * (float)uStack_4d90;
        fStack_506c = fStack_506c * uStack_4d90._4_4_;
        fStack_5068 = fStack_5068 * (float)uStack_4d88;
        local_4be0 = CONCAT44(fStack_507c,local_5080);
        uStack_4bd8 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4bd0 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4bc8 = CONCAT44(0x3d53568b,fStack_5068);
        local_4c00 = 0x3e2aaaaa;
        uStack_4bfc = 0x3e2aaaaa;
        uStack_4bf8 = 0x3e2aaaaa;
        uStack_4bf4 = 0x3e2aaaaa;
        uStack_4bf0 = 0x3e2aaaaa;
        uStack_4bec = 0x3e2aaaaa;
        uStack_4be8 = 0x3e2aaaaa;
        uStack_4be4 = 0x3e2aaaaa;
        local_5080 = local_5080 + 0.16666666;
        fStack_507c = fStack_507c + 0.16666666;
        fStack_5078 = fStack_5078 + 0.16666666;
        fStack_5074 = fStack_5074 + 0.16666666;
        fStack_5070 = fStack_5070 + 0.16666666;
        fStack_506c = fStack_506c + 0.16666666;
        fStack_5068 = fStack_5068 + 0.16666666;
        local_4ee0 = CONCAT44(fStack_507c,local_5080);
        uStack_4ed8 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4ed0 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4ec8 = CONCAT44(0x3e5f804d,fStack_5068);
        local_4f00 = local_4fa0._0_8_;
        uStack_4ef8 = local_4fa0._8_8_;
        uStack_4ef0 = local_4fa0._16_8_;
        uStack_4ee8 = local_4fa0._24_8_;
        local_5080 = local_5080 * (float)local_4da0;
        fStack_507c = fStack_507c * local_4da0._4_4_;
        fStack_5078 = fStack_5078 * (float)uStack_4d98;
        fStack_5074 = fStack_5074 * uStack_4d98._4_4_;
        fStack_5070 = fStack_5070 * (float)uStack_4d90;
        fStack_506c = fStack_506c * uStack_4d90._4_4_;
        fStack_5068 = fStack_5068 * (float)uStack_4d88;
        local_4c20 = CONCAT44(fStack_507c,local_5080);
        uStack_4c18 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4c10 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4c08 = CONCAT44(0x3e5f804d,fStack_5068);
        local_4c40 = 0x3f000000;
        uStack_4c3c = 0x3f000000;
        uStack_4c38 = 0x3f000000;
        uStack_4c34 = 0x3f000000;
        uStack_4c30 = 0x3f000000;
        uStack_4c2c = 0x3f000000;
        uStack_4c28 = 0x3f000000;
        uStack_4c24 = 0x3f000000;
        local_5080 = local_5080 + 0.5;
        fStack_507c = fStack_507c + 0.5;
        fStack_5078 = fStack_5078 + 0.5;
        fStack_5074 = fStack_5074 + 0.5;
        fStack_5070 = fStack_5070 + 0.5;
        fStack_506c = fStack_506c + 0.5;
        fStack_5068 = fStack_5068 + 0.5;
        local_4f20 = CONCAT44(fStack_507c,local_5080);
        uStack_4f18 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4f10 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4f08 = CONCAT44(0x3f37e013,fStack_5068);
        local_4f40 = CONCAT44(fStack_505c,local_5060);
        uStack_4f38 = CONCAT44(fStack_5054,fStack_5058);
        uStack_4f30 = CONCAT44(fStack_504c,fStack_5050);
        uStack_4f28 = CONCAT44(uStack_4d88._4_4_,fStack_5048);
        local_5080 = local_5080 * local_5060;
        fStack_507c = fStack_507c * fStack_505c;
        fStack_5078 = fStack_5078 * fStack_5058;
        fStack_5074 = fStack_5074 * fStack_5054;
        fStack_5070 = fStack_5070 * fStack_5050;
        fStack_506c = fStack_506c * fStack_504c;
        fStack_5068 = fStack_5068 * fStack_5048;
        local_4c60 = CONCAT44(fStack_507c,local_5080);
        uStack_4c58 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4c50 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4c48 = CONCAT44(0x3f37e013,fStack_5068);
        local_4c80 = local_4fa0._0_8_;
        uStack_4c78 = local_4fa0._8_8_;
        uStack_4c70 = local_4fa0._16_8_;
        uStack_4c68 = local_4fa0._24_8_;
        local_5080 = local_5080 + (float)local_4da0;
        fStack_507c = fStack_507c + local_4da0._4_4_;
        fStack_5078 = fStack_5078 + (float)uStack_4d98;
        fStack_5074 = fStack_5074 + uStack_4d98._4_4_;
        fStack_5070 = fStack_5070 + (float)uStack_4d90;
        fStack_506c = fStack_506c + uStack_4d90._4_4_;
        fStack_5068 = fStack_5068 + (float)uStack_4d88;
        local_4ca0 = CONCAT44(fStack_507c,local_5080);
        uStack_4c98 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4c90 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4c88 = CONCAT44(uStack_4d88._4_4_ + 0.71826285,fStack_5068);
        local_4cc0 = 0x3f8000003f800000;
        uStack_4cb8 = 0x3f8000003f800000;
        uStack_4cb0 = 0x3f8000003f800000;
        uStack_4ca8 = 0x3f8000003f800000;
        local_5080 = local_5080 + 1.0;
        fStack_507c = fStack_507c + 1.0;
        fStack_5078 = fStack_5078 + 1.0;
        fStack_5074 = fStack_5074 + 1.0;
        fStack_5070 = fStack_5070 + 1.0;
        fStack_506c = fStack_506c + 1.0;
        fStack_5068 = fStack_5068 + 1.0;
        fStack_5064 = uStack_4d88._4_4_ + 0.71826285 + 1.0;
        local_27a0 = local_4fe0;
        uStack_2798 = uStack_4fd8;
        uStack_2790 = uStack_4fd0;
        uStack_2788 = uStack_4fc8;
        local_5000._4_4_ = (int)local_4d20._4_4_;
        local_5000._0_4_ = (int)(float)local_4d20;
        local_5000._8_4_ = (int)(float)uStack_4d18;
        local_5000._12_4_ = (int)uStack_4d18._4_4_;
        local_5000._16_4_ = (int)(float)uStack_4d10;
        local_5000._20_4_ = (int)uStack_4d10._4_4_;
        auVar159 = local_5000._0_24_;
        local_5000._24_4_ = (int)(float)uStack_4d08;
        local_5000._28_4_ = (int)uStack_4d08._4_4_;
        auVar5 = local_5000;
        local_26a0 = local_5000._0_8_;
        uStack_2698 = local_5000._8_8_;
        local_5000._16_8_ = auVar159._16_8_;
        uStack_2690 = local_5000._16_8_;
        local_5000._24_8_ = auVar5._24_8_;
        uStack_2688 = local_5000._24_8_;
        local_26c0 = 0x7f0000007f;
        uStack_26b8 = 0x7f0000007f;
        uStack_26b0 = 0x7f0000007f;
        uStack_26a8 = 0x7f0000007f;
        local_24e0 = local_5000._0_8_;
        uStack_24d8 = local_5000._8_8_;
        uStack_24d0 = local_5000._16_8_;
        uStack_24c8 = local_5000._24_8_;
        local_2500 = 0x7f0000007f;
        uStack_24f8 = 0x7f0000007f;
        uStack_24f0 = 0x7f0000007f;
        uStack_24e8 = 0x7f0000007f;
        auVar86._16_8_ = local_5000._16_8_;
        auVar86._0_16_ = local_5000._0_16_;
        auVar86._24_8_ = local_5000._24_8_;
        auVar85._8_8_ = 0x7f0000007f;
        auVar85._0_8_ = 0x7f0000007f;
        auVar85._16_8_ = 0x7f0000007f;
        auVar85._24_8_ = 0x7f0000007f;
        auVar5 = vpaddd_avx2(auVar86,auVar85);
        local_5000._0_8_ = auVar5._0_8_;
        local_25a0 = local_5000._0_8_;
        local_5000._8_8_ = auVar5._8_8_;
        uStack_2598 = local_5000._8_8_;
        local_5000._16_8_ = auVar5._16_8_;
        uStack_2590 = local_5000._16_8_;
        local_5000._24_8_ = auVar5._24_8_;
        uStack_2588 = local_5000._24_8_;
        local_25a4 = 0x17;
        local_23e0 = local_5000._0_8_;
        uStack_23d8 = local_5000._8_8_;
        uStack_23d0 = local_5000._16_8_;
        uStack_23c8 = local_5000._24_8_;
        local_23e4 = 0x17;
        local_5000 = vpslld_avx2(auVar5,ZEXT416(0x17));
        local_2520 = local_5000._0_8_;
        uStack_2518 = local_5000._8_8_;
        uStack_2510 = local_5000._16_8_;
        uStack_2508 = local_5000._24_8_;
        local_50a0 = local_5000._0_8_;
        uStack_5098 = local_5000._8_8_;
        uStack_5090 = local_5000._16_8_;
        uStack_5088 = local_5000._24_8_;
        local_4f60 = CONCAT44(fStack_507c,local_5080);
        uStack_4f58 = CONCAT44(fStack_5074,fStack_5078);
        uStack_4f50 = CONCAT44(fStack_506c,fStack_5070);
        uStack_4f48 = CONCAT44(fStack_5064,fStack_5068);
        local_4f80._0_4_ = local_5000._0_4_;
        local_4f80._4_4_ = local_5000._4_4_;
        uStack_4f78._0_4_ = local_5000._8_4_;
        uStack_4f78._4_4_ = local_5000._12_4_;
        uStack_4f70._0_4_ = local_5000._16_4_;
        uStack_4f70._4_4_ = local_5000._20_4_;
        uStack_4f68._0_4_ = local_5000._24_4_;
        local_5080 = local_5080 * (float)local_4f80;
        fStack_507c = fStack_507c * local_4f80._4_4_;
        fStack_5078 = fStack_5078 * (float)uStack_4f78;
        fStack_5074 = fStack_5074 * uStack_4f78._4_4_;
        fStack_5070 = fStack_5070 * (float)uStack_4f70;
        fStack_506c = fStack_506c * uStack_4f70._4_4_;
        fStack_5068 = fStack_5068 * (float)uStack_4f68;
        local_5100 = CONCAT44(fStack_507c,local_5080);
        uStack_50f8 = CONCAT44(fStack_5074,fStack_5078);
        uStack_50f0 = CONCAT44(fStack_506c,fStack_5070);
        uStack_50e8 = CONCAT44(fStack_5064,fStack_5068);
        local_44c8 = 0x3f800000;
        local_2220 = 0x3f800000;
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_2230 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_6620 = auVar1._0_8_;
        local_2240 = local_6620;
        uStack_6618 = auVar1._8_8_;
        uStack_2238 = uStack_6618;
        local_2a80 = 0x7f0000007f;
        uStack_2a78 = 0x7f0000007f;
        uStack_2a70 = 0x7f0000007f;
        uStack_2a68 = 0x7f0000007f;
        local_5120._0_4_ = auVar1._0_4_;
        local_5120._4_4_ = auVar1._4_4_;
        uStack_5118._0_4_ = auVar1._8_4_;
        uStack_5118._4_4_ = auVar1._12_4_;
        uStack_5110._0_4_ = auStack_2230._0_4_;
        uStack_5110._4_4_ = auStack_2230._4_4_;
        uStack_5108._0_4_ = auStack_2230._8_4_;
        uStack_5108._4_4_ = auStack_2230._12_4_;
        local_5fe0._4_4_ = fStack_507c + local_5120._4_4_;
        local_5fe0._0_4_ = local_5080 + (float)local_5120;
        uStack_5fd8._0_4_ = fStack_5078 + (float)uStack_5118;
        uStack_5fd8._4_4_ = fStack_5074 + uStack_5118._4_4_;
        uStack_5fd0._0_4_ = fStack_5070 + (float)uStack_5110;
        uStack_5fd0._4_4_ = fStack_506c + uStack_5110._4_4_;
        auVar159 = _local_5fe0;
        uStack_5fc8._0_4_ = fStack_5068 + (float)uStack_5108;
        uStack_5fc8._4_4_ = fStack_5064 + uStack_5108._4_4_;
        auVar5 = _local_5fe0;
        local_6020 = 0x3f800000;
        uStack_601c = 0x3f800000;
        uStack_6018 = 0x3f800000;
        uStack_6014 = 0x3f800000;
        uStack_6010 = 0x3f800000;
        uStack_600c = 0x3f800000;
        uStack_6008 = 0x3f800000;
        uStack_6004 = 0x3f800000;
        local_6040 = vcmpps_avx(_local_5fe0,local_30e0,2);
        local_2f20 = local_5fe0;
        uStack_2f18 = uStack_5fd8;
        uStack_5fd0 = auVar159._16_8_;
        uStack_2f10 = uStack_5fd0;
        uStack_5fc8 = auVar5._24_8_;
        uStack_2f08 = uStack_5fc8;
        local_2f40 = 0x800000;
        uStack_2f3c = 0x800000;
        uStack_2f38 = 0x800000;
        uStack_2f34 = 0x800000;
        uStack_2f30 = 0x800000;
        uStack_2f2c = 0x800000;
        uStack_2f28 = 0x800000;
        uStack_2f24 = 0x800000;
        auVar66._16_8_ = uStack_5fd0;
        auVar66._0_16_ = _local_5fe0;
        auVar66._24_8_ = uStack_5fc8;
        auVar65._8_4_ = 0x800000;
        auVar65._0_8_ = 0x80000000800000;
        auVar65._12_4_ = 0x800000;
        auVar65._16_4_ = 0x800000;
        auVar65._20_4_ = 0x800000;
        auVar65._24_4_ = 0x800000;
        auVar65._28_4_ = 0x800000;
        auVar5 = vmaxps_avx(auVar66,auVar65);
        local_5fe0 = auVar5._0_8_;
        local_2e60 = local_5fe0;
        uStack_5fd8 = auVar5._8_8_;
        uStack_2e58 = uStack_5fd8;
        uStack_5fd0 = auVar5._16_8_;
        uStack_2e50 = uStack_5fd0;
        uStack_5fc8 = auVar5._24_8_;
        uStack_2e48 = uStack_5fc8;
        local_2ea0 = local_5fe0;
        uStack_2e98 = uStack_5fd8;
        uStack_2e90 = uStack_5fd0;
        uStack_2e88 = uStack_5fc8;
        local_2ea4 = 0x17;
        local_29e0 = local_5fe0;
        uStack_29d8 = uStack_5fd8;
        uStack_29d0 = uStack_5fd0;
        uStack_29c8 = uStack_5fc8;
        local_29e4 = 0x17;
        auVar4 = vpsrld_avx2(auVar5,ZEXT416(0x17));
        local_2be0 = local_5fe0;
        uStack_2bd8 = uStack_5fd8;
        uStack_2bd0 = uStack_5fd0;
        uStack_2bc8 = uStack_5fc8;
        local_2c00 = 0x807fffff;
        uStack_2bfc = 0x807fffff;
        uStack_2bf8 = 0x807fffff;
        uStack_2bf4 = 0x807fffff;
        uStack_2bf0 = 0x807fffff;
        uStack_2bec = 0x807fffff;
        uStack_2be8 = 0x807fffff;
        uStack_2be4 = 0x807fffff;
        auVar74._8_4_ = 0x807fffff;
        auVar74._0_8_ = 0x807fffff807fffff;
        auVar74._12_4_ = 0x807fffff;
        auVar74._16_4_ = 0x807fffff;
        auVar74._20_4_ = 0x807fffff;
        auVar74._24_4_ = 0x807fffff;
        auVar74._28_4_ = 0x807fffff;
        auVar5 = vpand_avx2(auVar5,auVar74);
        local_5fe0 = auVar5._0_8_;
        local_2ae0 = local_5fe0;
        uStack_5fd8 = auVar5._8_8_;
        uStack_2ad8 = uStack_5fd8;
        uStack_5fd0 = auVar5._16_8_;
        uStack_2ad0 = uStack_5fd0;
        uStack_5fc8 = auVar5._24_8_;
        uStack_2ac8 = uStack_5fc8;
        local_2b00 = 0x3f000000;
        uStack_2afc = 0x3f000000;
        uStack_2af8 = 0x3f000000;
        uStack_2af4 = 0x3f000000;
        uStack_2af0 = 0x3f000000;
        uStack_2aec = 0x3f000000;
        uStack_2ae8 = 0x3f000000;
        uStack_2ae4 = 0x3f000000;
        auVar78._8_4_ = 0x3f000000;
        auVar78._0_8_ = 0x3f0000003f000000;
        auVar78._12_4_ = 0x3f000000;
        auVar78._16_4_ = 0x3f000000;
        auVar78._20_4_ = 0x3f000000;
        auVar78._24_4_ = 0x3f000000;
        auVar78._28_4_ = 0x3f000000;
        auVar6 = vpor_avx2(auVar5,auVar78);
        local_6000._0_8_ = auVar4._0_8_;
        local_2a60 = local_6000._0_8_;
        local_6000._8_8_ = auVar4._8_8_;
        uStack_2a58 = local_6000._8_8_;
        local_6000._16_8_ = auVar4._16_8_;
        uStack_2a50 = local_6000._16_8_;
        local_6000._24_8_ = auVar4._24_8_;
        uStack_2a48 = local_6000._24_8_;
        local_2960 = local_6000._0_8_;
        uStack_2958 = local_6000._8_8_;
        uStack_2950 = local_6000._16_8_;
        uStack_2948 = local_6000._24_8_;
        local_2980 = 0x7f0000007f;
        uStack_2978 = 0x7f0000007f;
        uStack_2970 = 0x7f0000007f;
        uStack_2968 = 0x7f0000007f;
        auVar79._8_8_ = 0x7f0000007f;
        auVar79._0_8_ = 0x7f0000007f;
        auVar79._16_8_ = 0x7f0000007f;
        auVar79._24_8_ = 0x7f0000007f;
        local_6000 = vpsubd_avx2(auVar4,auVar79);
        local_2a20 = local_6000._0_8_;
        uStack_2a18 = local_6000._8_8_;
        uStack_2a10 = local_6000._16_8_;
        uStack_2a08 = local_6000._24_8_;
        auVar5 = vcvtdq2ps_avx(local_6000);
        local_6060 = auVar5._0_8_;
        uVar12 = local_6060;
        uStack_6058 = auVar5._8_8_;
        uVar13 = uStack_6058;
        uStack_6050 = auVar5._16_8_;
        uVar14 = uStack_6050;
        uStack_6048 = auVar5._24_8_;
        uVar15 = uStack_6048;
        local_5160 = 0x3f8000003f800000;
        uStack_5158 = 0x3f8000003f800000;
        uStack_5150 = 0x3f8000003f800000;
        uStack_5148 = 0x3f8000003f800000;
        local_5140._0_4_ = auVar5._0_4_;
        local_5140._4_4_ = auVar5._4_4_;
        uStack_5138._0_4_ = auVar5._8_4_;
        uStack_5138._4_4_ = auVar5._12_4_;
        uStack_5130._0_4_ = auVar5._16_4_;
        uStack_5130._4_4_ = auVar5._20_4_;
        uStack_5128._0_4_ = auVar5._24_4_;
        uStack_5128._4_4_ = auVar5._28_4_;
        local_6060._4_4_ = local_5140._4_4_ + 1.0;
        local_6060._0_4_ = (float)local_5140 + 1.0;
        uStack_6058._0_4_ = (float)uStack_5138 + 1.0;
        uStack_6058._4_4_ = uStack_5138._4_4_ + 1.0;
        uStack_6050._0_4_ = (float)uStack_5130 + 1.0;
        uStack_6050._4_4_ = uStack_5130._4_4_ + 1.0;
        auVar159 = _local_6060;
        uStack_6048._0_4_ = (float)uStack_5128 + 1.0;
        uStack_6048._4_4_ = uStack_5128._4_4_ + 1.0;
        auVar34 = _local_6060;
        auVar173._8_4_ = 0x3f3504f3;
        auVar173._0_8_ = 0x3f3504f33f3504f3;
        auVar173._12_4_ = 0x3f3504f3;
        auVar173._16_4_ = 0x3f3504f3;
        auVar173._20_4_ = 0x3f3504f3;
        auVar173._24_4_ = 0x3f3504f3;
        auVar173._28_4_ = 0x3f3504f3;
        local_6080 = vcmpps_avx(auVar6,auVar173,1);
        local_5fe0 = auVar6._0_8_;
        local_2c20 = local_5fe0;
        uStack_5fd8 = auVar6._8_8_;
        uStack_2c18 = uStack_5fd8;
        uStack_5fd0 = auVar6._16_8_;
        uStack_2c10 = uStack_5fd0;
        uStack_5fc8 = auVar6._24_8_;
        uStack_2c08 = uStack_5fc8;
        local_2c40 = local_6080._0_8_;
        uStack_2c38 = local_6080._8_8_;
        uStack_2c30 = local_6080._16_8_;
        uStack_2c28 = local_6080._24_8_;
        auVar4 = vpand_avx2(auVar6,local_6080);
        local_31a0 = local_5fe0;
        uStack_3198 = uStack_5fd8;
        uStack_3190 = uStack_5fd0;
        uStack_3188 = uStack_5fc8;
        local_31c0 = 0x3f8000003f800000;
        uStack_31b8 = 0x3f8000003f800000;
        uStack_31b0 = 0x3f8000003f800000;
        uStack_31a8 = 0x3f8000003f800000;
        auVar58._8_8_ = 0x3f8000003f800000;
        auVar58._0_8_ = 0x3f8000003f800000;
        auVar58._16_8_ = 0x3f8000003f800000;
        auVar58._24_8_ = 0x3f8000003f800000;
        auVar5 = vsubps_avx(auVar6,auVar58);
        local_31e0 = local_6060;
        uStack_31d8 = uStack_6058;
        uStack_6050 = auVar159._16_8_;
        uStack_31d0 = uStack_6050;
        uStack_6048 = auVar34._24_8_;
        uStack_31c8 = uStack_6048;
        local_2c60 = 0x3f8000003f800000;
        uStack_2c58 = 0x3f8000003f800000;
        uStack_2c50 = 0x3f8000003f800000;
        uStack_2c48 = 0x3f8000003f800000;
        local_2c80 = local_6080._0_8_;
        uStack_2c78 = local_6080._8_8_;
        uStack_2c70 = local_6080._16_8_;
        uStack_2c68 = local_6080._24_8_;
        auVar73._8_8_ = 0x3f8000003f800000;
        auVar73._0_8_ = 0x3f8000003f800000;
        auVar73._16_8_ = 0x3f8000003f800000;
        auVar73._24_8_ = 0x3f8000003f800000;
        local_3200 = vpand_avx2(auVar73,local_6080);
        auVar57._16_8_ = uStack_6050;
        auVar57._0_16_ = _local_6060;
        auVar57._24_8_ = uStack_6048;
        _local_6060 = vsubps_avx(auVar57,local_3200);
        local_5fe0 = auVar5._0_8_;
        uVar16 = local_5fe0;
        uStack_5fd8 = auVar5._8_8_;
        uVar17 = uStack_5fd8;
        uStack_5fd0 = auVar5._16_8_;
        uVar18 = uStack_5fd0;
        uStack_5fc8 = auVar5._24_8_;
        uVar19 = uStack_5fc8;
        local_60a0 = auVar4._0_8_;
        uVar20 = local_60a0;
        uStack_6098 = auVar4._8_8_;
        uVar21 = uStack_6098;
        uStack_6090 = auVar4._16_8_;
        uVar22 = uStack_6090;
        uStack_6088 = auVar4._24_8_;
        uVar23 = uStack_6088;
        local_5180._0_4_ = auVar5._0_4_;
        local_5180._4_4_ = auVar5._4_4_;
        uStack_5178._0_4_ = auVar5._8_4_;
        uStack_5178._4_4_ = auVar5._12_4_;
        uStack_5170._0_4_ = auVar5._16_4_;
        uStack_5170._4_4_ = auVar5._20_4_;
        uStack_5168._0_4_ = auVar5._24_4_;
        uStack_5168._4_4_ = auVar5._28_4_;
        local_51a0._0_4_ = auVar4._0_4_;
        local_51a0._4_4_ = auVar4._4_4_;
        uStack_5198._0_4_ = auVar4._8_4_;
        uStack_5198._4_4_ = auVar4._12_4_;
        uStack_5190._0_4_ = auVar4._16_4_;
        uStack_5190._4_4_ = auVar4._20_4_;
        uStack_5188._0_4_ = auVar4._24_4_;
        uStack_5188._4_4_ = auVar4._28_4_;
        local_5180._0_4_ = (float)local_5180 + (float)local_51a0;
        local_5180._4_4_ = local_5180._4_4_ + local_51a0._4_4_;
        uStack_5178._0_4_ = (float)uStack_5178 + (float)uStack_5198;
        uStack_5178._4_4_ = uStack_5178._4_4_ + uStack_5198._4_4_;
        uStack_5170._0_4_ = (float)uStack_5170 + (float)uStack_5190;
        uStack_5170._4_4_ = uStack_5170._4_4_ + uStack_5190._4_4_;
        uStack_5168._0_4_ = (float)uStack_5168 + (float)uStack_5188;
        fStack_60a4 = uStack_5168._4_4_ + uStack_5188._4_4_;
        local_5fe0._4_4_ = local_5180._4_4_;
        local_5fe0._0_4_ = (float)local_5180;
        uStack_5fd8._0_4_ = (float)uStack_5178;
        uStack_5fd8._4_4_ = uStack_5178._4_4_;
        uStack_5fd0._0_4_ = (float)uStack_5170;
        uStack_5fd0._4_4_ = uStack_5170._4_4_;
        auVar159 = _local_5fe0;
        uStack_5fc8._0_4_ = (float)uStack_5168;
        uStack_5fc8._4_4_ = fStack_60a4;
        auVar5 = _local_5fe0;
        local_5c80 = local_5fe0;
        uStack_5c78 = uStack_5fd8;
        uStack_5fd0 = auVar159._16_8_;
        uStack_5c70 = uStack_5fd0;
        uStack_5fc8 = auVar5._24_8_;
        uStack_5c68 = uStack_5fc8;
        local_60c0 = (float)local_5180 * (float)local_5180;
        fStack_60bc = local_5180._4_4_ * local_5180._4_4_;
        fStack_60b8 = (float)uStack_5178 * (float)uStack_5178;
        fStack_60b4 = uStack_5178._4_4_ * uStack_5178._4_4_;
        fStack_60b0 = (float)uStack_5170 * (float)uStack_5170;
        fStack_60ac = uStack_5170._4_4_ * uStack_5170._4_4_;
        fStack_60a8 = (float)uStack_5168 * (float)uStack_5168;
        uStack_60d8._0_4_ = 0x3d9021bb;
        local_60e0 = (undefined1  [8])0x3d9021bb3d9021bb;
        uStack_60d8._4_4_ = 0x3d9021bb;
        uStack_60d0._0_4_ = 0x3d9021bb;
        uStack_60d0._4_4_ = 0x3d9021bb;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = 0x3d9021bb;
        uStack_60c8._4_4_ = 0x3d9021bb;
        auVar5 = _local_60e0;
        local_5ca0 = 0x3d9021bb3d9021bb;
        uStack_5c98 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5c90 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5c88 = uStack_60c8;
        local_5cc0 = local_5fe0;
        uStack_5cb8 = uStack_5fd8;
        uStack_5cb0 = uStack_5fd0;
        uStack_5ca8 = uStack_5fc8;
        local_60e0._4_4_ = local_5180._4_4_ * 0.070376836;
        local_60e0._0_4_ = (float)local_5180 * 0.070376836;
        uStack_60d8._0_4_ = (float)uStack_5178 * 0.070376836;
        uStack_60d8._4_4_ = uStack_5178._4_4_ * 0.070376836;
        uStack_60d0._0_4_ = (float)uStack_5170 * 0.070376836;
        uStack_60d0._4_4_ = uStack_5170._4_4_ * 0.070376836;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = (float)uStack_5168 * 0.070376836;
        uStack_60c8._4_4_ = 0x3d9021bb;
        auVar5 = _local_60e0;
        local_51c0 = local_60e0;
        uStack_51b8 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_51b0 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_51a8 = uStack_60c8;
        local_51e0 = 0xbdebd1b8;
        uStack_51dc = 0xbdebd1b8;
        uStack_51d8 = 0xbdebd1b8;
        uStack_51d4 = 0xbdebd1b8;
        uStack_51d0 = 0xbdebd1b8;
        uStack_51cc = 0xbdebd1b8;
        uStack_51c8 = 0xbdebd1b8;
        uStack_51c4 = 0xbdebd1b8;
        local_60e0._0_4_ = (float)local_5180 * 0.070376836 + -0.1151461;
        local_60e0._4_4_ = local_5180._4_4_ * 0.070376836 + -0.1151461;
        fVar168 = (float)uStack_5178 * 0.070376836 + -0.1151461;
        fVar169 = uStack_5178._4_4_ * 0.070376836 + -0.1151461;
        fVar170 = (float)uStack_5170 * 0.070376836 + -0.1151461;
        fVar171 = uStack_5170._4_4_ * 0.070376836 + -0.1151461;
        fVar172 = (float)uStack_5168 * 0.070376836 + -0.1151461;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0xbd375ffa;
        auVar5 = _local_60e0;
        local_5ce0 = local_60e0;
        uStack_5cd8 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5cd0 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5cc8 = uStack_60c8;
        local_5d00 = local_5fe0;
        uStack_5cf8 = uStack_5fd8;
        uStack_5cf0 = uStack_5fd0;
        uStack_5ce8 = uStack_5fc8;
        local_60e0._0_4_ = (float)local_60e0._0_4_ * (float)local_5180;
        local_60e0._4_4_ = (float)local_60e0._4_4_ * local_5180._4_4_;
        fVar168 = fVar168 * (float)uStack_5178;
        fVar169 = fVar169 * uStack_5178._4_4_;
        fVar170 = fVar170 * (float)uStack_5170;
        fVar171 = fVar171 * uStack_5170._4_4_;
        fVar172 = fVar172 * (float)uStack_5168;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0xbd375ffa;
        auVar5 = _local_60e0;
        local_5200 = local_60e0;
        uStack_51f8 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_51f0 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_51e8 = uStack_60c8;
        local_5220 = 0x3def251a;
        uStack_521c = 0x3def251a;
        uStack_5218 = 0x3def251a;
        uStack_5214 = 0x3def251a;
        uStack_5210 = 0x3def251a;
        uStack_520c = 0x3def251a;
        uStack_5208 = 0x3def251a;
        uStack_5204 = 0x3def251a;
        local_60e0._0_4_ = (float)local_60e0._0_4_ + 0.116769984;
        local_60e0._4_4_ = (float)local_60e0._4_4_ + 0.116769984;
        fVar168 = fVar168 + 0.116769984;
        fVar169 = fVar169 + 0.116769984;
        fVar170 = fVar170 + 0.116769984;
        fVar171 = fVar171 + 0.116769984;
        fVar172 = fVar172 + 0.116769984;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0x3d93751d;
        auVar5 = _local_60e0;
        local_5d20 = local_60e0;
        uStack_5d18 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5d10 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5d08 = uStack_60c8;
        local_5d40 = local_5fe0;
        uStack_5d38 = uStack_5fd8;
        uStack_5d30 = uStack_5fd0;
        uStack_5d28 = uStack_5fc8;
        local_60e0._0_4_ = (float)local_60e0._0_4_ * (float)local_5180;
        local_60e0._4_4_ = (float)local_60e0._4_4_ * local_5180._4_4_;
        fVar168 = fVar168 * (float)uStack_5178;
        fVar169 = fVar169 * uStack_5178._4_4_;
        fVar170 = fVar170 * (float)uStack_5170;
        fVar171 = fVar171 * uStack_5170._4_4_;
        fVar172 = fVar172 * (float)uStack_5168;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0x3d93751d;
        auVar5 = _local_60e0;
        local_5240 = local_60e0;
        uStack_5238 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5230 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5228 = uStack_60c8;
        local_5260 = 0xbdfe5d4f;
        uStack_525c = 0xbdfe5d4f;
        uStack_5258 = 0xbdfe5d4f;
        uStack_5254 = 0xbdfe5d4f;
        uStack_5250 = 0xbdfe5d4f;
        uStack_524c = 0xbdfe5d4f;
        uStack_5248 = 0xbdfe5d4f;
        uStack_5244 = 0xbdfe5d4f;
        local_60e0._0_4_ = (float)local_60e0._0_4_ + -0.12420141;
        local_60e0._4_4_ = (float)local_60e0._4_4_ + -0.12420141;
        fVar168 = fVar168 + -0.12420141;
        fVar169 = fVar169 + -0.12420141;
        fVar170 = fVar170 + -0.12420141;
        fVar171 = fVar171 + -0.12420141;
        fVar172 = fVar172 + -0.12420141;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0xbd55d064;
        auVar5 = _local_60e0;
        local_5d60 = local_60e0;
        uStack_5d58 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5d50 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5d48 = uStack_60c8;
        local_5d80 = local_5fe0;
        uStack_5d78 = uStack_5fd8;
        uStack_5d70 = uStack_5fd0;
        uStack_5d68 = uStack_5fc8;
        local_60e0._0_4_ = (float)local_60e0._0_4_ * (float)local_5180;
        local_60e0._4_4_ = (float)local_60e0._4_4_ * local_5180._4_4_;
        fVar168 = fVar168 * (float)uStack_5178;
        fVar169 = fVar169 * uStack_5178._4_4_;
        fVar170 = fVar170 * (float)uStack_5170;
        fVar171 = fVar171 * uStack_5170._4_4_;
        fVar172 = fVar172 * (float)uStack_5168;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0xbd55d064;
        auVar5 = _local_60e0;
        local_5280 = local_60e0;
        uStack_5278 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5270 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5268 = uStack_60c8;
        local_52a0 = 0x3e11e9bf;
        uStack_529c = 0x3e11e9bf;
        uStack_5298 = 0x3e11e9bf;
        uStack_5294 = 0x3e11e9bf;
        uStack_5290 = 0x3e11e9bf;
        uStack_528c = 0x3e11e9bf;
        uStack_5288 = 0x3e11e9bf;
        uStack_5284 = 0x3e11e9bf;
        local_60e0._0_4_ = (float)local_60e0._0_4_ + 0.14249323;
        local_60e0._4_4_ = (float)local_60e0._4_4_ + 0.14249323;
        fVar168 = fVar168 + 0.14249323;
        fVar169 = fVar169 + 0.14249323;
        fVar170 = fVar170 + 0.14249323;
        fVar171 = fVar171 + 0.14249323;
        fVar172 = fVar172 + 0.14249323;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0x3db8eb4c;
        auVar5 = _local_60e0;
        local_5da0 = local_60e0;
        uStack_5d98 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5d90 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5d88 = uStack_60c8;
        local_5dc0 = local_5fe0;
        uStack_5db8 = uStack_5fd8;
        uStack_5db0 = uStack_5fd0;
        uStack_5da8 = uStack_5fc8;
        local_60e0._0_4_ = (float)local_60e0._0_4_ * (float)local_5180;
        local_60e0._4_4_ = (float)local_60e0._4_4_ * local_5180._4_4_;
        fVar168 = fVar168 * (float)uStack_5178;
        fVar169 = fVar169 * uStack_5178._4_4_;
        fVar170 = fVar170 * (float)uStack_5170;
        fVar171 = fVar171 * uStack_5170._4_4_;
        fVar172 = fVar172 * (float)uStack_5168;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0x3db8eb4c;
        auVar5 = _local_60e0;
        local_52c0 = local_60e0;
        uStack_52b8 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_52b0 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_52a8 = uStack_60c8;
        local_52e0 = 0xbe2aae50;
        uStack_52dc = 0xbe2aae50;
        uStack_52d8 = 0xbe2aae50;
        uStack_52d4 = 0xbe2aae50;
        uStack_52d0 = 0xbe2aae50;
        uStack_52cc = 0xbe2aae50;
        uStack_52c8 = 0xbe2aae50;
        uStack_52c4 = 0xbe2aae50;
        local_60e0._0_4_ = (float)local_60e0._0_4_ + -0.16668057;
        local_60e0._4_4_ = (float)local_60e0._4_4_ + -0.16668057;
        fVar168 = fVar168 + -0.16668057;
        fVar169 = fVar169 + -0.16668057;
        fVar170 = fVar170 + -0.16668057;
        fVar171 = fVar171 + -0.16668057;
        fVar172 = fVar172 + -0.16668057;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0xbd9c7154;
        auVar5 = _local_60e0;
        local_5de0 = local_60e0;
        uStack_5dd8 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5dd0 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5dc8 = uStack_60c8;
        local_5e00 = local_5fe0;
        uStack_5df8 = uStack_5fd8;
        uStack_5df0 = uStack_5fd0;
        uStack_5de8 = uStack_5fc8;
        local_60e0._0_4_ = (float)local_60e0._0_4_ * (float)local_5180;
        local_60e0._4_4_ = (float)local_60e0._4_4_ * local_5180._4_4_;
        fVar168 = fVar168 * (float)uStack_5178;
        fVar169 = fVar169 * uStack_5178._4_4_;
        fVar170 = fVar170 * (float)uStack_5170;
        fVar171 = fVar171 * uStack_5170._4_4_;
        fVar172 = fVar172 * (float)uStack_5168;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0xbd9c7154;
        auVar5 = _local_60e0;
        local_5300 = local_60e0;
        uStack_52f8 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_52f0 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_52e8 = uStack_60c8;
        local_5320 = 0x3e4cceac;
        uStack_531c = 0x3e4cceac;
        uStack_5318 = 0x3e4cceac;
        uStack_5314 = 0x3e4cceac;
        uStack_5310 = 0x3e4cceac;
        uStack_530c = 0x3e4cceac;
        uStack_5308 = 0x3e4cceac;
        uStack_5304 = 0x3e4cceac;
        local_60e0._0_4_ = (float)local_60e0._0_4_ + 0.20000714;
        local_60e0._4_4_ = (float)local_60e0._4_4_ + 0.20000714;
        fVar168 = fVar168 + 0.20000714;
        fVar169 = fVar169 + 0.20000714;
        fVar170 = fVar170 + 0.20000714;
        fVar171 = fVar171 + 0.20000714;
        fVar172 = fVar172 + 0.20000714;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0x3dfd2c04;
        auVar5 = _local_60e0;
        local_5e20 = local_60e0;
        uStack_5e18 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5e10 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5e08 = uStack_60c8;
        local_5e40 = local_5fe0;
        uStack_5e38 = uStack_5fd8;
        uStack_5e30 = uStack_5fd0;
        uStack_5e28 = uStack_5fc8;
        local_60e0._0_4_ = (float)local_60e0._0_4_ * (float)local_5180;
        local_60e0._4_4_ = (float)local_60e0._4_4_ * local_5180._4_4_;
        fVar168 = fVar168 * (float)uStack_5178;
        fVar169 = fVar169 * uStack_5178._4_4_;
        fVar170 = fVar170 * (float)uStack_5170;
        fVar171 = fVar171 * uStack_5170._4_4_;
        fVar172 = fVar172 * (float)uStack_5168;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0x3dfd2c04;
        auVar5 = _local_60e0;
        local_5340 = local_60e0;
        uStack_5338 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5330 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5328 = uStack_60c8;
        local_5360 = 0xbe7ffffc;
        uStack_535c = 0xbe7ffffc;
        uStack_5358 = 0xbe7ffffc;
        uStack_5354 = 0xbe7ffffc;
        uStack_5350 = 0xbe7ffffc;
        uStack_534c = 0xbe7ffffc;
        uStack_5348 = 0xbe7ffffc;
        uStack_5344 = 0xbe7ffffc;
        local_60e0._0_4_ = (float)local_60e0._0_4_ + -0.24999994;
        local_60e0._4_4_ = (float)local_60e0._4_4_ + -0.24999994;
        fVar168 = fVar168 + -0.24999994;
        fVar169 = fVar169 + -0.24999994;
        fVar170 = fVar170 + -0.24999994;
        fVar171 = fVar171 + -0.24999994;
        fVar172 = fVar172 + -0.24999994;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0xbe0169fa;
        auVar5 = _local_60e0;
        local_5e60 = local_60e0;
        uStack_5e58 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5e50 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5e48 = uStack_60c8;
        local_5e80 = local_5fe0;
        uStack_5e78 = uStack_5fd8;
        uStack_5e70 = uStack_5fd0;
        uStack_5e68 = uStack_5fc8;
        local_60e0._0_4_ = (float)local_60e0._0_4_ * (float)local_5180;
        local_60e0._4_4_ = (float)local_60e0._4_4_ * local_5180._4_4_;
        fVar168 = fVar168 * (float)uStack_5178;
        fVar169 = fVar169 * uStack_5178._4_4_;
        fVar170 = fVar170 * (float)uStack_5170;
        fVar171 = fVar171 * uStack_5170._4_4_;
        fVar172 = fVar172 * (float)uStack_5168;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0xbe0169fa;
        auVar5 = _local_60e0;
        local_5380 = local_60e0;
        uStack_5378 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5370 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5368 = uStack_60c8;
        local_53a0 = 0x3eaaaaaa;
        uStack_539c = 0x3eaaaaaa;
        uStack_5398 = 0x3eaaaaaa;
        uStack_5394 = 0x3eaaaaaa;
        uStack_5390 = 0x3eaaaaaa;
        uStack_538c = 0x3eaaaaaa;
        uStack_5388 = 0x3eaaaaaa;
        uStack_5384 = 0x3eaaaaaa;
        local_60e0._0_4_ = (float)local_60e0._0_4_ + 0.3333333;
        local_60e0._4_4_ = (float)local_60e0._4_4_ + 0.3333333;
        fVar168 = fVar168 + 0.3333333;
        fVar169 = fVar169 + 0.3333333;
        fVar170 = fVar170 + 0.3333333;
        fVar171 = fVar171 + 0.3333333;
        fVar172 = fVar172 + 0.3333333;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0x3e53eb5a;
        auVar5 = _local_60e0;
        local_5ea0 = local_60e0;
        uStack_5e98 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5e90 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5e88 = uStack_60c8;
        local_5ec0 = local_5fe0;
        uStack_5eb8 = uStack_5fd8;
        uStack_5eb0 = uStack_5fd0;
        uStack_5ea8 = uStack_5fc8;
        local_60e0._0_4_ = (float)local_60e0._0_4_ * (float)local_5180;
        local_60e0._4_4_ = (float)local_60e0._4_4_ * local_5180._4_4_;
        fVar168 = fVar168 * (float)uStack_5178;
        fVar169 = fVar169 * uStack_5178._4_4_;
        fVar170 = fVar170 * (float)uStack_5170;
        fVar171 = fVar171 * uStack_5170._4_4_;
        fVar172 = fVar172 * (float)uStack_5168;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0x3e53eb5a;
        auVar5 = _local_60e0;
        local_5ee0 = local_60e0;
        uStack_5ed8 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_5ed0 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_5ec8 = uStack_60c8;
        local_5f00 = CONCAT44(fStack_60bc,local_60c0);
        uStack_5ef8 = CONCAT44(fStack_60b4,fStack_60b8);
        uStack_5ef0 = CONCAT44(fStack_60ac,fStack_60b0);
        uStack_5ee8 = CONCAT44(fStack_60a4,fStack_60a8);
        local_60e0._0_4_ = (float)local_60e0._0_4_ * local_60c0;
        local_60e0._4_4_ = (float)local_60e0._4_4_ * fStack_60bc;
        fVar168 = fVar168 * fStack_60b8;
        fVar169 = fVar169 * fStack_60b4;
        fVar170 = fVar170 * fStack_60b0;
        fVar171 = fVar171 * fStack_60ac;
        fVar172 = fVar172 * fStack_60a8;
        uStack_60d8._0_4_ = fVar168;
        uStack_60d8._4_4_ = fVar169;
        uStack_60d0._0_4_ = fVar170;
        uStack_60d0._4_4_ = fVar171;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172;
        uStack_60c8._4_4_ = 0x3e53eb5a;
        auVar5 = _local_60e0;
        local_5f40 = 0xb95e8083;
        uStack_5f3c = 0xb95e8083;
        uStack_5f38 = 0xb95e8083;
        uStack_5f34 = 0xb95e8083;
        uStack_5f30 = 0xb95e8083;
        uStack_5f2c = 0xb95e8083;
        uStack_5f28 = 0xb95e8083;
        uStack_5f24 = 0xb95e8083;
        local_5f20._0_4_ = local_6060._0_4_;
        local_5f20._4_4_ = local_6060._4_4_;
        uStack_5f18._0_4_ = local_6060._8_4_;
        uStack_5f18._4_4_ = local_6060._12_4_;
        uStack_5f10._0_4_ = local_6060._16_4_;
        uStack_5f10._4_4_ = local_6060._20_4_;
        uStack_5f08._0_4_ = local_6060._24_4_;
        uStack_5f08._4_4_ = local_6060._28_4_;
        local_60a0._4_4_ = local_5f20._4_4_ * -0.00021219444;
        local_60a0._0_4_ = (float)local_5f20 * -0.00021219444;
        uStack_6098._0_4_ = (float)uStack_5f18 * -0.00021219444;
        uStack_6098._4_4_ = uStack_5f18._4_4_ * -0.00021219444;
        uStack_6090._0_4_ = (float)uStack_5f10 * -0.00021219444;
        uStack_6090._4_4_ = uStack_5f10._4_4_ * -0.00021219444;
        auVar164 = _local_60a0;
        uStack_6088._0_4_ = (float)uStack_5f08 * -0.00021219444;
        uStack_6088._4_4_ = uStack_5f08._4_4_;
        auVar4 = _local_60a0;
        local_53c0 = local_60e0;
        uStack_53b8 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_53b0 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_53a8 = uStack_60c8;
        local_53e0 = local_60a0;
        uStack_53d8 = uStack_6098;
        uStack_6090 = auVar164._16_8_;
        uStack_53d0 = uStack_6090;
        uStack_6088 = auVar4._24_8_;
        uStack_53c8 = uStack_6088;
        local_60e0._4_4_ = (float)local_60e0._4_4_ + local_5f20._4_4_ * -0.00021219444;
        local_60e0._0_4_ = (float)local_60e0._0_4_ + (float)local_5f20 * -0.00021219444;
        uStack_60d8._0_4_ = fVar168 + (float)uStack_5f18 * -0.00021219444;
        uStack_60d8._4_4_ = fVar169 + uStack_5f18._4_4_ * -0.00021219444;
        uStack_60d0._0_4_ = fVar170 + (float)uStack_5f10 * -0.00021219444;
        uStack_60d0._4_4_ = fVar171 + uStack_5f10._4_4_ * -0.00021219444;
        auVar159 = _local_60e0;
        uStack_60c8._0_4_ = fVar172 + (float)uStack_5f08 * -0.00021219444;
        uStack_60c8._4_4_ = uStack_5f08._4_4_ + 0.20695248;
        auVar5 = _local_60e0;
        local_5f60 = CONCAT44(fStack_60bc,local_60c0);
        uStack_5f58 = CONCAT44(fStack_60b4,fStack_60b8);
        uStack_5f50 = CONCAT44(fStack_60ac,fStack_60b0);
        uStack_5f48 = CONCAT44(fStack_60a4,fStack_60a8);
        local_5f80 = 0x3f000000;
        uStack_5f7c = 0x3f000000;
        uStack_5f78 = 0x3f000000;
        uStack_5f74 = 0x3f000000;
        uStack_5f70 = 0x3f000000;
        uStack_5f6c = 0x3f000000;
        uStack_5f68 = 0x3f000000;
        uStack_5f64 = 0x3f000000;
        local_60a0._4_4_ = fStack_60bc * 0.5;
        local_60a0._0_4_ = local_60c0 * 0.5;
        uStack_6098._0_4_ = fStack_60b8 * 0.5;
        uStack_6098._4_4_ = fStack_60b4 * 0.5;
        uStack_6090._0_4_ = fStack_60b0 * 0.5;
        uStack_6090._4_4_ = fStack_60ac * 0.5;
        auVar164 = _local_60a0;
        uStack_6088._0_4_ = fStack_60a8 * 0.5;
        uStack_6088._4_4_ = fStack_60a4;
        auVar4 = _local_60a0;
        local_3220 = local_60e0;
        uStack_3218 = uStack_60d8;
        uStack_60d0 = auVar159._16_8_;
        uStack_3210 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uStack_3208 = uStack_60c8;
        local_3240 = local_60a0;
        uStack_3238 = uStack_6098;
        uStack_6090 = auVar164._16_8_;
        uStack_3230 = uStack_6090;
        uStack_6088 = auVar4._24_8_;
        uStack_3228 = uStack_6088;
        auVar56._16_8_ = uStack_60d0;
        auVar56._0_16_ = _local_60e0;
        auVar56._24_8_ = uStack_60c8;
        auVar55._16_8_ = uStack_6090;
        auVar55._0_16_ = _local_60a0;
        auVar55._24_8_ = uStack_6088;
        auVar5 = vsubps_avx(auVar56,auVar55);
        local_5fa0 = local_6060;
        uStack_5f98 = uStack_6058;
        uStack_5f90 = uStack_6050;
        uStack_5f88 = uStack_6048;
        local_5fc0 = 0x3f318000;
        uStack_5fbc = 0x3f318000;
        uStack_5fb8 = 0x3f318000;
        uStack_5fb4 = 0x3f318000;
        uStack_5fb0 = 0x3f318000;
        uStack_5fac = 0x3f318000;
        uStack_5fa8 = 0x3f318000;
        uStack_5fa4 = 0x3f318000;
        local_60a0._4_4_ = local_5f20._4_4_ * 0.6933594;
        local_60a0._0_4_ = (float)local_5f20 * 0.6933594;
        uStack_6098._0_4_ = (float)uStack_5f18 * 0.6933594;
        uStack_6098._4_4_ = uStack_5f18._4_4_ * 0.6933594;
        uStack_6090._0_4_ = (float)uStack_5f10 * 0.6933594;
        uStack_6090._4_4_ = uStack_5f10._4_4_ * 0.6933594;
        auVar159 = _local_60a0;
        uStack_6088._0_4_ = (float)uStack_5f08 * 0.6933594;
        uStack_6088._4_4_ = uStack_5f08._4_4_;
        auVar34 = _local_60a0;
        local_5400 = local_5fe0;
        uStack_53f8 = uStack_5fd8;
        uStack_53f0 = uStack_5fd0;
        uStack_53e8 = uStack_5fc8;
        local_60e0 = auVar5._0_8_;
        uVar24 = local_60e0;
        uStack_60d8 = auVar5._8_8_;
        uVar25 = uStack_60d8;
        uStack_60d0 = auVar5._16_8_;
        uVar26 = uStack_60d0;
        uStack_60c8 = auVar5._24_8_;
        uVar27 = uStack_60c8;
        local_5420._0_4_ = auVar5._0_4_;
        local_5420._4_4_ = auVar5._4_4_;
        uStack_5418._0_4_ = auVar5._8_4_;
        uStack_5418._4_4_ = auVar5._12_4_;
        uStack_5410._0_4_ = auVar5._16_4_;
        uStack_5410._4_4_ = auVar5._20_4_;
        uStack_5408._0_4_ = auVar5._24_4_;
        uStack_5408._4_4_ = auVar5._28_4_;
        local_5fe0._4_4_ = local_5180._4_4_ + local_5420._4_4_;
        local_5fe0._0_4_ = (float)local_5180 + (float)local_5420;
        uStack_5fd8._0_4_ = (float)uStack_5178 + (float)uStack_5418;
        uStack_5fd8._4_4_ = uStack_5178._4_4_ + uStack_5418._4_4_;
        uStack_5fd0._0_4_ = (float)uStack_5170 + (float)uStack_5410;
        uStack_5fd0._4_4_ = uStack_5170._4_4_ + uStack_5410._4_4_;
        auVar164 = _local_5fe0;
        uStack_5fc8._0_4_ = (float)uStack_5168 + (float)uStack_5408;
        uStack_5fc8._4_4_ = fStack_60a4 + uStack_5408._4_4_;
        auVar5 = _local_5fe0;
        local_5440 = local_5fe0;
        uStack_5438 = uStack_5fd8;
        uStack_5fd0 = auVar164._16_8_;
        uStack_5430 = uStack_5fd0;
        uStack_5fc8 = auVar5._24_8_;
        uStack_5428 = uStack_5fc8;
        local_5460 = local_60a0;
        uStack_5458 = uStack_6098;
        uStack_6090 = auVar159._16_8_;
        uStack_5450 = uStack_6090;
        uStack_6088 = auVar34._24_8_;
        uStack_5448 = uStack_6088;
        local_5fe0._4_4_ = local_5180._4_4_ + local_5420._4_4_ + local_5f20._4_4_ * 0.6933594;
        local_5fe0._0_4_ = (float)local_5180 + (float)local_5420 + (float)local_5f20 * 0.6933594;
        uStack_5fd8._0_4_ = (float)uStack_5178 + (float)uStack_5418 + (float)uStack_5f18 * 0.6933594
        ;
        uStack_5fd8._4_4_ = uStack_5178._4_4_ + uStack_5418._4_4_ + uStack_5f18._4_4_ * 0.6933594;
        uStack_5fd0._0_4_ = (float)uStack_5170 + (float)uStack_5410 + (float)uStack_5f10 * 0.6933594
        ;
        uStack_5fd0._4_4_ = uStack_5170._4_4_ + uStack_5410._4_4_ + uStack_5f10._4_4_ * 0.6933594;
        auVar159 = _local_5fe0;
        uStack_5fc8._0_4_ = (float)uStack_5168 + (float)uStack_5408 + (float)uStack_5f08 * 0.6933594
        ;
        uStack_5fc8._4_4_ = fStack_60a4 + uStack_5408._4_4_ + uStack_5f08._4_4_;
        auVar39 = _local_5fe0;
        local_2b20 = local_5fe0;
        uStack_2b18 = uStack_5fd8;
        uStack_5fd0 = auVar159._16_8_;
        uStack_2b10 = uStack_5fd0;
        uStack_5fc8 = auVar39._24_8_;
        uStack_2b08 = uStack_5fc8;
        local_2b40 = local_6040._0_8_;
        uStack_2b38 = local_6040._8_8_;
        uStack_2b30 = local_6040._16_8_;
        uStack_2b28 = local_6040._24_8_;
        auVar77._16_8_ = uStack_5fd0;
        auVar77._0_16_ = _local_5fe0;
        auVar77._24_8_ = uStack_5fc8;
        _local_60e0 = vpor_avx2(auVar77,local_6040);
        local_61e0 = local_60e0;
        uStack_61d8 = uStack_60d8;
        uStack_61d0 = uStack_60d0;
        uStack_61c8 = uStack_60c8;
        local_44cc = 0x3f800000;
        local_21e0 = 0x3f800000;
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        local_2200 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        auStack_21f0 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        local_6200 = local_2200._0_8_;
        uStack_61f8 = local_2200._8_8_;
        uStack_61f0 = auStack_21f0._0_8_;
        uStack_61e8 = auStack_21f0._8_8_;
        local_44d0 = 0x40000000;
        local_21a0 = 0x40000000;
        auVar1 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x20);
        local_21c0 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x30);
        auVar1 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x20);
        auStack_21b0 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x30);
        local_6220 = local_21c0._0_8_;
        uStack_6218 = local_21c0._8_8_;
        uStack_6210 = auStack_21b0._0_8_;
        uStack_6208 = auStack_21b0._8_8_;
        local_61a0._0_4_ = local_60e0._0_4_;
        local_61a0._4_4_ = local_60e0._4_4_;
        uStack_6198._0_4_ = local_60e0._8_4_;
        uStack_6198._4_4_ = local_60e0._12_4_;
        uStack_6190._0_4_ = local_60e0._16_4_;
        uStack_6190._4_4_ = local_60e0._20_4_;
        uStack_6188._0_4_ = local_60e0._24_4_;
        uStack_6188._4_4_ = local_60e0._28_4_;
        uStack_3d44 = uStack_6188._4_4_;
        local_61c0._0_4_ = local_21c0._0_4_;
        local_61c0._4_4_ = local_21c0._4_4_;
        uStack_61b8._0_4_ = local_21c0._8_4_;
        uStack_61b8._4_4_ = local_21c0._12_4_;
        uStack_61b0._0_4_ = auStack_21b0._0_4_;
        uStack_61b0._4_4_ = auStack_21b0._4_4_;
        uStack_61a8._0_4_ = auStack_21b0._8_4_;
        local_3d60 = (float)local_61a0 * (float)local_61c0;
        fStack_3d5c = local_61a0._4_4_ * local_61c0._4_4_;
        fStack_3d58 = (float)uStack_6198 * (float)uStack_61b8;
        fStack_3d54 = uStack_6198._4_4_ * uStack_61b8._4_4_;
        fStack_3d50 = (float)uStack_6190 * (float)uStack_61b0;
        fStack_3d4c = uStack_6190._4_4_ * uStack_61b0._4_4_;
        fStack_3d48 = (float)uStack_6188 * (float)uStack_61a8;
        local_3704 = 0x3f800000;
        local_22e0 = 0x3f800000;
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        local_2300 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        auStack_22f0 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        local_3d80._0_4_ = local_2300._0_4_;
        local_3d20 = (float)local_3d80;
        local_3d80._4_4_ = local_2300._4_4_;
        fStack_3d1c = local_3d80._4_4_;
        uStack_3d78._0_4_ = local_2300._8_4_;
        fStack_3d18 = (float)uStack_3d78;
        uStack_3d78._4_4_ = local_2300._12_4_;
        fStack_3d14 = uStack_3d78._4_4_;
        uStack_3d70._0_4_ = auStack_22f0._0_4_;
        fStack_3d10 = (float)uStack_3d70;
        uStack_3d70._4_4_ = auStack_22f0._4_4_;
        fStack_3d0c = uStack_3d70._4_4_;
        uStack_3d68._0_4_ = auStack_22f0._8_4_;
        fStack_3d08 = (float)uStack_3d68;
        uStack_3d68._4_4_ = auStack_22f0._12_4_;
        fStack_3d04 = uStack_3d68._4_4_;
        local_3180 = ZEXT1632(ZEXT816(0) << 0x40);
        local_35a0 = 0;
        uStack_3598 = 0;
        uStack_3590 = 0;
        uStack_3588 = 0;
        local_35c0 = CONCAT44(fStack_3d5c,local_3d60);
        uStack_35b8 = CONCAT44(fStack_3d54,fStack_3d58);
        uStack_35b0 = CONCAT44(fStack_3d4c,fStack_3d50);
        uStack_35a8 = CONCAT44(uStack_6188._4_4_,fStack_3d48);
        auVar43._8_8_ = uStack_35b8;
        auVar43._0_8_ = local_35c0;
        auVar43._16_8_ = uStack_35b0;
        auVar43._24_8_ = uStack_35a8;
        auVar5 = vsubps_avx(ZEXT832(0),auVar43);
        local_2780 = 0x7f0000007f;
        uStack_2778 = 0x7f0000007f;
        uStack_2770 = 0x7f0000007f;
        uStack_2768 = 0x7f0000007f;
        local_3c80 = 0x3f800000;
        uStack_3c7c = 0x3f800000;
        uStack_3c78 = 0x3f800000;
        uStack_3c74 = 0x3f800000;
        uStack_3c70 = 0x3f800000;
        uStack_3c6c = 0x3f800000;
        uStack_3c68 = 0x3f800000;
        uStack_3c64 = 0x3f800000;
        local_3c00._0_8_ = auVar5._0_8_;
        local_28e0 = local_3c00._0_8_;
        local_3c00._8_8_ = auVar5._8_8_;
        uStack_28d8 = local_3c00._8_8_;
        local_3c00._16_8_ = auVar5._16_8_;
        uStack_28d0 = local_3c00._16_8_;
        local_3c00._24_8_ = auVar5._24_8_;
        uStack_28c8 = local_3c00._24_8_;
        local_2900 = 0x42b0c0a5;
        uStack_28fc = 0x42b0c0a5;
        uStack_28f8 = 0x42b0c0a5;
        uStack_28f4 = 0x42b0c0a5;
        uStack_28f0 = 0x42b0c0a5;
        uStack_28ec = 0x42b0c0a5;
        uStack_28e8 = 0x42b0c0a5;
        uStack_28e4 = 0x42b0c0a5;
        auVar81._8_4_ = 0x42b0c0a5;
        auVar81._0_8_ = 0x42b0c0a542b0c0a5;
        auVar81._12_4_ = 0x42b0c0a5;
        auVar81._16_4_ = 0x42b0c0a5;
        auVar81._20_4_ = 0x42b0c0a5;
        auVar81._24_4_ = 0x42b0c0a5;
        auVar81._28_4_ = 0x42b0c0a5;
        auVar5 = vminps_avx(auVar5,auVar81);
        local_3c00._0_8_ = auVar5._0_8_;
        local_3060 = local_3c00._0_8_;
        local_3c00._8_8_ = auVar5._8_8_;
        uStack_3058 = local_3c00._8_8_;
        local_3c00._16_8_ = auVar5._16_8_;
        uStack_3050 = local_3c00._16_8_;
        local_3c00._24_8_ = auVar5._24_8_;
        uStack_3048 = local_3c00._24_8_;
        local_3080 = 0xc2b0c0a5;
        uStack_307c = 0xc2b0c0a5;
        uStack_3078 = 0xc2b0c0a5;
        uStack_3074 = 0xc2b0c0a5;
        uStack_3070 = 0xc2b0c0a5;
        uStack_306c = 0xc2b0c0a5;
        uStack_3068 = 0xc2b0c0a5;
        uStack_3064 = 0xc2b0c0a5;
        auVar59._8_4_ = 0xc2b0c0a5;
        auVar59._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar59._12_4_ = 0xc2b0c0a5;
        auVar59._16_4_ = 0xc2b0c0a5;
        auVar59._20_4_ = 0xc2b0c0a5;
        auVar59._24_4_ = 0xc2b0c0a5;
        auVar59._28_4_ = 0xc2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar59);
        local_3c00._0_8_ = auVar4._0_8_;
        uVar28 = local_3c00._0_8_;
        local_3c00._8_8_ = auVar4._8_8_;
        uVar29 = local_3c00._8_8_;
        local_3c00._16_8_ = auVar4._16_8_;
        uVar30 = local_3c00._16_8_;
        local_3c00._24_8_ = auVar4._24_8_;
        uVar31 = local_3c00._24_8_;
        local_3960 = 0x3fb8aa3b;
        uStack_395c = 0x3fb8aa3b;
        uStack_3958 = 0x3fb8aa3b;
        uStack_3954 = 0x3fb8aa3b;
        uStack_3950 = 0x3fb8aa3b;
        uStack_394c = 0x3fb8aa3b;
        uStack_3948 = 0x3fb8aa3b;
        uStack_3944 = 0x3fb8aa3b;
        local_3940._0_4_ = auVar4._0_4_;
        local_3940._4_4_ = auVar4._4_4_;
        uStack_3938._0_4_ = auVar4._8_4_;
        uStack_3938._4_4_ = auVar4._12_4_;
        uStack_3930._0_4_ = auVar4._16_4_;
        uStack_3930._4_4_ = auVar4._20_4_;
        uStack_3928._0_4_ = auVar4._24_4_;
        uStack_3928._4_4_ = auVar4._28_4_;
        local_3c40._4_4_ = local_3940._4_4_ * 1.442695;
        local_3c40._0_4_ = (float)local_3940 * 1.442695;
        uStack_3c38._0_4_ = (float)uStack_3938 * 1.442695;
        uStack_3c38._4_4_ = uStack_3938._4_4_ * 1.442695;
        uStack_3c30._0_4_ = (float)uStack_3930 * 1.442695;
        uStack_3c30._4_4_ = uStack_3930._4_4_ * 1.442695;
        auVar159 = _local_3c40;
        uStack_3c28._0_4_ = (float)uStack_3928 * 1.442695;
        uStack_3c28._4_4_ = uStack_3928._4_4_;
        auVar5 = _local_3c40;
        local_3740 = local_3c40;
        uStack_3738 = uStack_3c38;
        uStack_3c30 = auVar159._16_8_;
        uStack_3730 = uStack_3c30;
        uStack_3c28 = auVar5._24_8_;
        uStack_3728 = uStack_3c28;
        local_3760 = 0x3f000000;
        uStack_375c = 0x3f000000;
        uStack_3758 = 0x3f000000;
        uStack_3754 = 0x3f000000;
        uStack_3750 = 0x3f000000;
        uStack_374c = 0x3f000000;
        uStack_3748 = 0x3f000000;
        uStack_3744 = 0x3f000000;
        local_3c40._4_4_ = local_3940._4_4_ * 1.442695 + 0.5;
        local_3c40._0_4_ = (float)local_3940 * 1.442695 + 0.5;
        uStack_3c38._0_4_ = (float)uStack_3938 * 1.442695 + 0.5;
        uStack_3c38._4_4_ = uStack_3938._4_4_ * 1.442695 + 0.5;
        uStack_3c30._0_4_ = (float)uStack_3930 * 1.442695 + 0.5;
        uStack_3c30._4_4_ = uStack_3930._4_4_ * 1.442695 + 0.5;
        uStack_3c28._0_4_ = (float)uStack_3928 * 1.442695 + 0.5;
        uStack_3c28._4_4_ = uStack_3928._4_4_ + 0.5;
        auVar6 = vroundps_avx(_local_3c40,1);
        auVar5 = vcmpps_avx(_local_3c40,auVar6,1);
        local_3ca0._0_8_ = auVar5._0_8_;
        local_2e20 = local_3ca0._0_8_;
        local_3ca0._8_8_ = auVar5._8_8_;
        uStack_2e18 = local_3ca0._8_8_;
        local_3ca0._16_8_ = auVar5._16_8_;
        uStack_2e10 = local_3ca0._16_8_;
        local_3ca0._24_8_ = auVar5._24_8_;
        uStack_2e08 = local_3ca0._24_8_;
        local_2e40 = 0x3f8000003f800000;
        uStack_2e38 = 0x3f8000003f800000;
        uStack_2e30 = 0x3f8000003f800000;
        uStack_2e28 = 0x3f8000003f800000;
        auVar67._8_8_ = 0x3f8000003f800000;
        auVar67._0_8_ = 0x3f8000003f800000;
        auVar67._16_8_ = 0x3f8000003f800000;
        auVar67._24_8_ = 0x3f8000003f800000;
        local_3ca0 = vpand_avx2(auVar5,auVar67);
        local_3c20 = auVar6._0_8_;
        local_35e0 = local_3c20;
        uStack_3c18 = auVar6._8_8_;
        uStack_35d8 = uStack_3c18;
        uStack_3c10 = auVar6._16_8_;
        uStack_35d0 = uStack_3c10;
        uStack_3c08 = auVar6._24_8_;
        uStack_35c8 = uStack_3c08;
        local_3600 = local_3ca0._0_8_;
        uStack_35f8 = local_3ca0._8_8_;
        uStack_35f0 = local_3ca0._16_8_;
        uStack_35e8 = local_3ca0._24_8_;
        _local_3c40 = vsubps_avx(auVar6,local_3ca0);
        local_39a0 = 0x3f318000;
        uStack_399c = 0x3f318000;
        uStack_3998 = 0x3f318000;
        uStack_3994 = 0x3f318000;
        uStack_3990 = 0x3f318000;
        uStack_398c = 0x3f318000;
        uStack_3988 = 0x3f318000;
        uStack_3984 = 0x3f318000;
        local_3980._0_4_ = local_3c40._0_4_;
        local_3980._4_4_ = local_3c40._4_4_;
        uStack_3978._0_4_ = local_3c40._8_4_;
        uStack_3978._4_4_ = local_3c40._12_4_;
        uStack_3970._0_4_ = local_3c40._16_4_;
        uStack_3970._4_4_ = local_3c40._20_4_;
        uStack_3968._0_4_ = local_3c40._24_4_;
        uStack_3968._4_4_ = local_3c40._28_4_;
        local_3c20._4_4_ = local_3980._4_4_ * 0.6933594;
        local_3c20._0_4_ = (float)local_3980 * 0.6933594;
        uStack_3c18._0_4_ = (float)uStack_3978 * 0.6933594;
        uStack_3c18._4_4_ = uStack_3978._4_4_ * 0.6933594;
        uStack_3c10._0_4_ = (float)uStack_3970 * 0.6933594;
        uStack_3c10._4_4_ = uStack_3970._4_4_ * 0.6933594;
        auVar159 = _local_3c20;
        uStack_3c08._0_4_ = (float)uStack_3968 * 0.6933594;
        uStack_3c08._4_4_ = uStack_3968._4_4_;
        auVar6 = _local_3c20;
        local_39c0 = local_3c40;
        uStack_39b8 = uStack_3c38;
        uStack_39b0 = uStack_3c30;
        uStack_39a8 = uStack_3c28;
        local_39e0 = 0xb95e8083;
        uStack_39dc = 0xb95e8083;
        uStack_39d8 = 0xb95e8083;
        uStack_39d4 = 0xb95e8083;
        uStack_39d0 = 0xb95e8083;
        uStack_39cc = 0xb95e8083;
        uStack_39c8 = 0xb95e8083;
        uStack_39c4 = 0xb95e8083;
        local_3620 = local_3c00._0_8_;
        uStack_3618 = local_3c00._8_8_;
        uStack_3610 = local_3c00._16_8_;
        uStack_3608 = local_3c00._24_8_;
        local_3640 = local_3c20;
        uStack_3638 = uStack_3c18;
        uStack_3c10 = auVar159._16_8_;
        uStack_3630 = uStack_3c10;
        uStack_3c08 = auVar6._24_8_;
        uStack_3628 = uStack_3c08;
        auVar42._16_8_ = uStack_3c10;
        auVar42._0_16_ = _local_3c20;
        auVar42._24_8_ = uStack_3c08;
        auVar5 = vsubps_avx(auVar4,auVar42);
        local_3c00._0_8_ = auVar5._0_8_;
        local_3660 = local_3c00._0_8_;
        local_3c00._8_8_ = auVar5._8_8_;
        uStack_3658 = local_3c00._8_8_;
        local_3c00._16_8_ = auVar5._16_8_;
        uStack_3650 = local_3c00._16_8_;
        local_3c00._24_8_ = auVar5._24_8_;
        uStack_3648 = local_3c00._24_8_;
        local_3680 = CONCAT44(local_3980._4_4_ * -0.00021219444,(float)local_3980 * -0.00021219444);
        uStack_3678 = CONCAT44(uStack_3978._4_4_ * -0.00021219444,
                               (float)uStack_3978 * -0.00021219444);
        uStack_3670 = CONCAT44(uStack_3970._4_4_ * -0.00021219444,
                               (float)uStack_3970 * -0.00021219444);
        uStack_3668 = CONCAT44(uStack_3968._4_4_,(float)uStack_3968 * -0.00021219444);
        auVar41._8_8_ = uStack_3678;
        auVar41._0_8_ = local_3680;
        auVar41._16_8_ = uStack_3670;
        auVar41._24_8_ = uStack_3668;
        local_3c00 = vsubps_avx(auVar5,auVar41);
        local_3a20 = local_3c00._0_8_;
        uStack_3a18 = local_3c00._8_8_;
        uStack_3a10 = local_3c00._16_8_;
        uStack_3a08 = local_3c00._24_8_;
        local_3a00._0_4_ = local_3c00._0_4_;
        local_3a00._4_4_ = local_3c00._4_4_;
        uStack_39f8._0_4_ = local_3c00._8_4_;
        uStack_39f8._4_4_ = local_3c00._12_4_;
        uStack_39f0._0_4_ = local_3c00._16_4_;
        uStack_39f0._4_4_ = local_3c00._20_4_;
        uStack_39e8._0_4_ = local_3c00._24_4_;
        uStack_39e8._4_4_ = local_3c00._28_4_;
        fStack_3ca4 = uStack_39e8._4_4_;
        local_3cc0 = (float)local_3a00 * (float)local_3a00;
        fStack_3cbc = local_3a00._4_4_ * local_3a00._4_4_;
        fStack_3cb8 = (float)uStack_39f8 * (float)uStack_39f8;
        fStack_3cb4 = uStack_39f8._4_4_ * uStack_39f8._4_4_;
        fStack_3cb0 = (float)uStack_39f0 * (float)uStack_39f0;
        fStack_3cac = uStack_39f0._4_4_ * uStack_39f0._4_4_;
        fStack_3ca8 = (float)uStack_39e8 * (float)uStack_39e8;
        local_3a40 = 0x3950696739506967;
        uStack_3a38 = 0x3950696739506967;
        uStack_3a30 = 0x3950696739506967;
        uStack_3a28 = 0x3950696739506967;
        local_3a60 = local_3c00._0_8_;
        uStack_3a58 = local_3c00._8_8_;
        uStack_3a50 = local_3c00._16_8_;
        uStack_3a48 = local_3c00._24_8_;
        local_3780 = CONCAT44(local_3a00._4_4_ * 0.00019875691,(float)local_3a00 * 0.00019875691);
        uStack_3778 = CONCAT44(uStack_39f8._4_4_ * 0.00019875691,(float)uStack_39f8 * 0.00019875691)
        ;
        uStack_3770 = CONCAT44(uStack_39f0._4_4_ * 0.00019875691,(float)uStack_39f0 * 0.00019875691)
        ;
        uStack_3768 = CONCAT44(0x39506967,(float)uStack_39e8 * 0.00019875691);
        local_37a0 = 0x3ab743ce;
        uStack_379c = 0x3ab743ce;
        uStack_3798 = 0x3ab743ce;
        uStack_3794 = 0x3ab743ce;
        uStack_3790 = 0x3ab743ce;
        uStack_378c = 0x3ab743ce;
        uStack_3788 = 0x3ab743ce;
        uStack_3784 = 0x3ab743ce;
        local_3ce0 = (float)local_3a00 * 0.00019875691 + 0.0013981999;
        fStack_3cdc = local_3a00._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3cd8 = (float)uStack_39f8 * 0.00019875691 + 0.0013981999;
        fStack_3cd4 = uStack_39f8._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3cd0 = (float)uStack_39f0 * 0.00019875691 + 0.0013981999;
        fStack_3ccc = uStack_39f0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_3cc8 = (float)uStack_39e8 * 0.00019875691 + 0.0013981999;
        local_3a80 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_3a78 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_3a70 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_3a68 = CONCAT44(0x3ad150fb,fStack_3cc8);
        local_3aa0 = local_3c00._0_8_;
        uStack_3a98 = local_3c00._8_8_;
        uStack_3a90 = local_3c00._16_8_;
        uStack_3a88 = local_3c00._24_8_;
        local_3ce0 = (float)local_3a00 * local_3ce0;
        fStack_3cdc = local_3a00._4_4_ * fStack_3cdc;
        fStack_3cd8 = (float)uStack_39f8 * fStack_3cd8;
        fStack_3cd4 = uStack_39f8._4_4_ * fStack_3cd4;
        fStack_3cd0 = (float)uStack_39f0 * fStack_3cd0;
        fStack_3ccc = uStack_39f0._4_4_ * fStack_3ccc;
        fStack_3cc8 = (float)uStack_39e8 * fStack_3cc8;
        local_37c0 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_37b8 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_37b0 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_37a8 = CONCAT44(0x3ad150fb,fStack_3cc8);
        local_37e0 = 0x3c088908;
        uStack_37dc = 0x3c088908;
        uStack_37d8 = 0x3c088908;
        uStack_37d4 = 0x3c088908;
        uStack_37d0 = 0x3c088908;
        uStack_37cc = 0x3c088908;
        uStack_37c8 = 0x3c088908;
        uStack_37c4 = 0x3c088908;
        local_3ce0 = local_3ce0 + 0.008333452;
        fStack_3cdc = fStack_3cdc + 0.008333452;
        fStack_3cd8 = fStack_3cd8 + 0.008333452;
        fStack_3cd4 = fStack_3cd4 + 0.008333452;
        fStack_3cd0 = fStack_3cd0 + 0.008333452;
        fStack_3ccc = fStack_3ccc + 0.008333452;
        fStack_3cc8 = fStack_3cc8 + 0.008333452;
        local_3ac0 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_3ab8 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_3ab0 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_3aa8 = CONCAT44(0x3c22b327,fStack_3cc8);
        local_3ae0 = local_3c00._0_8_;
        uStack_3ad8 = local_3c00._8_8_;
        uStack_3ad0 = local_3c00._16_8_;
        uStack_3ac8 = local_3c00._24_8_;
        local_3ce0 = local_3ce0 * (float)local_3a00;
        fStack_3cdc = fStack_3cdc * local_3a00._4_4_;
        fStack_3cd8 = fStack_3cd8 * (float)uStack_39f8;
        fStack_3cd4 = fStack_3cd4 * uStack_39f8._4_4_;
        fStack_3cd0 = fStack_3cd0 * (float)uStack_39f0;
        fStack_3ccc = fStack_3ccc * uStack_39f0._4_4_;
        fStack_3cc8 = fStack_3cc8 * (float)uStack_39e8;
        local_3800 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_37f8 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_37f0 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_37e8 = CONCAT44(0x3c22b327,fStack_3cc8);
        local_3820 = 0x3d2aa9c1;
        uStack_381c = 0x3d2aa9c1;
        uStack_3818 = 0x3d2aa9c1;
        uStack_3814 = 0x3d2aa9c1;
        uStack_3810 = 0x3d2aa9c1;
        uStack_380c = 0x3d2aa9c1;
        uStack_3808 = 0x3d2aa9c1;
        uStack_3804 = 0x3d2aa9c1;
        local_3ce0 = local_3ce0 + 0.041665796;
        fStack_3cdc = fStack_3cdc + 0.041665796;
        fStack_3cd8 = fStack_3cd8 + 0.041665796;
        fStack_3cd4 = fStack_3cd4 + 0.041665796;
        fStack_3cd0 = fStack_3cd0 + 0.041665796;
        fStack_3ccc = fStack_3ccc + 0.041665796;
        fStack_3cc8 = fStack_3cc8 + 0.041665796;
        local_3b00 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_3af8 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_3af0 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_3ae8 = CONCAT44(0x3d53568b,fStack_3cc8);
        local_3b20 = local_3c00._0_8_;
        uStack_3b18 = local_3c00._8_8_;
        uStack_3b10 = local_3c00._16_8_;
        uStack_3b08 = local_3c00._24_8_;
        local_3ce0 = local_3ce0 * (float)local_3a00;
        fStack_3cdc = fStack_3cdc * local_3a00._4_4_;
        fStack_3cd8 = fStack_3cd8 * (float)uStack_39f8;
        fStack_3cd4 = fStack_3cd4 * uStack_39f8._4_4_;
        fStack_3cd0 = fStack_3cd0 * (float)uStack_39f0;
        fStack_3ccc = fStack_3ccc * uStack_39f0._4_4_;
        fStack_3cc8 = fStack_3cc8 * (float)uStack_39e8;
        local_3840 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_3838 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_3830 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_3828 = CONCAT44(0x3d53568b,fStack_3cc8);
        local_3860 = 0x3e2aaaaa;
        uStack_385c = 0x3e2aaaaa;
        uStack_3858 = 0x3e2aaaaa;
        uStack_3854 = 0x3e2aaaaa;
        uStack_3850 = 0x3e2aaaaa;
        uStack_384c = 0x3e2aaaaa;
        uStack_3848 = 0x3e2aaaaa;
        uStack_3844 = 0x3e2aaaaa;
        local_3ce0 = local_3ce0 + 0.16666666;
        fStack_3cdc = fStack_3cdc + 0.16666666;
        fStack_3cd8 = fStack_3cd8 + 0.16666666;
        fStack_3cd4 = fStack_3cd4 + 0.16666666;
        fStack_3cd0 = fStack_3cd0 + 0.16666666;
        fStack_3ccc = fStack_3ccc + 0.16666666;
        fStack_3cc8 = fStack_3cc8 + 0.16666666;
        local_3b40 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_3b38 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_3b30 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_3b28 = CONCAT44(0x3e5f804d,fStack_3cc8);
        local_3b60 = local_3c00._0_8_;
        uStack_3b58 = local_3c00._8_8_;
        uStack_3b50 = local_3c00._16_8_;
        uStack_3b48 = local_3c00._24_8_;
        local_3ce0 = local_3ce0 * (float)local_3a00;
        fStack_3cdc = fStack_3cdc * local_3a00._4_4_;
        fStack_3cd8 = fStack_3cd8 * (float)uStack_39f8;
        fStack_3cd4 = fStack_3cd4 * uStack_39f8._4_4_;
        fStack_3cd0 = fStack_3cd0 * (float)uStack_39f0;
        fStack_3ccc = fStack_3ccc * uStack_39f0._4_4_;
        fStack_3cc8 = fStack_3cc8 * (float)uStack_39e8;
        local_3880 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_3878 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_3870 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_3868 = CONCAT44(0x3e5f804d,fStack_3cc8);
        local_38a0 = 0x3f000000;
        uStack_389c = 0x3f000000;
        uStack_3898 = 0x3f000000;
        uStack_3894 = 0x3f000000;
        uStack_3890 = 0x3f000000;
        uStack_388c = 0x3f000000;
        uStack_3888 = 0x3f000000;
        uStack_3884 = 0x3f000000;
        local_3ce0 = local_3ce0 + 0.5;
        fStack_3cdc = fStack_3cdc + 0.5;
        fStack_3cd8 = fStack_3cd8 + 0.5;
        fStack_3cd4 = fStack_3cd4 + 0.5;
        fStack_3cd0 = fStack_3cd0 + 0.5;
        fStack_3ccc = fStack_3ccc + 0.5;
        fStack_3cc8 = fStack_3cc8 + 0.5;
        local_3b80 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_3b78 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_3b70 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_3b68 = CONCAT44(0x3f37e013,fStack_3cc8);
        local_3ba0 = CONCAT44(fStack_3cbc,local_3cc0);
        uStack_3b98 = CONCAT44(fStack_3cb4,fStack_3cb8);
        uStack_3b90 = CONCAT44(fStack_3cac,fStack_3cb0);
        uStack_3b88 = CONCAT44(uStack_39e8._4_4_,fStack_3ca8);
        local_3ce0 = local_3ce0 * local_3cc0;
        fStack_3cdc = fStack_3cdc * fStack_3cbc;
        fStack_3cd8 = fStack_3cd8 * fStack_3cb8;
        fStack_3cd4 = fStack_3cd4 * fStack_3cb4;
        fStack_3cd0 = fStack_3cd0 * fStack_3cb0;
        fStack_3ccc = fStack_3ccc * fStack_3cac;
        fStack_3cc8 = fStack_3cc8 * fStack_3ca8;
        local_38c0 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_38b8 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_38b0 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_38a8 = CONCAT44(0x3f37e013,fStack_3cc8);
        local_38e0 = local_3c00._0_8_;
        uStack_38d8 = local_3c00._8_8_;
        uStack_38d0 = local_3c00._16_8_;
        uStack_38c8 = local_3c00._24_8_;
        local_3ce0 = local_3ce0 + (float)local_3a00;
        fStack_3cdc = fStack_3cdc + local_3a00._4_4_;
        fStack_3cd8 = fStack_3cd8 + (float)uStack_39f8;
        fStack_3cd4 = fStack_3cd4 + uStack_39f8._4_4_;
        fStack_3cd0 = fStack_3cd0 + (float)uStack_39f0;
        fStack_3ccc = fStack_3ccc + uStack_39f0._4_4_;
        fStack_3cc8 = fStack_3cc8 + (float)uStack_39e8;
        local_3900 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_38f8 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_38f0 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_38e8 = CONCAT44(uStack_39e8._4_4_ + 0.71826285,fStack_3cc8);
        local_3920 = 0x3f8000003f800000;
        uStack_3918 = 0x3f8000003f800000;
        uStack_3910 = 0x3f8000003f800000;
        uStack_3908 = 0x3f8000003f800000;
        local_3ce0 = local_3ce0 + 1.0;
        fStack_3cdc = fStack_3cdc + 1.0;
        fStack_3cd8 = fStack_3cd8 + 1.0;
        fStack_3cd4 = fStack_3cd4 + 1.0;
        fStack_3cd0 = fStack_3cd0 + 1.0;
        fStack_3ccc = fStack_3ccc + 1.0;
        fStack_3cc8 = fStack_3cc8 + 1.0;
        fStack_3cc4 = uStack_39e8._4_4_ + 0.71826285 + 1.0;
        local_2800 = local_3c40;
        uStack_27f8 = uStack_3c38;
        uStack_27f0 = uStack_3c30;
        uStack_27e8 = uStack_3c28;
        local_3c60._4_4_ = (int)local_3980._4_4_;
        local_3c60._0_4_ = (int)(float)local_3980;
        local_3c60._8_4_ = (int)(float)uStack_3978;
        local_3c60._12_4_ = (int)uStack_3978._4_4_;
        local_3c60._16_4_ = (int)(float)uStack_3970;
        local_3c60._20_4_ = (int)uStack_3970._4_4_;
        auVar159 = local_3c60._0_24_;
        local_3c60._24_4_ = (int)(float)uStack_3968;
        local_3c60._28_4_ = (int)uStack_3968._4_4_;
        auVar5 = local_3c60;
        local_2760 = local_3c60._0_8_;
        uStack_2758 = local_3c60._8_8_;
        local_3c60._16_8_ = auVar159._16_8_;
        uStack_2750 = local_3c60._16_8_;
        local_3c60._24_8_ = auVar5._24_8_;
        uStack_2748 = local_3c60._24_8_;
        local_2420 = local_3c60._0_8_;
        uStack_2418 = local_3c60._8_8_;
        uStack_2410 = local_3c60._16_8_;
        uStack_2408 = local_3c60._24_8_;
        local_2440 = 0x7f0000007f;
        uStack_2438 = 0x7f0000007f;
        uStack_2430 = 0x7f0000007f;
        uStack_2428 = 0x7f0000007f;
        auVar92._16_8_ = local_3c60._16_8_;
        auVar92._0_16_ = local_3c60._0_16_;
        auVar92._24_8_ = local_3c60._24_8_;
        auVar91._8_8_ = 0x7f0000007f;
        auVar91._0_8_ = 0x7f0000007f;
        auVar91._16_8_ = 0x7f0000007f;
        auVar91._24_8_ = 0x7f0000007f;
        auVar5 = vpaddd_avx2(auVar92,auVar91);
        local_3c60._0_8_ = auVar5._0_8_;
        local_2660 = local_3c60._0_8_;
        local_3c60._8_8_ = auVar5._8_8_;
        uStack_2658 = local_3c60._8_8_;
        local_3c60._16_8_ = auVar5._16_8_;
        uStack_2650 = local_3c60._16_8_;
        local_3c60._24_8_ = auVar5._24_8_;
        uStack_2648 = local_3c60._24_8_;
        local_2664 = 0x17;
        local_2320 = local_3c60._0_8_;
        uStack_2318 = local_3c60._8_8_;
        uStack_2310 = local_3c60._16_8_;
        uStack_2308 = local_3c60._24_8_;
        local_2324 = 0x17;
        local_3c60 = vpslld_avx2(auVar5,ZEXT416(0x17));
        local_2580 = local_3c60._0_8_;
        uStack_2578 = local_3c60._8_8_;
        uStack_2570 = local_3c60._16_8_;
        uStack_2568 = local_3c60._24_8_;
        local_3d00 = local_3c60._0_8_;
        uStack_3cf8 = local_3c60._8_8_;
        uStack_3cf0 = local_3c60._16_8_;
        uStack_3ce8 = local_3c60._24_8_;
        local_3bc0 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_3bb8 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_3bb0 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_3ba8 = CONCAT44(fStack_3cc4,fStack_3cc8);
        local_3be0._0_4_ = local_3c60._0_4_;
        local_3be0._4_4_ = local_3c60._4_4_;
        uStack_3bd8._0_4_ = local_3c60._8_4_;
        uStack_3bd8._4_4_ = local_3c60._12_4_;
        uStack_3bd0._0_4_ = local_3c60._16_4_;
        uStack_3bd0._4_4_ = local_3c60._20_4_;
        uStack_3bc8._0_4_ = local_3c60._24_4_;
        local_3ce0 = local_3ce0 * (float)local_3be0;
        fStack_3cdc = fStack_3cdc * local_3be0._4_4_;
        fStack_3cd8 = fStack_3cd8 * (float)uStack_3bd8;
        fStack_3cd4 = fStack_3cd4 * uStack_3bd8._4_4_;
        fStack_3cd0 = fStack_3cd0 * (float)uStack_3bd0;
        fStack_3ccc = fStack_3ccc * uStack_3bd0._4_4_;
        fStack_3cc8 = fStack_3cc8 * (float)uStack_3bc8;
        local_3d40 = CONCAT44(fStack_3cdc,local_3ce0);
        uStack_3d38 = CONCAT44(fStack_3cd4,fStack_3cd8);
        uStack_3d30 = CONCAT44(fStack_3ccc,fStack_3cd0);
        uStack_3d28 = CONCAT44(fStack_3cc4,fStack_3cc8);
        local_3700 = (float)local_3d80 + local_3ce0;
        fStack_36fc = local_3d80._4_4_ + fStack_3cdc;
        fStack_36f8 = (float)uStack_3d78 + fStack_3cd8;
        fStack_36f4 = uStack_3d78._4_4_ + fStack_3cd4;
        fStack_36f0 = (float)uStack_3d70 + fStack_3cd0;
        fStack_36ec = uStack_3d70._4_4_ + fStack_3ccc;
        fStack_36e8 = (float)uStack_3d68 + fStack_3cc8;
        fStack_36e4 = uStack_3d68._4_4_ + fStack_3cc4;
        auVar38._16_4_ = (float)uStack_3d70;
        auVar38._0_16_ = local_2300;
        auVar38._20_4_ = uStack_3d70._4_4_;
        auVar38._24_4_ = (float)uStack_3d68;
        auVar38._28_4_ = uStack_3d68._4_4_;
        auVar37._4_4_ = fStack_36fc;
        auVar37._0_4_ = local_3700;
        auVar37._8_4_ = fStack_36f8;
        auVar37._12_4_ = fStack_36f4;
        auVar37._16_4_ = fStack_36f0;
        auVar37._20_4_ = fStack_36ec;
        auVar37._24_4_ = fStack_36e8;
        auVar37._28_4_ = fStack_36e4;
        auVar5 = vrcpps_avx(auVar37);
        auVar7._4_4_ = local_3d80._4_4_ * auVar5._4_4_;
        auVar7._0_4_ = (float)local_3d80 * auVar5._0_4_;
        auVar7._8_4_ = (float)uStack_3d78 * auVar5._8_4_;
        auVar7._12_4_ = uStack_3d78._4_4_ * auVar5._12_4_;
        auVar7._16_4_ = (float)uStack_3d70 * auVar5._16_4_;
        auVar7._20_4_ = uStack_3d70._4_4_ * auVar5._20_4_;
        auVar7._24_4_ = (float)uStack_3d68 * auVar5._24_4_;
        auVar7._28_4_ = uStack_3d68._4_4_;
        auVar1 = vfmsub213ps_fma(auVar7,auVar37,auVar38);
        auVar1 = vfnmadd213ps_fma(ZEXT1632(auVar1),auVar5,auVar7);
        local_4440 = local_21c0._0_8_;
        uStack_4438 = local_21c0._8_8_;
        uStack_4430 = auStack_21b0._0_8_;
        uStack_4428 = auStack_21b0._8_8_;
        local_4460 = local_2200._0_8_;
        uStack_4458 = local_2200._8_8_;
        uStack_4450 = auStack_21f0._0_8_;
        uStack_4448 = auStack_21f0._8_8_;
        local_4420 = ZEXT1632(auVar1);
        auVar36._16_8_ = auStack_21b0._0_8_;
        auVar36._0_16_ = local_21c0;
        auVar36._24_8_ = auStack_21b0._8_8_;
        auVar35._16_8_ = auStack_21f0._0_8_;
        auVar35._0_16_ = local_2200;
        auVar35._24_8_ = auStack_21f0._8_8_;
        auVar175._8_4_ = 0x80000000;
        auVar175._0_8_ = 0x8000000080000000;
        auVar175._12_4_ = 0x80000000;
        auVar175._16_4_ = 0x80000000;
        auVar175._20_4_ = 0x80000000;
        auVar175._24_4_ = 0x80000000;
        auVar175._28_4_ = 0x80000000;
        auVar1 = vfmadd213ps_fma(auVar36,local_4420,auVar35 ^ auVar175);
        local_6280._0_4_ = (float)local_63a0;
        local_6280._4_4_ = (float)((ulong)local_63a0 >> 0x20);
        uStack_6278._0_4_ = (float)uStack_6398;
        uStack_6278._4_4_ = (float)((ulong)uStack_6398 >> 0x20);
        uStack_6270._0_4_ = (float)uStack_6390;
        uStack_6270._4_4_ = (float)((ulong)uStack_6390 >> 0x20);
        uStack_6268._0_4_ = (float)uStack_6388;
        uStack_6268._4_4_ = (undefined4)((ulong)uStack_6388 >> 0x20);
        local_62a0._0_4_ = auVar1._0_4_;
        local_62a0._4_4_ = auVar1._4_4_;
        fStack_6298 = auVar1._8_4_;
        fStack_6294 = auVar1._12_4_;
        local_64a0 = CONCAT44(local_6280._4_4_ * (float)local_62a0._4_4_,
                              (float)local_6280 * (float)local_62a0._0_4_);
        uStack_6498 = CONCAT44(uStack_6278._4_4_ * fStack_6294,(float)uStack_6278 * fStack_6298);
        uStack_6490 = CONCAT44(uStack_6270._4_4_ * 0.0,(float)uStack_6270 * 0.0);
        uStack_6488 = CONCAT44(uStack_6268._4_4_,(float)uStack_6268 * 0.0);
        local_6318 = local_6410;
        local_6340 = local_64a0;
        uStack_6338 = uStack_6498;
        uStack_6330 = uStack_6490;
        uStack_6328 = uStack_6488;
        auVar32._8_8_ = uStack_6498;
        auVar32._0_8_ = local_64a0;
        auVar32._16_8_ = uStack_6490;
        auVar32._24_8_ = uStack_6488;
        *local_6410 = auVar32;
        local_6410 = local_6410 + 1;
        _local_62a0 = ZEXT1632(auVar1);
        local_6280 = local_63a0;
        uStack_6278 = uStack_6398;
        uStack_6270 = uStack_6390;
        uStack_6268 = uStack_6388;
        local_61c0 = local_21c0._0_8_;
        uStack_61b8 = local_21c0._8_8_;
        uStack_61b0 = auStack_21b0._0_8_;
        uStack_61a8 = auStack_21b0._8_8_;
        local_61a0 = local_60e0;
        uStack_6198 = uStack_60d8;
        uStack_6190 = uStack_60d0;
        uStack_6188 = uStack_60c8;
        _local_60a0 = auVar34;
        _local_5fe0 = auVar39;
        local_5f20 = local_6060;
        uStack_5f18 = uStack_6058;
        uStack_5f10 = uStack_6050;
        uStack_5f08 = uStack_6048;
        local_5c60 = local_5c80;
        uStack_5c58 = uStack_5c78;
        uStack_5c50 = uStack_5c70;
        uStack_5c48 = uStack_5c68;
        local_5420 = uVar24;
        uStack_5418 = uVar25;
        uStack_5410 = uVar26;
        uStack_5408 = uVar27;
        local_51a0 = uVar20;
        uStack_5198 = uVar21;
        uStack_5190 = uVar22;
        uStack_5188 = uVar23;
        local_5180 = uVar16;
        uStack_5178 = uVar17;
        uStack_5170 = uVar18;
        uStack_5168 = uVar19;
        local_5140 = uVar12;
        uStack_5138 = uVar13;
        uStack_5130 = uVar14;
        uStack_5128 = uVar15;
        local_5120 = local_6620;
        uStack_5118 = uStack_6618;
        uStack_5110 = auStack_2230._0_8_;
        uStack_5108 = auStack_2230._8_8_;
        _local_4fc0 = auVar40;
        local_4f80 = local_5000._0_8_;
        uStack_4f78 = local_5000._8_8_;
        uStack_4f70 = local_5000._16_8_;
        uStack_4f68 = local_5000._24_8_;
        local_4da0 = local_4dc0;
        uStack_4d98 = uStack_4db8;
        uStack_4d90 = uStack_4db0;
        uStack_4d88 = uStack_4da8;
        local_4d20 = local_4fe0;
        uStack_4d18 = uStack_4fd8;
        uStack_4d10 = uStack_4fd0;
        uStack_4d08 = uStack_4fc8;
        local_4ce0 = uVar8;
        uStack_4cd8 = uVar9;
        uStack_4cd0 = uVar10;
        uStack_4cc8 = uVar11;
        local_3d80 = local_2300._0_8_;
        uStack_3d78 = local_2300._8_8_;
        uStack_3d70 = auStack_22f0._0_8_;
        uStack_3d68 = auStack_22f0._8_8_;
        _local_3c20 = auVar6;
        local_3be0 = local_3c60._0_8_;
        uStack_3bd8 = local_3c60._8_8_;
        uStack_3bd0 = local_3c60._16_8_;
        uStack_3bc8 = local_3c60._24_8_;
        local_3a00 = local_3a20;
        uStack_39f8 = uStack_3a18;
        uStack_39f0 = uStack_3a10;
        uStack_39e8 = uStack_3a08;
        local_3980 = local_3c40;
        uStack_3978 = uStack_3c38;
        uStack_3970 = uStack_3c30;
        uStack_3968 = uStack_3c28;
        local_3940 = uVar28;
        uStack_3938 = uVar29;
        uStack_3930 = uVar30;
        uStack_3928 = uVar31;
        local_36e0 = local_3d20;
        fStack_36dc = fStack_3d1c;
        fStack_36d8 = fStack_3d18;
        fStack_36d4 = fStack_3d14;
        fStack_36d0 = fStack_3d10;
        fStack_36cc = fStack_3d0c;
        fStack_36c8 = fStack_3d08;
        fStack_36c4 = fStack_3d04;
        local_3160 = local_3180;
        local_30a0 = local_30e0;
        uStack_2808 = uStack_6388;
        local_22dc = local_22e0;
        local_22d8 = local_22e0;
        local_22d4 = local_22e0;
        local_22d0 = local_22e0;
        local_22cc = local_22e0;
        local_22c8 = local_22e0;
        local_22c4 = local_22e0;
        local_221c = local_2220;
        local_2218 = local_2220;
        local_2214 = local_2220;
        local_2210 = local_2220;
        local_220c = local_2220;
        local_2208 = local_2220;
        local_2204 = local_2220;
        local_21dc = local_21e0;
        local_21d8 = local_21e0;
        local_21d4 = local_21e0;
        local_21d0 = local_21e0;
        local_21cc = local_21e0;
        local_21c8 = local_21e0;
        local_21c4 = local_21e0;
        local_219c = local_21a0;
        local_2198 = local_21a0;
        local_2194 = local_21a0;
        local_2190 = local_21a0;
        local_218c = local_21a0;
        local_2188 = local_21a0;
        local_2184 = local_21a0;
      }
    }
  }
  else if (local_6404 == 4) {
    local_6404 = 4;
    for (local_64a4 = 0; local_64a4 < local_63fc; local_64a4 = local_64a4 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffff98f0._0_8_,
                         (int)((ulong)in_stack_ffffffffffff98e8 >> 0x20));
      pauVar166 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(&local_64f8);
      ncnn::Mat::~Mat((Mat *)0x8f5c6d);
      local_64b0 = pauVar166;
      for (local_64fc = 0; local_64fc < local_6400; local_64fc = local_64fc + 1) {
        local_6308 = local_64b0;
        local_62f0 = *(undefined8 *)*local_64b0;
        uStack_62e8 = *(undefined8 *)(*local_64b0 + 8);
        local_760 = ZEXT816(0) << 0x20;
        local_1770 = 0x3f800000;
        uStack_176c = 0x3f800000;
        uStack_1768 = 0x3f800000;
        uStack_1764 = 0x3f800000;
        local_290 = 0x42b0c0a5;
        uStack_28c = 0x42b0c0a5;
        uStack_288 = 0x42b0c0a5;
        uStack_284 = 0x42b0c0a5;
        auVar146._8_4_ = 0x42b0c0a5;
        auVar146._0_8_ = 0x42b0c0a542b0c0a5;
        auVar146._12_4_ = 0x42b0c0a5;
        auVar1 = vminps_avx(*local_64b0,auVar146);
        local_1730._0_8_ = auVar1._0_8_;
        local_640 = local_1730._0_8_;
        local_1730._8_8_ = auVar1._8_8_;
        uStack_638 = local_1730._8_8_;
        local_650 = 0xc2b0c0a5;
        uStack_64c = 0xc2b0c0a5;
        uStack_648 = 0xc2b0c0a5;
        uStack_644 = 0xc2b0c0a5;
        auVar118._8_4_ = 0xc2b0c0a5;
        auVar118._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar118._12_4_ = 0xc2b0c0a5;
        auVar3 = vmaxps_avx(auVar1,auVar118);
        local_1730._0_8_ = auVar3._0_8_;
        uVar8 = local_1730._0_8_;
        local_1730._8_8_ = auVar3._8_8_;
        uVar9 = local_1730._8_8_;
        local_15e0 = 0x3fb8aa3b;
        uStack_15dc = 0x3fb8aa3b;
        uStack_15d8 = 0x3fb8aa3b;
        uStack_15d4 = 0x3fb8aa3b;
        local_15d0._0_4_ = auVar3._0_4_;
        local_15d0._4_4_ = auVar3._4_4_;
        uStack_15c8._0_4_ = auVar3._8_4_;
        uStack_15c8._4_4_ = auVar3._12_4_;
        local_1750._4_4_ = local_15d0._4_4_ * 1.442695;
        local_1750._0_4_ = (float)local_15d0 * 1.442695;
        uStack_1748._0_4_ = (float)uStack_15c8 * 1.442695;
        uStack_1748._4_4_ = uStack_15c8._4_4_ * 1.442695;
        local_14d0 = local_1750;
        uStack_14c8 = uStack_1748;
        local_14e0 = 0x3f000000;
        uStack_14dc = 0x3f000000;
        uStack_14d8 = 0x3f000000;
        uStack_14d4 = 0x3f000000;
        local_1750._0_4_ = (float)local_15d0 * 1.442695 + 0.5;
        local_1750._4_4_ = local_15d0._4_4_ * 1.442695 + 0.5;
        fVar168 = (float)uStack_15c8 * 1.442695 + 0.5;
        fVar169 = uStack_15c8._4_4_ * 1.442695 + 0.5;
        uStack_1748._0_4_ = fVar168;
        uStack_1748._4_4_ = fVar169;
        local_200 = local_1750;
        uStack_1f8 = uStack_1748;
        local_1760._4_4_ = (int)(float)local_1750._4_4_;
        local_1760._0_4_ = (int)(float)local_1750._0_4_;
        local_1760._8_4_ = (int)fVar168;
        local_1760._12_4_ = (int)fVar169;
        local_360 = local_1760._0_8_;
        uStack_358 = local_1760._8_8_;
        auVar140._8_8_ = local_1760._8_8_;
        auVar140._0_8_ = local_1760._0_8_;
        auVar2 = vcvtdq2ps_avx(auVar140);
        local_1740 = auVar2._0_8_;
        local_180 = local_1740;
        uStack_1738 = auVar2._8_8_;
        uStack_178 = uStack_1738;
        local_190 = local_1750;
        uStack_188 = uStack_1748;
        auVar150._8_8_ = uStack_1748;
        auVar150._0_8_ = local_1750;
        auVar1 = vcmpps_avx(auVar150,auVar2,1);
        local_1780._0_8_ = auVar1._0_8_;
        local_520 = local_1780._0_8_;
        local_1780._8_8_ = auVar1._8_8_;
        uStack_518 = local_1780._8_8_;
        local_530 = 0x3f8000003f800000;
        uStack_528 = 0x3f8000003f800000;
        auVar126._8_8_ = 0x3f8000003f800000;
        auVar126._0_8_ = 0x3f8000003f800000;
        local_1780 = vpand_avx(auVar1,auVar126);
        local_1060 = local_1740;
        uStack_1058 = uStack_1738;
        local_1070 = local_1780._0_8_;
        uStack_1068 = local_1780._8_8_;
        _local_1750 = vsubps_avx(auVar2,local_1780);
        local_1600 = 0x3f318000;
        uStack_15fc = 0x3f318000;
        uStack_15f8 = 0x3f318000;
        uStack_15f4 = 0x3f318000;
        local_15f0._0_4_ = local_1750._0_4_;
        local_15f0._4_4_ = local_1750._4_4_;
        uStack_15e8._0_4_ = local_1750._8_4_;
        uStack_15e8._4_4_ = local_1750._12_4_;
        local_1740 = CONCAT44(local_15f0._4_4_ * 0.6933594,(float)local_15f0 * 0.6933594);
        uStack_1738._0_4_ = (float)uStack_15e8 * 0.6933594;
        uStack_1738._4_4_ = uStack_15e8._4_4_ * 0.6933594;
        local_1610 = local_1750;
        uStack_1608 = uStack_1748;
        local_1620 = 0xb95e8083;
        uStack_161c = 0xb95e8083;
        uStack_1618 = 0xb95e8083;
        uStack_1614 = 0xb95e8083;
        local_1080 = local_1730._0_8_;
        uStack_1078 = local_1730._8_8_;
        local_1090 = local_1740;
        uStack_1088 = uStack_1738;
        auVar95._8_8_ = uStack_1738;
        auVar95._0_8_ = local_1740;
        auVar1 = vsubps_avx(auVar3,auVar95);
        local_1730._0_8_ = auVar1._0_8_;
        local_10a0 = local_1730._0_8_;
        local_1730._8_8_ = auVar1._8_8_;
        uStack_1098 = local_1730._8_8_;
        local_10b0 = CONCAT44(local_15f0._4_4_ * -0.00021219444,(float)local_15f0 * -0.00021219444);
        uStack_10a8 = CONCAT44(uStack_15e8._4_4_ * -0.00021219444,
                               (float)uStack_15e8 * -0.00021219444);
        auVar94._8_8_ = uStack_10a8;
        auVar94._0_8_ = local_10b0;
        local_1730 = vsubps_avx(auVar1,auVar94);
        local_1640 = local_1730._0_8_;
        uStack_1638 = local_1730._8_8_;
        local_1630._0_4_ = local_1730._0_4_;
        local_1630._4_4_ = local_1730._4_4_;
        uStack_1628._0_4_ = local_1730._8_4_;
        uStack_1628._4_4_ = local_1730._12_4_;
        local_1790 = (float)local_1630 * (float)local_1630;
        fStack_178c = local_1630._4_4_ * local_1630._4_4_;
        fStack_1788 = (float)uStack_1628 * (float)uStack_1628;
        fStack_1784 = uStack_1628._4_4_ * uStack_1628._4_4_;
        local_1650 = 0x3950696739506967;
        uStack_1648 = 0x3950696739506967;
        local_1660 = local_1730._0_8_;
        uStack_1658 = local_1730._8_8_;
        local_14f0 = CONCAT44(local_1630._4_4_ * 0.00019875691,(float)local_1630 * 0.00019875691);
        uStack_14e8 = CONCAT44(uStack_1628._4_4_ * 0.00019875691,(float)uStack_1628 * 0.00019875691)
        ;
        local_1500 = 0x3ab743ce;
        uStack_14fc = 0x3ab743ce;
        uStack_14f8 = 0x3ab743ce;
        uStack_14f4 = 0x3ab743ce;
        local_17a0 = (float)local_1630 * 0.00019875691 + 0.0013981999;
        fStack_179c = local_1630._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_1798 = (float)uStack_1628 * 0.00019875691 + 0.0013981999;
        fStack_1794 = uStack_1628._4_4_ * 0.00019875691 + 0.0013981999;
        local_1670 = CONCAT44(fStack_179c,local_17a0);
        uStack_1668 = CONCAT44(fStack_1794,fStack_1798);
        local_1680 = local_1730._0_8_;
        uStack_1678 = local_1730._8_8_;
        local_17a0 = local_17a0 * (float)local_1630;
        fStack_179c = fStack_179c * local_1630._4_4_;
        fStack_1798 = fStack_1798 * (float)uStack_1628;
        fStack_1794 = fStack_1794 * uStack_1628._4_4_;
        local_1510 = CONCAT44(fStack_179c,local_17a0);
        uStack_1508 = CONCAT44(fStack_1794,fStack_1798);
        local_1520 = 0x3c088908;
        uStack_151c = 0x3c088908;
        uStack_1518 = 0x3c088908;
        uStack_1514 = 0x3c088908;
        local_17a0 = local_17a0 + 0.008333452;
        fStack_179c = fStack_179c + 0.008333452;
        fStack_1798 = fStack_1798 + 0.008333452;
        fStack_1794 = fStack_1794 + 0.008333452;
        local_1690 = CONCAT44(fStack_179c,local_17a0);
        uStack_1688 = CONCAT44(fStack_1794,fStack_1798);
        local_16a0 = local_1730._0_8_;
        uStack_1698 = local_1730._8_8_;
        local_17a0 = local_17a0 * (float)local_1630;
        fStack_179c = fStack_179c * local_1630._4_4_;
        fStack_1798 = fStack_1798 * (float)uStack_1628;
        fStack_1794 = fStack_1794 * uStack_1628._4_4_;
        local_1530 = CONCAT44(fStack_179c,local_17a0);
        uStack_1528 = CONCAT44(fStack_1794,fStack_1798);
        local_1540 = 0x3d2aa9c1;
        uStack_153c = 0x3d2aa9c1;
        uStack_1538 = 0x3d2aa9c1;
        uStack_1534 = 0x3d2aa9c1;
        local_17a0 = local_17a0 + 0.041665796;
        fStack_179c = fStack_179c + 0.041665796;
        fStack_1798 = fStack_1798 + 0.041665796;
        fStack_1794 = fStack_1794 + 0.041665796;
        local_16b0 = CONCAT44(fStack_179c,local_17a0);
        uStack_16a8 = CONCAT44(fStack_1794,fStack_1798);
        local_16c0 = local_1730._0_8_;
        uStack_16b8 = local_1730._8_8_;
        local_17a0 = local_17a0 * (float)local_1630;
        fStack_179c = fStack_179c * local_1630._4_4_;
        fStack_1798 = fStack_1798 * (float)uStack_1628;
        fStack_1794 = fStack_1794 * uStack_1628._4_4_;
        local_1550 = CONCAT44(fStack_179c,local_17a0);
        uStack_1548 = CONCAT44(fStack_1794,fStack_1798);
        local_1560 = 0x3e2aaaaa;
        uStack_155c = 0x3e2aaaaa;
        uStack_1558 = 0x3e2aaaaa;
        uStack_1554 = 0x3e2aaaaa;
        local_17a0 = local_17a0 + 0.16666666;
        fStack_179c = fStack_179c + 0.16666666;
        fStack_1798 = fStack_1798 + 0.16666666;
        fStack_1794 = fStack_1794 + 0.16666666;
        local_16d0 = CONCAT44(fStack_179c,local_17a0);
        uStack_16c8 = CONCAT44(fStack_1794,fStack_1798);
        local_16e0 = local_1730._0_8_;
        uStack_16d8 = local_1730._8_8_;
        local_17a0 = local_17a0 * (float)local_1630;
        fStack_179c = fStack_179c * local_1630._4_4_;
        fStack_1798 = fStack_1798 * (float)uStack_1628;
        fStack_1794 = fStack_1794 * uStack_1628._4_4_;
        local_1570 = CONCAT44(fStack_179c,local_17a0);
        uStack_1568 = CONCAT44(fStack_1794,fStack_1798);
        local_1580 = 0x3f000000;
        uStack_157c = 0x3f000000;
        uStack_1578 = 0x3f000000;
        uStack_1574 = 0x3f000000;
        local_17a0 = local_17a0 + 0.5;
        fStack_179c = fStack_179c + 0.5;
        fStack_1798 = fStack_1798 + 0.5;
        fStack_1794 = fStack_1794 + 0.5;
        local_16f0 = CONCAT44(fStack_179c,local_17a0);
        uStack_16e8 = CONCAT44(fStack_1794,fStack_1798);
        local_1700 = CONCAT44(fStack_178c,local_1790);
        uStack_16f8 = CONCAT44(fStack_1784,fStack_1788);
        local_17a0 = local_17a0 * local_1790;
        fStack_179c = fStack_179c * fStack_178c;
        fStack_1798 = fStack_1798 * fStack_1788;
        fStack_1794 = fStack_1794 * fStack_1784;
        local_1590 = CONCAT44(fStack_179c,local_17a0);
        uStack_1588 = CONCAT44(fStack_1794,fStack_1798);
        local_15a0 = local_1730._0_8_;
        uStack_1598 = local_1730._8_8_;
        local_17a0 = local_17a0 + (float)local_1630;
        fStack_179c = fStack_179c + local_1630._4_4_;
        fStack_1798 = fStack_1798 + (float)uStack_1628;
        fStack_1794 = fStack_1794 + uStack_1628._4_4_;
        local_15b0 = CONCAT44(fStack_179c,local_17a0);
        uStack_15a8 = CONCAT44(fStack_1794,fStack_1798);
        local_15c0 = 0x3f8000003f800000;
        uStack_15b8 = 0x3f8000003f800000;
        local_17a0 = local_17a0 + 1.0;
        fStack_179c = fStack_179c + 1.0;
        fStack_1798 = fStack_1798 + 1.0;
        fStack_1794 = fStack_1794 + 1.0;
        local_210 = local_1750;
        uStack_208 = uStack_1748;
        local_1760._4_4_ = (int)local_15f0._4_4_;
        local_1760._0_4_ = (int)(float)local_15f0;
        local_1760._8_4_ = (int)(float)uStack_15e8;
        local_1760._12_4_ = (int)uStack_15e8._4_4_;
        local_100 = local_1760._0_8_;
        uStack_f8 = local_1760._8_8_;
        local_3b0 = 0x7f0000007f;
        uStack_3a8 = 0x7f0000007f;
        auVar158._8_8_ = local_1760._8_8_;
        auVar158._0_8_ = local_1760._0_8_;
        auVar157._8_8_ = 0x7f0000007f;
        auVar157._0_8_ = 0x7f0000007f;
        auVar1 = vpaddd_avx(auVar158,auVar157);
        local_1760._0_8_ = auVar1._0_8_;
        local_80 = local_1760._0_8_;
        local_1760._8_8_ = auVar1._8_8_;
        uStack_78 = local_1760._8_8_;
        local_84 = 0x17;
        local_1760 = vpslld_avx(auVar1,ZEXT416(0x17));
        local_40 = local_1760._0_8_;
        uStack_38 = local_1760._8_8_;
        local_17b0 = local_1760._0_8_;
        uStack_17a8 = local_1760._8_8_;
        local_1710 = CONCAT44(fStack_179c,local_17a0);
        uStack_1708 = CONCAT44(fStack_1794,fStack_1798);
        local_1720._0_4_ = local_1760._0_4_;
        local_1720._4_4_ = local_1760._4_4_;
        uStack_1718._0_4_ = local_1760._8_4_;
        uStack_1718._4_4_ = local_1760._12_4_;
        local_17a0 = local_17a0 * (float)local_1720;
        fStack_179c = fStack_179c * local_1720._4_4_;
        fStack_1798 = fStack_1798 * (float)uStack_1718;
        fStack_1794 = fStack_1794 * uStack_1718._4_4_;
        local_17e0 = CONCAT44(fStack_179c,local_17a0);
        uStack_17d8 = CONCAT44(fStack_1794,fStack_1798);
        local_1134 = 0x3f800000;
        local_1150 = 0x3f800000;
        local_17f0 = 0x3f8000003f800000;
        uStack_17e8 = 0x3f8000003f800000;
        local_1f50._4_4_ = fStack_179c + 1.0;
        local_1f50._0_4_ = local_17a0 + 1.0;
        uStack_1f48._0_4_ = fStack_1798 + 1.0;
        uStack_1f48._4_4_ = fStack_1794 + 1.0;
        local_1f70 = 0x3f800000;
        uStack_1f6c = 0x3f800000;
        uStack_1f68 = 0x3f800000;
        uStack_1f64 = 0x3f800000;
        local_6c0 = local_1f50;
        uStack_6b8 = uStack_1f48;
        local_6d0 = 0;
        local_700._8_8_ = SUB168(ZEXT816(0),4);
        uStack_6c8 = local_700._8_8_;
        auVar114._8_8_ = uStack_1f48;
        auVar114._0_8_ = local_1f50;
        auVar160._8_8_ = 0;
        auVar160._0_8_ = local_700._8_8_;
        local_1f80 = vcmpps_avx(auVar114,auVar160 << 0x40,2);
        local_600 = local_1f50;
        uStack_5f8 = uStack_1f48;
        local_610 = 0x800000;
        uStack_60c = 0x800000;
        uStack_608 = 0x800000;
        uStack_604 = 0x800000;
        auVar122._8_8_ = uStack_1f48;
        auVar122._0_8_ = local_1f50;
        auVar121._8_4_ = 0x800000;
        auVar121._0_8_ = 0x80000000800000;
        auVar121._12_4_ = 0x800000;
        auVar1 = vmaxps_avx(auVar122,auVar121);
        local_1f50 = auVar1._0_8_;
        local_5a0 = local_1f50;
        uStack_1f48 = auVar1._8_8_;
        uStack_598 = uStack_1f48;
        local_5c0 = local_1f50;
        uStack_5b8 = uStack_1f48;
        local_5c4 = 0x17;
        auVar3 = vpsrld_avx(auVar1,ZEXT416(0x17));
        local_460 = local_1f50;
        uStack_458 = uStack_1f48;
        local_470 = 0x807fffff;
        uStack_46c = 0x807fffff;
        uStack_468 = 0x807fffff;
        uStack_464 = 0x807fffff;
        auVar130._8_4_ = 0x807fffff;
        auVar130._0_8_ = 0x807fffff807fffff;
        auVar130._12_4_ = 0x807fffff;
        auVar1 = vpand_avx(auVar1,auVar130);
        local_1f50 = auVar1._0_8_;
        local_3e0 = local_1f50;
        uStack_1f48 = auVar1._8_8_;
        uStack_3d8 = uStack_1f48;
        local_3f0 = 0x3f000000;
        uStack_3ec = 0x3f000000;
        uStack_3e8 = 0x3f000000;
        uStack_3e4 = 0x3f000000;
        auVar134._8_4_ = 0x3f000000;
        auVar134._0_8_ = 0x3f0000003f000000;
        auVar134._12_4_ = 0x3f000000;
        auVar2 = vpor_avx(auVar1,auVar134);
        local_1f60._0_8_ = auVar3._0_8_;
        local_3a0 = local_1f60._0_8_;
        local_1f60._8_8_ = auVar3._8_8_;
        uStack_398 = local_1f60._8_8_;
        auVar136._8_8_ = 0x7f0000007f;
        auVar136._0_8_ = 0x7f0000007f;
        local_1f60 = vpsubd_avx(auVar3,auVar136);
        local_340 = local_1f60._0_8_;
        uStack_338 = local_1f60._8_8_;
        auVar1 = vcvtdq2ps_avx(local_1f60);
        local_1f90 = auVar1._0_8_;
        uVar10 = local_1f90;
        uStack_1f88 = auVar1._8_8_;
        uVar11 = uStack_1f88;
        local_1810 = 0x3f8000003f800000;
        uStack_1808 = 0x3f8000003f800000;
        local_1800._0_4_ = auVar1._0_4_;
        local_1800._4_4_ = auVar1._4_4_;
        uStack_17f8._0_4_ = auVar1._8_4_;
        uStack_17f8._4_4_ = auVar1._12_4_;
        local_1f90._4_4_ = local_1800._4_4_ + 1.0;
        local_1f90._0_4_ = (float)local_1800 + 1.0;
        uStack_1f88._0_4_ = (float)uStack_17f8 + 1.0;
        uStack_1f88._4_4_ = uStack_17f8._4_4_ + 1.0;
        local_1f50 = auVar2._0_8_;
        local_300 = local_1f50;
        uStack_1f48 = auVar2._8_8_;
        uStack_2f8 = uStack_1f48;
        local_310 = 0x3f3504f3;
        uStack_30c = 0x3f3504f3;
        uStack_308 = 0x3f3504f3;
        uStack_304 = 0x3f3504f3;
        auVar142._8_4_ = 0x3f3504f3;
        auVar142._0_8_ = 0x3f3504f33f3504f3;
        auVar142._12_4_ = 0x3f3504f3;
        local_1fa0 = vcmpps_avx(auVar2,auVar142,1);
        local_480 = local_1f50;
        uStack_478 = uStack_1f48;
        local_490 = local_1fa0._0_8_;
        uStack_488 = local_1fa0._8_8_;
        auVar1 = vpand_avx(auVar2,local_1fa0);
        local_fa0 = local_1f50;
        uStack_f98 = uStack_1f48;
        local_fb0 = 0x3f8000003f800000;
        uStack_fa8 = 0x3f8000003f800000;
        auVar102._8_8_ = 0x3f8000003f800000;
        auVar102._0_8_ = 0x3f8000003f800000;
        auVar2 = vsubps_avx(auVar2,auVar102);
        local_fc0 = local_1f90;
        uStack_fb8 = uStack_1f88;
        local_4a0 = 0x3f8000003f800000;
        uStack_498 = 0x3f8000003f800000;
        local_4b0 = local_1fa0._0_8_;
        uStack_4a8 = local_1fa0._8_8_;
        auVar129._8_8_ = 0x3f8000003f800000;
        auVar129._0_8_ = 0x3f8000003f800000;
        local_fd0 = vpand_avx(auVar129,local_1fa0);
        auVar101._8_8_ = uStack_1f88;
        auVar101._0_8_ = local_1f90;
        _local_1f90 = vsubps_avx(auVar101,local_fd0);
        local_1f50 = auVar2._0_8_;
        uVar12 = local_1f50;
        uStack_1f48 = auVar2._8_8_;
        uVar13 = uStack_1f48;
        local_1fb0 = auVar1._0_8_;
        uVar14 = local_1fb0;
        uStack_1fa8 = auVar1._8_8_;
        uVar15 = uStack_1fa8;
        local_1820._0_4_ = auVar2._0_4_;
        local_1820._4_4_ = auVar2._4_4_;
        uStack_1818._0_4_ = auVar2._8_4_;
        uStack_1818._4_4_ = auVar2._12_4_;
        local_1830._0_4_ = auVar1._0_4_;
        local_1830._4_4_ = auVar1._4_4_;
        uStack_1828._0_4_ = auVar1._8_4_;
        uStack_1828._4_4_ = auVar1._12_4_;
        local_1820._0_4_ = (float)local_1820 + (float)local_1830;
        local_1820._4_4_ = local_1820._4_4_ + local_1830._4_4_;
        uStack_1818._0_4_ = (float)uStack_1818 + (float)uStack_1828;
        uStack_1818._4_4_ = uStack_1818._4_4_ + uStack_1828._4_4_;
        local_1f50._4_4_ = local_1820._4_4_;
        local_1f50._0_4_ = (float)local_1820;
        uStack_1f48._0_4_ = (float)uStack_1818;
        uStack_1f48._4_4_ = uStack_1818._4_4_;
        local_1da0 = local_1f50;
        uStack_1d98 = uStack_1f48;
        local_1fc0 = (float)local_1820 * (float)local_1820;
        fStack_1fbc = local_1820._4_4_ * local_1820._4_4_;
        fStack_1fb8 = (float)uStack_1818 * (float)uStack_1818;
        fStack_1fb4 = uStack_1818._4_4_ * uStack_1818._4_4_;
        uStack_1fc8._0_4_ = 0x3d9021bb;
        local_1fd0 = (undefined1  [8])0x3d9021bb3d9021bb;
        uStack_1fc8._4_4_ = 0x3d9021bb;
        local_1db0 = 0x3d9021bb3d9021bb;
        uStack_1da8 = uStack_1fc8;
        local_1dc0 = local_1f50;
        uStack_1db8 = uStack_1f48;
        local_1fd0._4_4_ = local_1820._4_4_ * 0.070376836;
        local_1fd0._0_4_ = (float)local_1820 * 0.070376836;
        uStack_1fc8._0_4_ = (float)uStack_1818 * 0.070376836;
        uStack_1fc8._4_4_ = uStack_1818._4_4_ * 0.070376836;
        local_1840 = local_1fd0;
        uStack_1838 = uStack_1fc8;
        local_1850 = 0xbdebd1b8;
        uStack_184c = 0xbdebd1b8;
        uStack_1848 = 0xbdebd1b8;
        uStack_1844 = 0xbdebd1b8;
        local_1fd0._0_4_ = (float)local_1820 * 0.070376836 + -0.1151461;
        local_1fd0._4_4_ = local_1820._4_4_ * 0.070376836 + -0.1151461;
        fVar168 = (float)uStack_1818 * 0.070376836 + -0.1151461;
        fVar169 = uStack_1818._4_4_ * 0.070376836 + -0.1151461;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1dd0 = local_1fd0;
        uStack_1dc8 = uStack_1fc8;
        local_1de0 = local_1f50;
        uStack_1dd8 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_1820;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_1820._4_4_;
        fVar168 = fVar168 * (float)uStack_1818;
        fVar169 = fVar169 * uStack_1818._4_4_;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1860 = local_1fd0;
        uStack_1858 = uStack_1fc8;
        local_1870 = 0x3def251a;
        uStack_186c = 0x3def251a;
        uStack_1868 = 0x3def251a;
        uStack_1864 = 0x3def251a;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + 0.116769984;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + 0.116769984;
        fVar168 = fVar168 + 0.116769984;
        fVar169 = fVar169 + 0.116769984;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1df0 = local_1fd0;
        uStack_1de8 = uStack_1fc8;
        local_1e00 = local_1f50;
        uStack_1df8 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_1820;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_1820._4_4_;
        fVar168 = fVar168 * (float)uStack_1818;
        fVar169 = fVar169 * uStack_1818._4_4_;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1880 = local_1fd0;
        uStack_1878 = uStack_1fc8;
        local_1890 = 0xbdfe5d4f;
        uStack_188c = 0xbdfe5d4f;
        uStack_1888 = 0xbdfe5d4f;
        uStack_1884 = 0xbdfe5d4f;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + -0.12420141;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + -0.12420141;
        fVar168 = fVar168 + -0.12420141;
        fVar169 = fVar169 + -0.12420141;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1e10 = local_1fd0;
        uStack_1e08 = uStack_1fc8;
        local_1e20 = local_1f50;
        uStack_1e18 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_1820;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_1820._4_4_;
        fVar168 = fVar168 * (float)uStack_1818;
        fVar169 = fVar169 * uStack_1818._4_4_;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_18a0 = local_1fd0;
        uStack_1898 = uStack_1fc8;
        local_18b0 = 0x3e11e9bf;
        uStack_18ac = 0x3e11e9bf;
        uStack_18a8 = 0x3e11e9bf;
        uStack_18a4 = 0x3e11e9bf;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + 0.14249323;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + 0.14249323;
        fVar168 = fVar168 + 0.14249323;
        fVar169 = fVar169 + 0.14249323;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1e30 = local_1fd0;
        uStack_1e28 = uStack_1fc8;
        local_1e40 = local_1f50;
        uStack_1e38 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_1820;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_1820._4_4_;
        fVar168 = fVar168 * (float)uStack_1818;
        fVar169 = fVar169 * uStack_1818._4_4_;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_18c0 = local_1fd0;
        uStack_18b8 = uStack_1fc8;
        local_18d0 = 0xbe2aae50;
        uStack_18cc = 0xbe2aae50;
        uStack_18c8 = 0xbe2aae50;
        uStack_18c4 = 0xbe2aae50;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + -0.16668057;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + -0.16668057;
        fVar168 = fVar168 + -0.16668057;
        fVar169 = fVar169 + -0.16668057;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1e50 = local_1fd0;
        uStack_1e48 = uStack_1fc8;
        local_1e60 = local_1f50;
        uStack_1e58 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_1820;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_1820._4_4_;
        fVar168 = fVar168 * (float)uStack_1818;
        fVar169 = fVar169 * uStack_1818._4_4_;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_18e0 = local_1fd0;
        uStack_18d8 = uStack_1fc8;
        local_18f0 = 0x3e4cceac;
        uStack_18ec = 0x3e4cceac;
        uStack_18e8 = 0x3e4cceac;
        uStack_18e4 = 0x3e4cceac;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + 0.20000714;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + 0.20000714;
        fVar168 = fVar168 + 0.20000714;
        fVar169 = fVar169 + 0.20000714;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1e70 = local_1fd0;
        uStack_1e68 = uStack_1fc8;
        local_1e80 = local_1f50;
        uStack_1e78 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_1820;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_1820._4_4_;
        fVar168 = fVar168 * (float)uStack_1818;
        fVar169 = fVar169 * uStack_1818._4_4_;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1900 = local_1fd0;
        uStack_18f8 = uStack_1fc8;
        local_1910 = 0xbe7ffffc;
        uStack_190c = 0xbe7ffffc;
        uStack_1908 = 0xbe7ffffc;
        uStack_1904 = 0xbe7ffffc;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + -0.24999994;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + -0.24999994;
        fVar168 = fVar168 + -0.24999994;
        fVar169 = fVar169 + -0.24999994;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1e90 = local_1fd0;
        uStack_1e88 = uStack_1fc8;
        local_1ea0 = local_1f50;
        uStack_1e98 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_1820;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_1820._4_4_;
        fVar168 = fVar168 * (float)uStack_1818;
        fVar169 = fVar169 * uStack_1818._4_4_;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1920 = local_1fd0;
        uStack_1918 = uStack_1fc8;
        local_1930 = 0x3eaaaaaa;
        uStack_192c = 0x3eaaaaaa;
        uStack_1928 = 0x3eaaaaaa;
        uStack_1924 = 0x3eaaaaaa;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + 0.3333333;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + 0.3333333;
        fVar168 = fVar168 + 0.3333333;
        fVar169 = fVar169 + 0.3333333;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1eb0 = local_1fd0;
        uStack_1ea8 = uStack_1fc8;
        local_1ec0 = local_1f50;
        uStack_1eb8 = uStack_1f48;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * (float)local_1820;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * local_1820._4_4_;
        fVar168 = fVar168 * (float)uStack_1818;
        fVar169 = fVar169 * uStack_1818._4_4_;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1ed0 = local_1fd0;
        uStack_1ec8 = uStack_1fc8;
        local_1ee0 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1ed8 = CONCAT44(fStack_1fb4,fStack_1fb8);
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ * local_1fc0;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ * fStack_1fbc;
        fVar168 = fVar168 * fStack_1fb8;
        fVar169 = fVar169 * fStack_1fb4;
        uStack_1fc8._0_4_ = fVar168;
        uStack_1fc8._4_4_ = fVar169;
        local_1f00 = 0xb95e8083;
        uStack_1efc = 0xb95e8083;
        uStack_1ef8 = 0xb95e8083;
        uStack_1ef4 = 0xb95e8083;
        local_1ef0._0_4_ = local_1f90._0_4_;
        local_1ef0._4_4_ = local_1f90._4_4_;
        uStack_1ee8._0_4_ = local_1f90._8_4_;
        uStack_1ee8._4_4_ = local_1f90._12_4_;
        local_1fb0 = CONCAT44(local_1ef0._4_4_ * -0.00021219444,(float)local_1ef0 * -0.00021219444);
        uStack_1fa8._0_4_ = (float)uStack_1ee8 * -0.00021219444;
        uStack_1fa8._4_4_ = uStack_1ee8._4_4_ * -0.00021219444;
        local_1940 = local_1fd0;
        uStack_1938 = uStack_1fc8;
        local_1950 = local_1fb0;
        uStack_1948 = uStack_1fa8;
        local_1fd0._4_4_ = (float)local_1fd0._4_4_ + local_1ef0._4_4_ * -0.00021219444;
        local_1fd0._0_4_ = (float)local_1fd0._0_4_ + (float)local_1ef0 * -0.00021219444;
        uStack_1fc8._0_4_ = fVar168 + (float)uStack_1ee8 * -0.00021219444;
        uStack_1fc8._4_4_ = fVar169 + uStack_1ee8._4_4_ * -0.00021219444;
        local_1f10 = CONCAT44(fStack_1fbc,local_1fc0);
        uStack_1f08 = CONCAT44(fStack_1fb4,fStack_1fb8);
        local_1f20 = 0x3f000000;
        uStack_1f1c = 0x3f000000;
        uStack_1f18 = 0x3f000000;
        uStack_1f14 = 0x3f000000;
        local_1fb0 = CONCAT44(fStack_1fbc * 0.5,local_1fc0 * 0.5);
        uStack_1fa8._0_4_ = fStack_1fb8 * 0.5;
        uStack_1fa8._4_4_ = fStack_1fb4 * 0.5;
        local_fe0 = local_1fd0;
        uStack_fd8 = uStack_1fc8;
        local_ff0 = local_1fb0;
        uStack_fe8 = uStack_1fa8;
        auVar100._8_8_ = uStack_1fc8;
        auVar100._0_8_ = local_1fd0;
        auVar99._8_8_ = uStack_1fa8;
        auVar99._0_8_ = local_1fb0;
        _local_1fd0 = vsubps_avx(auVar100,auVar99);
        local_1f30 = local_1f90;
        uStack_1f28 = uStack_1f88;
        local_1f40 = 0x3f318000;
        uStack_1f3c = 0x3f318000;
        uStack_1f38 = 0x3f318000;
        uStack_1f34 = 0x3f318000;
        local_1fb0 = CONCAT44(local_1ef0._4_4_ * 0.6933594,(float)local_1ef0 * 0.6933594);
        uStack_1fa8._0_4_ = (float)uStack_1ee8 * 0.6933594;
        uStack_1fa8._4_4_ = uStack_1ee8._4_4_ * 0.6933594;
        local_1960 = local_1f50;
        uStack_1958 = uStack_1f48;
        local_1970._0_4_ = local_1fd0._0_4_;
        local_1970._4_4_ = local_1fd0._4_4_;
        uStack_1968._0_4_ = local_1fd0._8_4_;
        uStack_1968._4_4_ = local_1fd0._12_4_;
        local_1f50._4_4_ = local_1820._4_4_ + local_1970._4_4_;
        local_1f50._0_4_ = (float)local_1820 + (float)local_1970;
        uStack_1f48._0_4_ = (float)uStack_1818 + (float)uStack_1968;
        uStack_1f48._4_4_ = uStack_1818._4_4_ + uStack_1968._4_4_;
        local_1980 = local_1f50;
        uStack_1978 = uStack_1f48;
        local_1990 = local_1fb0;
        uStack_1988 = uStack_1fa8;
        local_1f50._4_4_ = local_1820._4_4_ + local_1970._4_4_ + local_1ef0._4_4_ * 0.6933594;
        local_1f50._0_4_ = (float)local_1820 + (float)local_1970 + (float)local_1ef0 * 0.6933594;
        uStack_1f48._0_4_ = (float)uStack_1818 + (float)uStack_1968 + (float)uStack_1ee8 * 0.6933594
        ;
        uStack_1f48._4_4_ = uStack_1818._4_4_ + uStack_1968._4_4_ + uStack_1ee8._4_4_ * 0.6933594;
        local_400 = local_1f50;
        uStack_3f8 = uStack_1f48;
        local_410 = local_1f80._0_8_;
        uStack_408 = local_1f80._8_8_;
        auVar133._8_8_ = uStack_1f48;
        auVar133._0_8_ = local_1f50;
        _local_1f50 = vpor_avx(auVar133,local_1f80);
        local_2090 = local_1f50;
        uStack_2088 = uStack_1f48;
        local_1154 = 0x3f800000;
        local_1170 = 0x3f800000;
        local_20a0 = 0x3f8000003f800000;
        uStack_2098 = 0x3f8000003f800000;
        local_1174 = 0x40000000;
        local_1190 = 0x40000000;
        local_20b0 = 0x4000000040000000;
        uStack_20a8 = 0x4000000040000000;
        local_2050._0_4_ = local_1f50._0_4_;
        local_2050._4_4_ = local_1f50._4_4_;
        uStack_2048._0_4_ = local_1f50._8_4_;
        uStack_2048._4_4_ = local_1f50._12_4_;
        local_b70 = (float)local_2050 * 2.0;
        fStack_b6c = local_2050._4_4_ * 2.0;
        fStack_b68 = (float)uStack_2048 * 2.0;
        fStack_b64 = uStack_2048._4_4_ * 2.0;
        local_834 = 0x3f800000;
        local_850 = 0x3f800000;
        local_b80 = 0x3f8000003f800000;
        uStack_b78 = 0x3f8000003f800000;
        local_b50._8_8_ = 0x3f8000003f800000;
        local_b50._0_8_ = 0x3f8000003f800000;
        local_7c0 = 0;
        uStack_7b8 = local_700._8_8_;
        local_7d0 = CONCAT44(fStack_b6c,local_b70);
        uStack_7c8 = CONCAT44(fStack_b64,fStack_b68);
        auVar161._8_8_ = 0;
        auVar161._0_8_ = local_700._8_8_;
        auVar110._8_8_ = uStack_7c8;
        auVar110._0_8_ = local_7d0;
        auVar1 = vsubps_avx(auVar161 << 0x40,auVar110);
        local_770 = 0;
        uStack_768 = local_700._8_8_;
        local_170 = 0x7f0000007f;
        uStack_168 = 0x7f0000007f;
        local_b00 = 0x3f800000;
        uStack_afc = 0x3f800000;
        uStack_af8 = 0x3f800000;
        uStack_af4 = 0x3f800000;
        local_ac0._0_8_ = auVar1._0_8_;
        local_2e0 = local_ac0._0_8_;
        local_ac0._8_8_ = auVar1._8_8_;
        uStack_2d8 = local_ac0._8_8_;
        local_2f0 = 0x42b0c0a5;
        uStack_2ec = 0x42b0c0a5;
        uStack_2e8 = 0x42b0c0a5;
        uStack_2e4 = 0x42b0c0a5;
        auVar143._8_4_ = 0x42b0c0a5;
        auVar143._0_8_ = 0x42b0c0a542b0c0a5;
        auVar143._12_4_ = 0x42b0c0a5;
        auVar1 = vminps_avx(auVar1,auVar143);
        local_ac0._0_8_ = auVar1._0_8_;
        local_6a0 = local_ac0._0_8_;
        local_ac0._8_8_ = auVar1._8_8_;
        uStack_698 = local_ac0._8_8_;
        local_6b0 = 0xc2b0c0a5;
        uStack_6ac = 0xc2b0c0a5;
        uStack_6a8 = 0xc2b0c0a5;
        uStack_6a4 = 0xc2b0c0a5;
        auVar115._8_4_ = 0xc2b0c0a5;
        auVar115._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar115._12_4_ = 0xc2b0c0a5;
        auVar3 = vmaxps_avx(auVar1,auVar115);
        local_ac0._0_8_ = auVar3._0_8_;
        uVar16 = local_ac0._0_8_;
        local_ac0._8_8_ = auVar3._8_8_;
        uVar17 = local_ac0._8_8_;
        local_970 = 0x3fb8aa3b;
        uStack_96c = 0x3fb8aa3b;
        uStack_968 = 0x3fb8aa3b;
        uStack_964 = 0x3fb8aa3b;
        local_960._0_4_ = auVar3._0_4_;
        local_960._4_4_ = auVar3._4_4_;
        uStack_958._0_4_ = auVar3._8_4_;
        uStack_958._4_4_ = auVar3._12_4_;
        local_ae0._4_4_ = local_960._4_4_ * 1.442695;
        local_ae0._0_4_ = (float)local_960 * 1.442695;
        uStack_ad8._0_4_ = (float)uStack_958 * 1.442695;
        uStack_ad8._4_4_ = uStack_958._4_4_ * 1.442695;
        local_860 = local_ae0;
        uStack_858 = uStack_ad8;
        local_870 = 0x3f000000;
        uStack_86c = 0x3f000000;
        uStack_868 = 0x3f000000;
        uStack_864 = 0x3f000000;
        local_ae0._0_4_ = (float)local_960 * 1.442695 + 0.5;
        local_ae0._4_4_ = local_960._4_4_ * 1.442695 + 0.5;
        fVar168 = (float)uStack_958 * 1.442695 + 0.5;
        fVar169 = uStack_958._4_4_ * 1.442695 + 0.5;
        uStack_ad8._0_4_ = fVar168;
        uStack_ad8._4_4_ = fVar169;
        local_260 = local_ae0;
        uStack_258 = uStack_ad8;
        local_af0._4_4_ = (int)(float)local_ae0._4_4_;
        local_af0._0_4_ = (int)(float)local_ae0._0_4_;
        local_af0._8_4_ = (int)fVar168;
        local_af0._12_4_ = (int)fVar169;
        local_390 = local_af0._0_8_;
        uStack_388 = local_af0._8_8_;
        auVar137._8_8_ = local_af0._8_8_;
        auVar137._0_8_ = local_af0._0_8_;
        auVar2 = vcvtdq2ps_avx(auVar137);
        local_ad0 = auVar2._0_8_;
        local_1e0 = local_ad0;
        uStack_ac8 = auVar2._8_8_;
        uStack_1d8 = uStack_ac8;
        local_1f0 = local_ae0;
        uStack_1e8 = uStack_ad8;
        auVar147._8_8_ = uStack_ad8;
        auVar147._0_8_ = local_ae0;
        auVar1 = vcmpps_avx(auVar147,auVar2,1);
        local_b10._0_8_ = auVar1._0_8_;
        local_580 = local_b10._0_8_;
        local_b10._8_8_ = auVar1._8_8_;
        uStack_578 = local_b10._8_8_;
        local_590 = 0x3f8000003f800000;
        uStack_588 = 0x3f8000003f800000;
        auVar123._8_8_ = 0x3f8000003f800000;
        auVar123._0_8_ = 0x3f8000003f800000;
        local_b10 = vpand_avx(auVar1,auVar123);
        local_7e0 = local_ad0;
        uStack_7d8 = uStack_ac8;
        local_7f0 = local_b10._0_8_;
        uStack_7e8 = local_b10._8_8_;
        _local_ae0 = vsubps_avx(auVar2,local_b10);
        local_990 = 0x3f318000;
        uStack_98c = 0x3f318000;
        uStack_988 = 0x3f318000;
        uStack_984 = 0x3f318000;
        local_980._0_4_ = local_ae0._0_4_;
        local_980._4_4_ = local_ae0._4_4_;
        uStack_978._0_4_ = local_ae0._8_4_;
        uStack_978._4_4_ = local_ae0._12_4_;
        local_ad0 = CONCAT44(local_980._4_4_ * 0.6933594,(float)local_980 * 0.6933594);
        uStack_ac8._0_4_ = (float)uStack_978 * 0.6933594;
        uStack_ac8._4_4_ = uStack_978._4_4_ * 0.6933594;
        local_9a0 = local_ae0;
        uStack_998 = uStack_ad8;
        local_9b0 = 0xb95e8083;
        uStack_9ac = 0xb95e8083;
        uStack_9a8 = 0xb95e8083;
        uStack_9a4 = 0xb95e8083;
        local_800 = local_ac0._0_8_;
        uStack_7f8 = local_ac0._8_8_;
        local_810 = local_ad0;
        uStack_808 = uStack_ac8;
        auVar109._8_8_ = uStack_ac8;
        auVar109._0_8_ = local_ad0;
        auVar1 = vsubps_avx(auVar3,auVar109);
        local_ac0._0_8_ = auVar1._0_8_;
        local_820 = local_ac0._0_8_;
        local_ac0._8_8_ = auVar1._8_8_;
        uStack_818 = local_ac0._8_8_;
        local_830 = CONCAT44(local_980._4_4_ * -0.00021219444,(float)local_980 * -0.00021219444);
        uStack_828 = CONCAT44(uStack_978._4_4_ * -0.00021219444,(float)uStack_978 * -0.00021219444);
        auVar108._8_8_ = uStack_828;
        auVar108._0_8_ = local_830;
        local_ac0 = vsubps_avx(auVar1,auVar108);
        local_9d0 = local_ac0._0_8_;
        uStack_9c8 = local_ac0._8_8_;
        local_9c0._0_4_ = local_ac0._0_4_;
        local_9c0._4_4_ = local_ac0._4_4_;
        uStack_9b8._0_4_ = local_ac0._8_4_;
        uStack_9b8._4_4_ = local_ac0._12_4_;
        local_b20 = (float)local_9c0 * (float)local_9c0;
        fStack_b1c = local_9c0._4_4_ * local_9c0._4_4_;
        fStack_b18 = (float)uStack_9b8 * (float)uStack_9b8;
        fStack_b14 = uStack_9b8._4_4_ * uStack_9b8._4_4_;
        local_9e0 = 0x3950696739506967;
        uStack_9d8 = 0x3950696739506967;
        local_9f0 = local_ac0._0_8_;
        uStack_9e8 = local_ac0._8_8_;
        local_880 = CONCAT44(local_9c0._4_4_ * 0.00019875691,(float)local_9c0 * 0.00019875691);
        uStack_878 = CONCAT44(uStack_9b8._4_4_ * 0.00019875691,(float)uStack_9b8 * 0.00019875691);
        local_890 = 0x3ab743ce;
        uStack_88c = 0x3ab743ce;
        uStack_888 = 0x3ab743ce;
        uStack_884 = 0x3ab743ce;
        local_b30 = (float)local_9c0 * 0.00019875691 + 0.0013981999;
        fStack_b2c = local_9c0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_b28 = (float)uStack_9b8 * 0.00019875691 + 0.0013981999;
        fStack_b24 = uStack_9b8._4_4_ * 0.00019875691 + 0.0013981999;
        local_a00 = CONCAT44(fStack_b2c,local_b30);
        uStack_9f8 = CONCAT44(fStack_b24,fStack_b28);
        local_a10 = local_ac0._0_8_;
        uStack_a08 = local_ac0._8_8_;
        local_b30 = local_b30 * (float)local_9c0;
        fStack_b2c = fStack_b2c * local_9c0._4_4_;
        fStack_b28 = fStack_b28 * (float)uStack_9b8;
        fStack_b24 = fStack_b24 * uStack_9b8._4_4_;
        local_8a0 = CONCAT44(fStack_b2c,local_b30);
        uStack_898 = CONCAT44(fStack_b24,fStack_b28);
        local_8b0 = 0x3c088908;
        uStack_8ac = 0x3c088908;
        uStack_8a8 = 0x3c088908;
        uStack_8a4 = 0x3c088908;
        local_b30 = local_b30 + 0.008333452;
        fStack_b2c = fStack_b2c + 0.008333452;
        fStack_b28 = fStack_b28 + 0.008333452;
        fStack_b24 = fStack_b24 + 0.008333452;
        local_a20 = CONCAT44(fStack_b2c,local_b30);
        uStack_a18 = CONCAT44(fStack_b24,fStack_b28);
        local_a30 = local_ac0._0_8_;
        uStack_a28 = local_ac0._8_8_;
        local_b30 = (float)local_9c0 * local_b30;
        fStack_b2c = local_9c0._4_4_ * fStack_b2c;
        fStack_b28 = (float)uStack_9b8 * fStack_b28;
        fStack_b24 = uStack_9b8._4_4_ * fStack_b24;
        local_8c0 = CONCAT44(fStack_b2c,local_b30);
        uStack_8b8 = CONCAT44(fStack_b24,fStack_b28);
        local_8d0 = 0x3d2aa9c1;
        uStack_8cc = 0x3d2aa9c1;
        uStack_8c8 = 0x3d2aa9c1;
        uStack_8c4 = 0x3d2aa9c1;
        local_b30 = local_b30 + 0.041665796;
        fStack_b2c = fStack_b2c + 0.041665796;
        fStack_b28 = fStack_b28 + 0.041665796;
        fStack_b24 = fStack_b24 + 0.041665796;
        local_a40 = CONCAT44(fStack_b2c,local_b30);
        uStack_a38 = CONCAT44(fStack_b24,fStack_b28);
        local_a50 = local_ac0._0_8_;
        uStack_a48 = local_ac0._8_8_;
        local_b30 = local_b30 * (float)local_9c0;
        fStack_b2c = fStack_b2c * local_9c0._4_4_;
        fStack_b28 = fStack_b28 * (float)uStack_9b8;
        fStack_b24 = fStack_b24 * uStack_9b8._4_4_;
        local_8e0 = CONCAT44(fStack_b2c,local_b30);
        uStack_8d8 = CONCAT44(fStack_b24,fStack_b28);
        local_8f0 = 0x3e2aaaaa;
        uStack_8ec = 0x3e2aaaaa;
        uStack_8e8 = 0x3e2aaaaa;
        uStack_8e4 = 0x3e2aaaaa;
        local_b30 = local_b30 + 0.16666666;
        fStack_b2c = fStack_b2c + 0.16666666;
        fStack_b28 = fStack_b28 + 0.16666666;
        fStack_b24 = fStack_b24 + 0.16666666;
        local_a60 = CONCAT44(fStack_b2c,local_b30);
        uStack_a58 = CONCAT44(fStack_b24,fStack_b28);
        local_a70 = local_ac0._0_8_;
        uStack_a68 = local_ac0._8_8_;
        local_b30 = local_b30 * (float)local_9c0;
        fStack_b2c = fStack_b2c * local_9c0._4_4_;
        fStack_b28 = fStack_b28 * (float)uStack_9b8;
        fStack_b24 = fStack_b24 * uStack_9b8._4_4_;
        local_900 = CONCAT44(fStack_b2c,local_b30);
        uStack_8f8 = CONCAT44(fStack_b24,fStack_b28);
        local_910 = 0x3f000000;
        uStack_90c = 0x3f000000;
        uStack_908 = 0x3f000000;
        uStack_904 = 0x3f000000;
        local_b30 = local_b30 + 0.5;
        fStack_b2c = fStack_b2c + 0.5;
        fStack_b28 = fStack_b28 + 0.5;
        fStack_b24 = fStack_b24 + 0.5;
        local_a80 = CONCAT44(fStack_b2c,local_b30);
        uStack_a78 = CONCAT44(fStack_b24,fStack_b28);
        local_a90 = CONCAT44(fStack_b1c,local_b20);
        uStack_a88 = CONCAT44(fStack_b14,fStack_b18);
        local_b30 = local_b30 * local_b20;
        fStack_b2c = fStack_b2c * fStack_b1c;
        fStack_b28 = fStack_b28 * fStack_b18;
        fStack_b24 = fStack_b24 * fStack_b14;
        local_920 = CONCAT44(fStack_b2c,local_b30);
        uStack_918 = CONCAT44(fStack_b24,fStack_b28);
        local_930 = local_ac0._0_8_;
        uStack_928 = local_ac0._8_8_;
        local_b30 = local_b30 + (float)local_9c0;
        fStack_b2c = fStack_b2c + local_9c0._4_4_;
        fStack_b28 = fStack_b28 + (float)uStack_9b8;
        fStack_b24 = fStack_b24 + uStack_9b8._4_4_;
        local_940 = CONCAT44(fStack_b2c,local_b30);
        uStack_938 = CONCAT44(fStack_b24,fStack_b28);
        local_950 = 0x3f8000003f800000;
        uStack_948 = 0x3f8000003f800000;
        local_b30 = local_b30 + 1.0;
        fStack_b2c = fStack_b2c + 1.0;
        fStack_b28 = fStack_b28 + 1.0;
        fStack_b24 = fStack_b24 + 1.0;
        local_270 = local_ae0;
        uStack_268 = uStack_ad8;
        local_af0._4_4_ = (int)local_980._4_4_;
        local_af0._0_4_ = (int)(float)local_980;
        local_af0._8_4_ = (int)(float)uStack_978;
        local_af0._12_4_ = (int)uStack_978._4_4_;
        local_160 = local_af0._0_8_;
        uStack_158 = local_af0._8_8_;
        auVar152._8_8_ = local_af0._8_8_;
        auVar152._0_8_ = local_af0._0_8_;
        auVar151._8_8_ = 0x7f0000007f;
        auVar151._0_8_ = 0x7f0000007f;
        auVar1 = vpaddd_avx(auVar152,auVar151);
        local_af0._0_8_ = auVar1._0_8_;
        local_e0 = local_af0._0_8_;
        local_af0._8_8_ = auVar1._8_8_;
        uStack_d8 = local_af0._8_8_;
        local_e4 = 0x17;
        local_af0 = vpslld_avx(auVar1,ZEXT416(0x17));
        local_70 = local_af0._0_8_;
        uStack_68 = local_af0._8_8_;
        local_b40 = local_af0._0_8_;
        uStack_b38 = local_af0._8_8_;
        local_aa0._4_4_ = fStack_b2c;
        local_aa0._0_4_ = local_b30;
        local_aa0._8_4_ = fStack_b28;
        local_aa0._12_4_ = fStack_b24;
        local_ab0._0_4_ = local_af0._0_4_;
        local_ab0._4_4_ = local_af0._4_4_;
        uStack_aa8._0_4_ = local_af0._8_4_;
        uStack_aa8._4_4_ = local_af0._12_4_;
        local_b30 = local_b30 * (float)local_ab0;
        fStack_b2c = fStack_b2c * local_ab0._4_4_;
        fStack_b28 = fStack_b28 * (float)uStack_aa8;
        fStack_b24 = fStack_b24 * uStack_aa8._4_4_;
        local_b60 = CONCAT44(fStack_b2c,local_b30);
        uStack_b58 = CONCAT44(fStack_b24,fStack_b28);
        local_7b0 = local_b30 + 1.0;
        fStack_7ac = fStack_b2c + 1.0;
        fStack_7a8 = fStack_b28 + 1.0;
        fStack_7a4 = fStack_b24 + 1.0;
        auVar111._4_4_ = fStack_7ac;
        auVar111._0_4_ = local_7b0;
        auVar111._8_4_ = fStack_7a8;
        auVar111._12_4_ = fStack_7a4;
        _local_2070 = vdivps_avx(local_b50,auVar111);
        local_f60._0_4_ = (float)local_2070._0_4_ * 2.0;
        local_f60._4_4_ = (float)local_2070._4_4_ * 2.0;
        local_f60._8_4_ = fStack_2068 * 2.0;
        local_f60._12_4_ = fStack_2064 * 2.0;
        auVar104._8_8_ = 0x3f8000003f800000;
        auVar104._0_8_ = 0x3f8000003f800000;
        _local_20f0 = vsubps_avx(local_f60,auVar104);
        local_20e0._0_4_ = (float)local_62f0;
        local_20e0._4_4_ = (float)((ulong)local_62f0 >> 0x20);
        uStack_20d8._0_4_ = (float)uStack_62e8;
        uStack_20d8._4_4_ = (float)((ulong)uStack_62e8 >> 0x20);
        local_6510 = CONCAT44(local_20e0._4_4_ * (float)local_20f0._4_4_,
                              (float)local_20e0 * (float)local_20f0._0_4_);
        uStack_6508 = CONCAT44(uStack_20d8._4_4_ * fStack_20e4,(float)uStack_20d8 * fStack_20e8);
        local_62a8 = local_64b0;
        local_62c0 = local_6510;
        uStack_62b8 = uStack_6508;
        auVar33._8_8_ = uStack_6508;
        auVar33._0_8_ = local_6510;
        *local_64b0 = auVar33;
        local_64b0 = local_64b0 + 1;
        local_20e0 = local_62f0;
        uStack_20d8 = uStack_62e8;
        local_2080 = local_20b0;
        uStack_2078 = uStack_20a8;
        local_2060 = local_20b0;
        uStack_2058 = uStack_20a8;
        local_2050 = local_1f50;
        uStack_2048 = uStack_1f48;
        local_1ef0 = local_1f90;
        uStack_1ee8 = uStack_1f88;
        local_1d90 = local_1da0;
        uStack_1d88 = uStack_1d98;
        local_1970 = local_1fd0;
        uStack_1968 = uStack_1fc8;
        local_1830 = uVar14;
        uStack_1828 = uVar15;
        local_1820 = uVar12;
        uStack_1818 = uVar13;
        local_1800 = uVar10;
        uStack_17f8 = uVar11;
        local_1720 = local_1760._0_8_;
        uStack_1718 = local_1760._8_8_;
        local_1630 = local_1640;
        uStack_1628 = uStack_1638;
        local_15f0 = local_1750;
        uStack_15e8 = uStack_1748;
        local_15d0 = uVar8;
        uStack_15c8 = uVar9;
        uStack_118c = local_1190;
        uStack_1188 = local_1190;
        uStack_1184 = local_1190;
        uStack_116c = local_1170;
        uStack_1168 = local_1170;
        uStack_1164 = local_1170;
        uStack_114c = local_1150;
        uStack_1148 = local_1150;
        uStack_1144 = local_1150;
        local_f70 = local_20a0;
        uStack_f68 = uStack_2098;
        local_ab0 = local_af0._0_8_;
        uStack_aa8 = local_af0._8_8_;
        local_9c0 = local_9d0;
        uStack_9b8 = uStack_9c8;
        local_980 = local_ae0;
        uStack_978 = uStack_ad8;
        local_960 = uVar16;
        uStack_958 = uVar17;
        uStack_84c = local_850;
        uStack_848 = local_850;
        uStack_844 = local_850;
        local_7a0 = local_b50;
        local_720 = local_760;
        local_700 = local_760;
        local_280 = local_62f0;
        uStack_278 = uStack_62e8;
        local_110 = local_3b0;
        uStack_108 = uStack_3a8;
      }
    }
  }
  else {
    for (local_6514 = 0; local_6514 < local_63fc; local_6514 = local_6514 + 1) {
      ncnn::Mat::channel(in_stack_ffffffffffff98f0._0_8_,
                         (int)((ulong)in_stack_ffffffffffff98e8 >> 0x20));
      pauVar165 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_6568);
      ncnn::Mat::~Mat((Mat *)0x8f7ae1);
      local_6520 = pauVar165;
      for (local_656c = 0; local_656c + 7 < local_6400; local_656c = local_656c + 8) {
        local_63d0 = local_6520;
        local_63c0 = *(undefined8 *)*local_6520;
        uStack_63b8 = *(undefined8 *)(*local_6520 + 8);
        uStack_63b0 = *(undefined8 *)(*local_6520 + 0x10);
        auVar159 = *(undefined1 (*) [24])*local_6520;
        uStack_63a8 = *(undefined8 *)(*local_6520 + 0x18);
        local_3100 = ZEXT1632(ZEXT816(0) << 0x40);
        local_4a40 = 0x3f800000;
        uStack_4a3c = 0x3f800000;
        uStack_4a38 = 0x3f800000;
        uStack_4a34 = 0x3f800000;
        uStack_4a30 = 0x3f800000;
        uStack_4a2c = 0x3f800000;
        uStack_4a28 = 0x3f800000;
        uStack_4a24 = 0x3f800000;
        local_49c0._0_8_ = auVar159._0_8_;
        local_2860 = local_49c0._0_8_;
        local_49c0._8_8_ = auVar159._8_8_;
        uStack_2858 = local_49c0._8_8_;
        local_49c0._16_8_ = auVar159._16_8_;
        uStack_2850 = local_49c0._16_8_;
        local_2880 = 0x42b0c0a5;
        uStack_287c = 0x42b0c0a5;
        uStack_2878 = 0x42b0c0a5;
        uStack_2874 = 0x42b0c0a5;
        uStack_2870 = 0x42b0c0a5;
        uStack_286c = 0x42b0c0a5;
        uStack_2868 = 0x42b0c0a5;
        uStack_2864 = 0x42b0c0a5;
        auVar83._8_4_ = 0x42b0c0a5;
        auVar83._0_8_ = 0x42b0c0a542b0c0a5;
        auVar83._12_4_ = 0x42b0c0a5;
        auVar83._16_4_ = 0x42b0c0a5;
        auVar83._20_4_ = 0x42b0c0a5;
        auVar83._24_4_ = 0x42b0c0a5;
        auVar83._28_4_ = 0x42b0c0a5;
        auVar5 = vminps_avx(*local_6520,auVar83);
        local_49c0._0_8_ = auVar5._0_8_;
        local_2fe0 = local_49c0._0_8_;
        local_49c0._8_8_ = auVar5._8_8_;
        uStack_2fd8 = local_49c0._8_8_;
        local_49c0._16_8_ = auVar5._16_8_;
        uStack_2fd0 = local_49c0._16_8_;
        local_49c0._24_8_ = auVar5._24_8_;
        uStack_2fc8 = local_49c0._24_8_;
        local_3000 = 0xc2b0c0a5;
        uStack_2ffc = 0xc2b0c0a5;
        uStack_2ff8 = 0xc2b0c0a5;
        uStack_2ff4 = 0xc2b0c0a5;
        uStack_2ff0 = 0xc2b0c0a5;
        uStack_2fec = 0xc2b0c0a5;
        uStack_2fe8 = 0xc2b0c0a5;
        uStack_2fe4 = 0xc2b0c0a5;
        auVar61._8_4_ = 0xc2b0c0a5;
        auVar61._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar61._12_4_ = 0xc2b0c0a5;
        auVar61._16_4_ = 0xc2b0c0a5;
        auVar61._20_4_ = 0xc2b0c0a5;
        auVar61._24_4_ = 0xc2b0c0a5;
        auVar61._28_4_ = 0xc2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar61);
        local_49c0._0_8_ = auVar4._0_8_;
        uVar8 = local_49c0._0_8_;
        local_49c0._8_8_ = auVar4._8_8_;
        uVar9 = local_49c0._8_8_;
        local_49c0._16_8_ = auVar4._16_8_;
        uVar10 = local_49c0._16_8_;
        local_49c0._24_8_ = auVar4._24_8_;
        uVar11 = local_49c0._24_8_;
        local_4720 = 0x3fb8aa3b;
        uStack_471c = 0x3fb8aa3b;
        uStack_4718 = 0x3fb8aa3b;
        uStack_4714 = 0x3fb8aa3b;
        uStack_4710 = 0x3fb8aa3b;
        uStack_470c = 0x3fb8aa3b;
        uStack_4708 = 0x3fb8aa3b;
        uStack_4704 = 0x3fb8aa3b;
        local_4700._0_4_ = auVar4._0_4_;
        local_4700._4_4_ = auVar4._4_4_;
        uStack_46f8._0_4_ = auVar4._8_4_;
        uStack_46f8._4_4_ = auVar4._12_4_;
        uStack_46f0._0_4_ = auVar4._16_4_;
        uStack_46f0._4_4_ = auVar4._20_4_;
        uStack_46e8._0_4_ = auVar4._24_4_;
        uStack_46e8._4_4_ = auVar4._28_4_;
        local_4a00._4_4_ = local_4700._4_4_ * 1.442695;
        local_4a00._0_4_ = (float)local_4700 * 1.442695;
        uStack_49f8._0_4_ = (float)uStack_46f8 * 1.442695;
        uStack_49f8._4_4_ = uStack_46f8._4_4_ * 1.442695;
        uStack_49f0._0_4_ = (float)uStack_46f0 * 1.442695;
        uStack_49f0._4_4_ = uStack_46f0._4_4_ * 1.442695;
        auVar159 = _local_4a00;
        uStack_49e8._0_4_ = (float)uStack_46e8 * 1.442695;
        uStack_49e8._4_4_ = uStack_46e8._4_4_;
        auVar5 = _local_4a00;
        local_4500 = local_4a00;
        uStack_44f8 = uStack_49f8;
        uStack_49f0 = auVar159._16_8_;
        uStack_44f0 = uStack_49f0;
        uStack_49e8 = auVar5._24_8_;
        uStack_44e8 = uStack_49e8;
        local_4520 = 0x3f000000;
        uStack_451c = 0x3f000000;
        uStack_4518 = 0x3f000000;
        uStack_4514 = 0x3f000000;
        uStack_4510 = 0x3f000000;
        uStack_450c = 0x3f000000;
        uStack_4508 = 0x3f000000;
        uStack_4504 = 0x3f000000;
        local_4a00._4_4_ = local_4700._4_4_ * 1.442695 + 0.5;
        local_4a00._0_4_ = (float)local_4700 * 1.442695 + 0.5;
        uStack_49f8._0_4_ = (float)uStack_46f8 * 1.442695 + 0.5;
        uStack_49f8._4_4_ = uStack_46f8._4_4_ * 1.442695 + 0.5;
        uStack_49f0._0_4_ = (float)uStack_46f0 * 1.442695 + 0.5;
        uStack_49f0._4_4_ = uStack_46f0._4_4_ * 1.442695 + 0.5;
        uStack_49e8._0_4_ = (float)uStack_46e8 * 1.442695 + 0.5;
        uStack_49e8._4_4_ = uStack_46e8._4_4_ + 0.5;
        auVar6 = vroundps_avx(_local_4a00,1);
        auVar5 = vcmpps_avx(_local_4a00,auVar6,1);
        local_4a60._0_8_ = auVar5._0_8_;
        local_2da0 = local_4a60._0_8_;
        local_4a60._8_8_ = auVar5._8_8_;
        uStack_2d98 = local_4a60._8_8_;
        local_4a60._16_8_ = auVar5._16_8_;
        uStack_2d90 = local_4a60._16_8_;
        local_4a60._24_8_ = auVar5._24_8_;
        uStack_2d88 = local_4a60._24_8_;
        local_2dc0 = 0x3f8000003f800000;
        uStack_2db8 = 0x3f8000003f800000;
        uStack_2db0 = 0x3f8000003f800000;
        uStack_2da8 = 0x3f8000003f800000;
        auVar69._8_8_ = 0x3f8000003f800000;
        auVar69._0_8_ = 0x3f8000003f800000;
        auVar69._16_8_ = 0x3f8000003f800000;
        auVar69._24_8_ = 0x3f8000003f800000;
        local_4a60 = vpand_avx2(auVar5,auVar69);
        local_49e0 = auVar6._0_8_;
        local_33e0 = local_49e0;
        uStack_49d8 = auVar6._8_8_;
        uStack_33d8 = uStack_49d8;
        uStack_49d0 = auVar6._16_8_;
        uStack_33d0 = uStack_49d0;
        uStack_49c8 = auVar6._24_8_;
        uStack_33c8 = uStack_49c8;
        local_3400 = local_4a60._0_8_;
        uStack_33f8 = local_4a60._8_8_;
        uStack_33f0 = local_4a60._16_8_;
        uStack_33e8 = local_4a60._24_8_;
        _local_4a00 = vsubps_avx(auVar6,local_4a60);
        local_4760 = 0x3f318000;
        uStack_475c = 0x3f318000;
        uStack_4758 = 0x3f318000;
        uStack_4754 = 0x3f318000;
        uStack_4750 = 0x3f318000;
        uStack_474c = 0x3f318000;
        uStack_4748 = 0x3f318000;
        uStack_4744 = 0x3f318000;
        local_4740._0_4_ = local_4a00._0_4_;
        local_4740._4_4_ = local_4a00._4_4_;
        uStack_4738._0_4_ = local_4a00._8_4_;
        uStack_4738._4_4_ = local_4a00._12_4_;
        uStack_4730._0_4_ = local_4a00._16_4_;
        uStack_4730._4_4_ = local_4a00._20_4_;
        uStack_4728._0_4_ = local_4a00._24_4_;
        uStack_4728._4_4_ = local_4a00._28_4_;
        local_49e0._4_4_ = local_4740._4_4_ * 0.6933594;
        local_49e0._0_4_ = (float)local_4740 * 0.6933594;
        uStack_49d8._0_4_ = (float)uStack_4738 * 0.6933594;
        uStack_49d8._4_4_ = uStack_4738._4_4_ * 0.6933594;
        uStack_49d0._0_4_ = (float)uStack_4730 * 0.6933594;
        uStack_49d0._4_4_ = uStack_4730._4_4_ * 0.6933594;
        auVar159 = _local_49e0;
        uStack_49c8._0_4_ = (float)uStack_4728 * 0.6933594;
        uStack_49c8._4_4_ = uStack_4728._4_4_;
        auVar61 = _local_49e0;
        local_4780 = local_4a00;
        uStack_4778 = uStack_49f8;
        uStack_4770 = uStack_49f0;
        uStack_4768 = uStack_49e8;
        local_47a0 = 0xb95e8083;
        uStack_479c = 0xb95e8083;
        uStack_4798 = 0xb95e8083;
        uStack_4794 = 0xb95e8083;
        uStack_4790 = 0xb95e8083;
        uStack_478c = 0xb95e8083;
        uStack_4788 = 0xb95e8083;
        uStack_4784 = 0xb95e8083;
        local_3420 = local_49c0._0_8_;
        uStack_3418 = local_49c0._8_8_;
        uStack_3410 = local_49c0._16_8_;
        uStack_3408 = local_49c0._24_8_;
        local_3440 = local_49e0;
        uStack_3438 = uStack_49d8;
        uStack_49d0 = auVar159._16_8_;
        uStack_3430 = uStack_49d0;
        uStack_49c8 = auVar61._24_8_;
        uStack_3428 = uStack_49c8;
        auVar48._16_8_ = uStack_49d0;
        auVar48._0_16_ = _local_49e0;
        auVar48._24_8_ = uStack_49c8;
        auVar5 = vsubps_avx(auVar4,auVar48);
        local_49c0._0_8_ = auVar5._0_8_;
        local_3460 = local_49c0._0_8_;
        local_49c0._8_8_ = auVar5._8_8_;
        uStack_3458 = local_49c0._8_8_;
        local_49c0._16_8_ = auVar5._16_8_;
        uStack_3450 = local_49c0._16_8_;
        local_49c0._24_8_ = auVar5._24_8_;
        uStack_3448 = local_49c0._24_8_;
        local_3480 = CONCAT44(local_4740._4_4_ * -0.00021219444,(float)local_4740 * -0.00021219444);
        uStack_3478 = CONCAT44(uStack_4738._4_4_ * -0.00021219444,
                               (float)uStack_4738 * -0.00021219444);
        uStack_3470 = CONCAT44(uStack_4730._4_4_ * -0.00021219444,
                               (float)uStack_4730 * -0.00021219444);
        uStack_3468 = CONCAT44(uStack_4728._4_4_,(float)uStack_4728 * -0.00021219444);
        auVar47._8_8_ = uStack_3478;
        auVar47._0_8_ = local_3480;
        auVar47._16_8_ = uStack_3470;
        auVar47._24_8_ = uStack_3468;
        local_49c0 = vsubps_avx(auVar5,auVar47);
        local_47e0 = local_49c0._0_8_;
        uStack_47d8 = local_49c0._8_8_;
        uStack_47d0 = local_49c0._16_8_;
        uStack_47c8 = local_49c0._24_8_;
        local_47c0._0_4_ = local_49c0._0_4_;
        local_47c0._4_4_ = local_49c0._4_4_;
        uStack_47b8._0_4_ = local_49c0._8_4_;
        uStack_47b8._4_4_ = local_49c0._12_4_;
        uStack_47b0._0_4_ = local_49c0._16_4_;
        uStack_47b0._4_4_ = local_49c0._20_4_;
        uStack_47a8._0_4_ = local_49c0._24_4_;
        uStack_47a8._4_4_ = local_49c0._28_4_;
        fStack_4a64 = uStack_47a8._4_4_;
        local_4a80 = (float)local_47c0 * (float)local_47c0;
        fStack_4a7c = local_47c0._4_4_ * local_47c0._4_4_;
        fStack_4a78 = (float)uStack_47b8 * (float)uStack_47b8;
        fStack_4a74 = uStack_47b8._4_4_ * uStack_47b8._4_4_;
        fStack_4a70 = (float)uStack_47b0 * (float)uStack_47b0;
        fStack_4a6c = uStack_47b0._4_4_ * uStack_47b0._4_4_;
        fStack_4a68 = (float)uStack_47a8 * (float)uStack_47a8;
        local_4800 = 0x3950696739506967;
        uStack_47f8 = 0x3950696739506967;
        uStack_47f0 = 0x3950696739506967;
        uStack_47e8 = 0x3950696739506967;
        local_4820 = local_49c0._0_8_;
        uStack_4818 = local_49c0._8_8_;
        uStack_4810 = local_49c0._16_8_;
        uStack_4808 = local_49c0._24_8_;
        local_4540 = CONCAT44(local_47c0._4_4_ * 0.00019875691,(float)local_47c0 * 0.00019875691);
        uStack_4538 = CONCAT44(uStack_47b8._4_4_ * 0.00019875691,(float)uStack_47b8 * 0.00019875691)
        ;
        uStack_4530 = CONCAT44(uStack_47b0._4_4_ * 0.00019875691,(float)uStack_47b0 * 0.00019875691)
        ;
        uStack_4528 = CONCAT44(0x39506967,(float)uStack_47a8 * 0.00019875691);
        local_4560 = 0x3ab743ce;
        uStack_455c = 0x3ab743ce;
        uStack_4558 = 0x3ab743ce;
        uStack_4554 = 0x3ab743ce;
        uStack_4550 = 0x3ab743ce;
        uStack_454c = 0x3ab743ce;
        uStack_4548 = 0x3ab743ce;
        uStack_4544 = 0x3ab743ce;
        local_4aa0 = (float)local_47c0 * 0.00019875691 + 0.0013981999;
        fStack_4a9c = local_47c0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_4a98 = (float)uStack_47b8 * 0.00019875691 + 0.0013981999;
        fStack_4a94 = uStack_47b8._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_4a90 = (float)uStack_47b0 * 0.00019875691 + 0.0013981999;
        fStack_4a8c = uStack_47b0._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_4a88 = (float)uStack_47a8 * 0.00019875691 + 0.0013981999;
        local_4840 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_4838 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_4830 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_4828 = CONCAT44(0x3ad150fb,fStack_4a88);
        local_4860 = local_49c0._0_8_;
        uStack_4858 = local_49c0._8_8_;
        uStack_4850 = local_49c0._16_8_;
        uStack_4848 = local_49c0._24_8_;
        local_4aa0 = local_4aa0 * (float)local_47c0;
        fStack_4a9c = fStack_4a9c * local_47c0._4_4_;
        fStack_4a98 = fStack_4a98 * (float)uStack_47b8;
        fStack_4a94 = fStack_4a94 * uStack_47b8._4_4_;
        fStack_4a90 = fStack_4a90 * (float)uStack_47b0;
        fStack_4a8c = fStack_4a8c * uStack_47b0._4_4_;
        fStack_4a88 = fStack_4a88 * (float)uStack_47a8;
        local_4580 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_4578 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_4570 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_4568 = CONCAT44(0x3ad150fb,fStack_4a88);
        local_45a0 = 0x3c088908;
        uStack_459c = 0x3c088908;
        uStack_4598 = 0x3c088908;
        uStack_4594 = 0x3c088908;
        uStack_4590 = 0x3c088908;
        uStack_458c = 0x3c088908;
        uStack_4588 = 0x3c088908;
        uStack_4584 = 0x3c088908;
        local_4aa0 = local_4aa0 + 0.008333452;
        fStack_4a9c = fStack_4a9c + 0.008333452;
        fStack_4a98 = fStack_4a98 + 0.008333452;
        fStack_4a94 = fStack_4a94 + 0.008333452;
        fStack_4a90 = fStack_4a90 + 0.008333452;
        fStack_4a8c = fStack_4a8c + 0.008333452;
        fStack_4a88 = fStack_4a88 + 0.008333452;
        local_4880 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_4878 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_4870 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_4868 = CONCAT44(0x3c22b327,fStack_4a88);
        local_48a0 = local_49c0._0_8_;
        uStack_4898 = local_49c0._8_8_;
        uStack_4890 = local_49c0._16_8_;
        uStack_4888 = local_49c0._24_8_;
        local_4aa0 = local_4aa0 * (float)local_47c0;
        fStack_4a9c = fStack_4a9c * local_47c0._4_4_;
        fStack_4a98 = fStack_4a98 * (float)uStack_47b8;
        fStack_4a94 = fStack_4a94 * uStack_47b8._4_4_;
        fStack_4a90 = fStack_4a90 * (float)uStack_47b0;
        fStack_4a8c = fStack_4a8c * uStack_47b0._4_4_;
        fStack_4a88 = fStack_4a88 * (float)uStack_47a8;
        local_45c0 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_45b8 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_45b0 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_45a8 = CONCAT44(0x3c22b327,fStack_4a88);
        local_45e0 = 0x3d2aa9c1;
        uStack_45dc = 0x3d2aa9c1;
        uStack_45d8 = 0x3d2aa9c1;
        uStack_45d4 = 0x3d2aa9c1;
        uStack_45d0 = 0x3d2aa9c1;
        uStack_45cc = 0x3d2aa9c1;
        uStack_45c8 = 0x3d2aa9c1;
        uStack_45c4 = 0x3d2aa9c1;
        local_4aa0 = local_4aa0 + 0.041665796;
        fStack_4a9c = fStack_4a9c + 0.041665796;
        fStack_4a98 = fStack_4a98 + 0.041665796;
        fStack_4a94 = fStack_4a94 + 0.041665796;
        fStack_4a90 = fStack_4a90 + 0.041665796;
        fStack_4a8c = fStack_4a8c + 0.041665796;
        fStack_4a88 = fStack_4a88 + 0.041665796;
        local_48c0 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_48b8 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_48b0 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_48a8 = CONCAT44(0x3d53568b,fStack_4a88);
        local_48e0 = local_49c0._0_8_;
        uStack_48d8 = local_49c0._8_8_;
        uStack_48d0 = local_49c0._16_8_;
        uStack_48c8 = local_49c0._24_8_;
        local_4aa0 = local_4aa0 * (float)local_47c0;
        fStack_4a9c = fStack_4a9c * local_47c0._4_4_;
        fStack_4a98 = fStack_4a98 * (float)uStack_47b8;
        fStack_4a94 = fStack_4a94 * uStack_47b8._4_4_;
        fStack_4a90 = fStack_4a90 * (float)uStack_47b0;
        fStack_4a8c = fStack_4a8c * uStack_47b0._4_4_;
        fStack_4a88 = fStack_4a88 * (float)uStack_47a8;
        local_4600 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_45f8 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_45f0 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_45e8 = CONCAT44(0x3d53568b,fStack_4a88);
        local_4620 = 0x3e2aaaaa;
        uStack_461c = 0x3e2aaaaa;
        uStack_4618 = 0x3e2aaaaa;
        uStack_4614 = 0x3e2aaaaa;
        uStack_4610 = 0x3e2aaaaa;
        uStack_460c = 0x3e2aaaaa;
        uStack_4608 = 0x3e2aaaaa;
        uStack_4604 = 0x3e2aaaaa;
        local_4aa0 = local_4aa0 + 0.16666666;
        fStack_4a9c = fStack_4a9c + 0.16666666;
        fStack_4a98 = fStack_4a98 + 0.16666666;
        fStack_4a94 = fStack_4a94 + 0.16666666;
        fStack_4a90 = fStack_4a90 + 0.16666666;
        fStack_4a8c = fStack_4a8c + 0.16666666;
        fStack_4a88 = fStack_4a88 + 0.16666666;
        local_4900 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_48f8 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_48f0 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_48e8 = CONCAT44(0x3e5f804d,fStack_4a88);
        local_4920 = local_49c0._0_8_;
        uStack_4918 = local_49c0._8_8_;
        uStack_4910 = local_49c0._16_8_;
        uStack_4908 = local_49c0._24_8_;
        local_4aa0 = local_4aa0 * (float)local_47c0;
        fStack_4a9c = fStack_4a9c * local_47c0._4_4_;
        fStack_4a98 = fStack_4a98 * (float)uStack_47b8;
        fStack_4a94 = fStack_4a94 * uStack_47b8._4_4_;
        fStack_4a90 = fStack_4a90 * (float)uStack_47b0;
        fStack_4a8c = fStack_4a8c * uStack_47b0._4_4_;
        fStack_4a88 = fStack_4a88 * (float)uStack_47a8;
        local_4640 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_4638 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_4630 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_4628 = CONCAT44(0x3e5f804d,fStack_4a88);
        local_4660 = 0x3f000000;
        uStack_465c = 0x3f000000;
        uStack_4658 = 0x3f000000;
        uStack_4654 = 0x3f000000;
        uStack_4650 = 0x3f000000;
        uStack_464c = 0x3f000000;
        uStack_4648 = 0x3f000000;
        uStack_4644 = 0x3f000000;
        local_4aa0 = local_4aa0 + 0.5;
        fStack_4a9c = fStack_4a9c + 0.5;
        fStack_4a98 = fStack_4a98 + 0.5;
        fStack_4a94 = fStack_4a94 + 0.5;
        fStack_4a90 = fStack_4a90 + 0.5;
        fStack_4a8c = fStack_4a8c + 0.5;
        fStack_4a88 = fStack_4a88 + 0.5;
        local_4940 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_4938 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_4930 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_4928 = CONCAT44(0x3f37e013,fStack_4a88);
        local_4960 = CONCAT44(fStack_4a7c,local_4a80);
        uStack_4958 = CONCAT44(fStack_4a74,fStack_4a78);
        uStack_4950 = CONCAT44(fStack_4a6c,fStack_4a70);
        uStack_4948 = CONCAT44(uStack_47a8._4_4_,fStack_4a68);
        local_4aa0 = local_4aa0 * local_4a80;
        fStack_4a9c = fStack_4a9c * fStack_4a7c;
        fStack_4a98 = fStack_4a98 * fStack_4a78;
        fStack_4a94 = fStack_4a94 * fStack_4a74;
        fStack_4a90 = fStack_4a90 * fStack_4a70;
        fStack_4a8c = fStack_4a8c * fStack_4a6c;
        fStack_4a88 = fStack_4a88 * fStack_4a68;
        local_4680 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_4678 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_4670 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_4668 = CONCAT44(0x3f37e013,fStack_4a88);
        local_46a0 = local_49c0._0_8_;
        uStack_4698 = local_49c0._8_8_;
        uStack_4690 = local_49c0._16_8_;
        uStack_4688 = local_49c0._24_8_;
        local_4aa0 = local_4aa0 + (float)local_47c0;
        fStack_4a9c = fStack_4a9c + local_47c0._4_4_;
        fStack_4a98 = fStack_4a98 + (float)uStack_47b8;
        fStack_4a94 = fStack_4a94 + uStack_47b8._4_4_;
        fStack_4a90 = fStack_4a90 + (float)uStack_47b0;
        fStack_4a8c = fStack_4a8c + uStack_47b0._4_4_;
        fStack_4a88 = fStack_4a88 + (float)uStack_47a8;
        local_46c0 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_46b8 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_46b0 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_46a8 = CONCAT44(uStack_47a8._4_4_ + 0.71826285,fStack_4a88);
        local_46e0 = 0x3f8000003f800000;
        uStack_46d8 = 0x3f8000003f800000;
        uStack_46d0 = 0x3f8000003f800000;
        uStack_46c8 = 0x3f8000003f800000;
        local_4aa0 = local_4aa0 + 1.0;
        fStack_4a9c = fStack_4a9c + 1.0;
        fStack_4a98 = fStack_4a98 + 1.0;
        fStack_4a94 = fStack_4a94 + 1.0;
        fStack_4a90 = fStack_4a90 + 1.0;
        fStack_4a8c = fStack_4a8c + 1.0;
        fStack_4a88 = fStack_4a88 + 1.0;
        fStack_4a84 = uStack_47a8._4_4_ + 0.71826285 + 1.0;
        local_27c0 = local_4a00;
        uStack_27b8 = uStack_49f8;
        uStack_27b0 = uStack_49f0;
        uStack_27a8 = uStack_49e8;
        local_4a20._4_4_ = (int)local_4740._4_4_;
        local_4a20._0_4_ = (int)(float)local_4740;
        local_4a20._8_4_ = (int)(float)uStack_4738;
        local_4a20._12_4_ = (int)uStack_4738._4_4_;
        local_4a20._16_4_ = (int)(float)uStack_4730;
        local_4a20._20_4_ = (int)uStack_4730._4_4_;
        auVar159 = local_4a20._0_24_;
        local_4a20._24_4_ = (int)(float)uStack_4728;
        local_4a20._28_4_ = (int)uStack_4728._4_4_;
        auVar5 = local_4a20;
        local_26e0 = local_4a20._0_8_;
        uStack_26d8 = local_4a20._8_8_;
        local_4a20._16_8_ = auVar159._16_8_;
        uStack_26d0 = local_4a20._16_8_;
        local_4a20._24_8_ = auVar5._24_8_;
        uStack_26c8 = local_4a20._24_8_;
        local_2700 = 0x7f0000007f;
        uStack_26f8 = 0x7f0000007f;
        uStack_26f0 = 0x7f0000007f;
        uStack_26e8 = 0x7f0000007f;
        local_24a0 = local_4a20._0_8_;
        uStack_2498 = local_4a20._8_8_;
        uStack_2490 = local_4a20._16_8_;
        uStack_2488 = local_4a20._24_8_;
        local_24c0 = 0x7f0000007f;
        uStack_24b8 = 0x7f0000007f;
        uStack_24b0 = 0x7f0000007f;
        uStack_24a8 = 0x7f0000007f;
        auVar88._16_8_ = local_4a20._16_8_;
        auVar88._0_16_ = local_4a20._0_16_;
        auVar88._24_8_ = local_4a20._24_8_;
        auVar87._8_8_ = 0x7f0000007f;
        auVar87._0_8_ = 0x7f0000007f;
        auVar87._16_8_ = 0x7f0000007f;
        auVar87._24_8_ = 0x7f0000007f;
        auVar5 = vpaddd_avx2(auVar88,auVar87);
        local_4a20._0_8_ = auVar5._0_8_;
        local_25e0 = local_4a20._0_8_;
        local_4a20._8_8_ = auVar5._8_8_;
        uStack_25d8 = local_4a20._8_8_;
        local_4a20._16_8_ = auVar5._16_8_;
        uStack_25d0 = local_4a20._16_8_;
        local_4a20._24_8_ = auVar5._24_8_;
        uStack_25c8 = local_4a20._24_8_;
        local_25e4 = 0x17;
        local_23a0 = local_4a20._0_8_;
        uStack_2398 = local_4a20._8_8_;
        uStack_2390 = local_4a20._16_8_;
        uStack_2388 = local_4a20._24_8_;
        local_23a4 = 0x17;
        local_4a20 = vpslld_avx2(auVar5,ZEXT416(0x17));
        local_2540 = local_4a20._0_8_;
        uStack_2538 = local_4a20._8_8_;
        uStack_2530 = local_4a20._16_8_;
        uStack_2528 = local_4a20._24_8_;
        local_4ac0 = local_4a20._0_8_;
        uStack_4ab8 = local_4a20._8_8_;
        uStack_4ab0 = local_4a20._16_8_;
        uStack_4aa8 = local_4a20._24_8_;
        local_4980 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_4978 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_4970 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_4968 = CONCAT44(fStack_4a84,fStack_4a88);
        local_49a0._0_4_ = local_4a20._0_4_;
        local_49a0._4_4_ = local_4a20._4_4_;
        uStack_4998._0_4_ = local_4a20._8_4_;
        uStack_4998._4_4_ = local_4a20._12_4_;
        uStack_4990._0_4_ = local_4a20._16_4_;
        uStack_4990._4_4_ = local_4a20._20_4_;
        uStack_4988._0_4_ = local_4a20._24_4_;
        local_4aa0 = local_4aa0 * (float)local_49a0;
        fStack_4a9c = fStack_4a9c * local_49a0._4_4_;
        fStack_4a98 = fStack_4a98 * (float)uStack_4998;
        fStack_4a94 = fStack_4a94 * uStack_4998._4_4_;
        fStack_4a90 = fStack_4a90 * (float)uStack_4990;
        fStack_4a8c = fStack_4a8c * uStack_4990._4_4_;
        fStack_4a88 = fStack_4a88 * (float)uStack_4988;
        local_50c0 = CONCAT44(fStack_4a9c,local_4aa0);
        uStack_50b8 = CONCAT44(fStack_4a94,fStack_4a98);
        uStack_50b0 = CONCAT44(fStack_4a8c,fStack_4a90);
        uStack_50a8 = CONCAT44(fStack_4a84,fStack_4a88);
        local_44c4 = 0x3f800000;
        local_2260 = 0x3f800000;
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
        auStack_2270 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
        local_66e0 = auVar1._0_8_;
        local_2280 = local_66e0;
        uStack_66d8 = auVar1._8_8_;
        uStack_2278 = uStack_66d8;
        local_2ac0 = 0x7f0000007f;
        uStack_2ab8 = 0x7f0000007f;
        uStack_2ab0 = 0x7f0000007f;
        uStack_2aa8 = 0x7f0000007f;
        local_50e0._0_4_ = auVar1._0_4_;
        local_50e0._4_4_ = auVar1._4_4_;
        uStack_50d8._0_4_ = auVar1._8_4_;
        uStack_50d8._4_4_ = auVar1._12_4_;
        uStack_50d0._0_4_ = auStack_2270._0_4_;
        uStack_50d0._4_4_ = auStack_2270._4_4_;
        uStack_50c8._0_4_ = auStack_2270._8_4_;
        uStack_50c8._4_4_ = auStack_2270._12_4_;
        local_5b40._4_4_ = fStack_4a9c + local_50e0._4_4_;
        local_5b40._0_4_ = local_4aa0 + (float)local_50e0;
        uStack_5b38._0_4_ = fStack_4a98 + (float)uStack_50d8;
        uStack_5b38._4_4_ = fStack_4a94 + uStack_50d8._4_4_;
        uStack_5b30._0_4_ = fStack_4a90 + (float)uStack_50d0;
        uStack_5b30._4_4_ = fStack_4a8c + uStack_50d0._4_4_;
        auVar159 = _local_5b40;
        uStack_5b28._0_4_ = fStack_4a88 + (float)uStack_50c8;
        uStack_5b28._4_4_ = fStack_4a84 + uStack_50c8._4_4_;
        auVar5 = _local_5b40;
        local_5b80 = 0x3f800000;
        uStack_5b7c = 0x3f800000;
        uStack_5b78 = 0x3f800000;
        uStack_5b74 = 0x3f800000;
        uStack_5b70 = 0x3f800000;
        uStack_5b6c = 0x3f800000;
        uStack_5b68 = 0x3f800000;
        uStack_5b64 = 0x3f800000;
        local_5ba0 = vcmpps_avx(_local_5b40,local_3100,2);
        local_2f60 = local_5b40;
        uStack_2f58 = uStack_5b38;
        uStack_5b30 = auVar159._16_8_;
        uStack_2f50 = uStack_5b30;
        uStack_5b28 = auVar5._24_8_;
        uStack_2f48 = uStack_5b28;
        local_2f80 = 0x800000;
        uStack_2f7c = 0x800000;
        uStack_2f78 = 0x800000;
        uStack_2f74 = 0x800000;
        uStack_2f70 = 0x800000;
        uStack_2f6c = 0x800000;
        uStack_2f68 = 0x800000;
        uStack_2f64 = 0x800000;
        auVar64._16_8_ = uStack_5b30;
        auVar64._0_16_ = _local_5b40;
        auVar64._24_8_ = uStack_5b28;
        auVar63._8_4_ = 0x800000;
        auVar63._0_8_ = 0x80000000800000;
        auVar63._12_4_ = 0x800000;
        auVar63._16_4_ = 0x800000;
        auVar63._20_4_ = 0x800000;
        auVar63._24_4_ = 0x800000;
        auVar63._28_4_ = 0x800000;
        auVar5 = vmaxps_avx(auVar64,auVar63);
        local_5b40 = auVar5._0_8_;
        local_2e80 = local_5b40;
        uStack_5b38 = auVar5._8_8_;
        uStack_2e78 = uStack_5b38;
        uStack_5b30 = auVar5._16_8_;
        uStack_2e70 = uStack_5b30;
        uStack_5b28 = auVar5._24_8_;
        uStack_2e68 = uStack_5b28;
        local_2ee0 = local_5b40;
        uStack_2ed8 = uStack_5b38;
        uStack_2ed0 = uStack_5b30;
        uStack_2ec8 = uStack_5b28;
        local_2ee4 = 0x17;
        local_29a0 = local_5b40;
        uStack_2998 = uStack_5b38;
        uStack_2990 = uStack_5b30;
        uStack_2988 = uStack_5b28;
        local_29a4 = 0x17;
        auVar4 = vpsrld_avx2(auVar5,ZEXT416(0x17));
        local_2ca0 = local_5b40;
        uStack_2c98 = uStack_5b38;
        uStack_2c90 = uStack_5b30;
        uStack_2c88 = uStack_5b28;
        local_2cc0 = 0x807fffff;
        uStack_2cbc = 0x807fffff;
        uStack_2cb8 = 0x807fffff;
        uStack_2cb4 = 0x807fffff;
        uStack_2cb0 = 0x807fffff;
        uStack_2cac = 0x807fffff;
        uStack_2ca8 = 0x807fffff;
        uStack_2ca4 = 0x807fffff;
        auVar72._8_4_ = 0x807fffff;
        auVar72._0_8_ = 0x807fffff807fffff;
        auVar72._12_4_ = 0x807fffff;
        auVar72._16_4_ = 0x807fffff;
        auVar72._20_4_ = 0x807fffff;
        auVar72._24_4_ = 0x807fffff;
        auVar72._28_4_ = 0x807fffff;
        auVar5 = vpand_avx2(auVar5,auVar72);
        local_5b40 = auVar5._0_8_;
        local_2b60 = local_5b40;
        uStack_5b38 = auVar5._8_8_;
        uStack_2b58 = uStack_5b38;
        uStack_5b30 = auVar5._16_8_;
        uStack_2b50 = uStack_5b30;
        uStack_5b28 = auVar5._24_8_;
        uStack_2b48 = uStack_5b28;
        local_2b80 = 0x3f000000;
        uStack_2b7c = 0x3f000000;
        uStack_2b78 = 0x3f000000;
        uStack_2b74 = 0x3f000000;
        uStack_2b70 = 0x3f000000;
        uStack_2b6c = 0x3f000000;
        uStack_2b68 = 0x3f000000;
        uStack_2b64 = 0x3f000000;
        auVar76._8_4_ = 0x3f000000;
        auVar76._0_8_ = 0x3f0000003f000000;
        auVar76._12_4_ = 0x3f000000;
        auVar76._16_4_ = 0x3f000000;
        auVar76._20_4_ = 0x3f000000;
        auVar76._24_4_ = 0x3f000000;
        auVar76._28_4_ = 0x3f000000;
        auVar6 = vpor_avx2(auVar5,auVar76);
        local_5b60._0_8_ = auVar4._0_8_;
        local_2aa0 = local_5b60._0_8_;
        local_5b60._8_8_ = auVar4._8_8_;
        uStack_2a98 = local_5b60._8_8_;
        local_5b60._16_8_ = auVar4._16_8_;
        uStack_2a90 = local_5b60._16_8_;
        local_5b60._24_8_ = auVar4._24_8_;
        uStack_2a88 = local_5b60._24_8_;
        local_2920 = local_5b60._0_8_;
        uStack_2918 = local_5b60._8_8_;
        uStack_2910 = local_5b60._16_8_;
        uStack_2908 = local_5b60._24_8_;
        local_2940 = 0x7f0000007f;
        uStack_2938 = 0x7f0000007f;
        uStack_2930 = 0x7f0000007f;
        uStack_2928 = 0x7f0000007f;
        auVar80._8_8_ = 0x7f0000007f;
        auVar80._0_8_ = 0x7f0000007f;
        auVar80._16_8_ = 0x7f0000007f;
        auVar80._24_8_ = 0x7f0000007f;
        local_5b60 = vpsubd_avx2(auVar4,auVar80);
        local_2a40 = local_5b60._0_8_;
        uStack_2a38 = local_5b60._8_8_;
        uStack_2a30 = local_5b60._16_8_;
        uStack_2a28 = local_5b60._24_8_;
        auVar5 = vcvtdq2ps_avx(local_5b60);
        local_5bc0 = auVar5._0_8_;
        uVar12 = local_5bc0;
        uStack_5bb8 = auVar5._8_8_;
        uVar13 = uStack_5bb8;
        uStack_5bb0 = auVar5._16_8_;
        uVar14 = uStack_5bb0;
        uStack_5ba8 = auVar5._24_8_;
        uVar15 = uStack_5ba8;
        local_54a0 = 0x3f8000003f800000;
        uStack_5498 = 0x3f8000003f800000;
        uStack_5490 = 0x3f8000003f800000;
        uStack_5488 = 0x3f8000003f800000;
        local_5480._0_4_ = auVar5._0_4_;
        local_5480._4_4_ = auVar5._4_4_;
        uStack_5478._0_4_ = auVar5._8_4_;
        uStack_5478._4_4_ = auVar5._12_4_;
        uStack_5470._0_4_ = auVar5._16_4_;
        uStack_5470._4_4_ = auVar5._20_4_;
        uStack_5468._0_4_ = auVar5._24_4_;
        uStack_5468._4_4_ = auVar5._28_4_;
        local_5bc0._4_4_ = local_5480._4_4_ + 1.0;
        local_5bc0._0_4_ = (float)local_5480 + 1.0;
        uStack_5bb8._0_4_ = (float)uStack_5478 + 1.0;
        uStack_5bb8._4_4_ = uStack_5478._4_4_ + 1.0;
        uStack_5bb0._0_4_ = (float)uStack_5470 + 1.0;
        uStack_5bb0._4_4_ = uStack_5470._4_4_ + 1.0;
        auVar159 = _local_5bc0;
        uStack_5ba8._0_4_ = (float)uStack_5468 + 1.0;
        uStack_5ba8._4_4_ = uStack_5468._4_4_ + 1.0;
        auVar34 = _local_5bc0;
        auVar174._8_4_ = 0x3f3504f3;
        auVar174._0_8_ = 0x3f3504f33f3504f3;
        auVar174._12_4_ = 0x3f3504f3;
        auVar174._16_4_ = 0x3f3504f3;
        auVar174._20_4_ = 0x3f3504f3;
        auVar174._24_4_ = 0x3f3504f3;
        auVar174._28_4_ = 0x3f3504f3;
        local_5be0 = vcmpps_avx(auVar6,auVar174,1);
        local_5b40 = auVar6._0_8_;
        local_2ce0 = local_5b40;
        uStack_5b38 = auVar6._8_8_;
        uStack_2cd8 = uStack_5b38;
        uStack_5b30 = auVar6._16_8_;
        uStack_2cd0 = uStack_5b30;
        uStack_5b28 = auVar6._24_8_;
        uStack_2cc8 = uStack_5b28;
        local_2d00 = local_5be0._0_8_;
        uStack_2cf8 = local_5be0._8_8_;
        uStack_2cf0 = local_5be0._16_8_;
        uStack_2ce8 = local_5be0._24_8_;
        auVar4 = vpand_avx2(auVar6,local_5be0);
        local_3260 = local_5b40;
        uStack_3258 = uStack_5b38;
        uStack_3250 = uStack_5b30;
        uStack_3248 = uStack_5b28;
        local_3280 = 0x3f8000003f800000;
        uStack_3278 = 0x3f8000003f800000;
        uStack_3270 = 0x3f8000003f800000;
        uStack_3268 = 0x3f8000003f800000;
        auVar54._8_8_ = 0x3f8000003f800000;
        auVar54._0_8_ = 0x3f8000003f800000;
        auVar54._16_8_ = 0x3f8000003f800000;
        auVar54._24_8_ = 0x3f8000003f800000;
        auVar5 = vsubps_avx(auVar6,auVar54);
        local_32a0 = local_5bc0;
        uStack_3298 = uStack_5bb8;
        uStack_5bb0 = auVar159._16_8_;
        uStack_3290 = uStack_5bb0;
        uStack_5ba8 = auVar34._24_8_;
        uStack_3288 = uStack_5ba8;
        local_2d20 = 0x3f8000003f800000;
        uStack_2d18 = 0x3f8000003f800000;
        uStack_2d10 = 0x3f8000003f800000;
        uStack_2d08 = 0x3f8000003f800000;
        local_2d40 = local_5be0._0_8_;
        uStack_2d38 = local_5be0._8_8_;
        uStack_2d30 = local_5be0._16_8_;
        uStack_2d28 = local_5be0._24_8_;
        auVar71._8_8_ = 0x3f8000003f800000;
        auVar71._0_8_ = 0x3f8000003f800000;
        auVar71._16_8_ = 0x3f8000003f800000;
        auVar71._24_8_ = 0x3f8000003f800000;
        local_32c0 = vpand_avx2(auVar71,local_5be0);
        auVar53._16_8_ = uStack_5bb0;
        auVar53._0_16_ = _local_5bc0;
        auVar53._24_8_ = uStack_5ba8;
        _local_5bc0 = vsubps_avx(auVar53,local_32c0);
        local_5b40 = auVar5._0_8_;
        uVar16 = local_5b40;
        uStack_5b38 = auVar5._8_8_;
        uVar17 = uStack_5b38;
        uStack_5b30 = auVar5._16_8_;
        uVar18 = uStack_5b30;
        uStack_5b28 = auVar5._24_8_;
        uVar19 = uStack_5b28;
        local_5c00 = auVar4._0_8_;
        uVar20 = local_5c00;
        uStack_5bf8 = auVar4._8_8_;
        uVar21 = uStack_5bf8;
        uStack_5bf0 = auVar4._16_8_;
        uVar22 = uStack_5bf0;
        uStack_5be8 = auVar4._24_8_;
        uVar23 = uStack_5be8;
        local_54c0._0_4_ = auVar5._0_4_;
        local_54c0._4_4_ = auVar5._4_4_;
        uStack_54b8._0_4_ = auVar5._8_4_;
        uStack_54b8._4_4_ = auVar5._12_4_;
        uStack_54b0._0_4_ = auVar5._16_4_;
        uStack_54b0._4_4_ = auVar5._20_4_;
        uStack_54a8._0_4_ = auVar5._24_4_;
        uStack_54a8._4_4_ = auVar5._28_4_;
        local_54e0._0_4_ = auVar4._0_4_;
        local_54e0._4_4_ = auVar4._4_4_;
        uStack_54d8._0_4_ = auVar4._8_4_;
        uStack_54d8._4_4_ = auVar4._12_4_;
        uStack_54d0._0_4_ = auVar4._16_4_;
        uStack_54d0._4_4_ = auVar4._20_4_;
        uStack_54c8._0_4_ = auVar4._24_4_;
        uStack_54c8._4_4_ = auVar4._28_4_;
        local_54c0._0_4_ = (float)local_54c0 + (float)local_54e0;
        local_54c0._4_4_ = local_54c0._4_4_ + local_54e0._4_4_;
        uStack_54b8._0_4_ = (float)uStack_54b8 + (float)uStack_54d8;
        uStack_54b8._4_4_ = uStack_54b8._4_4_ + uStack_54d8._4_4_;
        uStack_54b0._0_4_ = (float)uStack_54b0 + (float)uStack_54d0;
        uStack_54b0._4_4_ = uStack_54b0._4_4_ + uStack_54d0._4_4_;
        uStack_54a8._0_4_ = (float)uStack_54a8 + (float)uStack_54c8;
        fStack_5c04 = uStack_54a8._4_4_ + uStack_54c8._4_4_;
        local_5b40._4_4_ = local_54c0._4_4_;
        local_5b40._0_4_ = (float)local_54c0;
        uStack_5b38._0_4_ = (float)uStack_54b8;
        uStack_5b38._4_4_ = uStack_54b8._4_4_;
        uStack_5b30._0_4_ = (float)uStack_54b0;
        uStack_5b30._4_4_ = uStack_54b0._4_4_;
        auVar159 = _local_5b40;
        uStack_5b28._0_4_ = (float)uStack_54a8;
        uStack_5b28._4_4_ = fStack_5c04;
        auVar5 = _local_5b40;
        local_57e0 = local_5b40;
        uStack_57d8 = uStack_5b38;
        uStack_5b30 = auVar159._16_8_;
        uStack_57d0 = uStack_5b30;
        uStack_5b28 = auVar5._24_8_;
        uStack_57c8 = uStack_5b28;
        local_5c20 = (float)local_54c0 * (float)local_54c0;
        fStack_5c1c = local_54c0._4_4_ * local_54c0._4_4_;
        fStack_5c18 = (float)uStack_54b8 * (float)uStack_54b8;
        fStack_5c14 = uStack_54b8._4_4_ * uStack_54b8._4_4_;
        fStack_5c10 = (float)uStack_54b0 * (float)uStack_54b0;
        fStack_5c0c = uStack_54b0._4_4_ * uStack_54b0._4_4_;
        fStack_5c08 = (float)uStack_54a8 * (float)uStack_54a8;
        uStack_5c38._0_4_ = 0x3d9021bb;
        local_5c40 = (undefined1  [8])0x3d9021bb3d9021bb;
        uStack_5c38._4_4_ = 0x3d9021bb;
        uStack_5c30._0_4_ = 0x3d9021bb;
        uStack_5c30._4_4_ = 0x3d9021bb;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = 0x3d9021bb;
        uStack_5c28._4_4_ = 0x3d9021bb;
        auVar5 = _local_5c40;
        local_5800 = 0x3d9021bb3d9021bb;
        uStack_57f8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_57f0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_57e8 = uStack_5c28;
        local_5820 = local_5b40;
        uStack_5818 = uStack_5b38;
        uStack_5810 = uStack_5b30;
        uStack_5808 = uStack_5b28;
        local_5c40._4_4_ = local_54c0._4_4_ * 0.070376836;
        local_5c40._0_4_ = (float)local_54c0 * 0.070376836;
        uStack_5c38._0_4_ = (float)uStack_54b8 * 0.070376836;
        uStack_5c38._4_4_ = uStack_54b8._4_4_ * 0.070376836;
        uStack_5c30._0_4_ = (float)uStack_54b0 * 0.070376836;
        uStack_5c30._4_4_ = uStack_54b0._4_4_ * 0.070376836;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = (float)uStack_54a8 * 0.070376836;
        uStack_5c28._4_4_ = 0x3d9021bb;
        auVar5 = _local_5c40;
        local_5500 = local_5c40;
        uStack_54f8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_54f0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_54e8 = uStack_5c28;
        local_5520 = 0xbdebd1b8;
        uStack_551c = 0xbdebd1b8;
        uStack_5518 = 0xbdebd1b8;
        uStack_5514 = 0xbdebd1b8;
        uStack_5510 = 0xbdebd1b8;
        uStack_550c = 0xbdebd1b8;
        uStack_5508 = 0xbdebd1b8;
        uStack_5504 = 0xbdebd1b8;
        local_5c40._0_4_ = (float)local_54c0 * 0.070376836 + -0.1151461;
        local_5c40._4_4_ = local_54c0._4_4_ * 0.070376836 + -0.1151461;
        fVar168 = (float)uStack_54b8 * 0.070376836 + -0.1151461;
        fVar169 = uStack_54b8._4_4_ * 0.070376836 + -0.1151461;
        fVar170 = (float)uStack_54b0 * 0.070376836 + -0.1151461;
        fVar171 = uStack_54b0._4_4_ * 0.070376836 + -0.1151461;
        fVar172 = (float)uStack_54a8 * 0.070376836 + -0.1151461;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0xbd375ffa;
        auVar5 = _local_5c40;
        local_5840 = local_5c40;
        uStack_5838 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_5830 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_5828 = uStack_5c28;
        local_5860 = local_5b40;
        uStack_5858 = uStack_5b38;
        uStack_5850 = uStack_5b30;
        uStack_5848 = uStack_5b28;
        local_5c40._0_4_ = (float)local_5c40._0_4_ * (float)local_54c0;
        local_5c40._4_4_ = (float)local_5c40._4_4_ * local_54c0._4_4_;
        fVar168 = fVar168 * (float)uStack_54b8;
        fVar169 = fVar169 * uStack_54b8._4_4_;
        fVar170 = fVar170 * (float)uStack_54b0;
        fVar171 = fVar171 * uStack_54b0._4_4_;
        fVar172 = fVar172 * (float)uStack_54a8;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0xbd375ffa;
        auVar5 = _local_5c40;
        local_5540 = local_5c40;
        uStack_5538 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_5530 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_5528 = uStack_5c28;
        local_5560 = 0x3def251a;
        uStack_555c = 0x3def251a;
        uStack_5558 = 0x3def251a;
        uStack_5554 = 0x3def251a;
        uStack_5550 = 0x3def251a;
        uStack_554c = 0x3def251a;
        uStack_5548 = 0x3def251a;
        uStack_5544 = 0x3def251a;
        local_5c40._0_4_ = (float)local_5c40._0_4_ + 0.116769984;
        local_5c40._4_4_ = (float)local_5c40._4_4_ + 0.116769984;
        fVar168 = fVar168 + 0.116769984;
        fVar169 = fVar169 + 0.116769984;
        fVar170 = fVar170 + 0.116769984;
        fVar171 = fVar171 + 0.116769984;
        fVar172 = fVar172 + 0.116769984;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0x3d93751d;
        auVar5 = _local_5c40;
        local_5880 = local_5c40;
        uStack_5878 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_5870 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_5868 = uStack_5c28;
        local_58a0 = local_5b40;
        uStack_5898 = uStack_5b38;
        uStack_5890 = uStack_5b30;
        uStack_5888 = uStack_5b28;
        local_5c40._0_4_ = (float)local_5c40._0_4_ * (float)local_54c0;
        local_5c40._4_4_ = (float)local_5c40._4_4_ * local_54c0._4_4_;
        fVar168 = fVar168 * (float)uStack_54b8;
        fVar169 = fVar169 * uStack_54b8._4_4_;
        fVar170 = fVar170 * (float)uStack_54b0;
        fVar171 = fVar171 * uStack_54b0._4_4_;
        fVar172 = fVar172 * (float)uStack_54a8;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0x3d93751d;
        auVar5 = _local_5c40;
        local_5580 = local_5c40;
        uStack_5578 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_5570 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_5568 = uStack_5c28;
        local_55a0 = 0xbdfe5d4f;
        uStack_559c = 0xbdfe5d4f;
        uStack_5598 = 0xbdfe5d4f;
        uStack_5594 = 0xbdfe5d4f;
        uStack_5590 = 0xbdfe5d4f;
        uStack_558c = 0xbdfe5d4f;
        uStack_5588 = 0xbdfe5d4f;
        uStack_5584 = 0xbdfe5d4f;
        local_5c40._0_4_ = (float)local_5c40._0_4_ + -0.12420141;
        local_5c40._4_4_ = (float)local_5c40._4_4_ + -0.12420141;
        fVar168 = fVar168 + -0.12420141;
        fVar169 = fVar169 + -0.12420141;
        fVar170 = fVar170 + -0.12420141;
        fVar171 = fVar171 + -0.12420141;
        fVar172 = fVar172 + -0.12420141;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0xbd55d064;
        auVar5 = _local_5c40;
        local_58c0 = local_5c40;
        uStack_58b8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_58b0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_58a8 = uStack_5c28;
        local_58e0 = local_5b40;
        uStack_58d8 = uStack_5b38;
        uStack_58d0 = uStack_5b30;
        uStack_58c8 = uStack_5b28;
        local_5c40._0_4_ = (float)local_5c40._0_4_ * (float)local_54c0;
        local_5c40._4_4_ = (float)local_5c40._4_4_ * local_54c0._4_4_;
        fVar168 = fVar168 * (float)uStack_54b8;
        fVar169 = fVar169 * uStack_54b8._4_4_;
        fVar170 = fVar170 * (float)uStack_54b0;
        fVar171 = fVar171 * uStack_54b0._4_4_;
        fVar172 = fVar172 * (float)uStack_54a8;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0xbd55d064;
        auVar5 = _local_5c40;
        local_55c0 = local_5c40;
        uStack_55b8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_55b0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_55a8 = uStack_5c28;
        local_55e0 = 0x3e11e9bf;
        uStack_55dc = 0x3e11e9bf;
        uStack_55d8 = 0x3e11e9bf;
        uStack_55d4 = 0x3e11e9bf;
        uStack_55d0 = 0x3e11e9bf;
        uStack_55cc = 0x3e11e9bf;
        uStack_55c8 = 0x3e11e9bf;
        uStack_55c4 = 0x3e11e9bf;
        local_5c40._0_4_ = (float)local_5c40._0_4_ + 0.14249323;
        local_5c40._4_4_ = (float)local_5c40._4_4_ + 0.14249323;
        fVar168 = fVar168 + 0.14249323;
        fVar169 = fVar169 + 0.14249323;
        fVar170 = fVar170 + 0.14249323;
        fVar171 = fVar171 + 0.14249323;
        fVar172 = fVar172 + 0.14249323;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0x3db8eb4c;
        auVar5 = _local_5c40;
        local_5900 = local_5c40;
        uStack_58f8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_58f0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_58e8 = uStack_5c28;
        local_5920 = local_5b40;
        uStack_5918 = uStack_5b38;
        uStack_5910 = uStack_5b30;
        uStack_5908 = uStack_5b28;
        local_5c40._0_4_ = (float)local_5c40._0_4_ * (float)local_54c0;
        local_5c40._4_4_ = (float)local_5c40._4_4_ * local_54c0._4_4_;
        fVar168 = fVar168 * (float)uStack_54b8;
        fVar169 = fVar169 * uStack_54b8._4_4_;
        fVar170 = fVar170 * (float)uStack_54b0;
        fVar171 = fVar171 * uStack_54b0._4_4_;
        fVar172 = fVar172 * (float)uStack_54a8;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0x3db8eb4c;
        auVar5 = _local_5c40;
        local_5600 = local_5c40;
        uStack_55f8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_55f0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_55e8 = uStack_5c28;
        local_5620 = 0xbe2aae50;
        uStack_561c = 0xbe2aae50;
        uStack_5618 = 0xbe2aae50;
        uStack_5614 = 0xbe2aae50;
        uStack_5610 = 0xbe2aae50;
        uStack_560c = 0xbe2aae50;
        uStack_5608 = 0xbe2aae50;
        uStack_5604 = 0xbe2aae50;
        local_5c40._0_4_ = (float)local_5c40._0_4_ + -0.16668057;
        local_5c40._4_4_ = (float)local_5c40._4_4_ + -0.16668057;
        fVar168 = fVar168 + -0.16668057;
        fVar169 = fVar169 + -0.16668057;
        fVar170 = fVar170 + -0.16668057;
        fVar171 = fVar171 + -0.16668057;
        fVar172 = fVar172 + -0.16668057;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0xbd9c7154;
        auVar5 = _local_5c40;
        local_5940 = local_5c40;
        uStack_5938 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_5930 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_5928 = uStack_5c28;
        local_5960 = local_5b40;
        uStack_5958 = uStack_5b38;
        uStack_5950 = uStack_5b30;
        uStack_5948 = uStack_5b28;
        local_5c40._0_4_ = (float)local_5c40._0_4_ * (float)local_54c0;
        local_5c40._4_4_ = (float)local_5c40._4_4_ * local_54c0._4_4_;
        fVar168 = fVar168 * (float)uStack_54b8;
        fVar169 = fVar169 * uStack_54b8._4_4_;
        fVar170 = fVar170 * (float)uStack_54b0;
        fVar171 = fVar171 * uStack_54b0._4_4_;
        fVar172 = fVar172 * (float)uStack_54a8;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0xbd9c7154;
        auVar5 = _local_5c40;
        local_5640 = local_5c40;
        uStack_5638 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_5630 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_5628 = uStack_5c28;
        local_5660 = 0x3e4cceac;
        uStack_565c = 0x3e4cceac;
        uStack_5658 = 0x3e4cceac;
        uStack_5654 = 0x3e4cceac;
        uStack_5650 = 0x3e4cceac;
        uStack_564c = 0x3e4cceac;
        uStack_5648 = 0x3e4cceac;
        uStack_5644 = 0x3e4cceac;
        local_5c40._0_4_ = (float)local_5c40._0_4_ + 0.20000714;
        local_5c40._4_4_ = (float)local_5c40._4_4_ + 0.20000714;
        fVar168 = fVar168 + 0.20000714;
        fVar169 = fVar169 + 0.20000714;
        fVar170 = fVar170 + 0.20000714;
        fVar171 = fVar171 + 0.20000714;
        fVar172 = fVar172 + 0.20000714;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0x3dfd2c04;
        auVar5 = _local_5c40;
        local_5980 = local_5c40;
        uStack_5978 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_5970 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_5968 = uStack_5c28;
        local_59a0 = local_5b40;
        uStack_5998 = uStack_5b38;
        uStack_5990 = uStack_5b30;
        uStack_5988 = uStack_5b28;
        local_5c40._0_4_ = (float)local_5c40._0_4_ * (float)local_54c0;
        local_5c40._4_4_ = (float)local_5c40._4_4_ * local_54c0._4_4_;
        fVar168 = fVar168 * (float)uStack_54b8;
        fVar169 = fVar169 * uStack_54b8._4_4_;
        fVar170 = fVar170 * (float)uStack_54b0;
        fVar171 = fVar171 * uStack_54b0._4_4_;
        fVar172 = fVar172 * (float)uStack_54a8;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0x3dfd2c04;
        auVar5 = _local_5c40;
        local_5680 = local_5c40;
        uStack_5678 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_5670 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_5668 = uStack_5c28;
        local_56a0 = 0xbe7ffffc;
        uStack_569c = 0xbe7ffffc;
        uStack_5698 = 0xbe7ffffc;
        uStack_5694 = 0xbe7ffffc;
        uStack_5690 = 0xbe7ffffc;
        uStack_568c = 0xbe7ffffc;
        uStack_5688 = 0xbe7ffffc;
        uStack_5684 = 0xbe7ffffc;
        local_5c40._0_4_ = (float)local_5c40._0_4_ + -0.24999994;
        local_5c40._4_4_ = (float)local_5c40._4_4_ + -0.24999994;
        fVar168 = fVar168 + -0.24999994;
        fVar169 = fVar169 + -0.24999994;
        fVar170 = fVar170 + -0.24999994;
        fVar171 = fVar171 + -0.24999994;
        fVar172 = fVar172 + -0.24999994;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0xbe0169fa;
        auVar5 = _local_5c40;
        local_59c0 = local_5c40;
        uStack_59b8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_59b0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_59a8 = uStack_5c28;
        local_59e0 = local_5b40;
        uStack_59d8 = uStack_5b38;
        uStack_59d0 = uStack_5b30;
        uStack_59c8 = uStack_5b28;
        local_5c40._0_4_ = (float)local_5c40._0_4_ * (float)local_54c0;
        local_5c40._4_4_ = (float)local_5c40._4_4_ * local_54c0._4_4_;
        fVar168 = fVar168 * (float)uStack_54b8;
        fVar169 = fVar169 * uStack_54b8._4_4_;
        fVar170 = fVar170 * (float)uStack_54b0;
        fVar171 = fVar171 * uStack_54b0._4_4_;
        fVar172 = fVar172 * (float)uStack_54a8;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0xbe0169fa;
        auVar5 = _local_5c40;
        local_56c0 = local_5c40;
        uStack_56b8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_56b0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_56a8 = uStack_5c28;
        local_56e0 = 0x3eaaaaaa;
        uStack_56dc = 0x3eaaaaaa;
        uStack_56d8 = 0x3eaaaaaa;
        uStack_56d4 = 0x3eaaaaaa;
        uStack_56d0 = 0x3eaaaaaa;
        uStack_56cc = 0x3eaaaaaa;
        uStack_56c8 = 0x3eaaaaaa;
        uStack_56c4 = 0x3eaaaaaa;
        local_5c40._0_4_ = (float)local_5c40._0_4_ + 0.3333333;
        local_5c40._4_4_ = (float)local_5c40._4_4_ + 0.3333333;
        fVar168 = fVar168 + 0.3333333;
        fVar169 = fVar169 + 0.3333333;
        fVar170 = fVar170 + 0.3333333;
        fVar171 = fVar171 + 0.3333333;
        fVar172 = fVar172 + 0.3333333;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0x3e53eb5a;
        auVar5 = _local_5c40;
        local_5a00 = local_5c40;
        uStack_59f8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_59f0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_59e8 = uStack_5c28;
        local_5a20 = local_5b40;
        uStack_5a18 = uStack_5b38;
        uStack_5a10 = uStack_5b30;
        uStack_5a08 = uStack_5b28;
        local_5c40._0_4_ = (float)local_5c40._0_4_ * (float)local_54c0;
        local_5c40._4_4_ = (float)local_5c40._4_4_ * local_54c0._4_4_;
        fVar168 = fVar168 * (float)uStack_54b8;
        fVar169 = fVar169 * uStack_54b8._4_4_;
        fVar170 = fVar170 * (float)uStack_54b0;
        fVar171 = fVar171 * uStack_54b0._4_4_;
        fVar172 = fVar172 * (float)uStack_54a8;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0x3e53eb5a;
        auVar5 = _local_5c40;
        local_5a40 = local_5c40;
        uStack_5a38 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_5a30 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_5a28 = uStack_5c28;
        local_5a60 = CONCAT44(fStack_5c1c,local_5c20);
        uStack_5a58 = CONCAT44(fStack_5c14,fStack_5c18);
        uStack_5a50 = CONCAT44(fStack_5c0c,fStack_5c10);
        uStack_5a48 = CONCAT44(fStack_5c04,fStack_5c08);
        local_5c40._0_4_ = (float)local_5c40._0_4_ * local_5c20;
        local_5c40._4_4_ = (float)local_5c40._4_4_ * fStack_5c1c;
        fVar168 = fVar168 * fStack_5c18;
        fVar169 = fVar169 * fStack_5c14;
        fVar170 = fVar170 * fStack_5c10;
        fVar171 = fVar171 * fStack_5c0c;
        fVar172 = fVar172 * fStack_5c08;
        uStack_5c38._0_4_ = fVar168;
        uStack_5c38._4_4_ = fVar169;
        uStack_5c30._0_4_ = fVar170;
        uStack_5c30._4_4_ = fVar171;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172;
        uStack_5c28._4_4_ = 0x3e53eb5a;
        auVar5 = _local_5c40;
        local_5aa0 = 0xb95e8083;
        uStack_5a9c = 0xb95e8083;
        uStack_5a98 = 0xb95e8083;
        uStack_5a94 = 0xb95e8083;
        uStack_5a90 = 0xb95e8083;
        uStack_5a8c = 0xb95e8083;
        uStack_5a88 = 0xb95e8083;
        uStack_5a84 = 0xb95e8083;
        local_5a80._0_4_ = local_5bc0._0_4_;
        local_5a80._4_4_ = local_5bc0._4_4_;
        uStack_5a78._0_4_ = local_5bc0._8_4_;
        uStack_5a78._4_4_ = local_5bc0._12_4_;
        uStack_5a70._0_4_ = local_5bc0._16_4_;
        uStack_5a70._4_4_ = local_5bc0._20_4_;
        uStack_5a68._0_4_ = local_5bc0._24_4_;
        uStack_5a68._4_4_ = local_5bc0._28_4_;
        local_5c00._4_4_ = local_5a80._4_4_ * -0.00021219444;
        local_5c00._0_4_ = (float)local_5a80 * -0.00021219444;
        uStack_5bf8._0_4_ = (float)uStack_5a78 * -0.00021219444;
        uStack_5bf8._4_4_ = uStack_5a78._4_4_ * -0.00021219444;
        uStack_5bf0._0_4_ = (float)uStack_5a70 * -0.00021219444;
        uStack_5bf0._4_4_ = uStack_5a70._4_4_ * -0.00021219444;
        auVar164 = _local_5c00;
        uStack_5be8._0_4_ = (float)uStack_5a68 * -0.00021219444;
        uStack_5be8._4_4_ = uStack_5a68._4_4_;
        auVar4 = _local_5c00;
        local_5700 = local_5c40;
        uStack_56f8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_56f0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_56e8 = uStack_5c28;
        local_5720 = local_5c00;
        uStack_5718 = uStack_5bf8;
        uStack_5bf0 = auVar164._16_8_;
        uStack_5710 = uStack_5bf0;
        uStack_5be8 = auVar4._24_8_;
        uStack_5708 = uStack_5be8;
        local_5c40._4_4_ = (float)local_5c40._4_4_ + local_5a80._4_4_ * -0.00021219444;
        local_5c40._0_4_ = (float)local_5c40._0_4_ + (float)local_5a80 * -0.00021219444;
        uStack_5c38._0_4_ = fVar168 + (float)uStack_5a78 * -0.00021219444;
        uStack_5c38._4_4_ = fVar169 + uStack_5a78._4_4_ * -0.00021219444;
        uStack_5c30._0_4_ = fVar170 + (float)uStack_5a70 * -0.00021219444;
        uStack_5c30._4_4_ = fVar171 + uStack_5a70._4_4_ * -0.00021219444;
        auVar159 = _local_5c40;
        uStack_5c28._0_4_ = fVar172 + (float)uStack_5a68 * -0.00021219444;
        uStack_5c28._4_4_ = uStack_5a68._4_4_ + 0.20695248;
        auVar5 = _local_5c40;
        local_5ac0 = CONCAT44(fStack_5c1c,local_5c20);
        uStack_5ab8 = CONCAT44(fStack_5c14,fStack_5c18);
        uStack_5ab0 = CONCAT44(fStack_5c0c,fStack_5c10);
        uStack_5aa8 = CONCAT44(fStack_5c04,fStack_5c08);
        local_5ae0 = 0x3f000000;
        uStack_5adc = 0x3f000000;
        uStack_5ad8 = 0x3f000000;
        uStack_5ad4 = 0x3f000000;
        uStack_5ad0 = 0x3f000000;
        uStack_5acc = 0x3f000000;
        uStack_5ac8 = 0x3f000000;
        uStack_5ac4 = 0x3f000000;
        local_5c00._4_4_ = fStack_5c1c * 0.5;
        local_5c00._0_4_ = local_5c20 * 0.5;
        uStack_5bf8._0_4_ = fStack_5c18 * 0.5;
        uStack_5bf8._4_4_ = fStack_5c14 * 0.5;
        uStack_5bf0._0_4_ = fStack_5c10 * 0.5;
        uStack_5bf0._4_4_ = fStack_5c0c * 0.5;
        auVar164 = _local_5c00;
        uStack_5be8._0_4_ = fStack_5c08 * 0.5;
        uStack_5be8._4_4_ = fStack_5c04;
        auVar4 = _local_5c00;
        local_32e0 = local_5c40;
        uStack_32d8 = uStack_5c38;
        uStack_5c30 = auVar159._16_8_;
        uStack_32d0 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uStack_32c8 = uStack_5c28;
        local_3300 = local_5c00;
        uStack_32f8 = uStack_5bf8;
        uStack_5bf0 = auVar164._16_8_;
        uStack_32f0 = uStack_5bf0;
        uStack_5be8 = auVar4._24_8_;
        uStack_32e8 = uStack_5be8;
        auVar52._16_8_ = uStack_5c30;
        auVar52._0_16_ = _local_5c40;
        auVar52._24_8_ = uStack_5c28;
        auVar51._16_8_ = uStack_5bf0;
        auVar51._0_16_ = _local_5c00;
        auVar51._24_8_ = uStack_5be8;
        auVar5 = vsubps_avx(auVar52,auVar51);
        local_5b00 = local_5bc0;
        uStack_5af8 = uStack_5bb8;
        uStack_5af0 = uStack_5bb0;
        uStack_5ae8 = uStack_5ba8;
        local_5b20 = 0x3f318000;
        uStack_5b1c = 0x3f318000;
        uStack_5b18 = 0x3f318000;
        uStack_5b14 = 0x3f318000;
        uStack_5b10 = 0x3f318000;
        uStack_5b0c = 0x3f318000;
        uStack_5b08 = 0x3f318000;
        uStack_5b04 = 0x3f318000;
        local_5c00._4_4_ = local_5a80._4_4_ * 0.6933594;
        local_5c00._0_4_ = (float)local_5a80 * 0.6933594;
        uStack_5bf8._0_4_ = (float)uStack_5a78 * 0.6933594;
        uStack_5bf8._4_4_ = uStack_5a78._4_4_ * 0.6933594;
        uStack_5bf0._0_4_ = (float)uStack_5a70 * 0.6933594;
        uStack_5bf0._4_4_ = uStack_5a70._4_4_ * 0.6933594;
        auVar159 = _local_5c00;
        uStack_5be8._0_4_ = (float)uStack_5a68 * 0.6933594;
        uStack_5be8._4_4_ = uStack_5a68._4_4_;
        auVar47 = _local_5c00;
        local_5740 = local_5b40;
        uStack_5738 = uStack_5b38;
        uStack_5730 = uStack_5b30;
        uStack_5728 = uStack_5b28;
        local_5c40 = auVar5._0_8_;
        uVar24 = local_5c40;
        uStack_5c38 = auVar5._8_8_;
        uVar25 = uStack_5c38;
        uStack_5c30 = auVar5._16_8_;
        uVar26 = uStack_5c30;
        uStack_5c28 = auVar5._24_8_;
        uVar27 = uStack_5c28;
        local_5760._0_4_ = auVar5._0_4_;
        local_5760._4_4_ = auVar5._4_4_;
        uStack_5758._0_4_ = auVar5._8_4_;
        uStack_5758._4_4_ = auVar5._12_4_;
        uStack_5750._0_4_ = auVar5._16_4_;
        uStack_5750._4_4_ = auVar5._20_4_;
        uStack_5748._0_4_ = auVar5._24_4_;
        uStack_5748._4_4_ = auVar5._28_4_;
        local_5b40._4_4_ = local_54c0._4_4_ + local_5760._4_4_;
        local_5b40._0_4_ = (float)local_54c0 + (float)local_5760;
        uStack_5b38._0_4_ = (float)uStack_54b8 + (float)uStack_5758;
        uStack_5b38._4_4_ = uStack_54b8._4_4_ + uStack_5758._4_4_;
        uStack_5b30._0_4_ = (float)uStack_54b0 + (float)uStack_5750;
        uStack_5b30._4_4_ = uStack_54b0._4_4_ + uStack_5750._4_4_;
        auVar164 = _local_5b40;
        uStack_5b28._0_4_ = (float)uStack_54a8 + (float)uStack_5748;
        uStack_5b28._4_4_ = fStack_5c04 + uStack_5748._4_4_;
        auVar5 = _local_5b40;
        local_5780 = local_5b40;
        uStack_5778 = uStack_5b38;
        uStack_5b30 = auVar164._16_8_;
        uStack_5770 = uStack_5b30;
        uStack_5b28 = auVar5._24_8_;
        uStack_5768 = uStack_5b28;
        local_57a0 = local_5c00;
        uStack_5798 = uStack_5bf8;
        uStack_5bf0 = auVar159._16_8_;
        uStack_5790 = uStack_5bf0;
        uStack_5be8 = auVar47._24_8_;
        uStack_5788 = uStack_5be8;
        local_5b40._4_4_ = local_54c0._4_4_ + local_5760._4_4_ + local_5a80._4_4_ * 0.6933594;
        local_5b40._0_4_ = (float)local_54c0 + (float)local_5760 + (float)local_5a80 * 0.6933594;
        uStack_5b38._0_4_ = (float)uStack_54b8 + (float)uStack_5758 + (float)uStack_5a78 * 0.6933594
        ;
        uStack_5b38._4_4_ = uStack_54b8._4_4_ + uStack_5758._4_4_ + uStack_5a78._4_4_ * 0.6933594;
        uStack_5b30._0_4_ = (float)uStack_54b0 + (float)uStack_5750 + (float)uStack_5a70 * 0.6933594
        ;
        uStack_5b30._4_4_ = uStack_54b0._4_4_ + uStack_5750._4_4_ + uStack_5a70._4_4_ * 0.6933594;
        auVar159 = _local_5b40;
        uStack_5b28._0_4_ = (float)uStack_54a8 + (float)uStack_5748 + (float)uStack_5a68 * 0.6933594
        ;
        uStack_5b28._4_4_ = fStack_5c04 + uStack_5748._4_4_ + uStack_5a68._4_4_;
        auVar48 = _local_5b40;
        local_2ba0 = local_5b40;
        uStack_2b98 = uStack_5b38;
        uStack_5b30 = auVar159._16_8_;
        uStack_2b90 = uStack_5b30;
        uStack_5b28 = auVar48._24_8_;
        uStack_2b88 = uStack_5b28;
        local_2bc0 = local_5ba0._0_8_;
        uStack_2bb8 = local_5ba0._8_8_;
        uStack_2bb0 = local_5ba0._16_8_;
        uStack_2ba8 = local_5ba0._24_8_;
        auVar75._16_8_ = uStack_5b30;
        auVar75._0_16_ = _local_5b40;
        auVar75._24_8_ = uStack_5b28;
        _local_5c40 = vpor_avx2(auVar75,local_5ba0);
        local_6140 = local_5c40;
        uStack_6138 = uStack_5c38;
        uStack_6130 = uStack_5c30;
        uStack_6128 = uStack_5c28;
        local_44d4 = 0x3f800000;
        local_2160 = 0x3f800000;
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        local_2180 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        auStack_2170 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        local_6160 = local_2180._0_8_;
        uStack_6158 = local_2180._8_8_;
        uStack_6150 = auStack_2170._0_8_;
        uStack_6148 = auStack_2170._8_8_;
        local_44d8 = 0x40000000;
        local_2110 = 0x40000000;
        auVar1 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x20);
        local_2140 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x30);
        auVar1 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x20);
        auStack_2130 = vinsertps_avx(auVar1,ZEXT416(0x40000000),0x30);
        local_6180 = local_2140._0_8_;
        uStack_6178 = local_2140._8_8_;
        uStack_6170 = auStack_2130._0_8_;
        uStack_6168 = auStack_2130._8_8_;
        local_6100._0_4_ = local_5c40._0_4_;
        local_6100._4_4_ = local_5c40._4_4_;
        uStack_60f8._0_4_ = local_5c40._8_4_;
        uStack_60f8._4_4_ = local_5c40._12_4_;
        uStack_60f0._0_4_ = local_5c40._16_4_;
        uStack_60f0._4_4_ = local_5c40._20_4_;
        uStack_60e8._0_4_ = local_5c40._24_4_;
        uStack_60e8._4_4_ = local_5c40._28_4_;
        uStack_43c4 = uStack_60e8._4_4_;
        local_6120._0_4_ = local_2140._0_4_;
        local_6120._4_4_ = local_2140._4_4_;
        uStack_6118._0_4_ = local_2140._8_4_;
        uStack_6118._4_4_ = local_2140._12_4_;
        uStack_6110._0_4_ = auStack_2130._0_4_;
        uStack_6110._4_4_ = auStack_2130._4_4_;
        uStack_6108._0_4_ = auStack_2130._8_4_;
        local_43e0 = (float)local_6100 * (float)local_6120;
        fStack_43dc = local_6100._4_4_ * local_6120._4_4_;
        fStack_43d8 = (float)uStack_60f8 * (float)uStack_6118;
        fStack_43d4 = uStack_60f8._4_4_ * uStack_6118._4_4_;
        fStack_43d0 = (float)uStack_60f0 * (float)uStack_6110;
        fStack_43cc = uStack_60f0._4_4_ * uStack_6110._4_4_;
        fStack_43c8 = (float)uStack_60e8 * (float)uStack_6108;
        local_3d84 = 0x3f800000;
        local_22a0 = 0x3f800000;
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        local_22c0 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
        auStack_22b0 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
        local_4400._0_4_ = local_22c0._0_4_;
        local_43a0 = (float)local_4400;
        local_4400._4_4_ = local_22c0._4_4_;
        fStack_439c = local_4400._4_4_;
        uStack_43f8._0_4_ = local_22c0._8_4_;
        fStack_4398 = (float)uStack_43f8;
        uStack_43f8._4_4_ = local_22c0._12_4_;
        fStack_4394 = uStack_43f8._4_4_;
        uStack_43f0._0_4_ = auStack_22b0._0_4_;
        fStack_4390 = (float)uStack_43f0;
        uStack_43f0._4_4_ = auStack_22b0._4_4_;
        fStack_438c = uStack_43f0._4_4_;
        uStack_43e8._0_4_ = auStack_22b0._8_4_;
        fStack_4388 = (float)uStack_43e8;
        uStack_43e8._4_4_ = auStack_22b0._12_4_;
        fStack_4384 = uStack_43e8._4_4_;
        local_3140 = ZEXT1632(ZEXT816(0) << 0x40);
        local_34a0 = 0;
        uStack_3498 = 0;
        uStack_3490 = 0;
        uStack_3488 = 0;
        local_34c0 = CONCAT44(fStack_43dc,local_43e0);
        uStack_34b8 = CONCAT44(fStack_43d4,fStack_43d8);
        uStack_34b0 = CONCAT44(fStack_43cc,fStack_43d0);
        uStack_34a8 = CONCAT44(uStack_60e8._4_4_,fStack_43c8);
        auVar46._8_8_ = uStack_34b8;
        auVar46._0_8_ = local_34c0;
        auVar46._16_8_ = uStack_34b0;
        auVar46._24_8_ = uStack_34a8;
        auVar5 = vsubps_avx(ZEXT832(0),auVar46);
        local_2740 = 0x7f0000007f;
        uStack_2738 = 0x7f0000007f;
        uStack_2730 = 0x7f0000007f;
        uStack_2728 = 0x7f0000007f;
        local_4300 = 0x3f800000;
        uStack_42fc = 0x3f800000;
        uStack_42f8 = 0x3f800000;
        uStack_42f4 = 0x3f800000;
        uStack_42f0 = 0x3f800000;
        uStack_42ec = 0x3f800000;
        uStack_42e8 = 0x3f800000;
        uStack_42e4 = 0x3f800000;
        local_4280._0_8_ = auVar5._0_8_;
        local_28a0 = local_4280._0_8_;
        local_4280._8_8_ = auVar5._8_8_;
        uStack_2898 = local_4280._8_8_;
        local_4280._16_8_ = auVar5._16_8_;
        uStack_2890 = local_4280._16_8_;
        local_4280._24_8_ = auVar5._24_8_;
        uStack_2888 = local_4280._24_8_;
        local_28c0 = 0x42b0c0a5;
        uStack_28bc = 0x42b0c0a5;
        uStack_28b8 = 0x42b0c0a5;
        uStack_28b4 = 0x42b0c0a5;
        uStack_28b0 = 0x42b0c0a5;
        uStack_28ac = 0x42b0c0a5;
        uStack_28a8 = 0x42b0c0a5;
        uStack_28a4 = 0x42b0c0a5;
        auVar82._8_4_ = 0x42b0c0a5;
        auVar82._0_8_ = 0x42b0c0a542b0c0a5;
        auVar82._12_4_ = 0x42b0c0a5;
        auVar82._16_4_ = 0x42b0c0a5;
        auVar82._20_4_ = 0x42b0c0a5;
        auVar82._24_4_ = 0x42b0c0a5;
        auVar82._28_4_ = 0x42b0c0a5;
        auVar5 = vminps_avx(auVar5,auVar82);
        local_4280._0_8_ = auVar5._0_8_;
        local_3020 = local_4280._0_8_;
        local_4280._8_8_ = auVar5._8_8_;
        uStack_3018 = local_4280._8_8_;
        local_4280._16_8_ = auVar5._16_8_;
        uStack_3010 = local_4280._16_8_;
        local_4280._24_8_ = auVar5._24_8_;
        uStack_3008 = local_4280._24_8_;
        local_3040 = 0xc2b0c0a5;
        uStack_303c = 0xc2b0c0a5;
        uStack_3038 = 0xc2b0c0a5;
        uStack_3034 = 0xc2b0c0a5;
        uStack_3030 = 0xc2b0c0a5;
        uStack_302c = 0xc2b0c0a5;
        uStack_3028 = 0xc2b0c0a5;
        uStack_3024 = 0xc2b0c0a5;
        auVar60._8_4_ = 0xc2b0c0a5;
        auVar60._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar60._12_4_ = 0xc2b0c0a5;
        auVar60._16_4_ = 0xc2b0c0a5;
        auVar60._20_4_ = 0xc2b0c0a5;
        auVar60._24_4_ = 0xc2b0c0a5;
        auVar60._28_4_ = 0xc2b0c0a5;
        auVar4 = vmaxps_avx(auVar5,auVar60);
        local_4280._0_8_ = auVar4._0_8_;
        uVar28 = local_4280._0_8_;
        local_4280._8_8_ = auVar4._8_8_;
        uVar29 = local_4280._8_8_;
        local_4280._16_8_ = auVar4._16_8_;
        uVar30 = local_4280._16_8_;
        local_4280._24_8_ = auVar4._24_8_;
        uVar31 = local_4280._24_8_;
        local_3fe0 = 0x3fb8aa3b;
        uStack_3fdc = 0x3fb8aa3b;
        uStack_3fd8 = 0x3fb8aa3b;
        uStack_3fd4 = 0x3fb8aa3b;
        uStack_3fd0 = 0x3fb8aa3b;
        uStack_3fcc = 0x3fb8aa3b;
        uStack_3fc8 = 0x3fb8aa3b;
        uStack_3fc4 = 0x3fb8aa3b;
        local_3fc0._0_4_ = auVar4._0_4_;
        local_3fc0._4_4_ = auVar4._4_4_;
        uStack_3fb8._0_4_ = auVar4._8_4_;
        uStack_3fb8._4_4_ = auVar4._12_4_;
        uStack_3fb0._0_4_ = auVar4._16_4_;
        uStack_3fb0._4_4_ = auVar4._20_4_;
        uStack_3fa8._0_4_ = auVar4._24_4_;
        uStack_3fa8._4_4_ = auVar4._28_4_;
        local_42c0._4_4_ = local_3fc0._4_4_ * 1.442695;
        local_42c0._0_4_ = (float)local_3fc0 * 1.442695;
        uStack_42b8._0_4_ = (float)uStack_3fb8 * 1.442695;
        uStack_42b8._4_4_ = uStack_3fb8._4_4_ * 1.442695;
        uStack_42b0._0_4_ = (float)uStack_3fb0 * 1.442695;
        uStack_42b0._4_4_ = uStack_3fb0._4_4_ * 1.442695;
        auVar159 = _local_42c0;
        uStack_42a8._0_4_ = (float)uStack_3fa8 * 1.442695;
        uStack_42a8._4_4_ = uStack_3fa8._4_4_;
        auVar5 = _local_42c0;
        local_3dc0 = local_42c0;
        uStack_3db8 = uStack_42b8;
        uStack_42b0 = auVar159._16_8_;
        uStack_3db0 = uStack_42b0;
        uStack_42a8 = auVar5._24_8_;
        uStack_3da8 = uStack_42a8;
        local_3de0 = 0x3f000000;
        uStack_3ddc = 0x3f000000;
        uStack_3dd8 = 0x3f000000;
        uStack_3dd4 = 0x3f000000;
        uStack_3dd0 = 0x3f000000;
        uStack_3dcc = 0x3f000000;
        uStack_3dc8 = 0x3f000000;
        uStack_3dc4 = 0x3f000000;
        local_42c0._4_4_ = local_3fc0._4_4_ * 1.442695 + 0.5;
        local_42c0._0_4_ = (float)local_3fc0 * 1.442695 + 0.5;
        uStack_42b8._0_4_ = (float)uStack_3fb8 * 1.442695 + 0.5;
        uStack_42b8._4_4_ = uStack_3fb8._4_4_ * 1.442695 + 0.5;
        uStack_42b0._0_4_ = (float)uStack_3fb0 * 1.442695 + 0.5;
        uStack_42b0._4_4_ = uStack_3fb0._4_4_ * 1.442695 + 0.5;
        uStack_42a8._0_4_ = (float)uStack_3fa8 * 1.442695 + 0.5;
        uStack_42a8._4_4_ = uStack_3fa8._4_4_ + 0.5;
        auVar6 = vroundps_avx(_local_42c0,1);
        auVar5 = vcmpps_avx(_local_42c0,auVar6,1);
        local_4320._0_8_ = auVar5._0_8_;
        local_2de0 = local_4320._0_8_;
        local_4320._8_8_ = auVar5._8_8_;
        uStack_2dd8 = local_4320._8_8_;
        local_4320._16_8_ = auVar5._16_8_;
        uStack_2dd0 = local_4320._16_8_;
        local_4320._24_8_ = auVar5._24_8_;
        uStack_2dc8 = local_4320._24_8_;
        local_2e00 = 0x3f8000003f800000;
        uStack_2df8 = 0x3f8000003f800000;
        uStack_2df0 = 0x3f8000003f800000;
        uStack_2de8 = 0x3f8000003f800000;
        auVar68._8_8_ = 0x3f8000003f800000;
        auVar68._0_8_ = 0x3f8000003f800000;
        auVar68._16_8_ = 0x3f8000003f800000;
        auVar68._24_8_ = 0x3f8000003f800000;
        local_4320 = vpand_avx2(auVar5,auVar68);
        local_42a0 = auVar6._0_8_;
        local_34e0 = local_42a0;
        uStack_4298 = auVar6._8_8_;
        uStack_34d8 = uStack_4298;
        uStack_4290 = auVar6._16_8_;
        uStack_34d0 = uStack_4290;
        uStack_4288 = auVar6._24_8_;
        uStack_34c8 = uStack_4288;
        local_3500 = local_4320._0_8_;
        uStack_34f8 = local_4320._8_8_;
        uStack_34f0 = local_4320._16_8_;
        uStack_34e8 = local_4320._24_8_;
        _local_42c0 = vsubps_avx(auVar6,local_4320);
        local_4020 = 0x3f318000;
        uStack_401c = 0x3f318000;
        uStack_4018 = 0x3f318000;
        uStack_4014 = 0x3f318000;
        uStack_4010 = 0x3f318000;
        uStack_400c = 0x3f318000;
        uStack_4008 = 0x3f318000;
        uStack_4004 = 0x3f318000;
        local_4000._0_4_ = local_42c0._0_4_;
        local_4000._4_4_ = local_42c0._4_4_;
        uStack_3ff8._0_4_ = local_42c0._8_4_;
        uStack_3ff8._4_4_ = local_42c0._12_4_;
        uStack_3ff0._0_4_ = local_42c0._16_4_;
        uStack_3ff0._4_4_ = local_42c0._20_4_;
        uStack_3fe8._0_4_ = local_42c0._24_4_;
        uStack_3fe8._4_4_ = local_42c0._28_4_;
        local_42a0._4_4_ = local_4000._4_4_ * 0.6933594;
        local_42a0._0_4_ = (float)local_4000 * 0.6933594;
        uStack_4298._0_4_ = (float)uStack_3ff8 * 0.6933594;
        uStack_4298._4_4_ = uStack_3ff8._4_4_ * 0.6933594;
        uStack_4290._0_4_ = (float)uStack_3ff0 * 0.6933594;
        uStack_4290._4_4_ = uStack_3ff0._4_4_ * 0.6933594;
        auVar159 = _local_42a0;
        uStack_4288._0_4_ = (float)uStack_3fe8 * 0.6933594;
        uStack_4288._4_4_ = uStack_3fe8._4_4_;
        auVar46 = _local_42a0;
        local_4040 = local_42c0;
        uStack_4038 = uStack_42b8;
        uStack_4030 = uStack_42b0;
        uStack_4028 = uStack_42a8;
        local_4060 = 0xb95e8083;
        uStack_405c = 0xb95e8083;
        uStack_4058 = 0xb95e8083;
        uStack_4054 = 0xb95e8083;
        uStack_4050 = 0xb95e8083;
        uStack_404c = 0xb95e8083;
        uStack_4048 = 0xb95e8083;
        uStack_4044 = 0xb95e8083;
        local_3520 = local_4280._0_8_;
        uStack_3518 = local_4280._8_8_;
        uStack_3510 = local_4280._16_8_;
        uStack_3508 = local_4280._24_8_;
        local_3540 = local_42a0;
        uStack_3538 = uStack_4298;
        uStack_4290 = auVar159._16_8_;
        uStack_3530 = uStack_4290;
        uStack_4288 = auVar46._24_8_;
        uStack_3528 = uStack_4288;
        auVar45._16_8_ = uStack_4290;
        auVar45._0_16_ = _local_42a0;
        auVar45._24_8_ = uStack_4288;
        auVar5 = vsubps_avx(auVar4,auVar45);
        local_4280._0_8_ = auVar5._0_8_;
        local_3560 = local_4280._0_8_;
        local_4280._8_8_ = auVar5._8_8_;
        uStack_3558 = local_4280._8_8_;
        local_4280._16_8_ = auVar5._16_8_;
        uStack_3550 = local_4280._16_8_;
        local_4280._24_8_ = auVar5._24_8_;
        uStack_3548 = local_4280._24_8_;
        local_3580 = CONCAT44(local_4000._4_4_ * -0.00021219444,(float)local_4000 * -0.00021219444);
        uStack_3578 = CONCAT44(uStack_3ff8._4_4_ * -0.00021219444,
                               (float)uStack_3ff8 * -0.00021219444);
        uStack_3570 = CONCAT44(uStack_3ff0._4_4_ * -0.00021219444,
                               (float)uStack_3ff0 * -0.00021219444);
        uStack_3568 = CONCAT44(uStack_3fe8._4_4_,(float)uStack_3fe8 * -0.00021219444);
        auVar44._8_8_ = uStack_3578;
        auVar44._0_8_ = local_3580;
        auVar44._16_8_ = uStack_3570;
        auVar44._24_8_ = uStack_3568;
        local_4280 = vsubps_avx(auVar5,auVar44);
        local_40a0 = local_4280._0_8_;
        uStack_4098 = local_4280._8_8_;
        uStack_4090 = local_4280._16_8_;
        uStack_4088 = local_4280._24_8_;
        local_4080._0_4_ = local_4280._0_4_;
        local_4080._4_4_ = local_4280._4_4_;
        uStack_4078._0_4_ = local_4280._8_4_;
        uStack_4078._4_4_ = local_4280._12_4_;
        uStack_4070._0_4_ = local_4280._16_4_;
        uStack_4070._4_4_ = local_4280._20_4_;
        uStack_4068._0_4_ = local_4280._24_4_;
        uStack_4068._4_4_ = local_4280._28_4_;
        fStack_4324 = uStack_4068._4_4_;
        local_4340 = (float)local_4080 * (float)local_4080;
        fStack_433c = local_4080._4_4_ * local_4080._4_4_;
        fStack_4338 = (float)uStack_4078 * (float)uStack_4078;
        fStack_4334 = uStack_4078._4_4_ * uStack_4078._4_4_;
        fStack_4330 = (float)uStack_4070 * (float)uStack_4070;
        fStack_432c = uStack_4070._4_4_ * uStack_4070._4_4_;
        fStack_4328 = (float)uStack_4068 * (float)uStack_4068;
        local_40c0 = 0x3950696739506967;
        uStack_40b8 = 0x3950696739506967;
        uStack_40b0 = 0x3950696739506967;
        uStack_40a8 = 0x3950696739506967;
        local_40e0 = local_4280._0_8_;
        uStack_40d8 = local_4280._8_8_;
        uStack_40d0 = local_4280._16_8_;
        uStack_40c8 = local_4280._24_8_;
        local_3e00 = CONCAT44(local_4080._4_4_ * 0.00019875691,(float)local_4080 * 0.00019875691);
        uStack_3df8 = CONCAT44(uStack_4078._4_4_ * 0.00019875691,(float)uStack_4078 * 0.00019875691)
        ;
        uStack_3df0 = CONCAT44(uStack_4070._4_4_ * 0.00019875691,(float)uStack_4070 * 0.00019875691)
        ;
        uStack_3de8 = CONCAT44(0x39506967,(float)uStack_4068 * 0.00019875691);
        local_3e20 = 0x3ab743ce;
        uStack_3e1c = 0x3ab743ce;
        uStack_3e18 = 0x3ab743ce;
        uStack_3e14 = 0x3ab743ce;
        uStack_3e10 = 0x3ab743ce;
        uStack_3e0c = 0x3ab743ce;
        uStack_3e08 = 0x3ab743ce;
        uStack_3e04 = 0x3ab743ce;
        local_4360 = (float)local_4080 * 0.00019875691 + 0.0013981999;
        fStack_435c = local_4080._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_4358 = (float)uStack_4078 * 0.00019875691 + 0.0013981999;
        fStack_4354 = uStack_4078._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_4350 = (float)uStack_4070 * 0.00019875691 + 0.0013981999;
        fStack_434c = uStack_4070._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_4348 = (float)uStack_4068 * 0.00019875691 + 0.0013981999;
        local_4100 = CONCAT44(fStack_435c,local_4360);
        uStack_40f8 = CONCAT44(fStack_4354,fStack_4358);
        uStack_40f0 = CONCAT44(fStack_434c,fStack_4350);
        uStack_40e8 = CONCAT44(0x3ad150fb,fStack_4348);
        local_4120 = local_4280._0_8_;
        uStack_4118 = local_4280._8_8_;
        uStack_4110 = local_4280._16_8_;
        uStack_4108 = local_4280._24_8_;
        local_4360 = (float)local_4080 * local_4360;
        fStack_435c = local_4080._4_4_ * fStack_435c;
        fStack_4358 = (float)uStack_4078 * fStack_4358;
        fStack_4354 = uStack_4078._4_4_ * fStack_4354;
        fStack_4350 = (float)uStack_4070 * fStack_4350;
        fStack_434c = uStack_4070._4_4_ * fStack_434c;
        fStack_4348 = (float)uStack_4068 * fStack_4348;
        local_3e40 = CONCAT44(fStack_435c,local_4360);
        uStack_3e38 = CONCAT44(fStack_4354,fStack_4358);
        uStack_3e30 = CONCAT44(fStack_434c,fStack_4350);
        uStack_3e28 = CONCAT44(0x3ad150fb,fStack_4348);
        local_3e60 = 0x3c088908;
        uStack_3e5c = 0x3c088908;
        uStack_3e58 = 0x3c088908;
        uStack_3e54 = 0x3c088908;
        uStack_3e50 = 0x3c088908;
        uStack_3e4c = 0x3c088908;
        uStack_3e48 = 0x3c088908;
        uStack_3e44 = 0x3c088908;
        local_4360 = local_4360 + 0.008333452;
        fStack_435c = fStack_435c + 0.008333452;
        fStack_4358 = fStack_4358 + 0.008333452;
        fStack_4354 = fStack_4354 + 0.008333452;
        fStack_4350 = fStack_4350 + 0.008333452;
        fStack_434c = fStack_434c + 0.008333452;
        fStack_4348 = fStack_4348 + 0.008333452;
        local_4140 = CONCAT44(fStack_435c,local_4360);
        uStack_4138 = CONCAT44(fStack_4354,fStack_4358);
        uStack_4130 = CONCAT44(fStack_434c,fStack_4350);
        uStack_4128 = CONCAT44(0x3c22b327,fStack_4348);
        local_4160 = local_4280._0_8_;
        uStack_4158 = local_4280._8_8_;
        uStack_4150 = local_4280._16_8_;
        uStack_4148 = local_4280._24_8_;
        local_4360 = local_4360 * (float)local_4080;
        fStack_435c = fStack_435c * local_4080._4_4_;
        fStack_4358 = fStack_4358 * (float)uStack_4078;
        fStack_4354 = fStack_4354 * uStack_4078._4_4_;
        fStack_4350 = fStack_4350 * (float)uStack_4070;
        fStack_434c = fStack_434c * uStack_4070._4_4_;
        fStack_4348 = fStack_4348 * (float)uStack_4068;
        local_3e80 = CONCAT44(fStack_435c,local_4360);
        uStack_3e78 = CONCAT44(fStack_4354,fStack_4358);
        uStack_3e70 = CONCAT44(fStack_434c,fStack_4350);
        uStack_3e68 = CONCAT44(0x3c22b327,fStack_4348);
        local_3ea0 = 0x3d2aa9c1;
        uStack_3e9c = 0x3d2aa9c1;
        uStack_3e98 = 0x3d2aa9c1;
        uStack_3e94 = 0x3d2aa9c1;
        uStack_3e90 = 0x3d2aa9c1;
        uStack_3e8c = 0x3d2aa9c1;
        uStack_3e88 = 0x3d2aa9c1;
        uStack_3e84 = 0x3d2aa9c1;
        local_4360 = local_4360 + 0.041665796;
        fStack_435c = fStack_435c + 0.041665796;
        fStack_4358 = fStack_4358 + 0.041665796;
        fStack_4354 = fStack_4354 + 0.041665796;
        fStack_4350 = fStack_4350 + 0.041665796;
        fStack_434c = fStack_434c + 0.041665796;
        fStack_4348 = fStack_4348 + 0.041665796;
        local_4180 = CONCAT44(fStack_435c,local_4360);
        uStack_4178 = CONCAT44(fStack_4354,fStack_4358);
        uStack_4170 = CONCAT44(fStack_434c,fStack_4350);
        uStack_4168 = CONCAT44(0x3d53568b,fStack_4348);
        local_41a0 = local_4280._0_8_;
        uStack_4198 = local_4280._8_8_;
        uStack_4190 = local_4280._16_8_;
        uStack_4188 = local_4280._24_8_;
        local_4360 = local_4360 * (float)local_4080;
        fStack_435c = fStack_435c * local_4080._4_4_;
        fStack_4358 = fStack_4358 * (float)uStack_4078;
        fStack_4354 = fStack_4354 * uStack_4078._4_4_;
        fStack_4350 = fStack_4350 * (float)uStack_4070;
        fStack_434c = fStack_434c * uStack_4070._4_4_;
        fStack_4348 = fStack_4348 * (float)uStack_4068;
        local_3ec0 = CONCAT44(fStack_435c,local_4360);
        uStack_3eb8 = CONCAT44(fStack_4354,fStack_4358);
        uStack_3eb0 = CONCAT44(fStack_434c,fStack_4350);
        uStack_3ea8 = CONCAT44(0x3d53568b,fStack_4348);
        local_3ee0 = 0x3e2aaaaa;
        uStack_3edc = 0x3e2aaaaa;
        uStack_3ed8 = 0x3e2aaaaa;
        uStack_3ed4 = 0x3e2aaaaa;
        uStack_3ed0 = 0x3e2aaaaa;
        uStack_3ecc = 0x3e2aaaaa;
        uStack_3ec8 = 0x3e2aaaaa;
        uStack_3ec4 = 0x3e2aaaaa;
        local_4360 = local_4360 + 0.16666666;
        fStack_435c = fStack_435c + 0.16666666;
        fStack_4358 = fStack_4358 + 0.16666666;
        fStack_4354 = fStack_4354 + 0.16666666;
        fStack_4350 = fStack_4350 + 0.16666666;
        fStack_434c = fStack_434c + 0.16666666;
        fStack_4348 = fStack_4348 + 0.16666666;
        local_41c0 = CONCAT44(fStack_435c,local_4360);
        uStack_41b8 = CONCAT44(fStack_4354,fStack_4358);
        uStack_41b0 = CONCAT44(fStack_434c,fStack_4350);
        uStack_41a8 = CONCAT44(0x3e5f804d,fStack_4348);
        local_41e0 = local_4280._0_8_;
        uStack_41d8 = local_4280._8_8_;
        uStack_41d0 = local_4280._16_8_;
        uStack_41c8 = local_4280._24_8_;
        local_4360 = local_4360 * (float)local_4080;
        fStack_435c = fStack_435c * local_4080._4_4_;
        fStack_4358 = fStack_4358 * (float)uStack_4078;
        fStack_4354 = fStack_4354 * uStack_4078._4_4_;
        fStack_4350 = fStack_4350 * (float)uStack_4070;
        fStack_434c = fStack_434c * uStack_4070._4_4_;
        fStack_4348 = fStack_4348 * (float)uStack_4068;
        local_3f00 = CONCAT44(fStack_435c,local_4360);
        uStack_3ef8 = CONCAT44(fStack_4354,fStack_4358);
        uStack_3ef0 = CONCAT44(fStack_434c,fStack_4350);
        uStack_3ee8 = CONCAT44(0x3e5f804d,fStack_4348);
        local_3f20 = 0x3f000000;
        uStack_3f1c = 0x3f000000;
        uStack_3f18 = 0x3f000000;
        uStack_3f14 = 0x3f000000;
        uStack_3f10 = 0x3f000000;
        uStack_3f0c = 0x3f000000;
        uStack_3f08 = 0x3f000000;
        uStack_3f04 = 0x3f000000;
        local_4360 = local_4360 + 0.5;
        fStack_435c = fStack_435c + 0.5;
        fStack_4358 = fStack_4358 + 0.5;
        fStack_4354 = fStack_4354 + 0.5;
        fStack_4350 = fStack_4350 + 0.5;
        fStack_434c = fStack_434c + 0.5;
        fStack_4348 = fStack_4348 + 0.5;
        local_4200 = CONCAT44(fStack_435c,local_4360);
        uStack_41f8 = CONCAT44(fStack_4354,fStack_4358);
        uStack_41f0 = CONCAT44(fStack_434c,fStack_4350);
        uStack_41e8 = CONCAT44(0x3f37e013,fStack_4348);
        local_4220 = CONCAT44(fStack_433c,local_4340);
        uStack_4218 = CONCAT44(fStack_4334,fStack_4338);
        uStack_4210 = CONCAT44(fStack_432c,fStack_4330);
        uStack_4208 = CONCAT44(uStack_4068._4_4_,fStack_4328);
        local_4360 = local_4360 * local_4340;
        fStack_435c = fStack_435c * fStack_433c;
        fStack_4358 = fStack_4358 * fStack_4338;
        fStack_4354 = fStack_4354 * fStack_4334;
        fStack_4350 = fStack_4350 * fStack_4330;
        fStack_434c = fStack_434c * fStack_432c;
        fStack_4348 = fStack_4348 * fStack_4328;
        local_3f40 = CONCAT44(fStack_435c,local_4360);
        uStack_3f38 = CONCAT44(fStack_4354,fStack_4358);
        uStack_3f30 = CONCAT44(fStack_434c,fStack_4350);
        uStack_3f28 = CONCAT44(0x3f37e013,fStack_4348);
        local_3f60 = local_4280._0_8_;
        uStack_3f58 = local_4280._8_8_;
        uStack_3f50 = local_4280._16_8_;
        uStack_3f48 = local_4280._24_8_;
        local_4360 = local_4360 + (float)local_4080;
        fStack_435c = fStack_435c + local_4080._4_4_;
        fStack_4358 = fStack_4358 + (float)uStack_4078;
        fStack_4354 = fStack_4354 + uStack_4078._4_4_;
        fStack_4350 = fStack_4350 + (float)uStack_4070;
        fStack_434c = fStack_434c + uStack_4070._4_4_;
        fStack_4348 = fStack_4348 + (float)uStack_4068;
        local_3f80 = CONCAT44(fStack_435c,local_4360);
        uStack_3f78 = CONCAT44(fStack_4354,fStack_4358);
        uStack_3f70 = CONCAT44(fStack_434c,fStack_4350);
        uStack_3f68 = CONCAT44(uStack_4068._4_4_ + 0.71826285,fStack_4348);
        local_3fa0 = 0x3f8000003f800000;
        uStack_3f98 = 0x3f8000003f800000;
        uStack_3f90 = 0x3f8000003f800000;
        uStack_3f88 = 0x3f8000003f800000;
        local_4360 = local_4360 + 1.0;
        fStack_435c = fStack_435c + 1.0;
        fStack_4358 = fStack_4358 + 1.0;
        fStack_4354 = fStack_4354 + 1.0;
        fStack_4350 = fStack_4350 + 1.0;
        fStack_434c = fStack_434c + 1.0;
        fStack_4348 = fStack_4348 + 1.0;
        fStack_4344 = uStack_4068._4_4_ + 0.71826285 + 1.0;
        local_27e0 = local_42c0;
        uStack_27d8 = uStack_42b8;
        uStack_27d0 = uStack_42b0;
        uStack_27c8 = uStack_42a8;
        local_42e0._4_4_ = (int)local_4000._4_4_;
        local_42e0._0_4_ = (int)(float)local_4000;
        local_42e0._8_4_ = (int)(float)uStack_3ff8;
        local_42e0._12_4_ = (int)uStack_3ff8._4_4_;
        local_42e0._16_4_ = (int)(float)uStack_3ff0;
        local_42e0._20_4_ = (int)uStack_3ff0._4_4_;
        auVar159 = local_42e0._0_24_;
        local_42e0._24_4_ = (int)(float)uStack_3fe8;
        local_42e0._28_4_ = (int)uStack_3fe8._4_4_;
        auVar5 = local_42e0;
        local_2720 = local_42e0._0_8_;
        uStack_2718 = local_42e0._8_8_;
        local_42e0._16_8_ = auVar159._16_8_;
        uStack_2710 = local_42e0._16_8_;
        local_42e0._24_8_ = auVar5._24_8_;
        uStack_2708 = local_42e0._24_8_;
        local_2460 = local_42e0._0_8_;
        uStack_2458 = local_42e0._8_8_;
        uStack_2450 = local_42e0._16_8_;
        uStack_2448 = local_42e0._24_8_;
        local_2480 = 0x7f0000007f;
        uStack_2478 = 0x7f0000007f;
        uStack_2470 = 0x7f0000007f;
        uStack_2468 = 0x7f0000007f;
        auVar90._16_8_ = local_42e0._16_8_;
        auVar90._0_16_ = local_42e0._0_16_;
        auVar90._24_8_ = local_42e0._24_8_;
        auVar89._8_8_ = 0x7f0000007f;
        auVar89._0_8_ = 0x7f0000007f;
        auVar89._16_8_ = 0x7f0000007f;
        auVar89._24_8_ = 0x7f0000007f;
        auVar5 = vpaddd_avx2(auVar90,auVar89);
        local_42e0._0_8_ = auVar5._0_8_;
        local_2620 = local_42e0._0_8_;
        local_42e0._8_8_ = auVar5._8_8_;
        uStack_2618 = local_42e0._8_8_;
        local_42e0._16_8_ = auVar5._16_8_;
        uStack_2610 = local_42e0._16_8_;
        local_42e0._24_8_ = auVar5._24_8_;
        uStack_2608 = local_42e0._24_8_;
        local_2624 = 0x17;
        local_2360 = local_42e0._0_8_;
        uStack_2358 = local_42e0._8_8_;
        uStack_2350 = local_42e0._16_8_;
        uStack_2348 = local_42e0._24_8_;
        local_2364 = 0x17;
        local_42e0 = vpslld_avx2(auVar5,ZEXT416(0x17));
        local_2560 = local_42e0._0_8_;
        uStack_2558 = local_42e0._8_8_;
        uStack_2550 = local_42e0._16_8_;
        uStack_2548 = local_42e0._24_8_;
        local_4380 = local_42e0._0_8_;
        uStack_4378 = local_42e0._8_8_;
        uStack_4370 = local_42e0._16_8_;
        uStack_4368 = local_42e0._24_8_;
        local_4240 = CONCAT44(fStack_435c,local_4360);
        uStack_4238 = CONCAT44(fStack_4354,fStack_4358);
        uStack_4230 = CONCAT44(fStack_434c,fStack_4350);
        uStack_4228 = CONCAT44(fStack_4344,fStack_4348);
        local_4260._0_4_ = local_42e0._0_4_;
        local_4260._4_4_ = local_42e0._4_4_;
        uStack_4258._0_4_ = local_42e0._8_4_;
        uStack_4258._4_4_ = local_42e0._12_4_;
        uStack_4250._0_4_ = local_42e0._16_4_;
        uStack_4250._4_4_ = local_42e0._20_4_;
        uStack_4248._0_4_ = local_42e0._24_4_;
        local_4360 = local_4360 * (float)local_4260;
        fStack_435c = fStack_435c * local_4260._4_4_;
        fStack_4358 = fStack_4358 * (float)uStack_4258;
        fStack_4354 = fStack_4354 * uStack_4258._4_4_;
        fStack_4350 = fStack_4350 * (float)uStack_4250;
        fStack_434c = fStack_434c * uStack_4250._4_4_;
        fStack_4348 = fStack_4348 * (float)uStack_4248;
        local_43c0 = CONCAT44(fStack_435c,local_4360);
        uStack_43b8 = CONCAT44(fStack_4354,fStack_4358);
        uStack_43b0 = CONCAT44(fStack_434c,fStack_4350);
        uStack_43a8 = CONCAT44(fStack_4344,fStack_4348);
        local_36c0 = (float)local_4400 + local_4360;
        fStack_36bc = local_4400._4_4_ + fStack_435c;
        fStack_36b8 = (float)uStack_43f8 + fStack_4358;
        fStack_36b4 = uStack_43f8._4_4_ + fStack_4354;
        fStack_36b0 = (float)uStack_43f0 + fStack_4350;
        fStack_36ac = uStack_43f0._4_4_ + fStack_434c;
        fStack_36a8 = (float)uStack_43e8 + fStack_4348;
        fStack_36a4 = uStack_43e8._4_4_ + fStack_4344;
        auVar40._16_4_ = (float)uStack_43f0;
        auVar40._0_16_ = local_22c0;
        auVar40._20_4_ = uStack_43f0._4_4_;
        auVar40._24_4_ = (float)uStack_43e8;
        auVar40._28_4_ = uStack_43e8._4_4_;
        auVar39._4_4_ = fStack_36bc;
        auVar39._0_4_ = local_36c0;
        auVar39._8_4_ = fStack_36b8;
        auVar39._12_4_ = fStack_36b4;
        auVar39._16_4_ = fStack_36b0;
        auVar39._20_4_ = fStack_36ac;
        auVar39._24_4_ = fStack_36a8;
        auVar39._28_4_ = fStack_36a4;
        auVar5 = vrcpps_avx(auVar39);
        auVar4._4_4_ = local_4400._4_4_ * auVar5._4_4_;
        auVar4._0_4_ = (float)local_4400 * auVar5._0_4_;
        auVar4._8_4_ = (float)uStack_43f8 * auVar5._8_4_;
        auVar4._12_4_ = uStack_43f8._4_4_ * auVar5._12_4_;
        auVar4._16_4_ = (float)uStack_43f0 * auVar5._16_4_;
        auVar4._20_4_ = uStack_43f0._4_4_ * auVar5._20_4_;
        auVar4._24_4_ = (float)uStack_43e8 * auVar5._24_4_;
        auVar4._28_4_ = uStack_43e8._4_4_;
        auVar1 = vfmsub213ps_fma(auVar4,auVar39,auVar40);
        auVar1 = vfnmadd213ps_fma(ZEXT1632(auVar1),auVar5,auVar4);
        local_44a0 = local_2140._0_8_;
        uStack_4498 = local_2140._8_8_;
        uStack_4490 = auStack_2130._0_8_;
        uStack_4488 = auStack_2130._8_8_;
        local_44c0 = local_2180._0_8_;
        uStack_44b8 = local_2180._8_8_;
        uStack_44b0 = auStack_2170._0_8_;
        uStack_44a8 = auStack_2170._8_8_;
        local_4480 = ZEXT1632(auVar1);
        auVar34._16_8_ = auStack_2130._0_8_;
        auVar34._0_16_ = local_2140;
        auVar34._24_8_ = auStack_2130._8_8_;
        auVar6._16_8_ = auStack_2170._0_8_;
        auVar6._0_16_ = local_2180;
        auVar6._24_8_ = auStack_2170._8_8_;
        auVar176._8_4_ = 0x80000000;
        auVar176._0_8_ = 0x8000000080000000;
        auVar176._12_4_ = 0x80000000;
        auVar176._16_4_ = 0x80000000;
        auVar176._20_4_ = 0x80000000;
        auVar176._24_4_ = 0x80000000;
        auVar176._28_4_ = 0x80000000;
        auVar1 = vfmadd213ps_fma(auVar34,local_4480,auVar6 ^ auVar176);
        local_6240._0_4_ = (float)local_63c0;
        local_6240._4_4_ = (float)((ulong)local_63c0 >> 0x20);
        uStack_6238._0_4_ = (float)uStack_63b8;
        uStack_6238._4_4_ = (float)((ulong)uStack_63b8 >> 0x20);
        uStack_6230._0_4_ = (float)uStack_63b0;
        uStack_6230._4_4_ = (float)((ulong)uStack_63b0 >> 0x20);
        uStack_6228._0_4_ = (float)uStack_63a8;
        uStack_6228._4_4_ = (undefined4)((ulong)uStack_63a8 >> 0x20);
        local_6260._0_4_ = auVar1._0_4_;
        local_6260._4_4_ = auVar1._4_4_;
        fStack_6258 = auVar1._8_4_;
        fStack_6254 = auVar1._12_4_;
        local_65a0 = CONCAT44(local_6240._4_4_ * (float)local_6260._4_4_,
                              (float)local_6240 * (float)local_6260._0_4_);
        uStack_6598 = CONCAT44(uStack_6238._4_4_ * fStack_6254,(float)uStack_6238 * fStack_6258);
        uStack_6590 = CONCAT44(uStack_6230._4_4_ * 0.0,(float)uStack_6230 * 0.0);
        uStack_6588 = CONCAT44(uStack_6228._4_4_,(float)uStack_6228 * 0.0);
        local_6348 = local_6520;
        local_6380 = local_65a0;
        uStack_6378 = uStack_6598;
        uStack_6370 = uStack_6590;
        uStack_6368 = uStack_6588;
        auVar5._8_8_ = uStack_6598;
        auVar5._0_8_ = local_65a0;
        auVar5._16_8_ = uStack_6590;
        auVar5._24_8_ = uStack_6588;
        *local_6520 = auVar5;
        local_6520 = local_6520 + 1;
        _local_6260 = ZEXT1632(auVar1);
        local_6240 = local_63c0;
        uStack_6238 = uStack_63b8;
        uStack_6230 = uStack_63b0;
        uStack_6228 = uStack_63a8;
        local_6120 = local_2140._0_8_;
        uStack_6118 = local_2140._8_8_;
        uStack_6110 = auStack_2130._0_8_;
        uStack_6108 = auStack_2130._8_8_;
        local_6100 = local_5c40;
        uStack_60f8 = uStack_5c38;
        uStack_60f0 = uStack_5c30;
        uStack_60e8 = uStack_5c28;
        _local_5c00 = auVar47;
        _local_5b40 = auVar48;
        local_5a80 = local_5bc0;
        uStack_5a78 = uStack_5bb8;
        uStack_5a70 = uStack_5bb0;
        uStack_5a68 = uStack_5ba8;
        local_57c0 = local_57e0;
        uStack_57b8 = uStack_57d8;
        uStack_57b0 = uStack_57d0;
        uStack_57a8 = uStack_57c8;
        local_5760 = uVar24;
        uStack_5758 = uVar25;
        uStack_5750 = uVar26;
        uStack_5748 = uVar27;
        local_54e0 = uVar20;
        uStack_54d8 = uVar21;
        uStack_54d0 = uVar22;
        uStack_54c8 = uVar23;
        local_54c0 = uVar16;
        uStack_54b8 = uVar17;
        uStack_54b0 = uVar18;
        uStack_54a8 = uVar19;
        local_5480 = uVar12;
        uStack_5478 = uVar13;
        uStack_5470 = uVar14;
        uStack_5468 = uVar15;
        local_50e0 = local_66e0;
        uStack_50d8 = uStack_66d8;
        uStack_50d0 = auStack_2270._0_8_;
        uStack_50c8 = auStack_2270._8_8_;
        _local_49e0 = auVar61;
        local_49a0 = local_4a20._0_8_;
        uStack_4998 = local_4a20._8_8_;
        uStack_4990 = local_4a20._16_8_;
        uStack_4988 = local_4a20._24_8_;
        local_47c0 = local_47e0;
        uStack_47b8 = uStack_47d8;
        uStack_47b0 = uStack_47d0;
        uStack_47a8 = uStack_47c8;
        local_4740 = local_4a00;
        uStack_4738 = uStack_49f8;
        uStack_4730 = uStack_49f0;
        uStack_4728 = uStack_49e8;
        local_4700 = uVar8;
        uStack_46f8 = uVar9;
        uStack_46f0 = uVar10;
        uStack_46e8 = uVar11;
        local_4400 = local_22c0._0_8_;
        uStack_43f8 = local_22c0._8_8_;
        uStack_43f0 = auStack_22b0._0_8_;
        uStack_43e8 = auStack_22b0._8_8_;
        _local_42a0 = auVar46;
        local_4260 = local_42e0._0_8_;
        uStack_4258 = local_42e0._8_8_;
        uStack_4250 = local_42e0._16_8_;
        uStack_4248 = local_42e0._24_8_;
        local_4080 = local_40a0;
        uStack_4078 = uStack_4098;
        uStack_4070 = uStack_4090;
        uStack_4068 = uStack_4088;
        local_4000 = local_42c0;
        uStack_3ff8 = uStack_42b8;
        uStack_3ff0 = uStack_42b0;
        uStack_3fe8 = uStack_42a8;
        local_3fc0 = uVar28;
        uStack_3fb8 = uVar29;
        uStack_3fb0 = uVar30;
        uStack_3fa8 = uVar31;
        local_36a0 = local_43a0;
        fStack_369c = fStack_439c;
        fStack_3698 = fStack_4398;
        fStack_3694 = fStack_4394;
        fStack_3690 = fStack_4390;
        fStack_368c = fStack_438c;
        fStack_3688 = fStack_4388;
        fStack_3684 = fStack_4384;
        local_3120 = local_3140;
        local_30c0 = local_3100;
        uStack_2848 = uStack_63a8;
        local_229c = local_22a0;
        local_2298 = local_22a0;
        local_2294 = local_22a0;
        local_2290 = local_22a0;
        local_228c = local_22a0;
        local_2288 = local_22a0;
        local_2284 = local_22a0;
        local_225c = local_2260;
        local_2258 = local_2260;
        local_2254 = local_2260;
        local_2250 = local_2260;
        local_224c = local_2260;
        local_2248 = local_2260;
        local_2244 = local_2260;
        local_215c = local_2160;
        local_2158 = local_2160;
        local_2154 = local_2160;
        local_2150 = local_2160;
        local_214c = local_2160;
        local_2148 = local_2160;
        local_2144 = local_2160;
        local_210c = local_2110;
        local_2108 = local_2110;
        local_2104 = local_2110;
        local_2100 = local_2110;
        local_20fc = local_2110;
        local_20f8 = local_2110;
        local_20f4 = local_2110;
      }
      for (; local_656c + 3 < local_6400; local_656c = local_656c + 4) {
        local_6310 = local_6520;
        local_6300 = *(undefined8 *)*local_6520;
        in_stack_ffffffffffff98e8 = *(undefined8 *)(*local_6520 + 8);
        in_stack_ffffffffffff98f0 = ZEXT816(0) << 0x20;
        local_1480 = 0x3f800000;
        uStack_147c = 0x3f800000;
        uStack_1478 = 0x3f800000;
        uStack_1474 = 0x3f800000;
        local_2b0 = 0x42b0c0a5;
        uStack_2ac = 0x42b0c0a5;
        uStack_2a8 = 0x42b0c0a5;
        uStack_2a4 = 0x42b0c0a5;
        auVar145._8_4_ = 0x42b0c0a5;
        auVar145._0_8_ = 0x42b0c0a542b0c0a5;
        auVar145._12_4_ = 0x42b0c0a5;
        auVar1 = vminps_avx(*(undefined1 (*) [16])*local_6520,auVar145);
        local_1440._0_8_ = auVar1._0_8_;
        local_660 = local_1440._0_8_;
        local_1440._8_8_ = auVar1._8_8_;
        uStack_658 = local_1440._8_8_;
        local_670 = 0xc2b0c0a5;
        uStack_66c = 0xc2b0c0a5;
        uStack_668 = 0xc2b0c0a5;
        uStack_664 = 0xc2b0c0a5;
        auVar117._8_4_ = 0xc2b0c0a5;
        auVar117._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar117._12_4_ = 0xc2b0c0a5;
        auVar3 = vmaxps_avx(auVar1,auVar117);
        local_1440._0_8_ = auVar3._0_8_;
        uVar8 = local_1440._0_8_;
        local_1440._8_8_ = auVar3._8_8_;
        uVar9 = local_1440._8_8_;
        local_12f0 = 0x3fb8aa3b;
        uStack_12ec = 0x3fb8aa3b;
        uStack_12e8 = 0x3fb8aa3b;
        uStack_12e4 = 0x3fb8aa3b;
        local_12e0._0_4_ = auVar3._0_4_;
        local_12e0._4_4_ = auVar3._4_4_;
        uStack_12d8._0_4_ = auVar3._8_4_;
        uStack_12d8._4_4_ = auVar3._12_4_;
        local_1460._4_4_ = local_12e0._4_4_ * 1.442695;
        local_1460._0_4_ = (float)local_12e0 * 1.442695;
        uStack_1458._0_4_ = (float)uStack_12d8 * 1.442695;
        uStack_1458._4_4_ = uStack_12d8._4_4_ * 1.442695;
        local_11e0 = local_1460;
        uStack_11d8 = uStack_1458;
        local_11f0 = 0x3f000000;
        uStack_11ec = 0x3f000000;
        uStack_11e8 = 0x3f000000;
        uStack_11e4 = 0x3f000000;
        local_1460._0_4_ = (float)local_12e0 * 1.442695 + 0.5;
        local_1460._4_4_ = local_12e0._4_4_ * 1.442695 + 0.5;
        fVar168 = (float)uStack_12d8 * 1.442695 + 0.5;
        fVar169 = uStack_12d8._4_4_ * 1.442695 + 0.5;
        uStack_1458._0_4_ = fVar168;
        uStack_1458._4_4_ = fVar169;
        local_220 = local_1460;
        uStack_218 = uStack_1458;
        local_1470._4_4_ = (int)(float)local_1460._4_4_;
        local_1470._0_4_ = (int)(float)local_1460._0_4_;
        local_1470._8_4_ = (int)fVar168;
        local_1470._12_4_ = (int)fVar169;
        local_370 = local_1470._0_8_;
        uStack_368 = local_1470._8_8_;
        auVar139._8_8_ = local_1470._8_8_;
        auVar139._0_8_ = local_1470._0_8_;
        auVar2 = vcvtdq2ps_avx(auVar139);
        local_1450 = auVar2._0_8_;
        local_1a0 = local_1450;
        uStack_1448 = auVar2._8_8_;
        uStack_198 = uStack_1448;
        local_1b0 = local_1460;
        uStack_1a8 = uStack_1458;
        auVar149._8_8_ = uStack_1458;
        auVar149._0_8_ = local_1460;
        auVar1 = vcmpps_avx(auVar149,auVar2,1);
        local_1490._0_8_ = auVar1._0_8_;
        local_540 = local_1490._0_8_;
        local_1490._8_8_ = auVar1._8_8_;
        uStack_538 = local_1490._8_8_;
        local_550 = 0x3f8000003f800000;
        uStack_548 = 0x3f8000003f800000;
        auVar125._8_8_ = 0x3f8000003f800000;
        auVar125._0_8_ = 0x3f8000003f800000;
        local_1490 = vpand_avx(auVar1,auVar125);
        local_10c0 = local_1450;
        uStack_10b8 = uStack_1448;
        local_10d0 = local_1490._0_8_;
        uStack_10c8 = local_1490._8_8_;
        _local_1460 = vsubps_avx(auVar2,local_1490);
        local_1310 = 0x3f318000;
        uStack_130c = 0x3f318000;
        uStack_1308 = 0x3f318000;
        uStack_1304 = 0x3f318000;
        local_1300._0_4_ = local_1460._0_4_;
        local_1300._4_4_ = local_1460._4_4_;
        uStack_12f8._0_4_ = local_1460._8_4_;
        uStack_12f8._4_4_ = local_1460._12_4_;
        local_1450 = CONCAT44(local_1300._4_4_ * 0.6933594,(float)local_1300 * 0.6933594);
        uStack_1448._0_4_ = (float)uStack_12f8 * 0.6933594;
        uStack_1448._4_4_ = uStack_12f8._4_4_ * 0.6933594;
        local_1320 = local_1460;
        uStack_1318 = uStack_1458;
        local_1330 = 0xb95e8083;
        uStack_132c = 0xb95e8083;
        uStack_1328 = 0xb95e8083;
        uStack_1324 = 0xb95e8083;
        local_10e0 = local_1440._0_8_;
        uStack_10d8 = local_1440._8_8_;
        local_10f0 = local_1450;
        uStack_10e8 = uStack_1448;
        auVar93._8_8_ = uStack_1448;
        auVar93._0_8_ = local_1450;
        auVar1 = vsubps_avx(auVar3,auVar93);
        local_1440._0_8_ = auVar1._0_8_;
        local_1100 = local_1440._0_8_;
        local_1440._8_8_ = auVar1._8_8_;
        uStack_10f8 = local_1440._8_8_;
        local_1110 = CONCAT44(local_1300._4_4_ * -0.00021219444,(float)local_1300 * -0.00021219444);
        uStack_1108 = CONCAT44(uStack_12f8._4_4_ * -0.00021219444,
                               (float)uStack_12f8 * -0.00021219444);
        auVar2._8_8_ = uStack_1108;
        auVar2._0_8_ = local_1110;
        local_1440 = vsubps_avx(auVar1,auVar2);
        local_1350 = local_1440._0_8_;
        uStack_1348 = local_1440._8_8_;
        local_1340._0_4_ = local_1440._0_4_;
        local_1340._4_4_ = local_1440._4_4_;
        uStack_1338._0_4_ = local_1440._8_4_;
        uStack_1338._4_4_ = local_1440._12_4_;
        local_14a0 = (float)local_1340 * (float)local_1340;
        fStack_149c = local_1340._4_4_ * local_1340._4_4_;
        fStack_1498 = (float)uStack_1338 * (float)uStack_1338;
        fStack_1494 = uStack_1338._4_4_ * uStack_1338._4_4_;
        local_1360 = 0x3950696739506967;
        uStack_1358 = 0x3950696739506967;
        local_1370 = local_1440._0_8_;
        uStack_1368 = local_1440._8_8_;
        local_1200 = CONCAT44(local_1340._4_4_ * 0.00019875691,(float)local_1340 * 0.00019875691);
        uStack_11f8 = CONCAT44(uStack_1338._4_4_ * 0.00019875691,(float)uStack_1338 * 0.00019875691)
        ;
        local_1210 = 0x3ab743ce;
        uStack_120c = 0x3ab743ce;
        uStack_1208 = 0x3ab743ce;
        uStack_1204 = 0x3ab743ce;
        local_14b0 = (float)local_1340 * 0.00019875691 + 0.0013981999;
        fStack_14ac = local_1340._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_14a8 = (float)uStack_1338 * 0.00019875691 + 0.0013981999;
        fStack_14a4 = uStack_1338._4_4_ * 0.00019875691 + 0.0013981999;
        local_1380 = CONCAT44(fStack_14ac,local_14b0);
        uStack_1378 = CONCAT44(fStack_14a4,fStack_14a8);
        local_1390 = local_1440._0_8_;
        uStack_1388 = local_1440._8_8_;
        local_14b0 = local_14b0 * (float)local_1340;
        fStack_14ac = fStack_14ac * local_1340._4_4_;
        fStack_14a8 = fStack_14a8 * (float)uStack_1338;
        fStack_14a4 = fStack_14a4 * uStack_1338._4_4_;
        local_1220 = CONCAT44(fStack_14ac,local_14b0);
        uStack_1218 = CONCAT44(fStack_14a4,fStack_14a8);
        local_1230 = 0x3c088908;
        uStack_122c = 0x3c088908;
        uStack_1228 = 0x3c088908;
        uStack_1224 = 0x3c088908;
        local_14b0 = local_14b0 + 0.008333452;
        fStack_14ac = fStack_14ac + 0.008333452;
        fStack_14a8 = fStack_14a8 + 0.008333452;
        fStack_14a4 = fStack_14a4 + 0.008333452;
        local_13a0 = CONCAT44(fStack_14ac,local_14b0);
        uStack_1398 = CONCAT44(fStack_14a4,fStack_14a8);
        local_13b0 = local_1440._0_8_;
        uStack_13a8 = local_1440._8_8_;
        local_14b0 = local_14b0 * (float)local_1340;
        fStack_14ac = fStack_14ac * local_1340._4_4_;
        fStack_14a8 = fStack_14a8 * (float)uStack_1338;
        fStack_14a4 = fStack_14a4 * uStack_1338._4_4_;
        local_1240 = CONCAT44(fStack_14ac,local_14b0);
        uStack_1238 = CONCAT44(fStack_14a4,fStack_14a8);
        local_1250 = 0x3d2aa9c1;
        uStack_124c = 0x3d2aa9c1;
        uStack_1248 = 0x3d2aa9c1;
        uStack_1244 = 0x3d2aa9c1;
        local_14b0 = local_14b0 + 0.041665796;
        fStack_14ac = fStack_14ac + 0.041665796;
        fStack_14a8 = fStack_14a8 + 0.041665796;
        fStack_14a4 = fStack_14a4 + 0.041665796;
        local_13c0 = CONCAT44(fStack_14ac,local_14b0);
        uStack_13b8 = CONCAT44(fStack_14a4,fStack_14a8);
        local_13d0 = local_1440._0_8_;
        uStack_13c8 = local_1440._8_8_;
        local_14b0 = local_14b0 * (float)local_1340;
        fStack_14ac = fStack_14ac * local_1340._4_4_;
        fStack_14a8 = fStack_14a8 * (float)uStack_1338;
        fStack_14a4 = fStack_14a4 * uStack_1338._4_4_;
        local_1260 = CONCAT44(fStack_14ac,local_14b0);
        uStack_1258 = CONCAT44(fStack_14a4,fStack_14a8);
        local_1270 = 0x3e2aaaaa;
        uStack_126c = 0x3e2aaaaa;
        uStack_1268 = 0x3e2aaaaa;
        uStack_1264 = 0x3e2aaaaa;
        local_14b0 = local_14b0 + 0.16666666;
        fStack_14ac = fStack_14ac + 0.16666666;
        fStack_14a8 = fStack_14a8 + 0.16666666;
        fStack_14a4 = fStack_14a4 + 0.16666666;
        local_13e0 = CONCAT44(fStack_14ac,local_14b0);
        uStack_13d8 = CONCAT44(fStack_14a4,fStack_14a8);
        local_13f0 = local_1440._0_8_;
        uStack_13e8 = local_1440._8_8_;
        local_14b0 = local_14b0 * (float)local_1340;
        fStack_14ac = fStack_14ac * local_1340._4_4_;
        fStack_14a8 = fStack_14a8 * (float)uStack_1338;
        fStack_14a4 = fStack_14a4 * uStack_1338._4_4_;
        local_1280 = CONCAT44(fStack_14ac,local_14b0);
        uStack_1278 = CONCAT44(fStack_14a4,fStack_14a8);
        local_1290 = 0x3f000000;
        uStack_128c = 0x3f000000;
        uStack_1288 = 0x3f000000;
        uStack_1284 = 0x3f000000;
        local_14b0 = local_14b0 + 0.5;
        fStack_14ac = fStack_14ac + 0.5;
        fStack_14a8 = fStack_14a8 + 0.5;
        fStack_14a4 = fStack_14a4 + 0.5;
        local_1400 = CONCAT44(fStack_14ac,local_14b0);
        uStack_13f8 = CONCAT44(fStack_14a4,fStack_14a8);
        local_1410 = CONCAT44(fStack_149c,local_14a0);
        uStack_1408 = CONCAT44(fStack_1494,fStack_1498);
        local_14b0 = local_14b0 * local_14a0;
        fStack_14ac = fStack_14ac * fStack_149c;
        fStack_14a8 = fStack_14a8 * fStack_1498;
        fStack_14a4 = fStack_14a4 * fStack_1494;
        local_12a0 = CONCAT44(fStack_14ac,local_14b0);
        uStack_1298 = CONCAT44(fStack_14a4,fStack_14a8);
        local_12b0 = local_1440._0_8_;
        uStack_12a8 = local_1440._8_8_;
        local_14b0 = local_14b0 + (float)local_1340;
        fStack_14ac = fStack_14ac + local_1340._4_4_;
        fStack_14a8 = fStack_14a8 + (float)uStack_1338;
        fStack_14a4 = fStack_14a4 + uStack_1338._4_4_;
        local_12c0 = CONCAT44(fStack_14ac,local_14b0);
        uStack_12b8 = CONCAT44(fStack_14a4,fStack_14a8);
        local_12d0 = 0x3f8000003f800000;
        uStack_12c8 = 0x3f8000003f800000;
        local_14b0 = local_14b0 + 1.0;
        fStack_14ac = fStack_14ac + 1.0;
        fStack_14a8 = fStack_14a8 + 1.0;
        fStack_14a4 = fStack_14a4 + 1.0;
        local_230 = local_1460;
        uStack_228 = uStack_1458;
        local_1470._4_4_ = (int)local_1300._4_4_;
        local_1470._0_4_ = (int)(float)local_1300;
        local_1470._8_4_ = (int)(float)uStack_12f8;
        local_1470._12_4_ = (int)uStack_12f8._4_4_;
        local_120 = local_1470._0_8_;
        uStack_118 = local_1470._8_8_;
        local_3d0 = 0x7f0000007f;
        uStack_3c8 = 0x7f0000007f;
        auVar156._8_8_ = local_1470._8_8_;
        auVar156._0_8_ = local_1470._0_8_;
        auVar155._8_8_ = 0x7f0000007f;
        auVar155._0_8_ = 0x7f0000007f;
        auVar1 = vpaddd_avx(auVar156,auVar155);
        local_1470._0_8_ = auVar1._0_8_;
        local_a0 = local_1470._0_8_;
        local_1470._8_8_ = auVar1._8_8_;
        uStack_98 = local_1470._8_8_;
        local_a4 = 0x17;
        local_1470 = vpslld_avx(auVar1,ZEXT416(0x17));
        local_50 = local_1470._0_8_;
        uStack_48 = local_1470._8_8_;
        local_14c0 = local_1470._0_8_;
        uStack_14b8 = local_1470._8_8_;
        local_1420 = CONCAT44(fStack_14ac,local_14b0);
        uStack_1418 = CONCAT44(fStack_14a4,fStack_14a8);
        local_1430._0_4_ = local_1470._0_4_;
        local_1430._4_4_ = local_1470._4_4_;
        uStack_1428._0_4_ = local_1470._8_4_;
        uStack_1428._4_4_ = local_1470._12_4_;
        local_14b0 = local_14b0 * (float)local_1430;
        fStack_14ac = fStack_14ac * local_1430._4_4_;
        fStack_14a8 = fStack_14a8 * (float)uStack_1428;
        fStack_14a4 = fStack_14a4 * uStack_1428._4_4_;
        local_17c0 = CONCAT44(fStack_14ac,local_14b0);
        uStack_17b8 = CONCAT44(fStack_14a4,fStack_14a8);
        local_1114 = 0x3f800000;
        local_1130 = 0x3f800000;
        local_17d0 = 0x3f8000003f800000;
        uStack_17c8 = 0x3f8000003f800000;
        local_1d00._4_4_ = fStack_14ac + 1.0;
        local_1d00._0_4_ = local_14b0 + 1.0;
        uStack_1cf8._0_4_ = fStack_14a8 + 1.0;
        uStack_1cf8._4_4_ = fStack_14a4 + 1.0;
        local_1d20 = 0x3f800000;
        uStack_1d1c = 0x3f800000;
        uStack_1d18 = 0x3f800000;
        uStack_1d14 = 0x3f800000;
        local_6e0 = local_1d00;
        uStack_6d8 = uStack_1cf8;
        local_750 = 0;
        local_6f0 = 0;
        local_710._8_8_ = SUB168(ZEXT816(0),4);
        uStack_6e8 = local_710._8_8_;
        auVar113._8_8_ = uStack_1cf8;
        auVar113._0_8_ = local_1d00;
        auVar162._8_8_ = 0;
        auVar162._0_8_ = local_710._8_8_;
        local_1d30 = vcmpps_avx(auVar113,auVar162 << 0x40,2);
        local_620 = local_1d00;
        uStack_618 = uStack_1cf8;
        local_630 = 0x800000;
        uStack_62c = 0x800000;
        uStack_628 = 0x800000;
        uStack_624 = 0x800000;
        auVar120._8_8_ = uStack_1cf8;
        auVar120._0_8_ = local_1d00;
        auVar119._8_4_ = 0x800000;
        auVar119._0_8_ = 0x80000000800000;
        auVar119._12_4_ = 0x800000;
        auVar1 = vmaxps_avx(auVar120,auVar119);
        local_1d00 = auVar1._0_8_;
        local_5b0 = local_1d00;
        uStack_1cf8 = auVar1._8_8_;
        uStack_5a8 = uStack_1cf8;
        local_5e0 = local_1d00;
        uStack_5d8 = uStack_1cf8;
        local_5e4 = 0x17;
        auVar3 = vpsrld_avx(auVar1,ZEXT416(0x17));
        local_4c0 = local_1d00;
        uStack_4b8 = uStack_1cf8;
        local_4d0 = 0x807fffff;
        uStack_4cc = 0x807fffff;
        uStack_4c8 = 0x807fffff;
        uStack_4c4 = 0x807fffff;
        auVar128._8_4_ = 0x807fffff;
        auVar128._0_8_ = 0x807fffff807fffff;
        auVar128._12_4_ = 0x807fffff;
        auVar1 = vpand_avx(auVar1,auVar128);
        local_1d00 = auVar1._0_8_;
        local_420 = local_1d00;
        uStack_1cf8 = auVar1._8_8_;
        uStack_418 = uStack_1cf8;
        local_430 = 0x3f000000;
        uStack_42c = 0x3f000000;
        uStack_428 = 0x3f000000;
        uStack_424 = 0x3f000000;
        auVar132._8_4_ = 0x3f000000;
        auVar132._0_8_ = 0x3f0000003f000000;
        auVar132._12_4_ = 0x3f000000;
        auVar2 = vpor_avx(auVar1,auVar132);
        local_1d10._0_8_ = auVar3._0_8_;
        local_3c0 = local_1d10._0_8_;
        local_1d10._8_8_ = auVar3._8_8_;
        uStack_3b8 = local_1d10._8_8_;
        auVar135._8_8_ = 0x7f0000007f;
        auVar135._0_8_ = 0x7f0000007f;
        local_1d10 = vpsubd_avx(auVar3,auVar135);
        local_350 = local_1d10._0_8_;
        uStack_348 = local_1d10._8_8_;
        auVar1 = vcvtdq2ps_avx(local_1d10);
        local_1d40 = auVar1._0_8_;
        uVar10 = local_1d40;
        uStack_1d38 = auVar1._8_8_;
        uVar11 = uStack_1d38;
        local_19b0 = 0x3f8000003f800000;
        uStack_19a8 = 0x3f8000003f800000;
        local_19a0._0_4_ = auVar1._0_4_;
        local_19a0._4_4_ = auVar1._4_4_;
        uStack_1998._0_4_ = auVar1._8_4_;
        uStack_1998._4_4_ = auVar1._12_4_;
        local_1d40._4_4_ = local_19a0._4_4_ + 1.0;
        local_1d40._0_4_ = (float)local_19a0 + 1.0;
        uStack_1d38._0_4_ = (float)uStack_1998 + 1.0;
        uStack_1d38._4_4_ = uStack_1998._4_4_ + 1.0;
        local_1d00 = auVar2._0_8_;
        local_320 = local_1d00;
        uStack_1cf8 = auVar2._8_8_;
        uStack_318 = uStack_1cf8;
        local_330 = 0x3f3504f3;
        uStack_32c = 0x3f3504f3;
        uStack_328 = 0x3f3504f3;
        uStack_324 = 0x3f3504f3;
        auVar141._8_4_ = 0x3f3504f3;
        auVar141._0_8_ = 0x3f3504f33f3504f3;
        auVar141._12_4_ = 0x3f3504f3;
        local_1d50 = vcmpps_avx(auVar2,auVar141,1);
        local_4e0 = local_1d00;
        uStack_4d8 = uStack_1cf8;
        local_4f0 = local_1d50._0_8_;
        uStack_4e8 = local_1d50._8_8_;
        auVar1 = vpand_avx(auVar2,local_1d50);
        local_1000 = local_1d00;
        uStack_ff8 = uStack_1cf8;
        local_1010 = 0x3f8000003f800000;
        uStack_1008 = 0x3f8000003f800000;
        auVar98._8_8_ = 0x3f8000003f800000;
        auVar98._0_8_ = 0x3f8000003f800000;
        auVar2 = vsubps_avx(auVar2,auVar98);
        local_1020 = local_1d40;
        uStack_1018 = uStack_1d38;
        local_500 = 0x3f8000003f800000;
        uStack_4f8 = 0x3f8000003f800000;
        local_510 = local_1d50._0_8_;
        uStack_508 = local_1d50._8_8_;
        auVar127._8_8_ = 0x3f8000003f800000;
        auVar127._0_8_ = 0x3f8000003f800000;
        local_1030 = vpand_avx(auVar127,local_1d50);
        auVar97._8_8_ = uStack_1d38;
        auVar97._0_8_ = local_1d40;
        _local_1d40 = vsubps_avx(auVar97,local_1030);
        local_1d00 = auVar2._0_8_;
        uVar12 = local_1d00;
        uStack_1cf8 = auVar2._8_8_;
        uVar13 = uStack_1cf8;
        local_1d60 = auVar1._0_8_;
        uVar14 = local_1d60;
        uStack_1d58 = auVar1._8_8_;
        uVar15 = uStack_1d58;
        local_19c0._0_4_ = auVar2._0_4_;
        local_19c0._4_4_ = auVar2._4_4_;
        uStack_19b8._0_4_ = auVar2._8_4_;
        uStack_19b8._4_4_ = auVar2._12_4_;
        local_19d0._0_4_ = auVar1._0_4_;
        local_19d0._4_4_ = auVar1._4_4_;
        uStack_19c8._0_4_ = auVar1._8_4_;
        uStack_19c8._4_4_ = auVar1._12_4_;
        local_19c0._0_4_ = (float)local_19c0 + (float)local_19d0;
        local_19c0._4_4_ = local_19c0._4_4_ + local_19d0._4_4_;
        uStack_19b8._0_4_ = (float)uStack_19b8 + (float)uStack_19c8;
        uStack_19b8._4_4_ = uStack_19b8._4_4_ + uStack_19c8._4_4_;
        local_1d00._4_4_ = local_19c0._4_4_;
        local_1d00._0_4_ = (float)local_19c0;
        uStack_1cf8._0_4_ = (float)uStack_19b8;
        uStack_1cf8._4_4_ = uStack_19b8._4_4_;
        local_1b50 = local_1d00;
        uStack_1b48 = uStack_1cf8;
        local_1d70 = (float)local_19c0 * (float)local_19c0;
        fStack_1d6c = local_19c0._4_4_ * local_19c0._4_4_;
        fStack_1d68 = (float)uStack_19b8 * (float)uStack_19b8;
        fStack_1d64 = uStack_19b8._4_4_ * uStack_19b8._4_4_;
        uStack_1d78._0_4_ = 0x3d9021bb;
        local_1d80 = (undefined1  [8])0x3d9021bb3d9021bb;
        uStack_1d78._4_4_ = 0x3d9021bb;
        local_1b60 = 0x3d9021bb3d9021bb;
        uStack_1b58 = uStack_1d78;
        local_1b70 = local_1d00;
        uStack_1b68 = uStack_1cf8;
        local_1d80._4_4_ = local_19c0._4_4_ * 0.070376836;
        local_1d80._0_4_ = (float)local_19c0 * 0.070376836;
        uStack_1d78._0_4_ = (float)uStack_19b8 * 0.070376836;
        uStack_1d78._4_4_ = uStack_19b8._4_4_ * 0.070376836;
        local_19e0 = local_1d80;
        uStack_19d8 = uStack_1d78;
        local_19f0 = 0xbdebd1b8;
        uStack_19ec = 0xbdebd1b8;
        uStack_19e8 = 0xbdebd1b8;
        uStack_19e4 = 0xbdebd1b8;
        local_1d80._0_4_ = (float)local_19c0 * 0.070376836 + -0.1151461;
        local_1d80._4_4_ = local_19c0._4_4_ * 0.070376836 + -0.1151461;
        fVar168 = (float)uStack_19b8 * 0.070376836 + -0.1151461;
        fVar169 = uStack_19b8._4_4_ * 0.070376836 + -0.1151461;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1b80 = local_1d80;
        uStack_1b78 = uStack_1d78;
        local_1b90 = local_1d00;
        uStack_1b88 = uStack_1cf8;
        local_1d80._0_4_ = (float)local_1d80._0_4_ * (float)local_19c0;
        local_1d80._4_4_ = (float)local_1d80._4_4_ * local_19c0._4_4_;
        fVar168 = fVar168 * (float)uStack_19b8;
        fVar169 = fVar169 * uStack_19b8._4_4_;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1a00 = local_1d80;
        uStack_19f8 = uStack_1d78;
        local_1a10 = 0x3def251a;
        uStack_1a0c = 0x3def251a;
        uStack_1a08 = 0x3def251a;
        uStack_1a04 = 0x3def251a;
        local_1d80._0_4_ = (float)local_1d80._0_4_ + 0.116769984;
        local_1d80._4_4_ = (float)local_1d80._4_4_ + 0.116769984;
        fVar168 = fVar168 + 0.116769984;
        fVar169 = fVar169 + 0.116769984;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1ba0 = local_1d80;
        uStack_1b98 = uStack_1d78;
        local_1bb0 = local_1d00;
        uStack_1ba8 = uStack_1cf8;
        local_1d80._0_4_ = (float)local_1d80._0_4_ * (float)local_19c0;
        local_1d80._4_4_ = (float)local_1d80._4_4_ * local_19c0._4_4_;
        fVar168 = fVar168 * (float)uStack_19b8;
        fVar169 = fVar169 * uStack_19b8._4_4_;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1a20 = local_1d80;
        uStack_1a18 = uStack_1d78;
        local_1a30 = 0xbdfe5d4f;
        uStack_1a2c = 0xbdfe5d4f;
        uStack_1a28 = 0xbdfe5d4f;
        uStack_1a24 = 0xbdfe5d4f;
        local_1d80._0_4_ = (float)local_1d80._0_4_ + -0.12420141;
        local_1d80._4_4_ = (float)local_1d80._4_4_ + -0.12420141;
        fVar168 = fVar168 + -0.12420141;
        fVar169 = fVar169 + -0.12420141;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1bc0 = local_1d80;
        uStack_1bb8 = uStack_1d78;
        local_1bd0 = local_1d00;
        uStack_1bc8 = uStack_1cf8;
        local_1d80._0_4_ = (float)local_1d80._0_4_ * (float)local_19c0;
        local_1d80._4_4_ = (float)local_1d80._4_4_ * local_19c0._4_4_;
        fVar168 = fVar168 * (float)uStack_19b8;
        fVar169 = fVar169 * uStack_19b8._4_4_;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1a40 = local_1d80;
        uStack_1a38 = uStack_1d78;
        local_1a50 = 0x3e11e9bf;
        uStack_1a4c = 0x3e11e9bf;
        uStack_1a48 = 0x3e11e9bf;
        uStack_1a44 = 0x3e11e9bf;
        local_1d80._0_4_ = (float)local_1d80._0_4_ + 0.14249323;
        local_1d80._4_4_ = (float)local_1d80._4_4_ + 0.14249323;
        fVar168 = fVar168 + 0.14249323;
        fVar169 = fVar169 + 0.14249323;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1be0 = local_1d80;
        uStack_1bd8 = uStack_1d78;
        local_1bf0 = local_1d00;
        uStack_1be8 = uStack_1cf8;
        local_1d80._0_4_ = (float)local_1d80._0_4_ * (float)local_19c0;
        local_1d80._4_4_ = (float)local_1d80._4_4_ * local_19c0._4_4_;
        fVar168 = fVar168 * (float)uStack_19b8;
        fVar169 = fVar169 * uStack_19b8._4_4_;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1a60 = local_1d80;
        uStack_1a58 = uStack_1d78;
        local_1a70 = 0xbe2aae50;
        uStack_1a6c = 0xbe2aae50;
        uStack_1a68 = 0xbe2aae50;
        uStack_1a64 = 0xbe2aae50;
        local_1d80._0_4_ = (float)local_1d80._0_4_ + -0.16668057;
        local_1d80._4_4_ = (float)local_1d80._4_4_ + -0.16668057;
        fVar168 = fVar168 + -0.16668057;
        fVar169 = fVar169 + -0.16668057;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1c00 = local_1d80;
        uStack_1bf8 = uStack_1d78;
        local_1c10 = local_1d00;
        uStack_1c08 = uStack_1cf8;
        local_1d80._0_4_ = (float)local_1d80._0_4_ * (float)local_19c0;
        local_1d80._4_4_ = (float)local_1d80._4_4_ * local_19c0._4_4_;
        fVar168 = fVar168 * (float)uStack_19b8;
        fVar169 = fVar169 * uStack_19b8._4_4_;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1a80 = local_1d80;
        uStack_1a78 = uStack_1d78;
        local_1a90 = 0x3e4cceac;
        uStack_1a8c = 0x3e4cceac;
        uStack_1a88 = 0x3e4cceac;
        uStack_1a84 = 0x3e4cceac;
        local_1d80._0_4_ = (float)local_1d80._0_4_ + 0.20000714;
        local_1d80._4_4_ = (float)local_1d80._4_4_ + 0.20000714;
        fVar168 = fVar168 + 0.20000714;
        fVar169 = fVar169 + 0.20000714;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1c20 = local_1d80;
        uStack_1c18 = uStack_1d78;
        local_1c30 = local_1d00;
        uStack_1c28 = uStack_1cf8;
        local_1d80._0_4_ = (float)local_1d80._0_4_ * (float)local_19c0;
        local_1d80._4_4_ = (float)local_1d80._4_4_ * local_19c0._4_4_;
        fVar168 = fVar168 * (float)uStack_19b8;
        fVar169 = fVar169 * uStack_19b8._4_4_;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1aa0 = local_1d80;
        uStack_1a98 = uStack_1d78;
        local_1ab0 = 0xbe7ffffc;
        uStack_1aac = 0xbe7ffffc;
        uStack_1aa8 = 0xbe7ffffc;
        uStack_1aa4 = 0xbe7ffffc;
        local_1d80._0_4_ = (float)local_1d80._0_4_ + -0.24999994;
        local_1d80._4_4_ = (float)local_1d80._4_4_ + -0.24999994;
        fVar168 = fVar168 + -0.24999994;
        fVar169 = fVar169 + -0.24999994;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1c40 = local_1d80;
        uStack_1c38 = uStack_1d78;
        local_1c50 = local_1d00;
        uStack_1c48 = uStack_1cf8;
        local_1d80._0_4_ = (float)local_1d80._0_4_ * (float)local_19c0;
        local_1d80._4_4_ = (float)local_1d80._4_4_ * local_19c0._4_4_;
        fVar168 = fVar168 * (float)uStack_19b8;
        fVar169 = fVar169 * uStack_19b8._4_4_;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1ac0 = local_1d80;
        uStack_1ab8 = uStack_1d78;
        local_1ad0 = 0x3eaaaaaa;
        uStack_1acc = 0x3eaaaaaa;
        uStack_1ac8 = 0x3eaaaaaa;
        uStack_1ac4 = 0x3eaaaaaa;
        local_1d80._0_4_ = (float)local_1d80._0_4_ + 0.3333333;
        local_1d80._4_4_ = (float)local_1d80._4_4_ + 0.3333333;
        fVar168 = fVar168 + 0.3333333;
        fVar169 = fVar169 + 0.3333333;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1c60 = local_1d80;
        uStack_1c58 = uStack_1d78;
        local_1c70 = local_1d00;
        uStack_1c68 = uStack_1cf8;
        local_1d80._0_4_ = (float)local_1d80._0_4_ * (float)local_19c0;
        local_1d80._4_4_ = (float)local_1d80._4_4_ * local_19c0._4_4_;
        fVar168 = fVar168 * (float)uStack_19b8;
        fVar169 = fVar169 * uStack_19b8._4_4_;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1c80 = local_1d80;
        uStack_1c78 = uStack_1d78;
        local_1c90 = CONCAT44(fStack_1d6c,local_1d70);
        uStack_1c88 = CONCAT44(fStack_1d64,fStack_1d68);
        local_1d80._0_4_ = (float)local_1d80._0_4_ * local_1d70;
        local_1d80._4_4_ = (float)local_1d80._4_4_ * fStack_1d6c;
        fVar168 = fVar168 * fStack_1d68;
        fVar169 = fVar169 * fStack_1d64;
        uStack_1d78._0_4_ = fVar168;
        uStack_1d78._4_4_ = fVar169;
        local_1cb0 = 0xb95e8083;
        uStack_1cac = 0xb95e8083;
        uStack_1ca8 = 0xb95e8083;
        uStack_1ca4 = 0xb95e8083;
        local_1ca0._0_4_ = local_1d40._0_4_;
        local_1ca0._4_4_ = local_1d40._4_4_;
        uStack_1c98._0_4_ = local_1d40._8_4_;
        uStack_1c98._4_4_ = local_1d40._12_4_;
        local_1d60 = CONCAT44(local_1ca0._4_4_ * -0.00021219444,(float)local_1ca0 * -0.00021219444);
        uStack_1d58._0_4_ = (float)uStack_1c98 * -0.00021219444;
        uStack_1d58._4_4_ = uStack_1c98._4_4_ * -0.00021219444;
        local_1ae0 = local_1d80;
        uStack_1ad8 = uStack_1d78;
        local_1af0 = local_1d60;
        uStack_1ae8 = uStack_1d58;
        local_1d80._4_4_ = (float)local_1d80._4_4_ + local_1ca0._4_4_ * -0.00021219444;
        local_1d80._0_4_ = (float)local_1d80._0_4_ + (float)local_1ca0 * -0.00021219444;
        uStack_1d78._0_4_ = fVar168 + (float)uStack_1c98 * -0.00021219444;
        uStack_1d78._4_4_ = fVar169 + uStack_1c98._4_4_ * -0.00021219444;
        local_1cc0 = CONCAT44(fStack_1d6c,local_1d70);
        uStack_1cb8 = CONCAT44(fStack_1d64,fStack_1d68);
        local_1cd0 = 0x3f000000;
        uStack_1ccc = 0x3f000000;
        uStack_1cc8 = 0x3f000000;
        uStack_1cc4 = 0x3f000000;
        local_1d60 = CONCAT44(fStack_1d6c * 0.5,local_1d70 * 0.5);
        uStack_1d58._0_4_ = fStack_1d68 * 0.5;
        uStack_1d58._4_4_ = fStack_1d64 * 0.5;
        local_1040 = local_1d80;
        uStack_1038 = uStack_1d78;
        local_1050 = local_1d60;
        uStack_1048 = uStack_1d58;
        auVar96._8_8_ = uStack_1d78;
        auVar96._0_8_ = local_1d80;
        auVar3._8_8_ = uStack_1d58;
        auVar3._0_8_ = local_1d60;
        _local_1d80 = vsubps_avx(auVar96,auVar3);
        local_1ce0 = local_1d40;
        uStack_1cd8 = uStack_1d38;
        local_1cf0 = 0x3f318000;
        uStack_1cec = 0x3f318000;
        uStack_1ce8 = 0x3f318000;
        uStack_1ce4 = 0x3f318000;
        local_1d60 = CONCAT44(local_1ca0._4_4_ * 0.6933594,(float)local_1ca0 * 0.6933594);
        uStack_1d58._0_4_ = (float)uStack_1c98 * 0.6933594;
        uStack_1d58._4_4_ = uStack_1c98._4_4_ * 0.6933594;
        local_1b00 = local_1d00;
        uStack_1af8 = uStack_1cf8;
        local_1b10._0_4_ = local_1d80._0_4_;
        local_1b10._4_4_ = local_1d80._4_4_;
        uStack_1b08._0_4_ = local_1d80._8_4_;
        uStack_1b08._4_4_ = local_1d80._12_4_;
        local_1d00._4_4_ = local_19c0._4_4_ + local_1b10._4_4_;
        local_1d00._0_4_ = (float)local_19c0 + (float)local_1b10;
        uStack_1cf8._0_4_ = (float)uStack_19b8 + (float)uStack_1b08;
        uStack_1cf8._4_4_ = uStack_19b8._4_4_ + uStack_1b08._4_4_;
        local_1b20 = local_1d00;
        uStack_1b18 = uStack_1cf8;
        local_1b30 = local_1d60;
        uStack_1b28 = uStack_1d58;
        local_1d00._4_4_ = local_19c0._4_4_ + local_1b10._4_4_ + local_1ca0._4_4_ * 0.6933594;
        local_1d00._0_4_ = (float)local_19c0 + (float)local_1b10 + (float)local_1ca0 * 0.6933594;
        uStack_1cf8._0_4_ = (float)uStack_19b8 + (float)uStack_1b08 + (float)uStack_1c98 * 0.6933594
        ;
        uStack_1cf8._4_4_ = uStack_19b8._4_4_ + uStack_1b08._4_4_ + uStack_1c98._4_4_ * 0.6933594;
        local_440 = local_1d00;
        uStack_438 = uStack_1cf8;
        local_450 = local_1d30._0_8_;
        uStack_448 = local_1d30._8_8_;
        auVar131._8_8_ = uStack_1cf8;
        auVar131._0_8_ = local_1d00;
        _local_1d00 = vpor_avx(auVar131,local_1d30);
        local_2020 = local_1d00;
        uStack_2018 = uStack_1cf8;
        local_1194 = 0x3f800000;
        local_11b0 = 0x3f800000;
        local_2030 = 0x3f8000003f800000;
        uStack_2028 = 0x3f8000003f800000;
        local_11b4 = 0x40000000;
        local_11d0 = 0x40000000;
        local_2040 = 0x4000000040000000;
        uStack_2038 = 0x4000000040000000;
        local_1fe0._0_4_ = local_1d00._0_4_;
        local_1fe0._4_4_ = local_1d00._4_4_;
        uStack_1fd8._0_4_ = local_1d00._8_4_;
        uStack_1fd8._4_4_ = local_1d00._12_4_;
        local_f40 = (float)local_1fe0 * 2.0;
        fStack_f3c = local_1fe0._4_4_ * 2.0;
        fStack_f38 = (float)uStack_1fd8 * 2.0;
        fStack_f34 = uStack_1fd8._4_4_ * 2.0;
        local_c04 = 0x3f800000;
        local_c20 = 0x3f800000;
        local_f50 = 0x3f8000003f800000;
        uStack_f48 = 0x3f8000003f800000;
        local_f20._8_8_ = 0x3f8000003f800000;
        local_f20._0_8_ = 0x3f8000003f800000;
        local_b90 = 0;
        uStack_b88 = local_710._8_8_;
        local_ba0 = CONCAT44(fStack_f3c,local_f40);
        uStack_b98 = CONCAT44(fStack_f34,fStack_f38);
        auVar163._8_8_ = 0;
        auVar163._0_8_ = local_710._8_8_;
        auVar107._8_8_ = uStack_b98;
        auVar107._0_8_ = local_ba0;
        auVar1 = vsubps_avx(auVar163 << 0x40,auVar107);
        uStack_748 = local_710._8_8_;
        local_150 = 0x7f0000007f;
        uStack_148 = 0x7f0000007f;
        local_ed0 = 0x3f800000;
        uStack_ecc = 0x3f800000;
        uStack_ec8 = 0x3f800000;
        uStack_ec4 = 0x3f800000;
        local_e90._0_8_ = auVar1._0_8_;
        local_2c0 = local_e90._0_8_;
        local_e90._8_8_ = auVar1._8_8_;
        uStack_2b8 = local_e90._8_8_;
        local_2d0 = 0x42b0c0a5;
        uStack_2cc = 0x42b0c0a5;
        uStack_2c8 = 0x42b0c0a5;
        uStack_2c4 = 0x42b0c0a5;
        auVar144._8_4_ = 0x42b0c0a5;
        auVar144._0_8_ = 0x42b0c0a542b0c0a5;
        auVar144._12_4_ = 0x42b0c0a5;
        auVar1 = vminps_avx(auVar1,auVar144);
        local_e90._0_8_ = auVar1._0_8_;
        local_680 = local_e90._0_8_;
        local_e90._8_8_ = auVar1._8_8_;
        uStack_678 = local_e90._8_8_;
        local_690 = 0xc2b0c0a5;
        uStack_68c = 0xc2b0c0a5;
        uStack_688 = 0xc2b0c0a5;
        uStack_684 = 0xc2b0c0a5;
        auVar116._8_4_ = 0xc2b0c0a5;
        auVar116._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar116._12_4_ = 0xc2b0c0a5;
        auVar3 = vmaxps_avx(auVar1,auVar116);
        local_e90._0_8_ = auVar3._0_8_;
        uVar16 = local_e90._0_8_;
        local_e90._8_8_ = auVar3._8_8_;
        uVar17 = local_e90._8_8_;
        local_d40 = 0x3fb8aa3b;
        uStack_d3c = 0x3fb8aa3b;
        uStack_d38 = 0x3fb8aa3b;
        uStack_d34 = 0x3fb8aa3b;
        local_d30._0_4_ = auVar3._0_4_;
        local_d30._4_4_ = auVar3._4_4_;
        uStack_d28._0_4_ = auVar3._8_4_;
        uStack_d28._4_4_ = auVar3._12_4_;
        local_eb0._4_4_ = local_d30._4_4_ * 1.442695;
        local_eb0._0_4_ = (float)local_d30 * 1.442695;
        uStack_ea8._0_4_ = (float)uStack_d28 * 1.442695;
        uStack_ea8._4_4_ = uStack_d28._4_4_ * 1.442695;
        local_c30 = local_eb0;
        uStack_c28 = uStack_ea8;
        local_c40 = 0x3f000000;
        uStack_c3c = 0x3f000000;
        uStack_c38 = 0x3f000000;
        uStack_c34 = 0x3f000000;
        local_eb0._0_4_ = (float)local_d30 * 1.442695 + 0.5;
        local_eb0._4_4_ = local_d30._4_4_ * 1.442695 + 0.5;
        fVar168 = (float)uStack_d28 * 1.442695 + 0.5;
        fVar169 = uStack_d28._4_4_ * 1.442695 + 0.5;
        uStack_ea8._0_4_ = fVar168;
        uStack_ea8._4_4_ = fVar169;
        local_240 = local_eb0;
        uStack_238 = uStack_ea8;
        local_ec0._4_4_ = (int)(float)local_eb0._4_4_;
        local_ec0._0_4_ = (int)(float)local_eb0._0_4_;
        local_ec0._8_4_ = (int)fVar168;
        local_ec0._12_4_ = (int)fVar169;
        local_380 = local_ec0._0_8_;
        uStack_378 = local_ec0._8_8_;
        auVar138._8_8_ = local_ec0._8_8_;
        auVar138._0_8_ = local_ec0._0_8_;
        auVar2 = vcvtdq2ps_avx(auVar138);
        local_ea0 = auVar2._0_8_;
        local_1c0 = local_ea0;
        uStack_e98 = auVar2._8_8_;
        uStack_1b8 = uStack_e98;
        local_1d0 = local_eb0;
        uStack_1c8 = uStack_ea8;
        auVar148._8_8_ = uStack_ea8;
        auVar148._0_8_ = local_eb0;
        auVar1 = vcmpps_avx(auVar148,auVar2,1);
        local_ee0._0_8_ = auVar1._0_8_;
        local_560 = local_ee0._0_8_;
        local_ee0._8_8_ = auVar1._8_8_;
        uStack_558 = local_ee0._8_8_;
        local_570 = 0x3f8000003f800000;
        uStack_568 = 0x3f8000003f800000;
        auVar124._8_8_ = 0x3f8000003f800000;
        auVar124._0_8_ = 0x3f8000003f800000;
        local_ee0 = vpand_avx(auVar1,auVar124);
        local_bb0 = local_ea0;
        uStack_ba8 = uStack_e98;
        local_bc0 = local_ee0._0_8_;
        uStack_bb8 = local_ee0._8_8_;
        _local_eb0 = vsubps_avx(auVar2,local_ee0);
        local_d60 = 0x3f318000;
        uStack_d5c = 0x3f318000;
        uStack_d58 = 0x3f318000;
        uStack_d54 = 0x3f318000;
        local_d50._0_4_ = local_eb0._0_4_;
        local_d50._4_4_ = local_eb0._4_4_;
        uStack_d48._0_4_ = local_eb0._8_4_;
        uStack_d48._4_4_ = local_eb0._12_4_;
        local_ea0 = CONCAT44(local_d50._4_4_ * 0.6933594,(float)local_d50 * 0.6933594);
        uStack_e98._0_4_ = (float)uStack_d48 * 0.6933594;
        uStack_e98._4_4_ = uStack_d48._4_4_ * 0.6933594;
        local_d70 = local_eb0;
        uStack_d68 = uStack_ea8;
        local_d80 = 0xb95e8083;
        uStack_d7c = 0xb95e8083;
        uStack_d78 = 0xb95e8083;
        uStack_d74 = 0xb95e8083;
        local_bd0 = local_e90._0_8_;
        uStack_bc8 = local_e90._8_8_;
        local_be0 = local_ea0;
        uStack_bd8 = uStack_e98;
        auVar106._8_8_ = uStack_e98;
        auVar106._0_8_ = local_ea0;
        auVar1 = vsubps_avx(auVar3,auVar106);
        local_e90._0_8_ = auVar1._0_8_;
        local_bf0 = local_e90._0_8_;
        local_e90._8_8_ = auVar1._8_8_;
        uStack_be8 = local_e90._8_8_;
        local_c00 = CONCAT44(local_d50._4_4_ * -0.00021219444,(float)local_d50 * -0.00021219444);
        uStack_bf8 = CONCAT44(uStack_d48._4_4_ * -0.00021219444,(float)uStack_d48 * -0.00021219444);
        auVar105._8_8_ = uStack_bf8;
        auVar105._0_8_ = local_c00;
        local_e90 = vsubps_avx(auVar1,auVar105);
        local_da0 = local_e90._0_8_;
        uStack_d98 = local_e90._8_8_;
        local_d90._0_4_ = local_e90._0_4_;
        local_d90._4_4_ = local_e90._4_4_;
        uStack_d88._0_4_ = local_e90._8_4_;
        uStack_d88._4_4_ = local_e90._12_4_;
        local_ef0 = (float)local_d90 * (float)local_d90;
        fStack_eec = local_d90._4_4_ * local_d90._4_4_;
        fStack_ee8 = (float)uStack_d88 * (float)uStack_d88;
        fStack_ee4 = uStack_d88._4_4_ * uStack_d88._4_4_;
        local_db0 = 0x3950696739506967;
        uStack_da8 = 0x3950696739506967;
        local_dc0 = local_e90._0_8_;
        uStack_db8 = local_e90._8_8_;
        local_c50 = CONCAT44(local_d90._4_4_ * 0.00019875691,(float)local_d90 * 0.00019875691);
        uStack_c48 = CONCAT44(uStack_d88._4_4_ * 0.00019875691,(float)uStack_d88 * 0.00019875691);
        local_c60 = 0x3ab743ce;
        uStack_c5c = 0x3ab743ce;
        uStack_c58 = 0x3ab743ce;
        uStack_c54 = 0x3ab743ce;
        local_f00 = (float)local_d90 * 0.00019875691 + 0.0013981999;
        fStack_efc = local_d90._4_4_ * 0.00019875691 + 0.0013981999;
        fStack_ef8 = (float)uStack_d88 * 0.00019875691 + 0.0013981999;
        fStack_ef4 = uStack_d88._4_4_ * 0.00019875691 + 0.0013981999;
        local_dd0 = CONCAT44(fStack_efc,local_f00);
        uStack_dc8 = CONCAT44(fStack_ef4,fStack_ef8);
        local_de0 = local_e90._0_8_;
        uStack_dd8 = local_e90._8_8_;
        local_f00 = local_f00 * (float)local_d90;
        fStack_efc = fStack_efc * local_d90._4_4_;
        fStack_ef8 = fStack_ef8 * (float)uStack_d88;
        fStack_ef4 = fStack_ef4 * uStack_d88._4_4_;
        local_c70 = CONCAT44(fStack_efc,local_f00);
        uStack_c68 = CONCAT44(fStack_ef4,fStack_ef8);
        local_c80 = 0x3c088908;
        uStack_c7c = 0x3c088908;
        uStack_c78 = 0x3c088908;
        uStack_c74 = 0x3c088908;
        local_f00 = local_f00 + 0.008333452;
        fStack_efc = fStack_efc + 0.008333452;
        fStack_ef8 = fStack_ef8 + 0.008333452;
        fStack_ef4 = fStack_ef4 + 0.008333452;
        local_df0 = CONCAT44(fStack_efc,local_f00);
        uStack_de8 = CONCAT44(fStack_ef4,fStack_ef8);
        local_e00 = local_e90._0_8_;
        uStack_df8 = local_e90._8_8_;
        local_f00 = (float)local_d90 * local_f00;
        fStack_efc = local_d90._4_4_ * fStack_efc;
        fStack_ef8 = (float)uStack_d88 * fStack_ef8;
        fStack_ef4 = uStack_d88._4_4_ * fStack_ef4;
        local_c90 = CONCAT44(fStack_efc,local_f00);
        uStack_c88 = CONCAT44(fStack_ef4,fStack_ef8);
        local_ca0 = 0x3d2aa9c1;
        uStack_c9c = 0x3d2aa9c1;
        uStack_c98 = 0x3d2aa9c1;
        uStack_c94 = 0x3d2aa9c1;
        local_f00 = local_f00 + 0.041665796;
        fStack_efc = fStack_efc + 0.041665796;
        fStack_ef8 = fStack_ef8 + 0.041665796;
        fStack_ef4 = fStack_ef4 + 0.041665796;
        local_e10 = CONCAT44(fStack_efc,local_f00);
        uStack_e08 = CONCAT44(fStack_ef4,fStack_ef8);
        local_e20 = local_e90._0_8_;
        uStack_e18 = local_e90._8_8_;
        local_f00 = local_f00 * (float)local_d90;
        fStack_efc = fStack_efc * local_d90._4_4_;
        fStack_ef8 = fStack_ef8 * (float)uStack_d88;
        fStack_ef4 = fStack_ef4 * uStack_d88._4_4_;
        local_cb0 = CONCAT44(fStack_efc,local_f00);
        uStack_ca8 = CONCAT44(fStack_ef4,fStack_ef8);
        local_cc0 = 0x3e2aaaaa;
        uStack_cbc = 0x3e2aaaaa;
        uStack_cb8 = 0x3e2aaaaa;
        uStack_cb4 = 0x3e2aaaaa;
        local_f00 = local_f00 + 0.16666666;
        fStack_efc = fStack_efc + 0.16666666;
        fStack_ef8 = fStack_ef8 + 0.16666666;
        fStack_ef4 = fStack_ef4 + 0.16666666;
        local_e30 = CONCAT44(fStack_efc,local_f00);
        uStack_e28 = CONCAT44(fStack_ef4,fStack_ef8);
        local_e40 = local_e90._0_8_;
        uStack_e38 = local_e90._8_8_;
        local_f00 = local_f00 * (float)local_d90;
        fStack_efc = fStack_efc * local_d90._4_4_;
        fStack_ef8 = fStack_ef8 * (float)uStack_d88;
        fStack_ef4 = fStack_ef4 * uStack_d88._4_4_;
        local_cd0 = CONCAT44(fStack_efc,local_f00);
        uStack_cc8 = CONCAT44(fStack_ef4,fStack_ef8);
        local_ce0 = 0x3f000000;
        uStack_cdc = 0x3f000000;
        uStack_cd8 = 0x3f000000;
        uStack_cd4 = 0x3f000000;
        local_f00 = local_f00 + 0.5;
        fStack_efc = fStack_efc + 0.5;
        fStack_ef8 = fStack_ef8 + 0.5;
        fStack_ef4 = fStack_ef4 + 0.5;
        local_e50 = CONCAT44(fStack_efc,local_f00);
        uStack_e48 = CONCAT44(fStack_ef4,fStack_ef8);
        local_e60 = CONCAT44(fStack_eec,local_ef0);
        uStack_e58 = CONCAT44(fStack_ee4,fStack_ee8);
        local_f00 = local_f00 * local_ef0;
        fStack_efc = fStack_efc * fStack_eec;
        fStack_ef8 = fStack_ef8 * fStack_ee8;
        fStack_ef4 = fStack_ef4 * fStack_ee4;
        local_cf0 = CONCAT44(fStack_efc,local_f00);
        uStack_ce8 = CONCAT44(fStack_ef4,fStack_ef8);
        local_d00 = local_e90._0_8_;
        uStack_cf8 = local_e90._8_8_;
        local_f00 = local_f00 + (float)local_d90;
        fStack_efc = fStack_efc + local_d90._4_4_;
        fStack_ef8 = fStack_ef8 + (float)uStack_d88;
        fStack_ef4 = fStack_ef4 + uStack_d88._4_4_;
        local_d10 = CONCAT44(fStack_efc,local_f00);
        uStack_d08 = CONCAT44(fStack_ef4,fStack_ef8);
        local_d20 = 0x3f8000003f800000;
        uStack_d18 = 0x3f8000003f800000;
        local_f00 = local_f00 + 1.0;
        fStack_efc = fStack_efc + 1.0;
        fStack_ef8 = fStack_ef8 + 1.0;
        fStack_ef4 = fStack_ef4 + 1.0;
        local_250 = local_eb0;
        uStack_248 = uStack_ea8;
        local_ec0._4_4_ = (int)local_d50._4_4_;
        local_ec0._0_4_ = (int)(float)local_d50;
        local_ec0._8_4_ = (int)(float)uStack_d48;
        local_ec0._12_4_ = (int)uStack_d48._4_4_;
        local_140 = local_ec0._0_8_;
        uStack_138 = local_ec0._8_8_;
        auVar154._8_8_ = local_ec0._8_8_;
        auVar154._0_8_ = local_ec0._0_8_;
        auVar153._8_8_ = 0x7f0000007f;
        auVar153._0_8_ = 0x7f0000007f;
        auVar1 = vpaddd_avx(auVar154,auVar153);
        local_ec0._0_8_ = auVar1._0_8_;
        local_c0 = local_ec0._0_8_;
        local_ec0._8_8_ = auVar1._8_8_;
        uStack_b8 = local_ec0._8_8_;
        local_c4 = 0x17;
        local_ec0 = vpslld_avx(auVar1,ZEXT416(0x17));
        local_60 = local_ec0._0_8_;
        uStack_58 = local_ec0._8_8_;
        local_f10 = local_ec0._0_8_;
        uStack_f08 = local_ec0._8_8_;
        local_e70._4_4_ = fStack_efc;
        local_e70._0_4_ = local_f00;
        local_e70._8_4_ = fStack_ef8;
        local_e70._12_4_ = fStack_ef4;
        local_e80._0_4_ = local_ec0._0_4_;
        local_e80._4_4_ = local_ec0._4_4_;
        uStack_e78._0_4_ = local_ec0._8_4_;
        uStack_e78._4_4_ = local_ec0._12_4_;
        local_f00 = local_f00 * (float)local_e80;
        fStack_efc = fStack_efc * local_e80._4_4_;
        fStack_ef8 = fStack_ef8 * (float)uStack_e78;
        fStack_ef4 = fStack_ef4 * uStack_e78._4_4_;
        local_f30 = CONCAT44(fStack_efc,local_f00);
        uStack_f28 = CONCAT44(fStack_ef4,fStack_ef8);
        local_790 = local_f00 + 1.0;
        fStack_78c = fStack_efc + 1.0;
        fStack_788 = fStack_ef8 + 1.0;
        fStack_784 = fStack_ef4 + 1.0;
        auVar112._4_4_ = fStack_78c;
        auVar112._0_4_ = local_790;
        auVar112._8_4_ = fStack_788;
        auVar112._12_4_ = fStack_784;
        _local_2000 = vdivps_avx(local_f20,auVar112);
        local_f80._0_4_ = (float)local_2000._0_4_ * 2.0;
        local_f80._4_4_ = (float)local_2000._4_4_ * 2.0;
        local_f80._8_4_ = fStack_1ff8 * 2.0;
        local_f80._12_4_ = fStack_1ff4 * 2.0;
        auVar103._8_8_ = 0x3f8000003f800000;
        auVar103._0_8_ = 0x3f8000003f800000;
        _local_20d0 = vsubps_avx(local_f80,auVar103);
        local_20c0._0_4_ = (float)local_6300;
        local_20c0._4_4_ = (float)((ulong)local_6300 >> 0x20);
        uStack_20b8._0_4_ = (float)in_stack_ffffffffffff98e8;
        uStack_20b8._4_4_ = (float)((ulong)in_stack_ffffffffffff98e8 >> 0x20);
        local_65b0 = CONCAT44(local_20c0._4_4_ * (float)local_20d0._4_4_,
                              (float)local_20c0 * (float)local_20d0._0_4_);
        uStack_65a8 = CONCAT44(uStack_20b8._4_4_ * fStack_20c4,(float)uStack_20b8 * fStack_20c8);
        local_62c8 = local_6520;
        local_62e0 = local_65b0;
        uStack_62d8 = uStack_65a8;
        auVar1._8_8_ = uStack_65a8;
        auVar1._0_8_ = local_65b0;
        *(undefined1 (*) [16])*local_6520 = auVar1;
        local_6520 = (undefined1 (*) [32])(*local_6520 + 0x10);
        uStack_62f8 = in_stack_ffffffffffff98e8;
        local_20c0 = local_6300;
        uStack_20b8 = in_stack_ffffffffffff98e8;
        local_2010 = local_2040;
        uStack_2008 = uStack_2038;
        local_1ff0 = local_2040;
        uStack_1fe8 = uStack_2038;
        local_1fe0 = local_1d00;
        uStack_1fd8 = uStack_1cf8;
        local_1ca0 = local_1d40;
        uStack_1c98 = uStack_1d38;
        local_1b40 = local_1b50;
        uStack_1b38 = uStack_1b48;
        local_1b10 = local_1d80;
        uStack_1b08 = uStack_1d78;
        local_19d0 = uVar14;
        uStack_19c8 = uVar15;
        local_19c0 = uVar12;
        uStack_19b8 = uVar13;
        local_19a0 = uVar10;
        uStack_1998 = uVar11;
        local_1430 = local_1470._0_8_;
        uStack_1428 = local_1470._8_8_;
        local_1340 = local_1350;
        uStack_1338 = uStack_1348;
        local_1300 = local_1460;
        uStack_12f8 = uStack_1458;
        local_12e0 = uVar8;
        uStack_12d8 = uVar9;
        uStack_11cc = local_11d0;
        uStack_11c8 = local_11d0;
        uStack_11c4 = local_11d0;
        uStack_11ac = local_11b0;
        uStack_11a8 = local_11b0;
        uStack_11a4 = local_11b0;
        uStack_112c = local_1130;
        uStack_1128 = local_1130;
        uStack_1124 = local_1130;
        local_f90 = local_2030;
        uStack_f88 = uStack_2028;
        local_e80 = local_ec0._0_8_;
        uStack_e78 = local_ec0._8_8_;
        local_d90 = local_da0;
        uStack_d88 = uStack_d98;
        local_d50 = local_eb0;
        uStack_d48 = uStack_ea8;
        local_d30 = uVar16;
        uStack_d28 = uVar17;
        uStack_c1c = local_c20;
        uStack_c18 = local_c20;
        uStack_c14 = local_c20;
        local_780 = local_f20;
        local_740 = in_stack_ffffffffffff98f0;
        local_730 = in_stack_ffffffffffff98f0;
        local_710 = in_stack_ffffffffffff98f0;
        local_2a0 = local_6300;
        uStack_298 = in_stack_ffffffffffff98e8;
        local_130 = local_3d0;
        uStack_128 = uStack_3c8;
      }
      for (; local_656c < local_6400; local_656c = local_656c + 1) {
        fVar168 = *(float *)*local_6520;
        dVar167 = std::exp((double)(ulong)*(uint *)*local_6520);
        dVar167 = std::log((double)(ulong)(uint)(SUB84(dVar167,0) + 1.0));
        dVar167 = std::tanh(dVar167);
        *(float *)*local_6520 = fVar168 * SUB84(dVar167,0);
        local_6520 = (undefined1 (*) [32])(*local_6520 + 4);
      }
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanh(log(exp(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}